

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_pack8.h
# Opt level: O0

void ncnn::convdw3x3s1_pack8_avx(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined8 uVar50;
  undefined8 uVar51;
  undefined8 uVar52;
  undefined8 uVar53;
  undefined8 uVar54;
  undefined8 uVar55;
  undefined8 uVar56;
  undefined8 uVar57;
  undefined8 uVar58;
  undefined8 uVar59;
  undefined8 uVar60;
  undefined8 uVar61;
  undefined8 uVar62;
  undefined8 uVar63;
  undefined8 uVar64;
  undefined8 uVar65;
  undefined8 uVar66;
  undefined8 uVar67;
  undefined8 uVar68;
  undefined8 uVar69;
  undefined8 uVar70;
  undefined8 uVar71;
  undefined8 uVar72;
  undefined8 uVar73;
  undefined8 uVar74;
  undefined8 uVar75;
  undefined8 uVar76;
  undefined8 uVar77;
  undefined8 uVar78;
  Mat *in_RCX;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  float fVar79;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  undefined1 auVar80 [32];
  float fVar87;
  __m256 _r22_3;
  __m256 _r21_3;
  __m256 _r20_3;
  __m256 _r12_3;
  __m256 _r11_3;
  __m256 _r10_3;
  __m256 _r02_3;
  __m256 _r01_3;
  __m256 _r00_3;
  __m256 _sum0_3;
  __m256 _r23_2;
  __m256 _r13_2;
  __m256 _r03_2;
  __m256 _sum1_2;
  __m256 _r22_2;
  __m256 _r21_2;
  __m256 _r20_2;
  __m256 _r12_2;
  __m256 _r11_2;
  __m256 _r10_2;
  __m256 _r02_2;
  __m256 _r01_2;
  __m256 _r00_2;
  __m256 _sum0_2;
  __m256 _r25_1;
  __m256 _r15_1;
  __m256 _r05_1;
  __m256 _sum3_1;
  __m256 _r24_1;
  __m256 _r14_1;
  __m256 _r04_1;
  __m256 _sum2_1;
  __m256 _r23_1;
  __m256 _r13_1;
  __m256 _r03_1;
  __m256 _sum1_1;
  __m256 _r22_1;
  __m256 _r21_1;
  __m256 _r20_1;
  __m256 _r12_1;
  __m256 _r11_1;
  __m256 _r10_1;
  __m256 _r02_1;
  __m256 _r01_1;
  __m256 _r00_1;
  __m256 _sum0_1;
  __m256 _r29;
  __m256 _r19;
  __m256 _r09;
  __m256 _sum7;
  __m256 _r28;
  __m256 _r18;
  __m256 _r08;
  __m256 _sum6;
  __m256 _r27;
  __m256 _r17;
  __m256 _r07;
  __m256 _sum5;
  __m256 _r26;
  __m256 _r16;
  __m256 _r06;
  __m256 _sum4;
  __m256 _r25;
  __m256 _r15;
  __m256 _r05;
  __m256 _sum3;
  __m256 _r24;
  __m256 _r14;
  __m256 _r04;
  __m256 _sum2;
  __m256 _r23;
  __m256 _r13;
  __m256 _r03;
  __m256 _sum1;
  __m256 _r22;
  __m256 _r21;
  __m256 _r20;
  __m256 _r12;
  __m256 _r11;
  __m256 _r10;
  __m256 _r02;
  __m256 _r01;
  __m256 _r00;
  __m256 _sum0;
  int j;
  int i;
  __m256 _k22;
  __m256 _k21;
  __m256 _k20;
  __m256 _k12;
  __m256 _k11;
  __m256 _k10;
  __m256 _k02;
  __m256 _k01;
  __m256 _k00;
  float *r2;
  float *r1;
  float *r0;
  Mat img0;
  float *outptr0;
  float *k0;
  __m256 _bias0;
  Mat out;
  int g;
  float *bias;
  int group;
  int outh;
  int outw;
  float in_stack_ffffffffffff5b0c;
  float in_stack_ffffffffffff5b10;
  float in_stack_ffffffffffff5b14;
  undefined8 local_8a20;
  undefined8 uStack_8a18;
  undefined8 uStack_8a10;
  undefined8 uStack_8a08;
  int local_7f48;
  int local_7f44;
  float *local_7e20;
  float *local_7e18;
  float *local_7e10;
  Mat local_7e08;
  float *local_7dc0;
  float *local_7db8;
  undefined8 local_7da0;
  undefined8 uStack_7d98;
  undefined8 uStack_7d90;
  undefined8 uStack_7d88;
  Mat local_7d70;
  int local_7d24;
  float *local_7d20;
  int local_7d14;
  int local_7d10;
  int local_7d0c;
  Mat *local_7cf8;
  undefined4 local_7cdc;
  float *local_7cd8;
  float *local_7cd0;
  float *local_7cc8;
  float *local_7cc0;
  float *local_7cb8;
  float *local_7cb0;
  float *local_7ca8;
  float *local_7ca0;
  float *local_7c98;
  float *local_7c90;
  float *local_7c88;
  float *local_7c80;
  float *local_7c78;
  float *local_7c70;
  float *local_7c68;
  float *local_7c60;
  float *local_7c58;
  float *local_7c50;
  float *local_7c48;
  float *local_7c40;
  float *local_7c38;
  float *local_7c30;
  float *local_7c28;
  float *local_7c20;
  float *local_7c18;
  float *local_7c10;
  float *local_7c08;
  float *local_7c00;
  float *local_7bf8;
  float *local_7bf0;
  float *local_7be8;
  float *local_7be0;
  float *local_7bd8;
  float *local_7bd0;
  float *local_7bc8;
  float *local_7bc0;
  float *local_7bb8;
  float *local_7bb0;
  float *local_7ba8;
  float *local_7ba0;
  float *local_7b98;
  float *local_7b90;
  float *local_7b88;
  float *local_7b80;
  float *local_7b78;
  float *local_7b70;
  float *local_7b68;
  float *local_7b60;
  float *local_7b58;
  float *local_7b50;
  float *local_7b48;
  float *local_7b40;
  float *local_7b38;
  float *local_7b30;
  float *local_7b28;
  float *local_7b20;
  float *local_7b18;
  float *local_7b10;
  float *local_7b08;
  float *local_7b00;
  float *local_7af8;
  float *local_7af0;
  float *local_7ae8;
  float *local_7ae0;
  float *local_7ad8;
  float *local_7ad0;
  float *local_7ac8;
  float *local_7ac0;
  float *local_7ab8;
  float *local_7ab0;
  float *local_7aa8;
  float *local_7aa0;
  float *local_7a98;
  float *local_7a90;
  float *local_7a88;
  float *local_7a80;
  float *local_7a78;
  float *local_7a70;
  float *local_7a68;
  undefined8 local_7a60;
  undefined8 uStack_7a58;
  undefined8 uStack_7a50;
  undefined8 uStack_7a48;
  undefined8 local_7a40;
  undefined8 uStack_7a38;
  undefined8 uStack_7a30;
  undefined8 uStack_7a28;
  undefined8 local_7a20;
  undefined8 uStack_7a18;
  undefined8 uStack_7a10;
  undefined8 uStack_7a08;
  undefined8 local_7a00;
  undefined8 uStack_79f8;
  undefined8 uStack_79f0;
  undefined8 uStack_79e8;
  undefined8 local_79e0;
  undefined8 uStack_79d8;
  undefined8 uStack_79d0;
  undefined8 uStack_79c8;
  undefined8 local_79c0;
  undefined8 uStack_79b8;
  undefined8 uStack_79b0;
  undefined8 uStack_79a8;
  undefined8 local_79a0;
  undefined8 uStack_7998;
  undefined8 uStack_7990;
  undefined8 uStack_7988;
  undefined8 local_7980;
  undefined8 uStack_7978;
  undefined8 uStack_7970;
  undefined8 uStack_7968;
  undefined8 local_7960;
  undefined8 uStack_7958;
  undefined8 uStack_7950;
  undefined8 uStack_7948;
  undefined8 local_7940;
  undefined8 uStack_7938;
  undefined8 uStack_7930;
  undefined8 uStack_7928;
  undefined8 local_7920;
  undefined8 uStack_7918;
  undefined8 uStack_7910;
  undefined8 uStack_7908;
  undefined8 local_7900;
  undefined8 uStack_78f8;
  undefined8 uStack_78f0;
  undefined8 uStack_78e8;
  undefined8 local_78e0;
  undefined8 uStack_78d8;
  undefined8 uStack_78d0;
  undefined8 uStack_78c8;
  undefined8 local_78c0;
  undefined8 uStack_78b8;
  undefined8 uStack_78b0;
  undefined8 uStack_78a8;
  undefined8 local_78a0;
  undefined8 uStack_7898;
  undefined8 uStack_7890;
  undefined8 uStack_7888;
  undefined8 local_7880;
  undefined8 uStack_7878;
  undefined8 uStack_7870;
  undefined8 uStack_7868;
  undefined8 local_7860;
  undefined8 uStack_7858;
  undefined8 uStack_7850;
  undefined8 uStack_7848;
  undefined8 local_7840;
  undefined8 uStack_7838;
  undefined8 uStack_7830;
  undefined8 uStack_7828;
  undefined8 local_7820;
  undefined8 uStack_7818;
  undefined8 uStack_7810;
  undefined8 uStack_7808;
  undefined8 local_7800;
  undefined8 uStack_77f8;
  undefined8 uStack_77f0;
  undefined8 uStack_77e8;
  undefined8 local_77e0;
  undefined8 uStack_77d8;
  undefined8 uStack_77d0;
  undefined8 uStack_77c8;
  undefined8 local_77c0;
  undefined8 uStack_77b8;
  undefined8 uStack_77b0;
  undefined8 uStack_77a8;
  undefined8 local_77a0;
  undefined8 uStack_7798;
  undefined8 uStack_7790;
  undefined8 uStack_7788;
  undefined8 local_7780;
  undefined8 uStack_7778;
  undefined8 uStack_7770;
  undefined8 uStack_7768;
  undefined8 local_7760;
  undefined8 uStack_7758;
  undefined8 uStack_7750;
  undefined8 uStack_7748;
  undefined8 local_7740;
  undefined8 uStack_7738;
  undefined8 uStack_7730;
  undefined8 uStack_7728;
  undefined8 local_7720;
  undefined8 uStack_7718;
  undefined8 uStack_7710;
  undefined8 uStack_7708;
  undefined8 local_7700;
  undefined8 uStack_76f8;
  undefined8 uStack_76f0;
  undefined8 uStack_76e8;
  undefined8 local_76e0;
  undefined8 uStack_76d8;
  undefined8 uStack_76d0;
  undefined8 uStack_76c8;
  undefined8 local_76c0;
  undefined8 uStack_76b8;
  undefined8 uStack_76b0;
  undefined8 uStack_76a8;
  undefined8 local_76a0;
  undefined8 uStack_7698;
  undefined8 uStack_7690;
  undefined8 uStack_7688;
  undefined8 local_7680;
  undefined8 uStack_7678;
  undefined8 uStack_7670;
  undefined8 uStack_7668;
  undefined8 local_7660;
  undefined8 uStack_7658;
  undefined8 uStack_7650;
  undefined8 uStack_7648;
  undefined8 local_7640;
  undefined8 uStack_7638;
  undefined8 uStack_7630;
  undefined8 uStack_7628;
  undefined8 local_7620;
  undefined8 uStack_7618;
  undefined8 uStack_7610;
  undefined8 uStack_7608;
  undefined8 local_7600;
  undefined8 uStack_75f8;
  undefined8 uStack_75f0;
  undefined8 uStack_75e8;
  undefined8 local_75e0;
  undefined8 uStack_75d8;
  undefined8 uStack_75d0;
  undefined8 uStack_75c8;
  undefined8 local_75c0;
  undefined8 uStack_75b8;
  undefined8 uStack_75b0;
  undefined8 uStack_75a8;
  undefined8 local_75a0;
  undefined8 uStack_7598;
  undefined8 uStack_7590;
  undefined8 uStack_7588;
  undefined8 local_7580;
  undefined8 uStack_7578;
  undefined8 uStack_7570;
  undefined8 uStack_7568;
  undefined8 local_7560;
  undefined8 uStack_7558;
  undefined8 uStack_7550;
  undefined8 uStack_7548;
  undefined8 local_7540;
  undefined8 uStack_7538;
  undefined8 uStack_7530;
  undefined8 uStack_7528;
  undefined8 local_7520;
  undefined8 uStack_7518;
  undefined8 uStack_7510;
  undefined8 uStack_7508;
  undefined8 local_7500;
  undefined8 uStack_74f8;
  undefined8 uStack_74f0;
  undefined8 uStack_74e8;
  undefined8 local_74e0;
  undefined8 uStack_74d8;
  undefined8 uStack_74d0;
  undefined8 uStack_74c8;
  undefined8 local_74c0;
  undefined8 uStack_74b8;
  undefined8 uStack_74b0;
  undefined8 uStack_74a8;
  undefined8 local_74a0;
  undefined8 uStack_7498;
  undefined8 uStack_7490;
  undefined8 uStack_7488;
  undefined8 local_7480;
  undefined8 uStack_7478;
  undefined8 uStack_7470;
  undefined8 uStack_7468;
  undefined8 local_7460;
  undefined8 uStack_7458;
  undefined8 uStack_7450;
  undefined8 uStack_7448;
  undefined8 local_7440;
  undefined8 uStack_7438;
  undefined8 uStack_7430;
  undefined8 uStack_7428;
  undefined8 local_7420;
  undefined8 uStack_7418;
  undefined8 uStack_7410;
  undefined8 uStack_7408;
  undefined8 local_7400;
  undefined8 uStack_73f8;
  undefined8 uStack_73f0;
  undefined8 uStack_73e8;
  undefined8 local_73e0;
  undefined8 uStack_73d8;
  undefined8 uStack_73d0;
  undefined8 uStack_73c8;
  undefined8 local_73c0;
  undefined8 uStack_73b8;
  undefined8 uStack_73b0;
  undefined8 uStack_73a8;
  undefined8 local_73a0;
  undefined8 uStack_7398;
  undefined8 uStack_7390;
  undefined8 uStack_7388;
  undefined8 local_7380;
  undefined8 uStack_7378;
  undefined8 uStack_7370;
  undefined8 uStack_7368;
  undefined8 local_7360;
  undefined8 uStack_7358;
  undefined8 uStack_7350;
  undefined8 uStack_7348;
  undefined8 local_7340;
  undefined8 uStack_7338;
  undefined8 uStack_7330;
  undefined8 uStack_7328;
  undefined8 local_7320;
  undefined8 uStack_7318;
  undefined8 uStack_7310;
  undefined8 uStack_7308;
  undefined8 local_7300;
  undefined8 uStack_72f8;
  undefined8 uStack_72f0;
  undefined8 uStack_72e8;
  undefined8 local_72e0;
  undefined8 uStack_72d8;
  undefined8 uStack_72d0;
  undefined8 uStack_72c8;
  undefined8 local_72c0;
  undefined8 uStack_72b8;
  undefined8 uStack_72b0;
  undefined8 uStack_72a8;
  undefined8 local_72a0;
  undefined8 uStack_7298;
  undefined8 uStack_7290;
  undefined8 uStack_7288;
  undefined8 local_7280;
  undefined8 uStack_7278;
  undefined8 uStack_7270;
  undefined8 uStack_7268;
  undefined8 local_7260;
  undefined8 uStack_7258;
  undefined8 uStack_7250;
  undefined8 uStack_7248;
  undefined8 local_7240;
  undefined8 uStack_7238;
  undefined8 uStack_7230;
  undefined8 uStack_7228;
  undefined8 local_7220;
  undefined8 uStack_7218;
  undefined8 uStack_7210;
  undefined8 uStack_7208;
  undefined8 local_7200;
  undefined8 uStack_71f8;
  undefined8 uStack_71f0;
  undefined8 uStack_71e8;
  undefined8 local_71e0;
  undefined8 uStack_71d8;
  undefined8 uStack_71d0;
  undefined8 uStack_71c8;
  undefined8 local_71c0;
  undefined8 uStack_71b8;
  undefined8 uStack_71b0;
  undefined8 uStack_71a8;
  undefined8 local_71a0;
  undefined8 uStack_7198;
  undefined8 uStack_7190;
  undefined8 uStack_7188;
  undefined8 local_7180;
  undefined8 uStack_7178;
  undefined8 uStack_7170;
  undefined8 uStack_7168;
  undefined8 local_7160;
  undefined8 uStack_7158;
  undefined8 uStack_7150;
  undefined8 uStack_7148;
  undefined8 local_7140;
  undefined8 uStack_7138;
  undefined8 uStack_7130;
  undefined8 uStack_7128;
  undefined8 local_7120;
  undefined8 uStack_7118;
  undefined8 uStack_7110;
  undefined8 uStack_7108;
  undefined8 local_7100;
  undefined8 uStack_70f8;
  undefined8 uStack_70f0;
  undefined8 uStack_70e8;
  undefined8 local_70e0;
  undefined8 uStack_70d8;
  undefined8 uStack_70d0;
  undefined8 uStack_70c8;
  undefined8 local_70c0;
  undefined8 uStack_70b8;
  undefined8 uStack_70b0;
  undefined8 uStack_70a8;
  undefined8 local_70a0;
  undefined8 uStack_7098;
  undefined8 uStack_7090;
  undefined8 uStack_7088;
  undefined8 local_7080;
  undefined8 uStack_7078;
  undefined8 uStack_7070;
  undefined8 uStack_7068;
  undefined8 local_7060;
  undefined8 uStack_7058;
  undefined8 uStack_7050;
  undefined8 uStack_7048;
  undefined8 local_7040;
  undefined8 uStack_7038;
  undefined8 uStack_7030;
  undefined8 uStack_7028;
  undefined8 local_7020;
  undefined8 uStack_7018;
  undefined8 uStack_7010;
  undefined8 uStack_7008;
  undefined8 local_7000;
  undefined8 uStack_6ff8;
  undefined8 uStack_6ff0;
  undefined8 uStack_6fe8;
  undefined8 local_6fe0;
  undefined8 uStack_6fd8;
  undefined8 uStack_6fd0;
  undefined8 uStack_6fc8;
  undefined8 local_6fc0;
  undefined8 uStack_6fb8;
  undefined8 uStack_6fb0;
  undefined8 uStack_6fa8;
  undefined8 local_6fa0;
  undefined8 uStack_6f98;
  undefined8 uStack_6f90;
  undefined8 uStack_6f88;
  undefined8 local_6f80;
  undefined8 uStack_6f78;
  undefined8 uStack_6f70;
  undefined8 uStack_6f68;
  undefined8 local_6f60;
  undefined8 uStack_6f58;
  undefined8 uStack_6f50;
  undefined8 uStack_6f48;
  undefined8 local_6f40;
  undefined8 uStack_6f38;
  undefined8 uStack_6f30;
  undefined8 uStack_6f28;
  undefined8 local_6f20;
  undefined8 uStack_6f18;
  undefined8 uStack_6f10;
  undefined8 uStack_6f08;
  undefined8 local_6f00;
  undefined8 uStack_6ef8;
  undefined8 uStack_6ef0;
  undefined8 uStack_6ee8;
  undefined8 local_6ee0;
  undefined8 uStack_6ed8;
  undefined8 uStack_6ed0;
  undefined8 uStack_6ec8;
  undefined8 local_6ec0;
  undefined8 uStack_6eb8;
  undefined8 uStack_6eb0;
  undefined8 uStack_6ea8;
  undefined8 local_6ea0;
  undefined8 uStack_6e98;
  undefined8 uStack_6e90;
  undefined8 uStack_6e88;
  undefined8 local_6e80;
  undefined8 uStack_6e78;
  undefined8 uStack_6e70;
  undefined8 uStack_6e68;
  undefined8 local_6e60;
  undefined8 uStack_6e58;
  undefined8 uStack_6e50;
  undefined8 uStack_6e48;
  undefined8 local_6e40;
  undefined8 uStack_6e38;
  undefined8 uStack_6e30;
  undefined8 uStack_6e28;
  undefined8 local_6e20;
  undefined8 uStack_6e18;
  undefined8 uStack_6e10;
  undefined8 uStack_6e08;
  undefined8 local_6e00;
  undefined8 uStack_6df8;
  undefined8 uStack_6df0;
  undefined8 uStack_6de8;
  undefined8 local_6de0;
  undefined8 uStack_6dd8;
  undefined8 uStack_6dd0;
  undefined8 uStack_6dc8;
  undefined8 local_6dc0;
  undefined8 uStack_6db8;
  undefined8 uStack_6db0;
  undefined8 uStack_6da8;
  undefined8 local_6da0;
  undefined8 uStack_6d98;
  undefined8 uStack_6d90;
  undefined8 uStack_6d88;
  undefined8 local_6d80;
  undefined8 uStack_6d78;
  undefined8 uStack_6d70;
  undefined8 uStack_6d68;
  undefined8 local_6d60;
  undefined8 uStack_6d58;
  undefined8 uStack_6d50;
  undefined8 uStack_6d48;
  undefined8 local_6d40;
  undefined8 uStack_6d38;
  undefined8 uStack_6d30;
  undefined8 uStack_6d28;
  undefined8 local_6d20;
  undefined8 uStack_6d18;
  undefined8 uStack_6d10;
  undefined8 uStack_6d08;
  undefined8 local_6d00;
  undefined8 uStack_6cf8;
  undefined8 uStack_6cf0;
  undefined8 uStack_6ce8;
  undefined8 local_6ce0;
  undefined8 uStack_6cd8;
  undefined8 uStack_6cd0;
  undefined8 uStack_6cc8;
  undefined8 local_6cc0;
  undefined8 uStack_6cb8;
  undefined8 uStack_6cb0;
  undefined8 uStack_6ca8;
  undefined8 local_6ca0;
  undefined8 uStack_6c98;
  undefined8 uStack_6c90;
  undefined8 uStack_6c88;
  undefined8 local_6c80;
  undefined8 uStack_6c78;
  undefined8 uStack_6c70;
  undefined8 uStack_6c68;
  undefined8 local_6c60;
  undefined8 uStack_6c58;
  undefined8 uStack_6c50;
  undefined8 uStack_6c48;
  undefined8 local_6c40;
  undefined8 uStack_6c38;
  undefined8 uStack_6c30;
  undefined8 uStack_6c28;
  undefined8 local_6c20;
  undefined8 uStack_6c18;
  undefined8 uStack_6c10;
  undefined8 uStack_6c08;
  undefined8 local_6c00;
  undefined8 uStack_6bf8;
  undefined8 uStack_6bf0;
  undefined8 uStack_6be8;
  undefined8 local_6be0;
  undefined8 uStack_6bd8;
  undefined8 uStack_6bd0;
  undefined8 uStack_6bc8;
  undefined8 local_6bc0;
  undefined8 uStack_6bb8;
  undefined8 uStack_6bb0;
  undefined8 uStack_6ba8;
  undefined8 local_6ba0;
  undefined8 uStack_6b98;
  undefined8 uStack_6b90;
  undefined8 uStack_6b88;
  undefined8 local_6b80;
  undefined8 uStack_6b78;
  undefined8 uStack_6b70;
  undefined8 uStack_6b68;
  undefined8 local_6b60;
  undefined8 uStack_6b58;
  undefined8 uStack_6b50;
  undefined8 uStack_6b48;
  undefined8 local_6b40;
  undefined8 uStack_6b38;
  undefined8 uStack_6b30;
  undefined8 uStack_6b28;
  undefined8 local_6b20;
  undefined8 uStack_6b18;
  undefined8 uStack_6b10;
  undefined8 uStack_6b08;
  undefined8 local_6b00;
  undefined8 uStack_6af8;
  undefined8 uStack_6af0;
  undefined8 uStack_6ae8;
  undefined8 local_6ae0;
  undefined8 uStack_6ad8;
  undefined8 uStack_6ad0;
  undefined8 uStack_6ac8;
  undefined8 local_6ac0;
  undefined8 uStack_6ab8;
  undefined8 uStack_6ab0;
  undefined8 uStack_6aa8;
  undefined8 local_6aa0;
  undefined8 uStack_6a98;
  undefined8 uStack_6a90;
  undefined8 uStack_6a88;
  undefined8 local_6a80;
  undefined8 uStack_6a78;
  undefined8 uStack_6a70;
  undefined8 uStack_6a68;
  undefined8 local_6a60;
  undefined8 uStack_6a58;
  undefined8 uStack_6a50;
  undefined8 uStack_6a48;
  undefined8 local_6a40;
  undefined8 uStack_6a38;
  undefined8 uStack_6a30;
  undefined8 uStack_6a28;
  undefined8 local_6a20;
  undefined8 uStack_6a18;
  undefined8 uStack_6a10;
  undefined8 uStack_6a08;
  undefined8 local_6a00;
  undefined8 uStack_69f8;
  undefined8 uStack_69f0;
  undefined8 uStack_69e8;
  undefined8 local_69e0;
  undefined8 uStack_69d8;
  undefined8 uStack_69d0;
  undefined8 uStack_69c8;
  undefined8 local_69c0;
  undefined8 uStack_69b8;
  undefined8 uStack_69b0;
  undefined8 uStack_69a8;
  undefined8 local_69a0;
  undefined8 uStack_6998;
  undefined8 uStack_6990;
  undefined8 uStack_6988;
  undefined8 local_6980;
  undefined8 uStack_6978;
  undefined8 uStack_6970;
  undefined8 uStack_6968;
  undefined8 local_6960;
  undefined8 uStack_6958;
  undefined8 uStack_6950;
  undefined8 uStack_6948;
  undefined8 local_6940;
  undefined8 uStack_6938;
  undefined8 uStack_6930;
  undefined8 uStack_6928;
  undefined8 local_6920;
  undefined8 uStack_6918;
  undefined8 uStack_6910;
  undefined8 uStack_6908;
  undefined8 local_6900;
  undefined8 uStack_68f8;
  undefined8 uStack_68f0;
  undefined8 uStack_68e8;
  undefined8 local_68e0;
  undefined8 uStack_68d8;
  undefined8 uStack_68d0;
  undefined8 uStack_68c8;
  undefined8 local_68c0;
  undefined8 uStack_68b8;
  undefined8 uStack_68b0;
  undefined8 uStack_68a8;
  undefined8 local_68a0;
  undefined8 uStack_6898;
  undefined8 uStack_6890;
  undefined8 uStack_6888;
  undefined8 local_6880;
  undefined8 uStack_6878;
  undefined8 uStack_6870;
  undefined8 uStack_6868;
  undefined8 local_6860;
  undefined8 uStack_6858;
  undefined8 uStack_6850;
  undefined8 uStack_6848;
  undefined8 local_6840;
  undefined8 uStack_6838;
  undefined8 uStack_6830;
  undefined8 uStack_6828;
  undefined8 local_6820;
  undefined8 uStack_6818;
  undefined8 uStack_6810;
  undefined8 uStack_6808;
  undefined8 local_6800;
  undefined8 uStack_67f8;
  undefined8 uStack_67f0;
  undefined8 uStack_67e8;
  undefined8 local_67e0;
  undefined8 uStack_67d8;
  undefined8 uStack_67d0;
  undefined8 uStack_67c8;
  undefined8 local_67c0;
  undefined8 uStack_67b8;
  undefined8 uStack_67b0;
  undefined8 uStack_67a8;
  undefined8 local_67a0;
  undefined8 uStack_6798;
  undefined8 uStack_6790;
  undefined8 uStack_6788;
  undefined8 local_6780;
  undefined8 uStack_6778;
  undefined8 uStack_6770;
  undefined8 uStack_6768;
  undefined8 local_6760;
  undefined8 uStack_6758;
  undefined8 uStack_6750;
  undefined8 uStack_6748;
  undefined8 local_6740;
  undefined8 uStack_6738;
  undefined8 uStack_6730;
  undefined8 uStack_6728;
  undefined8 local_6720;
  undefined8 uStack_6718;
  undefined8 uStack_6710;
  undefined8 uStack_6708;
  undefined8 local_6700;
  undefined8 uStack_66f8;
  undefined8 uStack_66f0;
  undefined8 uStack_66e8;
  undefined8 local_66e0;
  undefined8 uStack_66d8;
  undefined8 uStack_66d0;
  undefined8 uStack_66c8;
  undefined8 local_66c0;
  undefined8 uStack_66b8;
  undefined8 uStack_66b0;
  undefined8 uStack_66a8;
  undefined8 local_66a0;
  undefined8 uStack_6698;
  undefined8 uStack_6690;
  undefined8 uStack_6688;
  undefined8 local_6680;
  undefined8 uStack_6678;
  undefined8 uStack_6670;
  undefined8 uStack_6668;
  undefined8 local_6660;
  undefined8 uStack_6658;
  undefined8 uStack_6650;
  undefined8 uStack_6648;
  undefined8 local_6640;
  undefined8 uStack_6638;
  undefined8 uStack_6630;
  undefined8 uStack_6628;
  undefined8 local_6620;
  undefined8 uStack_6618;
  undefined8 uStack_6610;
  undefined8 uStack_6608;
  undefined8 local_6600;
  undefined8 uStack_65f8;
  undefined8 uStack_65f0;
  undefined8 uStack_65e8;
  undefined8 local_65e0;
  undefined8 uStack_65d8;
  undefined8 uStack_65d0;
  undefined8 uStack_65c8;
  undefined8 local_65c0;
  undefined8 uStack_65b8;
  undefined8 uStack_65b0;
  undefined8 uStack_65a8;
  undefined8 local_65a0;
  undefined8 uStack_6598;
  undefined8 uStack_6590;
  undefined8 uStack_6588;
  undefined8 local_6580;
  undefined8 uStack_6578;
  undefined8 uStack_6570;
  undefined8 uStack_6568;
  undefined8 local_6560;
  undefined8 uStack_6558;
  undefined8 uStack_6550;
  undefined8 uStack_6548;
  undefined8 local_6540;
  undefined8 uStack_6538;
  undefined8 uStack_6530;
  undefined8 uStack_6528;
  undefined8 local_6520;
  undefined8 uStack_6518;
  undefined8 uStack_6510;
  undefined8 uStack_6508;
  undefined8 local_6500;
  undefined8 uStack_64f8;
  undefined8 uStack_64f0;
  undefined8 uStack_64e8;
  undefined8 local_64e0;
  undefined8 uStack_64d8;
  undefined8 uStack_64d0;
  undefined8 uStack_64c8;
  undefined8 local_64c0;
  undefined8 uStack_64b8;
  undefined8 uStack_64b0;
  undefined8 uStack_64a8;
  undefined8 local_64a0;
  undefined8 uStack_6498;
  undefined8 uStack_6490;
  undefined8 uStack_6488;
  undefined8 local_6480;
  undefined8 uStack_6478;
  undefined8 uStack_6470;
  undefined8 uStack_6468;
  undefined8 local_6460;
  undefined8 uStack_6458;
  undefined8 uStack_6450;
  undefined8 uStack_6448;
  undefined8 local_6440;
  undefined8 uStack_6438;
  undefined8 uStack_6430;
  undefined8 uStack_6428;
  undefined8 local_6420;
  undefined8 uStack_6418;
  undefined8 uStack_6410;
  undefined8 uStack_6408;
  undefined8 local_6400;
  undefined8 uStack_63f8;
  undefined8 uStack_63f0;
  undefined8 uStack_63e8;
  undefined8 local_63e0;
  undefined8 uStack_63d8;
  undefined8 uStack_63d0;
  undefined8 uStack_63c8;
  undefined8 local_63c0;
  undefined8 uStack_63b8;
  undefined8 uStack_63b0;
  undefined8 uStack_63a8;
  undefined8 local_63a0;
  undefined8 uStack_6398;
  undefined8 uStack_6390;
  undefined8 uStack_6388;
  undefined8 local_6380;
  undefined8 uStack_6378;
  undefined8 uStack_6370;
  undefined8 uStack_6368;
  undefined8 local_6360;
  undefined8 uStack_6358;
  undefined8 uStack_6350;
  undefined8 uStack_6348;
  undefined8 local_6340;
  undefined8 uStack_6338;
  undefined8 uStack_6330;
  undefined8 uStack_6328;
  undefined8 local_6320;
  undefined8 uStack_6318;
  undefined8 uStack_6310;
  undefined8 uStack_6308;
  undefined8 local_6300;
  undefined8 uStack_62f8;
  undefined8 uStack_62f0;
  undefined8 uStack_62e8;
  undefined8 local_62e0;
  undefined8 uStack_62d8;
  undefined8 uStack_62d0;
  undefined8 uStack_62c8;
  undefined8 local_62c0;
  undefined8 uStack_62b8;
  undefined8 uStack_62b0;
  undefined8 uStack_62a8;
  undefined8 local_62a0;
  undefined8 uStack_6298;
  undefined8 uStack_6290;
  undefined8 uStack_6288;
  undefined8 local_6280;
  undefined8 uStack_6278;
  undefined8 uStack_6270;
  undefined8 uStack_6268;
  undefined8 local_6260;
  undefined8 uStack_6258;
  undefined8 uStack_6250;
  undefined8 uStack_6248;
  undefined8 local_6240;
  undefined8 uStack_6238;
  undefined8 uStack_6230;
  undefined8 uStack_6228;
  undefined8 local_6220;
  undefined8 uStack_6218;
  undefined8 uStack_6210;
  undefined8 uStack_6208;
  undefined8 local_6200;
  undefined8 uStack_61f8;
  undefined8 uStack_61f0;
  undefined8 uStack_61e8;
  undefined8 local_61e0;
  undefined8 uStack_61d8;
  undefined8 uStack_61d0;
  undefined8 uStack_61c8;
  undefined8 local_61c0;
  undefined8 uStack_61b8;
  undefined8 uStack_61b0;
  undefined8 uStack_61a8;
  undefined8 local_61a0;
  undefined8 uStack_6198;
  undefined8 uStack_6190;
  undefined8 uStack_6188;
  undefined8 local_6180;
  undefined8 uStack_6178;
  undefined8 uStack_6170;
  undefined8 uStack_6168;
  undefined8 local_6160;
  undefined8 uStack_6158;
  undefined8 uStack_6150;
  undefined8 uStack_6148;
  undefined8 local_6140;
  undefined8 uStack_6138;
  undefined8 uStack_6130;
  undefined8 uStack_6128;
  undefined8 local_6120;
  undefined8 uStack_6118;
  undefined8 uStack_6110;
  undefined8 uStack_6108;
  undefined8 local_6100;
  undefined8 uStack_60f8;
  undefined8 uStack_60f0;
  undefined8 uStack_60e8;
  undefined8 local_60e0;
  undefined8 uStack_60d8;
  undefined8 uStack_60d0;
  undefined8 uStack_60c8;
  undefined8 local_60c0;
  undefined8 uStack_60b8;
  undefined8 uStack_60b0;
  undefined8 uStack_60a8;
  undefined8 local_60a0;
  undefined8 uStack_6098;
  undefined8 uStack_6090;
  undefined8 uStack_6088;
  undefined8 local_6080;
  undefined8 uStack_6078;
  undefined8 uStack_6070;
  undefined8 uStack_6068;
  undefined8 local_6060;
  undefined8 uStack_6058;
  undefined8 uStack_6050;
  undefined8 uStack_6048;
  undefined8 local_6040;
  undefined8 uStack_6038;
  undefined8 uStack_6030;
  undefined8 uStack_6028;
  undefined8 local_6020;
  undefined8 uStack_6018;
  undefined8 uStack_6010;
  undefined8 uStack_6008;
  undefined8 local_6000;
  undefined8 uStack_5ff8;
  undefined8 uStack_5ff0;
  undefined8 uStack_5fe8;
  undefined8 local_5fe0;
  undefined8 uStack_5fd8;
  undefined8 uStack_5fd0;
  undefined8 uStack_5fc8;
  undefined8 local_5fc0;
  undefined8 uStack_5fb8;
  undefined8 uStack_5fb0;
  undefined8 uStack_5fa8;
  undefined8 local_5fa0;
  undefined8 uStack_5f98;
  undefined8 uStack_5f90;
  undefined8 uStack_5f88;
  undefined8 local_5f80;
  undefined8 uStack_5f78;
  undefined8 uStack_5f70;
  undefined8 uStack_5f68;
  undefined8 local_5f60;
  undefined8 uStack_5f58;
  undefined8 uStack_5f50;
  undefined8 uStack_5f48;
  undefined8 local_5f40;
  undefined8 uStack_5f38;
  undefined8 uStack_5f30;
  undefined8 uStack_5f28;
  undefined8 local_5f20;
  undefined8 uStack_5f18;
  undefined8 uStack_5f10;
  undefined8 uStack_5f08;
  undefined8 local_5f00;
  undefined8 uStack_5ef8;
  undefined8 uStack_5ef0;
  undefined8 uStack_5ee8;
  undefined8 local_5ee0;
  undefined8 uStack_5ed8;
  undefined8 uStack_5ed0;
  undefined8 uStack_5ec8;
  undefined8 local_5ec0;
  undefined8 uStack_5eb8;
  undefined8 uStack_5eb0;
  undefined8 uStack_5ea8;
  undefined8 local_5ea0;
  undefined8 uStack_5e98;
  undefined8 uStack_5e90;
  undefined8 uStack_5e88;
  undefined8 local_5e80;
  undefined8 uStack_5e78;
  undefined8 uStack_5e70;
  undefined8 uStack_5e68;
  undefined8 local_5e60;
  undefined8 uStack_5e58;
  undefined8 uStack_5e50;
  undefined8 uStack_5e48;
  undefined8 local_5e40;
  undefined8 uStack_5e38;
  undefined8 uStack_5e30;
  undefined8 uStack_5e28;
  undefined8 local_5e20;
  undefined8 uStack_5e18;
  undefined8 uStack_5e10;
  undefined8 uStack_5e08;
  undefined8 local_5e00;
  undefined8 uStack_5df8;
  undefined8 uStack_5df0;
  undefined8 uStack_5de8;
  undefined8 local_5de0;
  undefined8 uStack_5dd8;
  undefined8 uStack_5dd0;
  undefined8 uStack_5dc8;
  undefined8 local_5dc0;
  undefined8 uStack_5db8;
  undefined8 uStack_5db0;
  undefined8 uStack_5da8;
  undefined8 local_5da0;
  undefined8 uStack_5d98;
  undefined8 uStack_5d90;
  undefined8 uStack_5d88;
  undefined8 local_5d80;
  undefined8 uStack_5d78;
  undefined8 uStack_5d70;
  undefined8 uStack_5d68;
  undefined8 local_5d60;
  undefined8 uStack_5d58;
  undefined8 uStack_5d50;
  undefined8 uStack_5d48;
  undefined8 local_5d40;
  undefined8 uStack_5d38;
  undefined8 uStack_5d30;
  undefined8 uStack_5d28;
  undefined8 local_5d20;
  undefined8 uStack_5d18;
  undefined8 uStack_5d10;
  undefined8 uStack_5d08;
  undefined8 local_5d00;
  undefined8 uStack_5cf8;
  undefined8 uStack_5cf0;
  undefined8 uStack_5ce8;
  undefined8 local_5ce0;
  undefined8 uStack_5cd8;
  undefined8 uStack_5cd0;
  undefined8 uStack_5cc8;
  undefined8 local_5cc0;
  undefined8 uStack_5cb8;
  undefined8 uStack_5cb0;
  undefined8 uStack_5ca8;
  undefined8 local_5ca0;
  undefined8 uStack_5c98;
  undefined8 uStack_5c90;
  undefined8 uStack_5c88;
  undefined8 local_5c80;
  undefined8 uStack_5c78;
  undefined8 uStack_5c70;
  undefined8 uStack_5c68;
  undefined8 local_5c60;
  undefined8 uStack_5c58;
  undefined8 uStack_5c50;
  undefined8 uStack_5c48;
  undefined8 local_5c40;
  undefined8 uStack_5c38;
  undefined8 uStack_5c30;
  undefined8 uStack_5c28;
  undefined8 local_5c20;
  undefined8 uStack_5c18;
  undefined8 uStack_5c10;
  undefined8 uStack_5c08;
  undefined8 local_5c00;
  undefined8 uStack_5bf8;
  undefined8 uStack_5bf0;
  undefined8 uStack_5be8;
  undefined8 local_5be0;
  undefined8 uStack_5bd8;
  undefined8 uStack_5bd0;
  undefined8 uStack_5bc8;
  undefined8 local_5bc0;
  undefined8 uStack_5bb8;
  undefined8 uStack_5bb0;
  undefined8 uStack_5ba8;
  undefined8 local_5ba0;
  undefined8 uStack_5b98;
  undefined8 uStack_5b90;
  undefined8 uStack_5b88;
  undefined8 local_5b80;
  undefined8 uStack_5b78;
  undefined8 uStack_5b70;
  undefined8 uStack_5b68;
  undefined8 local_5b60;
  undefined8 uStack_5b58;
  undefined8 uStack_5b50;
  undefined8 uStack_5b48;
  undefined8 local_5b40;
  undefined8 uStack_5b38;
  undefined8 uStack_5b30;
  undefined8 uStack_5b28;
  undefined8 local_5b20;
  undefined8 uStack_5b18;
  undefined8 uStack_5b10;
  undefined8 uStack_5b08;
  undefined8 local_5b00;
  undefined8 uStack_5af8;
  undefined8 uStack_5af0;
  undefined8 uStack_5ae8;
  undefined8 local_5ae0;
  undefined8 uStack_5ad8;
  undefined8 uStack_5ad0;
  undefined8 uStack_5ac8;
  undefined8 local_5ac0;
  undefined8 uStack_5ab8;
  undefined8 uStack_5ab0;
  undefined8 uStack_5aa8;
  undefined8 local_5aa0;
  undefined8 uStack_5a98;
  undefined8 uStack_5a90;
  undefined8 uStack_5a88;
  undefined8 local_5a80;
  undefined8 uStack_5a78;
  undefined8 uStack_5a70;
  undefined8 uStack_5a68;
  undefined8 local_5a60;
  undefined8 uStack_5a58;
  undefined8 uStack_5a50;
  undefined8 uStack_5a48;
  undefined8 local_5a40;
  undefined8 uStack_5a38;
  undefined8 uStack_5a30;
  undefined8 uStack_5a28;
  undefined8 local_5a20;
  undefined8 uStack_5a18;
  undefined8 uStack_5a10;
  undefined8 uStack_5a08;
  undefined8 local_5a00;
  undefined8 uStack_59f8;
  undefined8 uStack_59f0;
  undefined8 uStack_59e8;
  undefined8 local_59e0;
  undefined8 uStack_59d8;
  undefined8 uStack_59d0;
  undefined8 uStack_59c8;
  undefined8 local_59c0;
  undefined8 uStack_59b8;
  undefined8 uStack_59b0;
  undefined8 uStack_59a8;
  undefined8 local_59a0;
  undefined8 uStack_5998;
  undefined8 uStack_5990;
  undefined8 uStack_5988;
  undefined8 local_5980;
  undefined8 uStack_5978;
  undefined8 uStack_5970;
  undefined8 uStack_5968;
  undefined8 local_5960;
  undefined8 uStack_5958;
  undefined8 uStack_5950;
  undefined8 uStack_5948;
  undefined8 local_5940;
  undefined8 uStack_5938;
  undefined8 uStack_5930;
  undefined8 uStack_5928;
  undefined8 local_5920;
  undefined8 uStack_5918;
  undefined8 uStack_5910;
  undefined8 uStack_5908;
  undefined8 local_5900;
  undefined8 uStack_58f8;
  undefined8 uStack_58f0;
  undefined8 uStack_58e8;
  undefined8 local_58e0;
  undefined8 uStack_58d8;
  undefined8 uStack_58d0;
  undefined8 uStack_58c8;
  undefined8 local_58c0;
  undefined8 uStack_58b8;
  undefined8 uStack_58b0;
  undefined8 uStack_58a8;
  undefined8 local_58a0;
  undefined8 uStack_5898;
  undefined8 uStack_5890;
  undefined8 uStack_5888;
  undefined8 local_5880;
  undefined8 uStack_5878;
  undefined8 uStack_5870;
  undefined8 uStack_5868;
  undefined8 local_5860;
  undefined8 uStack_5858;
  undefined8 uStack_5850;
  undefined8 uStack_5848;
  undefined8 local_5840;
  undefined8 uStack_5838;
  undefined8 uStack_5830;
  undefined8 uStack_5828;
  undefined8 local_5820;
  undefined8 uStack_5818;
  undefined8 uStack_5810;
  undefined8 uStack_5808;
  undefined8 local_5800;
  undefined8 uStack_57f8;
  undefined8 uStack_57f0;
  undefined8 uStack_57e8;
  undefined8 local_57e0;
  undefined8 uStack_57d8;
  undefined8 uStack_57d0;
  undefined8 uStack_57c8;
  undefined8 local_57c0;
  undefined8 uStack_57b8;
  undefined8 uStack_57b0;
  undefined8 uStack_57a8;
  undefined8 local_57a0;
  undefined8 uStack_5798;
  undefined8 uStack_5790;
  undefined8 uStack_5788;
  undefined8 local_5780;
  undefined8 uStack_5778;
  undefined8 uStack_5770;
  undefined8 uStack_5768;
  undefined8 local_5760;
  undefined8 uStack_5758;
  undefined8 uStack_5750;
  undefined8 uStack_5748;
  undefined8 local_5740;
  undefined8 uStack_5738;
  undefined8 uStack_5730;
  undefined8 uStack_5728;
  undefined8 local_5720;
  undefined8 uStack_5718;
  undefined8 uStack_5710;
  undefined8 uStack_5708;
  undefined8 local_5700;
  undefined8 uStack_56f8;
  undefined8 uStack_56f0;
  undefined8 uStack_56e8;
  undefined8 local_56e0;
  undefined8 uStack_56d8;
  undefined8 uStack_56d0;
  undefined8 uStack_56c8;
  undefined8 local_56c0;
  undefined8 uStack_56b8;
  undefined8 uStack_56b0;
  undefined8 uStack_56a8;
  undefined8 local_56a0;
  undefined8 uStack_5698;
  undefined8 uStack_5690;
  undefined8 uStack_5688;
  undefined8 local_5680;
  undefined8 uStack_5678;
  undefined8 uStack_5670;
  undefined8 uStack_5668;
  undefined8 local_5660;
  undefined8 uStack_5658;
  undefined8 uStack_5650;
  undefined8 uStack_5648;
  undefined8 local_5640;
  undefined8 uStack_5638;
  undefined8 uStack_5630;
  undefined8 uStack_5628;
  undefined8 local_5620;
  undefined8 uStack_5618;
  undefined8 uStack_5610;
  undefined8 uStack_5608;
  undefined8 local_5600;
  undefined8 uStack_55f8;
  undefined8 uStack_55f0;
  undefined8 uStack_55e8;
  undefined8 local_55e0;
  undefined8 uStack_55d8;
  undefined8 uStack_55d0;
  undefined8 uStack_55c8;
  undefined8 local_55c0;
  undefined8 uStack_55b8;
  undefined8 uStack_55b0;
  undefined8 uStack_55a8;
  undefined8 local_55a0;
  undefined8 uStack_5598;
  undefined8 uStack_5590;
  undefined8 uStack_5588;
  undefined8 local_5580;
  undefined8 uStack_5578;
  undefined8 uStack_5570;
  undefined8 uStack_5568;
  undefined8 local_5560;
  undefined8 uStack_5558;
  undefined8 uStack_5550;
  undefined8 uStack_5548;
  undefined8 local_5540;
  undefined8 uStack_5538;
  undefined8 uStack_5530;
  undefined8 uStack_5528;
  undefined8 local_5520;
  undefined8 uStack_5518;
  undefined8 uStack_5510;
  undefined8 uStack_5508;
  undefined8 local_5500;
  undefined8 uStack_54f8;
  undefined8 uStack_54f0;
  undefined8 uStack_54e8;
  undefined8 local_54e0;
  undefined8 uStack_54d8;
  undefined8 uStack_54d0;
  undefined8 uStack_54c8;
  undefined8 local_54c0;
  undefined8 uStack_54b8;
  undefined8 uStack_54b0;
  undefined8 uStack_54a8;
  undefined8 local_54a0;
  undefined8 uStack_5498;
  undefined8 uStack_5490;
  undefined8 uStack_5488;
  undefined8 local_5480;
  undefined8 uStack_5478;
  undefined8 uStack_5470;
  undefined8 uStack_5468;
  undefined8 local_5460;
  undefined8 uStack_5458;
  undefined8 uStack_5450;
  undefined8 uStack_5448;
  undefined8 local_5440;
  undefined8 uStack_5438;
  undefined8 uStack_5430;
  undefined8 uStack_5428;
  undefined8 local_5420;
  undefined8 uStack_5418;
  undefined8 uStack_5410;
  undefined8 uStack_5408;
  undefined8 local_5400;
  undefined8 uStack_53f8;
  undefined8 uStack_53f0;
  undefined8 uStack_53e8;
  undefined8 local_53e0;
  undefined8 uStack_53d8;
  undefined8 uStack_53d0;
  undefined8 uStack_53c8;
  undefined8 local_53c0;
  undefined8 uStack_53b8;
  undefined8 uStack_53b0;
  undefined8 uStack_53a8;
  undefined8 local_53a0;
  undefined8 uStack_5398;
  undefined8 uStack_5390;
  undefined8 uStack_5388;
  undefined8 local_5380;
  undefined8 uStack_5378;
  undefined8 uStack_5370;
  undefined8 uStack_5368;
  undefined8 local_5360;
  undefined8 uStack_5358;
  undefined8 uStack_5350;
  undefined8 uStack_5348;
  undefined8 local_5340;
  undefined8 uStack_5338;
  undefined8 uStack_5330;
  undefined8 uStack_5328;
  undefined8 local_5320;
  undefined8 uStack_5318;
  undefined8 uStack_5310;
  undefined8 uStack_5308;
  undefined8 local_5300;
  undefined8 uStack_52f8;
  undefined8 uStack_52f0;
  undefined8 uStack_52e8;
  undefined8 local_52e0;
  undefined8 uStack_52d8;
  undefined8 uStack_52d0;
  undefined8 uStack_52c8;
  undefined8 local_52c0;
  undefined8 uStack_52b8;
  undefined8 uStack_52b0;
  undefined8 uStack_52a8;
  undefined8 local_52a0;
  undefined8 uStack_5298;
  undefined8 uStack_5290;
  undefined8 uStack_5288;
  undefined8 local_5280;
  undefined8 uStack_5278;
  undefined8 uStack_5270;
  undefined8 uStack_5268;
  undefined8 local_5260;
  undefined8 uStack_5258;
  undefined8 uStack_5250;
  undefined8 uStack_5248;
  undefined8 local_5240;
  undefined8 uStack_5238;
  undefined8 uStack_5230;
  undefined8 uStack_5228;
  undefined8 local_5220;
  undefined8 uStack_5218;
  undefined8 uStack_5210;
  undefined8 uStack_5208;
  undefined8 local_5200;
  undefined8 uStack_51f8;
  undefined8 uStack_51f0;
  undefined8 uStack_51e8;
  undefined8 local_51e0;
  undefined8 uStack_51d8;
  undefined8 uStack_51d0;
  undefined8 uStack_51c8;
  undefined8 local_51c0;
  undefined8 uStack_51b8;
  undefined8 uStack_51b0;
  undefined8 uStack_51a8;
  undefined8 local_51a0;
  undefined8 uStack_5198;
  undefined8 uStack_5190;
  undefined8 uStack_5188;
  undefined8 local_5180;
  undefined8 uStack_5178;
  undefined8 uStack_5170;
  undefined8 uStack_5168;
  undefined8 local_5160;
  undefined8 uStack_5158;
  undefined8 uStack_5150;
  undefined8 uStack_5148;
  undefined8 local_5140;
  undefined8 uStack_5138;
  undefined8 uStack_5130;
  undefined8 uStack_5128;
  undefined8 local_5120;
  undefined8 uStack_5118;
  undefined8 uStack_5110;
  undefined8 uStack_5108;
  undefined8 local_5100;
  undefined8 uStack_50f8;
  undefined8 uStack_50f0;
  undefined8 uStack_50e8;
  undefined8 local_50e0;
  undefined8 uStack_50d8;
  undefined8 uStack_50d0;
  undefined8 uStack_50c8;
  undefined8 local_50c0;
  undefined8 uStack_50b8;
  undefined8 uStack_50b0;
  undefined8 uStack_50a8;
  undefined8 local_50a0;
  undefined8 uStack_5098;
  undefined8 uStack_5090;
  undefined8 uStack_5088;
  undefined8 local_5080;
  undefined8 uStack_5078;
  undefined8 uStack_5070;
  undefined8 uStack_5068;
  undefined8 local_5060;
  undefined8 uStack_5058;
  undefined8 uStack_5050;
  undefined8 uStack_5048;
  undefined8 local_5040;
  undefined8 uStack_5038;
  undefined8 uStack_5030;
  undefined8 uStack_5028;
  undefined8 local_5020;
  undefined8 uStack_5018;
  undefined8 uStack_5010;
  undefined8 uStack_5008;
  undefined8 local_5000;
  undefined8 uStack_4ff8;
  undefined8 uStack_4ff0;
  undefined8 uStack_4fe8;
  undefined8 local_4fe0;
  undefined8 uStack_4fd8;
  undefined8 uStack_4fd0;
  undefined8 uStack_4fc8;
  undefined8 local_4fc0;
  undefined8 uStack_4fb8;
  undefined8 uStack_4fb0;
  undefined8 uStack_4fa8;
  undefined8 local_4fa0;
  undefined8 uStack_4f98;
  undefined8 uStack_4f90;
  undefined8 uStack_4f88;
  undefined8 local_4f80;
  undefined8 uStack_4f78;
  undefined8 uStack_4f70;
  undefined8 uStack_4f68;
  undefined8 local_4f60;
  undefined8 uStack_4f58;
  undefined8 uStack_4f50;
  undefined8 uStack_4f48;
  undefined8 local_4f40;
  undefined8 uStack_4f38;
  undefined8 uStack_4f30;
  undefined8 uStack_4f28;
  undefined8 local_4f20;
  undefined8 uStack_4f18;
  undefined8 uStack_4f10;
  undefined8 uStack_4f08;
  undefined8 local_4f00;
  undefined8 uStack_4ef8;
  undefined8 uStack_4ef0;
  undefined8 uStack_4ee8;
  undefined8 local_4ee0;
  undefined8 uStack_4ed8;
  undefined8 uStack_4ed0;
  undefined8 uStack_4ec8;
  undefined8 local_4ec0;
  undefined8 uStack_4eb8;
  undefined8 uStack_4eb0;
  undefined8 uStack_4ea8;
  undefined8 local_4ea0;
  undefined8 uStack_4e98;
  undefined8 uStack_4e90;
  undefined8 uStack_4e88;
  undefined8 local_4e80;
  undefined8 uStack_4e78;
  undefined8 uStack_4e70;
  undefined8 uStack_4e68;
  undefined8 local_4e60;
  undefined8 uStack_4e58;
  undefined8 uStack_4e50;
  undefined8 uStack_4e48;
  undefined8 local_4e40;
  undefined8 uStack_4e38;
  undefined8 uStack_4e30;
  undefined8 uStack_4e28;
  undefined8 local_4e20;
  undefined8 uStack_4e18;
  undefined8 uStack_4e10;
  undefined8 uStack_4e08;
  undefined8 local_4e00;
  undefined8 uStack_4df8;
  undefined8 uStack_4df0;
  undefined8 uStack_4de8;
  undefined8 local_4de0;
  undefined8 uStack_4dd8;
  undefined8 uStack_4dd0;
  undefined8 uStack_4dc8;
  undefined8 local_4dc0;
  undefined8 uStack_4db8;
  undefined8 uStack_4db0;
  undefined8 uStack_4da8;
  undefined8 local_4da0;
  undefined8 uStack_4d98;
  undefined8 uStack_4d90;
  undefined8 uStack_4d88;
  undefined8 local_4d80;
  undefined8 uStack_4d78;
  undefined8 uStack_4d70;
  undefined8 uStack_4d68;
  undefined8 local_4d60;
  undefined8 uStack_4d58;
  undefined8 uStack_4d50;
  undefined8 uStack_4d48;
  undefined8 local_4d40;
  undefined8 uStack_4d38;
  undefined8 uStack_4d30;
  undefined8 uStack_4d28;
  undefined8 local_4d20;
  undefined8 uStack_4d18;
  undefined8 uStack_4d10;
  undefined8 uStack_4d08;
  undefined8 local_4d00;
  undefined8 uStack_4cf8;
  undefined8 uStack_4cf0;
  undefined8 uStack_4ce8;
  undefined8 local_4ce0;
  undefined8 uStack_4cd8;
  undefined8 uStack_4cd0;
  undefined8 uStack_4cc8;
  undefined8 local_4cc0;
  undefined8 uStack_4cb8;
  undefined8 uStack_4cb0;
  undefined8 uStack_4ca8;
  undefined8 local_4ca0;
  undefined8 uStack_4c98;
  undefined8 uStack_4c90;
  undefined8 uStack_4c88;
  undefined8 local_4c80;
  undefined8 uStack_4c78;
  undefined8 uStack_4c70;
  undefined8 uStack_4c68;
  undefined8 local_4c60;
  undefined8 uStack_4c58;
  undefined8 uStack_4c50;
  undefined8 uStack_4c48;
  undefined8 local_4c40;
  undefined8 uStack_4c38;
  undefined8 uStack_4c30;
  undefined8 uStack_4c28;
  undefined8 local_4c20;
  undefined8 uStack_4c18;
  undefined8 uStack_4c10;
  undefined8 uStack_4c08;
  undefined8 local_4c00;
  undefined8 uStack_4bf8;
  undefined8 uStack_4bf0;
  undefined8 uStack_4be8;
  undefined8 local_4be0;
  undefined8 uStack_4bd8;
  undefined8 uStack_4bd0;
  undefined8 uStack_4bc8;
  undefined8 local_4bc0;
  undefined8 uStack_4bb8;
  undefined8 uStack_4bb0;
  undefined8 uStack_4ba8;
  undefined8 local_4ba0;
  undefined8 uStack_4b98;
  undefined8 uStack_4b90;
  undefined8 uStack_4b88;
  undefined8 local_4b80;
  undefined8 uStack_4b78;
  undefined8 uStack_4b70;
  undefined8 uStack_4b68;
  undefined8 local_4b60;
  undefined8 uStack_4b58;
  undefined8 uStack_4b50;
  undefined8 uStack_4b48;
  undefined8 local_4b40;
  undefined8 uStack_4b38;
  undefined8 uStack_4b30;
  undefined8 uStack_4b28;
  undefined8 local_4b20;
  undefined8 uStack_4b18;
  undefined8 uStack_4b10;
  undefined8 uStack_4b08;
  undefined8 local_4b00;
  undefined8 uStack_4af8;
  undefined8 uStack_4af0;
  undefined8 uStack_4ae8;
  undefined8 local_4ae0;
  undefined8 uStack_4ad8;
  undefined8 uStack_4ad0;
  undefined8 uStack_4ac8;
  undefined8 local_4ac0;
  undefined8 uStack_4ab8;
  undefined8 uStack_4ab0;
  undefined8 uStack_4aa8;
  undefined8 local_4aa0;
  undefined8 uStack_4a98;
  undefined8 uStack_4a90;
  undefined8 uStack_4a88;
  undefined8 local_4a80;
  undefined8 uStack_4a78;
  undefined8 uStack_4a70;
  undefined8 uStack_4a68;
  undefined8 local_4a60;
  undefined8 uStack_4a58;
  undefined8 uStack_4a50;
  undefined8 uStack_4a48;
  undefined8 local_4a40;
  undefined8 uStack_4a38;
  undefined8 uStack_4a30;
  undefined8 uStack_4a28;
  undefined8 local_4a20;
  undefined8 uStack_4a18;
  undefined8 uStack_4a10;
  undefined8 uStack_4a08;
  undefined8 local_4a00;
  undefined8 uStack_49f8;
  undefined8 uStack_49f0;
  undefined8 uStack_49e8;
  undefined8 local_49e0;
  undefined8 uStack_49d8;
  undefined8 uStack_49d0;
  undefined8 uStack_49c8;
  undefined8 local_49c0;
  undefined8 uStack_49b8;
  undefined8 uStack_49b0;
  undefined8 uStack_49a8;
  undefined8 local_49a0;
  undefined8 uStack_4998;
  undefined8 uStack_4990;
  undefined8 uStack_4988;
  undefined8 local_4980;
  undefined8 uStack_4978;
  undefined8 uStack_4970;
  undefined8 uStack_4968;
  undefined8 local_4960;
  undefined8 uStack_4958;
  undefined8 uStack_4950;
  undefined8 uStack_4948;
  undefined8 local_4940;
  undefined8 uStack_4938;
  undefined8 uStack_4930;
  undefined8 uStack_4928;
  undefined8 local_4920;
  undefined8 uStack_4918;
  undefined8 uStack_4910;
  undefined8 uStack_4908;
  undefined8 local_4900;
  undefined8 uStack_48f8;
  undefined8 uStack_48f0;
  undefined8 uStack_48e8;
  undefined8 local_48e0;
  undefined8 uStack_48d8;
  undefined8 uStack_48d0;
  undefined8 uStack_48c8;
  undefined8 local_48c0;
  undefined8 uStack_48b8;
  undefined8 uStack_48b0;
  undefined8 uStack_48a8;
  undefined8 local_48a0;
  undefined8 uStack_4898;
  undefined8 uStack_4890;
  undefined8 uStack_4888;
  undefined8 local_4880;
  undefined8 uStack_4878;
  undefined8 uStack_4870;
  undefined8 uStack_4868;
  undefined8 local_4860;
  undefined8 uStack_4858;
  undefined8 uStack_4850;
  undefined8 uStack_4848;
  undefined8 local_4840;
  undefined8 uStack_4838;
  undefined8 uStack_4830;
  undefined8 uStack_4828;
  undefined8 local_4820;
  undefined8 uStack_4818;
  undefined8 uStack_4810;
  undefined8 uStack_4808;
  undefined8 local_4800;
  undefined8 uStack_47f8;
  undefined8 uStack_47f0;
  undefined8 uStack_47e8;
  undefined8 local_47e0;
  undefined8 uStack_47d8;
  undefined8 uStack_47d0;
  undefined8 uStack_47c8;
  undefined8 local_47c0;
  undefined8 uStack_47b8;
  undefined8 uStack_47b0;
  undefined8 uStack_47a8;
  float *local_4788;
  undefined8 local_4780;
  undefined8 uStack_4778;
  undefined8 uStack_4770;
  undefined8 uStack_4768;
  float *local_4748;
  undefined8 local_4740;
  undefined8 uStack_4738;
  undefined8 uStack_4730;
  undefined8 uStack_4728;
  float *local_4708;
  undefined8 local_4700;
  undefined8 uStack_46f8;
  undefined8 uStack_46f0;
  undefined8 uStack_46e8;
  float *local_46c8;
  undefined8 local_46c0;
  undefined8 uStack_46b8;
  undefined8 uStack_46b0;
  undefined8 uStack_46a8;
  float *local_4688;
  undefined8 local_4680;
  undefined8 uStack_4678;
  undefined8 uStack_4670;
  undefined8 uStack_4668;
  float *local_4648;
  undefined8 local_4640;
  undefined8 uStack_4638;
  undefined8 uStack_4630;
  undefined8 uStack_4628;
  float *local_4608;
  undefined8 local_4600;
  undefined8 uStack_45f8;
  undefined8 uStack_45f0;
  undefined8 uStack_45e8;
  float *local_45c8;
  undefined8 local_45c0;
  undefined8 uStack_45b8;
  undefined8 uStack_45b0;
  undefined8 uStack_45a8;
  float *local_4588;
  undefined8 local_4580;
  undefined8 uStack_4578;
  undefined8 uStack_4570;
  undefined8 uStack_4568;
  float *local_4548;
  undefined8 local_4540;
  undefined8 uStack_4538;
  undefined8 uStack_4530;
  undefined8 uStack_4528;
  float *local_4508;
  undefined8 local_4500;
  undefined8 uStack_44f8;
  undefined8 uStack_44f0;
  undefined8 uStack_44e8;
  float *local_44c8;
  undefined8 local_44c0;
  undefined8 uStack_44b8;
  undefined8 uStack_44b0;
  undefined8 uStack_44a8;
  float *local_4488;
  undefined8 local_4480;
  undefined8 uStack_4478;
  undefined8 uStack_4470;
  undefined8 uStack_4468;
  float *local_4448;
  undefined8 local_4440;
  undefined8 uStack_4438;
  undefined8 uStack_4430;
  undefined8 uStack_4428;
  float *local_4408;
  undefined1 local_4400 [32];
  undefined4 local_43e0;
  undefined4 local_43dc;
  undefined4 local_43d8;
  undefined4 local_43d4;
  undefined4 local_43d0;
  undefined4 local_43cc;
  undefined4 local_43c8;
  undefined4 local_43c4;
  undefined8 local_43c0;
  undefined8 uStack_43b8;
  undefined8 uStack_43b0;
  undefined8 uStack_43a8;
  float local_43a0;
  float fStack_439c;
  float fStack_4398;
  float fStack_4394;
  float fStack_4390;
  float fStack_438c;
  float fStack_4388;
  float fStack_4384;
  undefined8 local_4380;
  undefined8 uStack_4378;
  undefined8 uStack_4370;
  undefined8 uStack_4368;
  float local_4360;
  float fStack_435c;
  float fStack_4358;
  float fStack_4354;
  float fStack_4350;
  float fStack_434c;
  float fStack_4348;
  float fStack_4344;
  undefined8 local_4340;
  undefined8 uStack_4338;
  undefined8 uStack_4330;
  undefined8 uStack_4328;
  float local_4320;
  float fStack_431c;
  float fStack_4318;
  float fStack_4314;
  float fStack_4310;
  float fStack_430c;
  float fStack_4308;
  float fStack_4304;
  undefined8 local_4300;
  undefined8 uStack_42f8;
  undefined8 uStack_42f0;
  undefined8 uStack_42e8;
  float local_42e0;
  float fStack_42dc;
  float fStack_42d8;
  float fStack_42d4;
  float fStack_42d0;
  float fStack_42cc;
  float fStack_42c8;
  float fStack_42c4;
  undefined8 local_42c0;
  undefined8 uStack_42b8;
  undefined8 uStack_42b0;
  undefined8 uStack_42a8;
  float local_42a0;
  float fStack_429c;
  float fStack_4298;
  float fStack_4294;
  float fStack_4290;
  float fStack_428c;
  float fStack_4288;
  float fStack_4284;
  undefined8 local_4280;
  undefined8 uStack_4278;
  undefined8 uStack_4270;
  undefined8 uStack_4268;
  float local_4260;
  float fStack_425c;
  float fStack_4258;
  float fStack_4254;
  float fStack_4250;
  float fStack_424c;
  float fStack_4248;
  float fStack_4244;
  undefined8 local_4240;
  undefined8 uStack_4238;
  undefined8 uStack_4230;
  undefined8 uStack_4228;
  float local_4220;
  float fStack_421c;
  float fStack_4218;
  float fStack_4214;
  float fStack_4210;
  float fStack_420c;
  float fStack_4208;
  float fStack_4204;
  undefined8 local_4200;
  undefined8 uStack_41f8;
  undefined8 uStack_41f0;
  undefined8 uStack_41e8;
  float local_41e0;
  float fStack_41dc;
  float fStack_41d8;
  float fStack_41d4;
  float fStack_41d0;
  float fStack_41cc;
  float fStack_41c8;
  float fStack_41c4;
  undefined8 local_41c0;
  undefined8 uStack_41b8;
  undefined8 uStack_41b0;
  undefined8 uStack_41a8;
  float local_41a0;
  float fStack_419c;
  float fStack_4198;
  float fStack_4194;
  float fStack_4190;
  float fStack_418c;
  float fStack_4188;
  float fStack_4184;
  undefined8 local_4180;
  undefined8 uStack_4178;
  undefined8 uStack_4170;
  undefined8 uStack_4168;
  float local_4160;
  float fStack_415c;
  float fStack_4158;
  float fStack_4154;
  float fStack_4150;
  float fStack_414c;
  float fStack_4148;
  float fStack_4144;
  undefined8 local_4140;
  undefined8 uStack_4138;
  undefined8 uStack_4130;
  undefined8 uStack_4128;
  float local_4120;
  float fStack_411c;
  float fStack_4118;
  float fStack_4114;
  float fStack_4110;
  float fStack_410c;
  float fStack_4108;
  float fStack_4104;
  undefined8 local_4100;
  undefined8 uStack_40f8;
  undefined8 uStack_40f0;
  undefined8 uStack_40e8;
  float local_40e0;
  float fStack_40dc;
  float fStack_40d8;
  float fStack_40d4;
  float fStack_40d0;
  float fStack_40cc;
  float fStack_40c8;
  float fStack_40c4;
  undefined8 local_40c0;
  undefined8 uStack_40b8;
  undefined8 uStack_40b0;
  undefined8 uStack_40a8;
  float local_40a0;
  float fStack_409c;
  float fStack_4098;
  float fStack_4094;
  float fStack_4090;
  float fStack_408c;
  float fStack_4088;
  float fStack_4084;
  undefined8 local_4080;
  undefined8 uStack_4078;
  undefined8 uStack_4070;
  undefined8 uStack_4068;
  float local_4060;
  float fStack_405c;
  float fStack_4058;
  float fStack_4054;
  float fStack_4050;
  float fStack_404c;
  float fStack_4048;
  float fStack_4044;
  undefined8 local_4040;
  undefined8 uStack_4038;
  undefined8 uStack_4030;
  undefined8 uStack_4028;
  float local_4020;
  float fStack_401c;
  float fStack_4018;
  float fStack_4014;
  float fStack_4010;
  float fStack_400c;
  float fStack_4008;
  float fStack_4004;
  undefined8 local_4000;
  undefined8 uStack_3ff8;
  undefined8 uStack_3ff0;
  undefined8 uStack_3fe8;
  float local_3fe0;
  float fStack_3fdc;
  float fStack_3fd8;
  float fStack_3fd4;
  float fStack_3fd0;
  float fStack_3fcc;
  float fStack_3fc8;
  float fStack_3fc4;
  undefined8 local_3fc0;
  undefined8 uStack_3fb8;
  undefined8 uStack_3fb0;
  undefined8 uStack_3fa8;
  float local_3fa0;
  float fStack_3f9c;
  float fStack_3f98;
  float fStack_3f94;
  float fStack_3f90;
  float fStack_3f8c;
  float fStack_3f88;
  float fStack_3f84;
  undefined8 local_3f80;
  undefined8 uStack_3f78;
  undefined8 uStack_3f70;
  undefined8 uStack_3f68;
  float local_3f60;
  float fStack_3f5c;
  float fStack_3f58;
  float fStack_3f54;
  float fStack_3f50;
  float fStack_3f4c;
  float fStack_3f48;
  float fStack_3f44;
  undefined8 local_3f40;
  undefined8 uStack_3f38;
  undefined8 uStack_3f30;
  undefined8 uStack_3f28;
  float local_3f20;
  float fStack_3f1c;
  float fStack_3f18;
  float fStack_3f14;
  float fStack_3f10;
  float fStack_3f0c;
  float fStack_3f08;
  float fStack_3f04;
  undefined8 local_3f00;
  undefined8 uStack_3ef8;
  undefined8 uStack_3ef0;
  undefined8 uStack_3ee8;
  float local_3ee0;
  float fStack_3edc;
  float fStack_3ed8;
  float fStack_3ed4;
  float fStack_3ed0;
  float fStack_3ecc;
  float fStack_3ec8;
  float fStack_3ec4;
  undefined8 local_3ec0;
  undefined8 uStack_3eb8;
  undefined8 uStack_3eb0;
  undefined8 uStack_3ea8;
  float local_3ea0;
  float fStack_3e9c;
  float fStack_3e98;
  float fStack_3e94;
  float fStack_3e90;
  float fStack_3e8c;
  float fStack_3e88;
  float fStack_3e84;
  undefined8 local_3e80;
  undefined8 uStack_3e78;
  undefined8 uStack_3e70;
  undefined8 uStack_3e68;
  float local_3e60;
  float fStack_3e5c;
  float fStack_3e58;
  float fStack_3e54;
  float fStack_3e50;
  float fStack_3e4c;
  float fStack_3e48;
  float fStack_3e44;
  undefined8 local_3e40;
  undefined8 uStack_3e38;
  undefined8 uStack_3e30;
  undefined8 uStack_3e28;
  float local_3e20;
  float fStack_3e1c;
  float fStack_3e18;
  float fStack_3e14;
  float fStack_3e10;
  float fStack_3e0c;
  float fStack_3e08;
  float fStack_3e04;
  undefined8 local_3e00;
  undefined8 uStack_3df8;
  undefined8 uStack_3df0;
  undefined8 uStack_3de8;
  float local_3de0;
  float fStack_3ddc;
  float fStack_3dd8;
  float fStack_3dd4;
  float fStack_3dd0;
  float fStack_3dcc;
  float fStack_3dc8;
  float fStack_3dc4;
  undefined8 local_3dc0;
  undefined8 uStack_3db8;
  undefined8 uStack_3db0;
  undefined8 uStack_3da8;
  float local_3da0;
  float fStack_3d9c;
  float fStack_3d98;
  float fStack_3d94;
  float fStack_3d90;
  float fStack_3d8c;
  float fStack_3d88;
  float fStack_3d84;
  undefined8 local_3d80;
  undefined8 uStack_3d78;
  undefined8 uStack_3d70;
  undefined8 uStack_3d68;
  float local_3d60;
  float fStack_3d5c;
  float fStack_3d58;
  float fStack_3d54;
  float fStack_3d50;
  float fStack_3d4c;
  float fStack_3d48;
  float fStack_3d44;
  undefined8 local_3d40;
  undefined8 uStack_3d38;
  undefined8 uStack_3d30;
  undefined8 uStack_3d28;
  float local_3d20;
  float fStack_3d1c;
  float fStack_3d18;
  float fStack_3d14;
  float fStack_3d10;
  float fStack_3d0c;
  float fStack_3d08;
  float fStack_3d04;
  undefined8 local_3d00;
  undefined8 uStack_3cf8;
  undefined8 uStack_3cf0;
  undefined8 uStack_3ce8;
  float local_3ce0;
  float fStack_3cdc;
  float fStack_3cd8;
  float fStack_3cd4;
  float fStack_3cd0;
  float fStack_3ccc;
  float fStack_3cc8;
  float fStack_3cc4;
  undefined8 local_3cc0;
  undefined8 uStack_3cb8;
  undefined8 uStack_3cb0;
  undefined8 uStack_3ca8;
  float local_3ca0;
  float fStack_3c9c;
  float fStack_3c98;
  float fStack_3c94;
  float fStack_3c90;
  float fStack_3c8c;
  float fStack_3c88;
  float fStack_3c84;
  undefined8 local_3c80;
  undefined8 uStack_3c78;
  undefined8 uStack_3c70;
  undefined8 uStack_3c68;
  float local_3c60;
  float fStack_3c5c;
  float fStack_3c58;
  float fStack_3c54;
  float fStack_3c50;
  float fStack_3c4c;
  float fStack_3c48;
  float fStack_3c44;
  undefined8 local_3c40;
  undefined8 uStack_3c38;
  undefined8 uStack_3c30;
  undefined8 uStack_3c28;
  float local_3c20;
  float fStack_3c1c;
  float fStack_3c18;
  float fStack_3c14;
  float fStack_3c10;
  float fStack_3c0c;
  float fStack_3c08;
  float fStack_3c04;
  undefined8 local_3c00;
  undefined8 uStack_3bf8;
  undefined8 uStack_3bf0;
  undefined8 uStack_3be8;
  float local_3be0;
  float fStack_3bdc;
  float fStack_3bd8;
  float fStack_3bd4;
  float fStack_3bd0;
  float fStack_3bcc;
  float fStack_3bc8;
  float fStack_3bc4;
  undefined8 local_3bc0;
  undefined8 uStack_3bb8;
  undefined8 uStack_3bb0;
  undefined8 uStack_3ba8;
  float local_3ba0;
  float fStack_3b9c;
  float fStack_3b98;
  float fStack_3b94;
  float fStack_3b90;
  float fStack_3b8c;
  float fStack_3b88;
  float fStack_3b84;
  undefined8 local_3b80;
  undefined8 uStack_3b78;
  undefined8 uStack_3b70;
  undefined8 uStack_3b68;
  float local_3b60;
  float fStack_3b5c;
  float fStack_3b58;
  float fStack_3b54;
  float fStack_3b50;
  float fStack_3b4c;
  float fStack_3b48;
  float fStack_3b44;
  undefined8 local_3b40;
  undefined8 uStack_3b38;
  undefined8 uStack_3b30;
  undefined8 uStack_3b28;
  float local_3b20;
  float fStack_3b1c;
  float fStack_3b18;
  float fStack_3b14;
  float fStack_3b10;
  float fStack_3b0c;
  float fStack_3b08;
  float fStack_3b04;
  undefined8 local_3b00;
  undefined8 uStack_3af8;
  undefined8 uStack_3af0;
  undefined8 uStack_3ae8;
  float local_3ae0;
  float fStack_3adc;
  float fStack_3ad8;
  float fStack_3ad4;
  float fStack_3ad0;
  float fStack_3acc;
  float fStack_3ac8;
  float fStack_3ac4;
  undefined8 local_3ac0;
  undefined8 uStack_3ab8;
  undefined8 uStack_3ab0;
  undefined8 uStack_3aa8;
  float local_3aa0;
  float fStack_3a9c;
  float fStack_3a98;
  float fStack_3a94;
  float fStack_3a90;
  float fStack_3a8c;
  float fStack_3a88;
  float fStack_3a84;
  undefined8 local_3a80;
  undefined8 uStack_3a78;
  undefined8 uStack_3a70;
  undefined8 uStack_3a68;
  float local_3a60;
  float fStack_3a5c;
  float fStack_3a58;
  float fStack_3a54;
  float fStack_3a50;
  float fStack_3a4c;
  float fStack_3a48;
  float fStack_3a44;
  undefined8 local_3a40;
  undefined8 uStack_3a38;
  undefined8 uStack_3a30;
  undefined8 uStack_3a28;
  float local_3a20;
  float fStack_3a1c;
  float fStack_3a18;
  float fStack_3a14;
  float fStack_3a10;
  float fStack_3a0c;
  float fStack_3a08;
  float fStack_3a04;
  undefined8 local_3a00;
  undefined8 uStack_39f8;
  undefined8 uStack_39f0;
  undefined8 uStack_39e8;
  float local_39e0;
  float fStack_39dc;
  float fStack_39d8;
  float fStack_39d4;
  float fStack_39d0;
  float fStack_39cc;
  float fStack_39c8;
  float fStack_39c4;
  undefined8 local_39c0;
  undefined8 uStack_39b8;
  undefined8 uStack_39b0;
  undefined8 uStack_39a8;
  float local_39a0;
  float fStack_399c;
  float fStack_3998;
  float fStack_3994;
  float fStack_3990;
  float fStack_398c;
  float fStack_3988;
  float fStack_3984;
  undefined8 local_3980;
  undefined8 uStack_3978;
  undefined8 uStack_3970;
  undefined8 uStack_3968;
  float local_3960;
  float fStack_395c;
  float fStack_3958;
  float fStack_3954;
  float fStack_3950;
  float fStack_394c;
  float fStack_3948;
  float fStack_3944;
  undefined8 local_3940;
  undefined8 uStack_3938;
  undefined8 uStack_3930;
  undefined8 uStack_3928;
  float local_3920;
  float fStack_391c;
  float fStack_3918;
  float fStack_3914;
  float fStack_3910;
  float fStack_390c;
  float fStack_3908;
  float fStack_3904;
  undefined8 local_3900;
  undefined8 uStack_38f8;
  undefined8 uStack_38f0;
  undefined8 uStack_38e8;
  float local_38e0;
  float fStack_38dc;
  float fStack_38d8;
  float fStack_38d4;
  float fStack_38d0;
  float fStack_38cc;
  float fStack_38c8;
  float fStack_38c4;
  undefined8 local_38c0;
  undefined8 uStack_38b8;
  undefined8 uStack_38b0;
  undefined8 uStack_38a8;
  float local_38a0;
  float fStack_389c;
  float fStack_3898;
  float fStack_3894;
  float fStack_3890;
  float fStack_388c;
  float fStack_3888;
  float fStack_3884;
  undefined8 local_3880;
  undefined8 uStack_3878;
  undefined8 uStack_3870;
  undefined8 uStack_3868;
  float local_3860;
  float fStack_385c;
  float fStack_3858;
  float fStack_3854;
  float fStack_3850;
  float fStack_384c;
  float fStack_3848;
  float fStack_3844;
  undefined8 local_3840;
  undefined8 uStack_3838;
  undefined8 uStack_3830;
  undefined8 uStack_3828;
  float local_3820;
  float fStack_381c;
  float fStack_3818;
  float fStack_3814;
  float fStack_3810;
  float fStack_380c;
  float fStack_3808;
  float fStack_3804;
  undefined8 local_3800;
  undefined8 uStack_37f8;
  undefined8 uStack_37f0;
  undefined8 uStack_37e8;
  float local_37e0;
  float fStack_37dc;
  float fStack_37d8;
  float fStack_37d4;
  float fStack_37d0;
  float fStack_37cc;
  float fStack_37c8;
  float fStack_37c4;
  undefined8 local_37c0;
  undefined8 uStack_37b8;
  undefined8 uStack_37b0;
  undefined8 uStack_37a8;
  float local_37a0;
  float fStack_379c;
  float fStack_3798;
  float fStack_3794;
  float fStack_3790;
  float fStack_378c;
  float fStack_3788;
  float fStack_3784;
  undefined8 local_3780;
  undefined8 uStack_3778;
  undefined8 uStack_3770;
  undefined8 uStack_3768;
  float local_3760;
  float fStack_375c;
  float fStack_3758;
  float fStack_3754;
  float fStack_3750;
  float fStack_374c;
  float fStack_3748;
  float fStack_3744;
  undefined8 local_3740;
  undefined8 uStack_3738;
  undefined8 uStack_3730;
  undefined8 uStack_3728;
  float local_3720;
  float fStack_371c;
  float fStack_3718;
  float fStack_3714;
  float fStack_3710;
  float fStack_370c;
  float fStack_3708;
  float fStack_3704;
  undefined8 local_3700;
  undefined8 uStack_36f8;
  undefined8 uStack_36f0;
  undefined8 uStack_36e8;
  float local_36e0;
  float fStack_36dc;
  float fStack_36d8;
  float fStack_36d4;
  float fStack_36d0;
  float fStack_36cc;
  float fStack_36c8;
  float fStack_36c4;
  undefined8 local_36c0;
  undefined8 uStack_36b8;
  undefined8 uStack_36b0;
  undefined8 uStack_36a8;
  float local_36a0;
  float fStack_369c;
  float fStack_3698;
  float fStack_3694;
  float fStack_3690;
  float fStack_368c;
  float fStack_3688;
  float fStack_3684;
  undefined8 local_3680;
  undefined8 uStack_3678;
  undefined8 uStack_3670;
  undefined8 uStack_3668;
  float local_3660;
  float fStack_365c;
  float fStack_3658;
  float fStack_3654;
  float fStack_3650;
  float fStack_364c;
  float fStack_3648;
  float fStack_3644;
  undefined8 local_3640;
  undefined8 uStack_3638;
  undefined8 uStack_3630;
  undefined8 uStack_3628;
  float local_3620;
  float fStack_361c;
  float fStack_3618;
  float fStack_3614;
  float fStack_3610;
  float fStack_360c;
  float fStack_3608;
  float fStack_3604;
  undefined8 local_3600;
  undefined8 uStack_35f8;
  undefined8 uStack_35f0;
  undefined8 uStack_35e8;
  float local_35e0;
  float fStack_35dc;
  float fStack_35d8;
  float fStack_35d4;
  float fStack_35d0;
  float fStack_35cc;
  float fStack_35c8;
  float fStack_35c4;
  undefined8 local_35c0;
  undefined8 uStack_35b8;
  undefined8 uStack_35b0;
  undefined8 uStack_35a8;
  float local_35a0;
  float fStack_359c;
  float fStack_3598;
  float fStack_3594;
  float fStack_3590;
  float fStack_358c;
  float fStack_3588;
  float fStack_3584;
  undefined8 local_3580;
  undefined8 uStack_3578;
  undefined8 uStack_3570;
  undefined8 uStack_3568;
  float local_3560;
  float fStack_355c;
  float fStack_3558;
  float fStack_3554;
  float fStack_3550;
  float fStack_354c;
  float fStack_3548;
  float fStack_3544;
  undefined8 local_3540;
  undefined8 uStack_3538;
  undefined8 uStack_3530;
  undefined8 uStack_3528;
  float local_3520;
  float fStack_351c;
  float fStack_3518;
  float fStack_3514;
  float fStack_3510;
  float fStack_350c;
  float fStack_3508;
  float fStack_3504;
  undefined8 local_3500;
  undefined8 uStack_34f8;
  undefined8 uStack_34f0;
  undefined8 uStack_34e8;
  float local_34e0;
  float fStack_34dc;
  float fStack_34d8;
  float fStack_34d4;
  float fStack_34d0;
  float fStack_34cc;
  float fStack_34c8;
  float fStack_34c4;
  undefined8 local_34c0;
  undefined8 uStack_34b8;
  undefined8 uStack_34b0;
  undefined8 uStack_34a8;
  float local_34a0;
  float fStack_349c;
  float fStack_3498;
  float fStack_3494;
  float fStack_3490;
  float fStack_348c;
  float fStack_3488;
  float fStack_3484;
  undefined8 local_3480;
  undefined8 uStack_3478;
  undefined8 uStack_3470;
  undefined8 uStack_3468;
  float local_3460;
  float fStack_345c;
  float fStack_3458;
  float fStack_3454;
  float fStack_3450;
  float fStack_344c;
  float fStack_3448;
  float fStack_3444;
  undefined8 local_3440;
  undefined8 uStack_3438;
  undefined8 uStack_3430;
  undefined8 uStack_3428;
  float local_3420;
  float fStack_341c;
  float fStack_3418;
  float fStack_3414;
  float fStack_3410;
  float fStack_340c;
  float fStack_3408;
  float fStack_3404;
  undefined8 local_3400;
  undefined8 uStack_33f8;
  undefined8 uStack_33f0;
  undefined8 uStack_33e8;
  float local_33e0;
  float fStack_33dc;
  float fStack_33d8;
  float fStack_33d4;
  float fStack_33d0;
  float fStack_33cc;
  float fStack_33c8;
  float fStack_33c4;
  undefined8 local_33c0;
  undefined8 uStack_33b8;
  undefined8 uStack_33b0;
  undefined8 uStack_33a8;
  float local_33a0;
  float fStack_339c;
  float fStack_3398;
  float fStack_3394;
  float fStack_3390;
  float fStack_338c;
  float fStack_3388;
  float fStack_3384;
  undefined8 local_3380;
  undefined8 uStack_3378;
  undefined8 uStack_3370;
  undefined8 uStack_3368;
  float local_3360;
  float fStack_335c;
  float fStack_3358;
  float fStack_3354;
  float fStack_3350;
  float fStack_334c;
  float fStack_3348;
  float fStack_3344;
  undefined8 local_3340;
  undefined8 uStack_3338;
  undefined8 uStack_3330;
  undefined8 uStack_3328;
  float local_3320;
  float fStack_331c;
  float fStack_3318;
  float fStack_3314;
  float fStack_3310;
  float fStack_330c;
  float fStack_3308;
  float fStack_3304;
  undefined8 local_3300;
  undefined8 uStack_32f8;
  undefined8 uStack_32f0;
  undefined8 uStack_32e8;
  float local_32e0;
  float fStack_32dc;
  float fStack_32d8;
  float fStack_32d4;
  float fStack_32d0;
  float fStack_32cc;
  float fStack_32c8;
  float fStack_32c4;
  undefined8 local_32c0;
  undefined8 uStack_32b8;
  undefined8 uStack_32b0;
  undefined8 uStack_32a8;
  float local_32a0;
  float fStack_329c;
  float fStack_3298;
  float fStack_3294;
  float fStack_3290;
  float fStack_328c;
  float fStack_3288;
  float fStack_3284;
  undefined8 local_3280;
  undefined8 uStack_3278;
  undefined8 uStack_3270;
  undefined8 uStack_3268;
  float local_3260;
  float fStack_325c;
  float fStack_3258;
  float fStack_3254;
  float fStack_3250;
  float fStack_324c;
  float fStack_3248;
  float fStack_3244;
  undefined8 local_3240;
  undefined8 uStack_3238;
  undefined8 uStack_3230;
  undefined8 uStack_3228;
  float local_3220;
  float fStack_321c;
  float fStack_3218;
  float fStack_3214;
  float fStack_3210;
  float fStack_320c;
  float fStack_3208;
  float fStack_3204;
  undefined8 local_3200;
  undefined8 uStack_31f8;
  undefined8 uStack_31f0;
  undefined8 uStack_31e8;
  float local_31e0;
  float fStack_31dc;
  float fStack_31d8;
  float fStack_31d4;
  float fStack_31d0;
  float fStack_31cc;
  float fStack_31c8;
  float fStack_31c4;
  undefined8 local_31c0;
  undefined8 uStack_31b8;
  undefined8 uStack_31b0;
  undefined8 uStack_31a8;
  float local_31a0;
  float fStack_319c;
  float fStack_3198;
  float fStack_3194;
  float fStack_3190;
  float fStack_318c;
  float fStack_3188;
  float fStack_3184;
  undefined8 local_3180;
  undefined8 uStack_3178;
  undefined8 uStack_3170;
  undefined8 uStack_3168;
  float local_3160;
  float fStack_315c;
  float fStack_3158;
  float fStack_3154;
  float fStack_3150;
  float fStack_314c;
  float fStack_3148;
  float fStack_3144;
  undefined8 local_3140;
  undefined8 uStack_3138;
  undefined8 uStack_3130;
  undefined8 uStack_3128;
  float local_3120;
  float fStack_311c;
  float fStack_3118;
  float fStack_3114;
  float fStack_3110;
  float fStack_310c;
  float fStack_3108;
  float fStack_3104;
  undefined8 local_3100;
  undefined8 uStack_30f8;
  undefined8 uStack_30f0;
  undefined8 uStack_30e8;
  float local_30e0;
  float fStack_30dc;
  float fStack_30d8;
  float fStack_30d4;
  float fStack_30d0;
  float fStack_30cc;
  float fStack_30c8;
  float fStack_30c4;
  undefined8 local_30c0;
  undefined8 uStack_30b8;
  undefined8 uStack_30b0;
  undefined8 uStack_30a8;
  float local_30a0;
  float fStack_309c;
  float fStack_3098;
  float fStack_3094;
  float fStack_3090;
  float fStack_308c;
  float fStack_3088;
  float fStack_3084;
  undefined8 local_3080;
  undefined8 uStack_3078;
  undefined8 uStack_3070;
  undefined8 uStack_3068;
  float local_3060;
  float fStack_305c;
  float fStack_3058;
  float fStack_3054;
  float fStack_3050;
  float fStack_304c;
  float fStack_3048;
  float fStack_3044;
  undefined8 local_3040;
  undefined8 uStack_3038;
  undefined8 uStack_3030;
  undefined8 uStack_3028;
  float local_3020;
  float fStack_301c;
  float fStack_3018;
  float fStack_3014;
  float fStack_3010;
  float fStack_300c;
  float fStack_3008;
  float fStack_3004;
  undefined8 local_3000;
  undefined8 uStack_2ff8;
  undefined8 uStack_2ff0;
  undefined8 uStack_2fe8;
  float local_2fe0;
  float fStack_2fdc;
  float fStack_2fd8;
  float fStack_2fd4;
  float fStack_2fd0;
  float fStack_2fcc;
  float fStack_2fc8;
  float fStack_2fc4;
  undefined8 local_2fc0;
  undefined8 uStack_2fb8;
  undefined8 uStack_2fb0;
  undefined8 uStack_2fa8;
  float local_2fa0;
  float fStack_2f9c;
  float fStack_2f98;
  float fStack_2f94;
  float fStack_2f90;
  float fStack_2f8c;
  float fStack_2f88;
  float fStack_2f84;
  undefined8 local_2f80;
  undefined8 uStack_2f78;
  undefined8 uStack_2f70;
  undefined8 uStack_2f68;
  float local_2f60;
  float fStack_2f5c;
  float fStack_2f58;
  float fStack_2f54;
  float fStack_2f50;
  float fStack_2f4c;
  float fStack_2f48;
  float fStack_2f44;
  undefined8 local_2f40;
  undefined8 uStack_2f38;
  undefined8 uStack_2f30;
  undefined8 uStack_2f28;
  float local_2f20;
  float fStack_2f1c;
  float fStack_2f18;
  float fStack_2f14;
  float fStack_2f10;
  float fStack_2f0c;
  float fStack_2f08;
  float fStack_2f04;
  undefined8 local_2f00;
  undefined8 uStack_2ef8;
  undefined8 uStack_2ef0;
  undefined8 uStack_2ee8;
  float local_2ee0;
  float fStack_2edc;
  float fStack_2ed8;
  float fStack_2ed4;
  float fStack_2ed0;
  float fStack_2ecc;
  float fStack_2ec8;
  float fStack_2ec4;
  undefined8 local_2ec0;
  undefined8 uStack_2eb8;
  undefined8 uStack_2eb0;
  undefined8 uStack_2ea8;
  float local_2ea0;
  float fStack_2e9c;
  float fStack_2e98;
  float fStack_2e94;
  float fStack_2e90;
  float fStack_2e8c;
  float fStack_2e88;
  float fStack_2e84;
  undefined8 local_2e80;
  undefined8 uStack_2e78;
  undefined8 uStack_2e70;
  undefined8 uStack_2e68;
  float local_2e60;
  float fStack_2e5c;
  float fStack_2e58;
  float fStack_2e54;
  float fStack_2e50;
  float fStack_2e4c;
  float fStack_2e48;
  float fStack_2e44;
  undefined8 local_2e40;
  undefined8 uStack_2e38;
  undefined8 uStack_2e30;
  undefined8 uStack_2e28;
  float local_2e20;
  float fStack_2e1c;
  float fStack_2e18;
  float fStack_2e14;
  float fStack_2e10;
  float fStack_2e0c;
  float fStack_2e08;
  float fStack_2e04;
  undefined8 local_2e00;
  undefined8 uStack_2df8;
  undefined8 uStack_2df0;
  undefined8 uStack_2de8;
  float local_2de0;
  float fStack_2ddc;
  float fStack_2dd8;
  float fStack_2dd4;
  float fStack_2dd0;
  float fStack_2dcc;
  float fStack_2dc8;
  float fStack_2dc4;
  undefined8 local_2dc0;
  undefined8 uStack_2db8;
  undefined8 uStack_2db0;
  undefined8 uStack_2da8;
  float local_2da0;
  float fStack_2d9c;
  float fStack_2d98;
  float fStack_2d94;
  float fStack_2d90;
  float fStack_2d8c;
  float fStack_2d88;
  float fStack_2d84;
  undefined8 local_2d80;
  undefined8 uStack_2d78;
  undefined8 uStack_2d70;
  undefined8 uStack_2d68;
  float local_2d60;
  float fStack_2d5c;
  float fStack_2d58;
  float fStack_2d54;
  float fStack_2d50;
  float fStack_2d4c;
  float fStack_2d48;
  float fStack_2d44;
  undefined8 local_2d40;
  undefined8 uStack_2d38;
  undefined8 uStack_2d30;
  undefined8 uStack_2d28;
  float local_2d20;
  float fStack_2d1c;
  float fStack_2d18;
  float fStack_2d14;
  float fStack_2d10;
  float fStack_2d0c;
  float fStack_2d08;
  float fStack_2d04;
  undefined8 local_2d00;
  undefined8 uStack_2cf8;
  undefined8 uStack_2cf0;
  undefined8 uStack_2ce8;
  float local_2ce0;
  float fStack_2cdc;
  float fStack_2cd8;
  float fStack_2cd4;
  float fStack_2cd0;
  float fStack_2ccc;
  float fStack_2cc8;
  float fStack_2cc4;
  undefined8 local_2cc0;
  undefined8 uStack_2cb8;
  undefined8 uStack_2cb0;
  undefined8 uStack_2ca8;
  float local_2ca0;
  float fStack_2c9c;
  float fStack_2c98;
  float fStack_2c94;
  float fStack_2c90;
  float fStack_2c8c;
  float fStack_2c88;
  float fStack_2c84;
  undefined8 local_2c80;
  undefined8 uStack_2c78;
  undefined8 uStack_2c70;
  undefined8 uStack_2c68;
  float local_2c60;
  float fStack_2c5c;
  float fStack_2c58;
  float fStack_2c54;
  float fStack_2c50;
  float fStack_2c4c;
  float fStack_2c48;
  float fStack_2c44;
  undefined8 local_2c40;
  undefined8 uStack_2c38;
  undefined8 uStack_2c30;
  undefined8 uStack_2c28;
  float local_2c20;
  float fStack_2c1c;
  float fStack_2c18;
  float fStack_2c14;
  float fStack_2c10;
  float fStack_2c0c;
  float fStack_2c08;
  float fStack_2c04;
  undefined8 local_2c00;
  undefined8 uStack_2bf8;
  undefined8 uStack_2bf0;
  undefined8 uStack_2be8;
  float local_2be0;
  float fStack_2bdc;
  float fStack_2bd8;
  float fStack_2bd4;
  float fStack_2bd0;
  float fStack_2bcc;
  float fStack_2bc8;
  float fStack_2bc4;
  undefined8 local_2bc0;
  undefined8 uStack_2bb8;
  undefined8 uStack_2bb0;
  undefined8 uStack_2ba8;
  float local_2ba0;
  float fStack_2b9c;
  float fStack_2b98;
  float fStack_2b94;
  float fStack_2b90;
  float fStack_2b8c;
  float fStack_2b88;
  float fStack_2b84;
  undefined8 local_2b80;
  undefined8 uStack_2b78;
  undefined8 uStack_2b70;
  undefined8 uStack_2b68;
  float local_2b60;
  float fStack_2b5c;
  float fStack_2b58;
  float fStack_2b54;
  float fStack_2b50;
  float fStack_2b4c;
  float fStack_2b48;
  float fStack_2b44;
  undefined8 local_2b40;
  undefined8 uStack_2b38;
  undefined8 uStack_2b30;
  undefined8 uStack_2b28;
  float local_2b20;
  float fStack_2b1c;
  float fStack_2b18;
  float fStack_2b14;
  float fStack_2b10;
  float fStack_2b0c;
  float fStack_2b08;
  float fStack_2b04;
  undefined8 local_2b00;
  undefined8 uStack_2af8;
  undefined8 uStack_2af0;
  undefined8 uStack_2ae8;
  float local_2ae0;
  float fStack_2adc;
  float fStack_2ad8;
  float fStack_2ad4;
  float fStack_2ad0;
  float fStack_2acc;
  float fStack_2ac8;
  float fStack_2ac4;
  undefined8 local_2ac0;
  undefined8 uStack_2ab8;
  undefined8 uStack_2ab0;
  undefined8 uStack_2aa8;
  float local_2aa0;
  float fStack_2a9c;
  float fStack_2a98;
  float fStack_2a94;
  float fStack_2a90;
  float fStack_2a8c;
  float fStack_2a88;
  float fStack_2a84;
  undefined8 local_2a80;
  undefined8 uStack_2a78;
  undefined8 uStack_2a70;
  undefined8 uStack_2a68;
  float local_2a60;
  float fStack_2a5c;
  float fStack_2a58;
  float fStack_2a54;
  float fStack_2a50;
  float fStack_2a4c;
  float fStack_2a48;
  float fStack_2a44;
  undefined8 local_2a40;
  undefined8 uStack_2a38;
  undefined8 uStack_2a30;
  undefined8 uStack_2a28;
  float local_2a20;
  float fStack_2a1c;
  float fStack_2a18;
  float fStack_2a14;
  float fStack_2a10;
  float fStack_2a0c;
  float fStack_2a08;
  float fStack_2a04;
  undefined8 local_2a00;
  undefined8 uStack_29f8;
  undefined8 uStack_29f0;
  undefined8 uStack_29e8;
  float local_29e0;
  float fStack_29dc;
  float fStack_29d8;
  float fStack_29d4;
  float fStack_29d0;
  float fStack_29cc;
  float fStack_29c8;
  float fStack_29c4;
  undefined8 local_29c0;
  undefined8 uStack_29b8;
  undefined8 uStack_29b0;
  undefined8 uStack_29a8;
  float local_29a0;
  float fStack_299c;
  float fStack_2998;
  float fStack_2994;
  float fStack_2990;
  float fStack_298c;
  float fStack_2988;
  float fStack_2984;
  undefined8 local_2980;
  undefined8 uStack_2978;
  undefined8 uStack_2970;
  undefined8 uStack_2968;
  float local_2960;
  float fStack_295c;
  float fStack_2958;
  float fStack_2954;
  float fStack_2950;
  float fStack_294c;
  float fStack_2948;
  float fStack_2944;
  undefined8 local_2940;
  undefined8 uStack_2938;
  undefined8 uStack_2930;
  undefined8 uStack_2928;
  float local_2920;
  float fStack_291c;
  float fStack_2918;
  float fStack_2914;
  float fStack_2910;
  float fStack_290c;
  float fStack_2908;
  float fStack_2904;
  undefined8 local_2900;
  undefined8 uStack_28f8;
  undefined8 uStack_28f0;
  undefined8 uStack_28e8;
  float local_28e0;
  float fStack_28dc;
  float fStack_28d8;
  float fStack_28d4;
  float fStack_28d0;
  float fStack_28cc;
  float fStack_28c8;
  float fStack_28c4;
  undefined8 local_28c0;
  undefined8 uStack_28b8;
  undefined8 uStack_28b0;
  undefined8 uStack_28a8;
  float local_28a0;
  float fStack_289c;
  float fStack_2898;
  float fStack_2894;
  float fStack_2890;
  float fStack_288c;
  float fStack_2888;
  float fStack_2884;
  undefined8 local_2880;
  undefined8 uStack_2878;
  undefined8 uStack_2870;
  undefined8 uStack_2868;
  float local_2860;
  float fStack_285c;
  float fStack_2858;
  float fStack_2854;
  float fStack_2850;
  float fStack_284c;
  float fStack_2848;
  float fStack_2844;
  undefined8 local_2840;
  undefined8 uStack_2838;
  undefined8 uStack_2830;
  undefined8 uStack_2828;
  float local_2820;
  float fStack_281c;
  float fStack_2818;
  float fStack_2814;
  float fStack_2810;
  float fStack_280c;
  float fStack_2808;
  float fStack_2804;
  undefined8 local_2800;
  undefined8 uStack_27f8;
  undefined8 uStack_27f0;
  undefined8 uStack_27e8;
  float local_27e0;
  float fStack_27dc;
  float fStack_27d8;
  float fStack_27d4;
  float fStack_27d0;
  float fStack_27cc;
  float fStack_27c8;
  float fStack_27c4;
  undefined8 local_27c0;
  undefined8 uStack_27b8;
  undefined8 uStack_27b0;
  undefined8 uStack_27a8;
  float local_27a0;
  float fStack_279c;
  float fStack_2798;
  float fStack_2794;
  float fStack_2790;
  float fStack_278c;
  float fStack_2788;
  float fStack_2784;
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 uStack_2770;
  undefined8 uStack_2768;
  float local_2760;
  float fStack_275c;
  float fStack_2758;
  float fStack_2754;
  float fStack_2750;
  float fStack_274c;
  float fStack_2748;
  float fStack_2744;
  undefined8 local_2740;
  undefined8 uStack_2738;
  undefined8 uStack_2730;
  undefined8 uStack_2728;
  float local_2720;
  float fStack_271c;
  float fStack_2718;
  float fStack_2714;
  float fStack_2710;
  float fStack_270c;
  float fStack_2708;
  float fStack_2704;
  undefined8 local_2700;
  undefined8 uStack_26f8;
  undefined8 uStack_26f0;
  undefined8 uStack_26e8;
  float local_26e0;
  float fStack_26dc;
  float fStack_26d8;
  float fStack_26d4;
  float fStack_26d0;
  float fStack_26cc;
  float fStack_26c8;
  float fStack_26c4;
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 uStack_26b0;
  undefined8 uStack_26a8;
  float local_26a0;
  float fStack_269c;
  float fStack_2698;
  float fStack_2694;
  float fStack_2690;
  float fStack_268c;
  float fStack_2688;
  float fStack_2684;
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  float local_2660;
  float fStack_265c;
  float fStack_2658;
  float fStack_2654;
  float fStack_2650;
  float fStack_264c;
  float fStack_2648;
  float fStack_2644;
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined8 uStack_2630;
  undefined8 uStack_2628;
  float local_2620;
  float fStack_261c;
  float fStack_2618;
  float fStack_2614;
  float fStack_2610;
  float fStack_260c;
  float fStack_2608;
  float fStack_2604;
  undefined8 local_2600;
  undefined8 uStack_25f8;
  undefined8 uStack_25f0;
  undefined8 uStack_25e8;
  float local_25e0;
  float fStack_25dc;
  float fStack_25d8;
  float fStack_25d4;
  float fStack_25d0;
  float fStack_25cc;
  float fStack_25c8;
  float fStack_25c4;
  undefined8 local_25c0;
  undefined8 uStack_25b8;
  undefined8 uStack_25b0;
  undefined8 uStack_25a8;
  float local_25a0;
  float fStack_259c;
  float fStack_2598;
  float fStack_2594;
  float fStack_2590;
  float fStack_258c;
  float fStack_2588;
  float fStack_2584;
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  float local_2560;
  float fStack_255c;
  float fStack_2558;
  float fStack_2554;
  float fStack_2550;
  float fStack_254c;
  float fStack_2548;
  float fStack_2544;
  undefined8 local_2540;
  undefined8 uStack_2538;
  undefined8 uStack_2530;
  undefined8 uStack_2528;
  float local_2520;
  float fStack_251c;
  float fStack_2518;
  float fStack_2514;
  float fStack_2510;
  float fStack_250c;
  float fStack_2508;
  float fStack_2504;
  undefined8 local_2500;
  undefined8 uStack_24f8;
  undefined8 uStack_24f0;
  undefined8 uStack_24e8;
  float local_24e0;
  float fStack_24dc;
  float fStack_24d8;
  float fStack_24d4;
  float fStack_24d0;
  float fStack_24cc;
  float fStack_24c8;
  float fStack_24c4;
  undefined8 local_24c0;
  undefined8 uStack_24b8;
  undefined8 uStack_24b0;
  undefined8 uStack_24a8;
  float local_24a0;
  float fStack_249c;
  float fStack_2498;
  float fStack_2494;
  float fStack_2490;
  float fStack_248c;
  float fStack_2488;
  float fStack_2484;
  undefined8 local_2480;
  undefined8 uStack_2478;
  undefined8 uStack_2470;
  undefined8 uStack_2468;
  float local_2460;
  float fStack_245c;
  float fStack_2458;
  float fStack_2454;
  float fStack_2450;
  float fStack_244c;
  float fStack_2448;
  float fStack_2444;
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined8 uStack_2430;
  undefined8 uStack_2428;
  float local_2420;
  float fStack_241c;
  float fStack_2418;
  float fStack_2414;
  float fStack_2410;
  float fStack_240c;
  float fStack_2408;
  float fStack_2404;
  undefined8 local_2400;
  undefined8 uStack_23f8;
  undefined8 uStack_23f0;
  undefined8 uStack_23e8;
  float local_23e0;
  float fStack_23dc;
  float fStack_23d8;
  float fStack_23d4;
  float fStack_23d0;
  float fStack_23cc;
  float fStack_23c8;
  float fStack_23c4;
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  float local_23a0;
  float fStack_239c;
  float fStack_2398;
  float fStack_2394;
  float fStack_2390;
  float fStack_238c;
  float fStack_2388;
  float fStack_2384;
  undefined8 local_2380;
  undefined8 uStack_2378;
  undefined8 uStack_2370;
  undefined8 uStack_2368;
  float local_2360;
  float fStack_235c;
  float fStack_2358;
  float fStack_2354;
  float fStack_2350;
  float fStack_234c;
  float fStack_2348;
  float fStack_2344;
  undefined8 local_2340;
  undefined8 uStack_2338;
  undefined8 uStack_2330;
  undefined8 uStack_2328;
  float local_2320;
  float fStack_231c;
  float fStack_2318;
  float fStack_2314;
  float fStack_2310;
  float fStack_230c;
  float fStack_2308;
  float fStack_2304;
  undefined8 local_2300;
  undefined8 uStack_22f8;
  undefined8 uStack_22f0;
  undefined8 uStack_22e8;
  float local_22e0;
  float fStack_22dc;
  float fStack_22d8;
  float fStack_22d4;
  float fStack_22d0;
  float fStack_22cc;
  float fStack_22c8;
  float fStack_22c4;
  undefined8 local_22c0;
  undefined8 uStack_22b8;
  undefined8 uStack_22b0;
  undefined8 uStack_22a8;
  float local_22a0;
  float fStack_229c;
  float fStack_2298;
  float fStack_2294;
  float fStack_2290;
  float fStack_228c;
  float fStack_2288;
  float fStack_2284;
  undefined8 local_2280;
  undefined8 uStack_2278;
  undefined8 uStack_2270;
  undefined8 uStack_2268;
  float local_2260;
  float fStack_225c;
  float fStack_2258;
  float fStack_2254;
  float fStack_2250;
  float fStack_224c;
  float fStack_2248;
  float fStack_2244;
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined8 uStack_2230;
  undefined8 uStack_2228;
  float local_2220;
  float fStack_221c;
  float fStack_2218;
  float fStack_2214;
  float fStack_2210;
  float fStack_220c;
  float fStack_2208;
  float fStack_2204;
  undefined8 local_2200;
  undefined8 uStack_21f8;
  undefined8 uStack_21f0;
  undefined8 uStack_21e8;
  float local_21e0;
  float fStack_21dc;
  float fStack_21d8;
  float fStack_21d4;
  float fStack_21d0;
  float fStack_21cc;
  float fStack_21c8;
  float fStack_21c4;
  undefined8 local_21c0;
  undefined8 uStack_21b8;
  undefined8 uStack_21b0;
  undefined8 uStack_21a8;
  float local_21a0;
  float fStack_219c;
  float fStack_2198;
  float fStack_2194;
  float fStack_2190;
  float fStack_218c;
  float fStack_2188;
  float fStack_2184;
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  float local_2160;
  float fStack_215c;
  float fStack_2158;
  float fStack_2154;
  float fStack_2150;
  float fStack_214c;
  float fStack_2148;
  float fStack_2144;
  undefined8 local_2140;
  undefined8 uStack_2138;
  undefined8 uStack_2130;
  undefined8 uStack_2128;
  float local_2120;
  float fStack_211c;
  float fStack_2118;
  float fStack_2114;
  float fStack_2110;
  float fStack_210c;
  float fStack_2108;
  float fStack_2104;
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 uStack_20f0;
  undefined8 uStack_20e8;
  float local_20e0;
  float fStack_20dc;
  float fStack_20d8;
  float fStack_20d4;
  float fStack_20d0;
  float fStack_20cc;
  float fStack_20c8;
  float fStack_20c4;
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  float local_20a0;
  float fStack_209c;
  float fStack_2098;
  float fStack_2094;
  float fStack_2090;
  float fStack_208c;
  float fStack_2088;
  float fStack_2084;
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  float local_2060;
  float fStack_205c;
  float fStack_2058;
  float fStack_2054;
  float fStack_2050;
  float fStack_204c;
  float fStack_2048;
  float fStack_2044;
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 uStack_2030;
  undefined8 uStack_2028;
  float local_2020;
  float fStack_201c;
  float fStack_2018;
  float fStack_2014;
  float fStack_2010;
  float fStack_200c;
  float fStack_2008;
  float fStack_2004;
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  float local_1fe0;
  float fStack_1fdc;
  float fStack_1fd8;
  float fStack_1fd4;
  float fStack_1fd0;
  float fStack_1fcc;
  float fStack_1fc8;
  float fStack_1fc4;
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  float local_1fa0;
  float fStack_1f9c;
  float fStack_1f98;
  float fStack_1f94;
  float fStack_1f90;
  float fStack_1f8c;
  float fStack_1f88;
  float fStack_1f84;
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 uStack_1f70;
  undefined8 uStack_1f68;
  float local_1f60;
  float fStack_1f5c;
  float fStack_1f58;
  float fStack_1f54;
  float fStack_1f50;
  float fStack_1f4c;
  float fStack_1f48;
  float fStack_1f44;
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined8 uStack_1f30;
  undefined8 uStack_1f28;
  float local_1f20;
  float fStack_1f1c;
  float fStack_1f18;
  float fStack_1f14;
  float fStack_1f10;
  float fStack_1f0c;
  float fStack_1f08;
  float fStack_1f04;
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  float local_1ee0;
  float fStack_1edc;
  float fStack_1ed8;
  float fStack_1ed4;
  float fStack_1ed0;
  float fStack_1ecc;
  float fStack_1ec8;
  float fStack_1ec4;
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  float local_1ea0;
  float fStack_1e9c;
  float fStack_1e98;
  float fStack_1e94;
  float fStack_1e90;
  float fStack_1e8c;
  float fStack_1e88;
  float fStack_1e84;
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  float local_1e60;
  float fStack_1e5c;
  float fStack_1e58;
  float fStack_1e54;
  float fStack_1e50;
  float fStack_1e4c;
  float fStack_1e48;
  float fStack_1e44;
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  float local_1e20;
  float fStack_1e1c;
  float fStack_1e18;
  float fStack_1e14;
  float fStack_1e10;
  float fStack_1e0c;
  float fStack_1e08;
  float fStack_1e04;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  float local_1de0;
  float fStack_1ddc;
  float fStack_1dd8;
  float fStack_1dd4;
  float fStack_1dd0;
  float fStack_1dcc;
  float fStack_1dc8;
  float fStack_1dc4;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  float local_1da0;
  float fStack_1d9c;
  float fStack_1d98;
  float fStack_1d94;
  float fStack_1d90;
  float fStack_1d8c;
  float fStack_1d88;
  float fStack_1d84;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  float local_1d60;
  float fStack_1d5c;
  float fStack_1d58;
  float fStack_1d54;
  float fStack_1d50;
  float fStack_1d4c;
  float fStack_1d48;
  float fStack_1d44;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  float local_1d20;
  float fStack_1d1c;
  float fStack_1d18;
  float fStack_1d14;
  float fStack_1d10;
  float fStack_1d0c;
  float fStack_1d08;
  float fStack_1d04;
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  float local_1ce0;
  float fStack_1cdc;
  float fStack_1cd8;
  float fStack_1cd4;
  float fStack_1cd0;
  float fStack_1ccc;
  float fStack_1cc8;
  float fStack_1cc4;
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  float local_1ca0;
  float fStack_1c9c;
  float fStack_1c98;
  float fStack_1c94;
  float fStack_1c90;
  float fStack_1c8c;
  float fStack_1c88;
  float fStack_1c84;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  float local_1c60;
  float fStack_1c5c;
  float fStack_1c58;
  float fStack_1c54;
  float fStack_1c50;
  float fStack_1c4c;
  float fStack_1c48;
  float fStack_1c44;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  float local_1c20;
  float fStack_1c1c;
  float fStack_1c18;
  float fStack_1c14;
  float fStack_1c10;
  float fStack_1c0c;
  float fStack_1c08;
  float fStack_1c04;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  float local_1be0;
  float fStack_1bdc;
  float fStack_1bd8;
  float fStack_1bd4;
  float fStack_1bd0;
  float fStack_1bcc;
  float fStack_1bc8;
  float fStack_1bc4;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  float local_1ba0;
  float fStack_1b9c;
  float fStack_1b98;
  float fStack_1b94;
  float fStack_1b90;
  float fStack_1b8c;
  float fStack_1b88;
  float fStack_1b84;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  float local_1b60;
  float fStack_1b5c;
  float fStack_1b58;
  float fStack_1b54;
  float fStack_1b50;
  float fStack_1b4c;
  float fStack_1b48;
  float fStack_1b44;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  float local_1b20;
  float fStack_1b1c;
  float fStack_1b18;
  float fStack_1b14;
  float fStack_1b10;
  float fStack_1b0c;
  float fStack_1b08;
  float fStack_1b04;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  float local_1ae0;
  float fStack_1adc;
  float fStack_1ad8;
  float fStack_1ad4;
  float fStack_1ad0;
  float fStack_1acc;
  float fStack_1ac8;
  float fStack_1ac4;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  float local_1aa0;
  float fStack_1a9c;
  float fStack_1a98;
  float fStack_1a94;
  float fStack_1a90;
  float fStack_1a8c;
  float fStack_1a88;
  float fStack_1a84;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  float local_1a60;
  float fStack_1a5c;
  float fStack_1a58;
  float fStack_1a54;
  float fStack_1a50;
  float fStack_1a4c;
  float fStack_1a48;
  float fStack_1a44;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  float local_1a20;
  float fStack_1a1c;
  float fStack_1a18;
  float fStack_1a14;
  float fStack_1a10;
  float fStack_1a0c;
  float fStack_1a08;
  float fStack_1a04;
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  float local_19e0;
  float fStack_19dc;
  float fStack_19d8;
  float fStack_19d4;
  float fStack_19d0;
  float fStack_19cc;
  float fStack_19c8;
  float fStack_19c4;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  float local_19a0;
  float fStack_199c;
  float fStack_1998;
  float fStack_1994;
  float fStack_1990;
  float fStack_198c;
  float fStack_1988;
  float fStack_1984;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  float local_1960;
  float fStack_195c;
  float fStack_1958;
  float fStack_1954;
  float fStack_1950;
  float fStack_194c;
  float fStack_1948;
  float fStack_1944;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  float local_1920;
  float fStack_191c;
  float fStack_1918;
  float fStack_1914;
  float fStack_1910;
  float fStack_190c;
  float fStack_1908;
  float fStack_1904;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  float local_18e0;
  float fStack_18dc;
  float fStack_18d8;
  float fStack_18d4;
  float fStack_18d0;
  float fStack_18cc;
  float fStack_18c8;
  float fStack_18c4;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  float local_18a0;
  float fStack_189c;
  float fStack_1898;
  float fStack_1894;
  float fStack_1890;
  float fStack_188c;
  float fStack_1888;
  float fStack_1884;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  float local_1860;
  float fStack_185c;
  float fStack_1858;
  float fStack_1854;
  float fStack_1850;
  float fStack_184c;
  float fStack_1848;
  float fStack_1844;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  float local_1820;
  float fStack_181c;
  float fStack_1818;
  float fStack_1814;
  float fStack_1810;
  float fStack_180c;
  float fStack_1808;
  float fStack_1804;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  float local_17e0;
  float fStack_17dc;
  float fStack_17d8;
  float fStack_17d4;
  float fStack_17d0;
  float fStack_17cc;
  float fStack_17c8;
  float fStack_17c4;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  float local_17a0;
  float fStack_179c;
  float fStack_1798;
  float fStack_1794;
  float fStack_1790;
  float fStack_178c;
  float fStack_1788;
  float fStack_1784;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  float local_1760;
  float fStack_175c;
  float fStack_1758;
  float fStack_1754;
  float fStack_1750;
  float fStack_174c;
  float fStack_1748;
  float fStack_1744;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  float local_1720;
  float fStack_171c;
  float fStack_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float fStack_1708;
  float fStack_1704;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  float local_16e0;
  float fStack_16dc;
  float fStack_16d8;
  float fStack_16d4;
  float fStack_16d0;
  float fStack_16cc;
  float fStack_16c8;
  float fStack_16c4;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  float local_16a0;
  float fStack_169c;
  float fStack_1698;
  float fStack_1694;
  float fStack_1690;
  float fStack_168c;
  float fStack_1688;
  float fStack_1684;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  float local_1660;
  float fStack_165c;
  float fStack_1658;
  float fStack_1654;
  float fStack_1650;
  float fStack_164c;
  float fStack_1648;
  float fStack_1644;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  float local_1620;
  float fStack_161c;
  float fStack_1618;
  float fStack_1614;
  float fStack_1610;
  float fStack_160c;
  float fStack_1608;
  float fStack_1604;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  float local_15e0;
  float fStack_15dc;
  float fStack_15d8;
  float fStack_15d4;
  float fStack_15d0;
  float fStack_15cc;
  float fStack_15c8;
  float fStack_15c4;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  float local_15a0;
  float fStack_159c;
  float fStack_1598;
  float fStack_1594;
  float fStack_1590;
  float fStack_158c;
  float fStack_1588;
  float fStack_1584;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  float local_1560;
  float fStack_155c;
  float fStack_1558;
  float fStack_1554;
  float fStack_1550;
  float fStack_154c;
  float fStack_1548;
  float fStack_1544;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  float local_1520;
  float fStack_151c;
  float fStack_1518;
  float fStack_1514;
  float fStack_1510;
  float fStack_150c;
  float fStack_1508;
  float fStack_1504;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  float local_14e0;
  float fStack_14dc;
  float fStack_14d8;
  float fStack_14d4;
  float fStack_14d0;
  float fStack_14cc;
  float fStack_14c8;
  float fStack_14c4;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  float local_14a0;
  float fStack_149c;
  float fStack_1498;
  float fStack_1494;
  float fStack_1490;
  float fStack_148c;
  float fStack_1488;
  float fStack_1484;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  float local_1460;
  float fStack_145c;
  float fStack_1458;
  float fStack_1454;
  float fStack_1450;
  float fStack_144c;
  float fStack_1448;
  float fStack_1444;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  float local_1420;
  float fStack_141c;
  float fStack_1418;
  float fStack_1414;
  float fStack_1410;
  float fStack_140c;
  float fStack_1408;
  float fStack_1404;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  float local_13e0;
  float fStack_13dc;
  float fStack_13d8;
  float fStack_13d4;
  float fStack_13d0;
  float fStack_13cc;
  float fStack_13c8;
  float fStack_13c4;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  float local_13a0;
  float fStack_139c;
  float fStack_1398;
  float fStack_1394;
  float fStack_1390;
  float fStack_138c;
  float fStack_1388;
  float fStack_1384;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  float local_1360;
  float fStack_135c;
  float fStack_1358;
  float fStack_1354;
  float fStack_1350;
  float fStack_134c;
  float fStack_1348;
  float fStack_1344;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  float local_1320;
  float fStack_131c;
  float fStack_1318;
  float fStack_1314;
  float fStack_1310;
  float fStack_130c;
  float fStack_1308;
  float fStack_1304;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  float local_12e0;
  float fStack_12dc;
  float fStack_12d8;
  float fStack_12d4;
  float fStack_12d0;
  float fStack_12cc;
  float fStack_12c8;
  float fStack_12c4;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  float local_12a0;
  float fStack_129c;
  float fStack_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  float local_1260;
  float fStack_125c;
  float fStack_1258;
  float fStack_1254;
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  float fStack_1244;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  float local_1220;
  float fStack_121c;
  float fStack_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  float fStack_1204;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  float local_11e0;
  float fStack_11dc;
  float fStack_11d8;
  float fStack_11d4;
  float fStack_11d0;
  float fStack_11cc;
  float fStack_11c8;
  float fStack_11c4;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  float local_11a0;
  float fStack_119c;
  float fStack_1198;
  float fStack_1194;
  float fStack_1190;
  float fStack_118c;
  float fStack_1188;
  float fStack_1184;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  float local_1160;
  float fStack_115c;
  float fStack_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  float fStack_1148;
  float fStack_1144;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  float local_1120;
  float fStack_111c;
  float fStack_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float fStack_1108;
  float fStack_1104;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  float local_10e0;
  float fStack_10dc;
  float fStack_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float fStack_10c8;
  float fStack_10c4;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  float local_10a0;
  float fStack_109c;
  float fStack_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float fStack_1088;
  float fStack_1084;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  float local_1060;
  float fStack_105c;
  float fStack_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float fStack_1048;
  float fStack_1044;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  float local_1020;
  float fStack_101c;
  float fStack_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float fStack_1008;
  float fStack_1004;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  float local_fe0;
  float fStack_fdc;
  float fStack_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float fStack_fc8;
  float fStack_fc4;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  float local_fa0;
  float fStack_f9c;
  float fStack_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float fStack_f88;
  float fStack_f84;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  float local_f60;
  float fStack_f5c;
  float fStack_f58;
  float fStack_f54;
  float fStack_f50;
  float fStack_f4c;
  float fStack_f48;
  float fStack_f44;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  float local_f20;
  float fStack_f1c;
  float fStack_f18;
  float fStack_f14;
  float fStack_f10;
  float fStack_f0c;
  float fStack_f08;
  float fStack_f04;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  float local_ee0;
  float fStack_edc;
  float fStack_ed8;
  float fStack_ed4;
  float fStack_ed0;
  float fStack_ecc;
  float fStack_ec8;
  float fStack_ec4;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  float local_ea0;
  float fStack_e9c;
  float fStack_e98;
  float fStack_e94;
  float fStack_e90;
  float fStack_e8c;
  float fStack_e88;
  float fStack_e84;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  float local_e60;
  float fStack_e5c;
  float fStack_e58;
  float fStack_e54;
  float fStack_e50;
  float fStack_e4c;
  float fStack_e48;
  float fStack_e44;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  float local_e20;
  float fStack_e1c;
  float fStack_e18;
  float fStack_e14;
  float fStack_e10;
  float fStack_e0c;
  float fStack_e08;
  float fStack_e04;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  float local_de0;
  float fStack_ddc;
  float fStack_dd8;
  float fStack_dd4;
  float fStack_dd0;
  float fStack_dcc;
  float fStack_dc8;
  float fStack_dc4;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  float local_da0;
  float fStack_d9c;
  float fStack_d98;
  float fStack_d94;
  float fStack_d90;
  float fStack_d8c;
  float fStack_d88;
  float fStack_d84;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  float local_d60;
  float fStack_d5c;
  float fStack_d58;
  float fStack_d54;
  float fStack_d50;
  float fStack_d4c;
  float fStack_d48;
  float fStack_d44;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  float local_d20;
  float fStack_d1c;
  float fStack_d18;
  float fStack_d14;
  float fStack_d10;
  float fStack_d0c;
  float fStack_d08;
  float fStack_d04;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  float local_ce0;
  float fStack_cdc;
  float fStack_cd8;
  float fStack_cd4;
  float fStack_cd0;
  float fStack_ccc;
  float fStack_cc8;
  float fStack_cc4;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  float local_ca0;
  float fStack_c9c;
  float fStack_c98;
  float fStack_c94;
  float fStack_c90;
  float fStack_c8c;
  float fStack_c88;
  float fStack_c84;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  float local_c60;
  float fStack_c5c;
  float fStack_c58;
  float fStack_c54;
  float fStack_c50;
  float fStack_c4c;
  float fStack_c48;
  float fStack_c44;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  float local_c20;
  float fStack_c1c;
  float fStack_c18;
  float fStack_c14;
  float fStack_c10;
  float fStack_c0c;
  float fStack_c08;
  float fStack_c04;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  float local_be0;
  float fStack_bdc;
  float fStack_bd8;
  float fStack_bd4;
  float fStack_bd0;
  float fStack_bcc;
  float fStack_bc8;
  float fStack_bc4;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  float local_ba0;
  float fStack_b9c;
  float fStack_b98;
  float fStack_b94;
  float fStack_b90;
  float fStack_b8c;
  float fStack_b88;
  float fStack_b84;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  float local_b60;
  float fStack_b5c;
  float fStack_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  float fStack_b48;
  float fStack_b44;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  float local_b20;
  float fStack_b1c;
  float fStack_b18;
  float fStack_b14;
  float fStack_b10;
  float fStack_b0c;
  float fStack_b08;
  float fStack_b04;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  float local_ae0;
  float fStack_adc;
  float fStack_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac8;
  float fStack_ac4;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  float local_aa0;
  float fStack_a9c;
  float fStack_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  float local_a60;
  float fStack_a5c;
  float fStack_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  float local_a20;
  float fStack_a1c;
  float fStack_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float fStack_a08;
  float fStack_a04;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  float local_9e0;
  float fStack_9dc;
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  float local_9a0;
  float fStack_99c;
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  float local_960;
  float fStack_95c;
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  float local_920;
  float fStack_91c;
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  float local_8e0;
  float fStack_8dc;
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  float local_8a0;
  float fStack_89c;
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  float local_860;
  float fStack_85c;
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  float local_820;
  float fStack_81c;
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  float local_7e0;
  float fStack_7dc;
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  float local_7a0;
  float fStack_79c;
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  float local_760;
  float fStack_75c;
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  float local_720;
  float fStack_71c;
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  float local_6e0;
  float fStack_6dc;
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  float local_1a0;
  float fStack_19c;
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  float local_60;
  float fStack_5c;
  float fStack_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float fStack_48;
  float fStack_44;
  
  local_7d0c = *(int *)(in_RSI + 0x2c);
  local_7d10 = *(int *)(in_RSI + 0x30);
  local_7d14 = *(int *)(in_RDI + 0x38);
  local_7cf8 = in_RDX;
  local_7d20 = Mat::operator_cast_to_float_(in_RCX);
  for (local_7d24 = 0; local_7d24 < local_7d14; local_7d24 = local_7d24 + 1) {
    Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffff5b14,in_stack_ffffffffffff5b10),
                 (int)in_stack_ffffffffffff5b0c);
    if (local_7d20 == (float *)0x0) {
      local_7cdc = 0;
      local_43c4 = 0;
      local_43c8 = 0;
      local_43cc = 0;
      local_43d0 = 0;
      local_43d4 = 0;
      local_43d8 = 0;
      local_43dc = 0;
      local_43e0 = 0;
      auVar1 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0),0x20);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0),0x20);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0),0x30);
      auVar80._16_16_ = auVar1;
      auVar80._0_16_ = auVar2;
      local_4400._0_8_ = auVar2._0_8_;
      local_4400._8_8_ = auVar2._8_8_;
      local_4400._16_8_ = auVar1._0_8_;
      local_4400._24_8_ = auVar1._8_8_;
      local_8a20 = local_4400._0_8_;
      uStack_8a18 = local_4400._8_8_;
      uStack_8a10 = local_4400._16_8_;
      uStack_8a08 = local_4400._24_8_;
      local_4400 = auVar80;
    }
    else {
      local_7a68 = local_7d20 + (local_7d24 << 3);
      local_8a20 = *(undefined8 *)local_7a68;
      uStack_8a18 = *(undefined8 *)(local_7a68 + 2);
      uStack_8a10 = *(undefined8 *)(local_7a68 + 4);
      uStack_8a08 = *(undefined8 *)(local_7a68 + 6);
    }
    local_7da0 = local_8a20;
    uStack_7d98 = uStack_8a18;
    uStack_7d90 = uStack_8a10;
    uStack_7d88 = uStack_8a08;
    local_7db8 = Mat::row(local_7cf8,local_7d24);
    local_7dc0 = Mat::row(&local_7d70,0);
    Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffff5b14,in_stack_ffffffffffff5b10),
                 (int)in_stack_ffffffffffff5b0c);
    local_7e10 = Mat::row(&local_7e08,0);
    local_7e18 = Mat::row(&local_7e08,1);
    local_7e20 = Mat::row(&local_7e08,2);
    local_7a70 = local_7db8;
    uVar3 = *(undefined8 *)local_7db8;
    uVar4 = *(undefined8 *)(local_7db8 + 2);
    uVar5 = *(undefined8 *)(local_7db8 + 4);
    uVar6 = *(undefined8 *)(local_7db8 + 6);
    local_7a78 = local_7db8 + 8;
    uVar7 = *(undefined8 *)local_7a78;
    uVar8 = *(undefined8 *)(local_7db8 + 10);
    uVar9 = *(undefined8 *)(local_7db8 + 0xc);
    uVar10 = *(undefined8 *)(local_7db8 + 0xe);
    local_7a80 = local_7db8 + 0x10;
    uVar11 = *(undefined8 *)local_7a80;
    uVar12 = *(undefined8 *)(local_7db8 + 0x12);
    uVar13 = *(undefined8 *)(local_7db8 + 0x14);
    uVar14 = *(undefined8 *)(local_7db8 + 0x16);
    local_7a88 = local_7db8 + 0x18;
    uVar15 = *(undefined8 *)local_7a88;
    uVar16 = *(undefined8 *)(local_7db8 + 0x1a);
    uVar17 = *(undefined8 *)(local_7db8 + 0x1c);
    uVar18 = *(undefined8 *)(local_7db8 + 0x1e);
    local_7a90 = local_7db8 + 0x20;
    uVar19 = *(undefined8 *)local_7a90;
    uVar20 = *(undefined8 *)(local_7db8 + 0x22);
    uVar21 = *(undefined8 *)(local_7db8 + 0x24);
    uVar22 = *(undefined8 *)(local_7db8 + 0x26);
    local_7a98 = local_7db8 + 0x28;
    uVar23 = *(undefined8 *)local_7a98;
    uVar24 = *(undefined8 *)(local_7db8 + 0x2a);
    uVar25 = *(undefined8 *)(local_7db8 + 0x2c);
    uVar26 = *(undefined8 *)(local_7db8 + 0x2e);
    local_7aa0 = local_7db8 + 0x30;
    uVar27 = *(undefined8 *)local_7aa0;
    uVar28 = *(undefined8 *)(local_7db8 + 0x32);
    uVar29 = *(undefined8 *)(local_7db8 + 0x34);
    uVar30 = *(undefined8 *)(local_7db8 + 0x36);
    local_7aa8 = local_7db8 + 0x38;
    uVar31 = *(undefined8 *)local_7aa8;
    uVar32 = *(undefined8 *)(local_7db8 + 0x3a);
    uVar33 = *(undefined8 *)(local_7db8 + 0x3c);
    uVar34 = *(undefined8 *)(local_7db8 + 0x3e);
    local_7ab0 = local_7db8 + 0x40;
    uVar35 = *(undefined8 *)local_7ab0;
    uVar36 = *(undefined8 *)(local_7db8 + 0x42);
    uVar37 = *(undefined8 *)(local_7db8 + 0x44);
    uVar38 = *(undefined8 *)(local_7db8 + 0x46);
    for (local_7f44 = 0; local_7f44 < local_7d10; local_7f44 = local_7f44 + 1) {
      local_7f48 = 0;
      while( true ) {
        uVar78 = uStack_43a8;
        uVar77 = uStack_43b0;
        uVar76 = uStack_43b8;
        uVar75 = local_43c0;
        uVar74 = uStack_47c8;
        uVar73 = uStack_47d0;
        uVar72 = uStack_47d8;
        uVar71 = local_47e0;
        uVar70 = uStack_4828;
        uVar69 = uStack_4830;
        uVar68 = uStack_4838;
        uVar67 = local_4840;
        uVar66 = uStack_4888;
        uVar65 = uStack_4890;
        uVar64 = uStack_4898;
        uVar63 = local_48a0;
        uVar62 = uStack_48e8;
        uVar61 = uStack_48f0;
        uVar60 = uStack_48f8;
        uVar59 = local_4900;
        uVar58 = uStack_4948;
        uVar57 = uStack_4950;
        uVar56 = uStack_4958;
        uVar55 = local_4960;
        uVar54 = uStack_49a8;
        uVar53 = uStack_49b0;
        uVar52 = uStack_49b8;
        uVar51 = local_49c0;
        uVar50 = uStack_4a08;
        uVar49 = uStack_4a10;
        uVar48 = uStack_4a18;
        uVar47 = local_4a20;
        uVar46 = uStack_4a68;
        uVar45 = uStack_4a70;
        uVar44 = uStack_4a78;
        uVar43 = local_4a80;
        uVar42 = uStack_4ac8;
        uVar41 = uStack_4ad0;
        uVar40 = uStack_4ad8;
        uVar39 = local_4ae0;
        local_47e0._0_4_ = (float)uVar3;
        local_47e0._4_4_ = (float)((ulong)uVar3 >> 0x20);
        uStack_47d8._0_4_ = (float)uVar4;
        uStack_47d8._4_4_ = (float)((ulong)uVar4 >> 0x20);
        uStack_47d0._0_4_ = (float)uVar5;
        uStack_47d0._4_4_ = (float)((ulong)uVar5 >> 0x20);
        uStack_47c8._0_4_ = (float)uVar6;
        uStack_47c8._4_4_ = (float)((ulong)uVar6 >> 0x20);
        local_43c0._0_4_ = (float)local_7da0;
        local_43c0._4_4_ = (float)((ulong)local_7da0 >> 0x20);
        uStack_43b8._0_4_ = (float)uStack_7d98;
        uStack_43b8._4_4_ = (float)((ulong)uStack_7d98 >> 0x20);
        uStack_43b0._0_4_ = (float)uStack_7d90;
        uStack_43b0._4_4_ = (float)((ulong)uStack_7d90 >> 0x20);
        uStack_43a8._0_4_ = (float)uStack_7d88;
        uStack_43a8._4_4_ = (float)((ulong)uStack_7d88 >> 0x20);
        local_4840._0_4_ = (float)uVar7;
        local_4840._4_4_ = (float)((ulong)uVar7 >> 0x20);
        uStack_4838._0_4_ = (float)uVar8;
        uStack_4838._4_4_ = (float)((ulong)uVar8 >> 0x20);
        uStack_4830._0_4_ = (float)uVar9;
        uStack_4830._4_4_ = (float)((ulong)uVar9 >> 0x20);
        uStack_4828._0_4_ = (float)uVar10;
        uStack_4828._4_4_ = (float)((ulong)uVar10 >> 0x20);
        local_48a0._0_4_ = (float)uVar11;
        local_48a0._4_4_ = (float)((ulong)uVar11 >> 0x20);
        uStack_4898._0_4_ = (float)uVar12;
        uStack_4898._4_4_ = (float)((ulong)uVar12 >> 0x20);
        uStack_4890._0_4_ = (float)uVar13;
        uStack_4890._4_4_ = (float)((ulong)uVar13 >> 0x20);
        uStack_4888._0_4_ = (float)uVar14;
        uStack_4888._4_4_ = (float)((ulong)uVar14 >> 0x20);
        local_4900._0_4_ = (float)uVar15;
        local_4900._4_4_ = (float)((ulong)uVar15 >> 0x20);
        uStack_48f8._0_4_ = (float)uVar16;
        uStack_48f8._4_4_ = (float)((ulong)uVar16 >> 0x20);
        uStack_48f0._0_4_ = (float)uVar17;
        uStack_48f0._4_4_ = (float)((ulong)uVar17 >> 0x20);
        uStack_48e8._0_4_ = (float)uVar18;
        uStack_48e8._4_4_ = (float)((ulong)uVar18 >> 0x20);
        local_4960._0_4_ = (float)uVar19;
        local_4960._4_4_ = (float)((ulong)uVar19 >> 0x20);
        uStack_4958._0_4_ = (float)uVar20;
        uStack_4958._4_4_ = (float)((ulong)uVar20 >> 0x20);
        uStack_4950._0_4_ = (float)uVar21;
        uStack_4950._4_4_ = (float)((ulong)uVar21 >> 0x20);
        uStack_4948._0_4_ = (float)uVar22;
        uStack_4948._4_4_ = (float)((ulong)uVar22 >> 0x20);
        local_49c0._0_4_ = (float)uVar23;
        local_49c0._4_4_ = (float)((ulong)uVar23 >> 0x20);
        uStack_49b8._0_4_ = (float)uVar24;
        uStack_49b8._4_4_ = (float)((ulong)uVar24 >> 0x20);
        uStack_49b0._0_4_ = (float)uVar25;
        uStack_49b0._4_4_ = (float)((ulong)uVar25 >> 0x20);
        uStack_49a8._0_4_ = (float)uVar26;
        uStack_49a8._4_4_ = (float)((ulong)uVar26 >> 0x20);
        local_4a20._0_4_ = (float)uVar27;
        local_4a20._4_4_ = (float)((ulong)uVar27 >> 0x20);
        uStack_4a18._0_4_ = (float)uVar28;
        uStack_4a18._4_4_ = (float)((ulong)uVar28 >> 0x20);
        uStack_4a10._0_4_ = (float)uVar29;
        uStack_4a10._4_4_ = (float)((ulong)uVar29 >> 0x20);
        uStack_4a08._0_4_ = (float)uVar30;
        uStack_4a08._4_4_ = (float)((ulong)uVar30 >> 0x20);
        local_4a80._0_4_ = (float)uVar31;
        local_4a80._4_4_ = (float)((ulong)uVar31 >> 0x20);
        uStack_4a78._0_4_ = (float)uVar32;
        uStack_4a78._4_4_ = (float)((ulong)uVar32 >> 0x20);
        uStack_4a70._0_4_ = (float)uVar33;
        uStack_4a70._4_4_ = (float)((ulong)uVar33 >> 0x20);
        uStack_4a68._0_4_ = (float)uVar34;
        uStack_4a68._4_4_ = (float)((ulong)uVar34 >> 0x20);
        local_4ae0._0_4_ = (float)uVar35;
        local_4ae0._4_4_ = (float)((ulong)uVar35 >> 0x20);
        uStack_4ad8._0_4_ = (float)uVar36;
        uStack_4ad8._4_4_ = (float)((ulong)uVar36 >> 0x20);
        uStack_4ad0._0_4_ = (float)uVar37;
        uStack_4ad0._4_4_ = (float)((ulong)uVar37 >> 0x20);
        uStack_4ac8._0_4_ = (float)uVar38;
        uStack_4ac8._4_4_ = (float)((ulong)uVar38 >> 0x20);
        if (local_7d0c <= local_7f48 + 7) break;
        local_7ab8 = local_7e10;
        local_4800 = *(undefined8 *)local_7e10;
        uStack_47f8 = *(undefined8 *)(local_7e10 + 2);
        uStack_47f0 = *(undefined8 *)(local_7e10 + 4);
        uStack_47e8 = *(undefined8 *)(local_7e10 + 6);
        local_7ac0 = local_7e10 + 8;
        local_4b60 = *(undefined8 *)local_7ac0;
        uStack_4b58 = *(undefined8 *)(local_7e10 + 10);
        uStack_4b50 = *(undefined8 *)(local_7e10 + 0xc);
        uStack_4b48 = *(undefined8 *)(local_7e10 + 0xe);
        local_7ac8 = local_7e10 + 0x10;
        local_4ec0 = *(undefined8 *)local_7ac8;
        uStack_4eb8 = *(undefined8 *)(local_7e10 + 0x12);
        uStack_4eb0 = *(undefined8 *)(local_7e10 + 0x14);
        uStack_4ea8 = *(undefined8 *)(local_7e10 + 0x16);
        local_7ad0 = local_7e18;
        local_4920 = *(undefined8 *)local_7e18;
        uStack_4918 = *(undefined8 *)(local_7e18 + 2);
        uStack_4910 = *(undefined8 *)(local_7e18 + 4);
        uStack_4908 = *(undefined8 *)(local_7e18 + 6);
        local_7ad8 = local_7e18 + 8;
        local_4c80 = *(undefined8 *)local_7ad8;
        uStack_4c78 = *(undefined8 *)(local_7e18 + 10);
        uStack_4c70 = *(undefined8 *)(local_7e18 + 0xc);
        uStack_4c68 = *(undefined8 *)(local_7e18 + 0xe);
        local_7ae0 = local_7e18 + 0x10;
        local_4fe0 = *(undefined8 *)local_7ae0;
        uStack_4fd8 = *(undefined8 *)(local_7e18 + 0x12);
        uStack_4fd0 = *(undefined8 *)(local_7e18 + 0x14);
        uStack_4fc8 = *(undefined8 *)(local_7e18 + 0x16);
        local_7ae8 = local_7e20;
        local_4a40 = *(undefined8 *)local_7e20;
        uStack_4a38 = *(undefined8 *)(local_7e20 + 2);
        uStack_4a30 = *(undefined8 *)(local_7e20 + 4);
        uStack_4a28 = *(undefined8 *)(local_7e20 + 6);
        local_7af0 = local_7e20 + 8;
        local_4da0 = *(undefined8 *)local_7af0;
        uStack_4d98 = *(undefined8 *)(local_7e20 + 10);
        uStack_4d90 = *(undefined8 *)(local_7e20 + 0xc);
        uStack_4d88 = *(undefined8 *)(local_7e20 + 0xe);
        local_7af8 = local_7e20 + 0x10;
        local_5100 = *(undefined8 *)local_7af8;
        uStack_50f8 = *(undefined8 *)(local_7e20 + 0x12);
        uStack_50f0 = *(undefined8 *)(local_7e20 + 0x14);
        uStack_50e8 = *(undefined8 *)(local_7e20 + 0x16);
        local_4820 = local_7da0;
        uStack_4818 = uStack_7d98;
        uStack_4810 = uStack_7d90;
        uStack_4808 = uStack_7d88;
        local_21e0 = (float)local_47e0;
        fStack_21dc = local_47e0._4_4_;
        fStack_21d8 = (float)uStack_47d8;
        fStack_21d4 = uStack_47d8._4_4_;
        fStack_21d0 = (float)uStack_47d0;
        fStack_21cc = uStack_47d0._4_4_;
        fStack_21c8 = (float)uStack_47c8;
        fStack_4384 = uStack_47c8._4_4_;
        local_2200._0_4_ = (float)local_4800;
        local_2200._4_4_ = (float)((ulong)local_4800 >> 0x20);
        uStack_21f8._0_4_ = (float)uStack_47f8;
        uStack_21f8._4_4_ = (float)((ulong)uStack_47f8 >> 0x20);
        uStack_21f0._0_4_ = (float)uStack_47f0;
        uStack_21f0._4_4_ = (float)((ulong)uStack_47f0 >> 0x20);
        uStack_21e8._0_4_ = (float)uStack_47e8;
        local_43a0 = (float)local_47e0 * (float)local_2200;
        fStack_439c = local_47e0._4_4_ * local_2200._4_4_;
        fStack_4398 = (float)uStack_47d8 * (float)uStack_21f8;
        fStack_4394 = uStack_47d8._4_4_ * uStack_21f8._4_4_;
        fStack_4390 = (float)uStack_47d0 * (float)uStack_21f0;
        fStack_438c = uStack_47d0._4_4_ * uStack_21f0._4_4_;
        fStack_4388 = (float)uStack_47c8 * (float)uStack_21e8;
        local_4880 = CONCAT44(fStack_439c + local_43c0._4_4_,local_43a0 + (float)local_43c0);
        uStack_4878 = CONCAT44(fStack_4394 + uStack_43b8._4_4_,fStack_4398 + (float)uStack_43b8);
        uStack_4870 = CONCAT44(fStack_438c + uStack_43b0._4_4_,fStack_4390 + (float)uStack_43b0);
        uStack_4868 = CONCAT44(uStack_47c8._4_4_ + uStack_43a8._4_4_,
                               fStack_4388 + (float)uStack_43a8);
        local_21a0 = (float)local_4840;
        fStack_219c = local_4840._4_4_;
        fStack_2198 = (float)uStack_4838;
        fStack_2194 = uStack_4838._4_4_;
        fStack_2190 = (float)uStack_4830;
        fStack_218c = uStack_4830._4_4_;
        fStack_2188 = (float)uStack_4828;
        fStack_4344 = uStack_4828._4_4_;
        local_21c0._0_4_ = (float)local_4b60;
        local_21c0._4_4_ = (float)((ulong)local_4b60 >> 0x20);
        uStack_21b8._0_4_ = (float)uStack_4b58;
        uStack_21b8._4_4_ = (float)((ulong)uStack_4b58 >> 0x20);
        uStack_21b0._0_4_ = (float)uStack_4b50;
        uStack_21b0._4_4_ = (float)((ulong)uStack_4b50 >> 0x20);
        uStack_21a8._0_4_ = (float)uStack_4b48;
        local_4360 = (float)local_4840 * (float)local_21c0;
        fStack_435c = local_4840._4_4_ * local_21c0._4_4_;
        fStack_4358 = (float)uStack_4838 * (float)uStack_21b8;
        fStack_4354 = uStack_4838._4_4_ * uStack_21b8._4_4_;
        fStack_4350 = (float)uStack_4830 * (float)uStack_21b0;
        fStack_434c = uStack_4830._4_4_ * uStack_21b0._4_4_;
        fStack_4348 = (float)uStack_4828 * (float)uStack_21a8;
        fVar79 = local_4360 + local_43a0 + (float)local_43c0;
        fVar81 = fStack_435c + fStack_439c + local_43c0._4_4_;
        fVar82 = fStack_4358 + fStack_4398 + (float)uStack_43b8;
        fVar83 = fStack_4354 + fStack_4394 + uStack_43b8._4_4_;
        fVar84 = fStack_4350 + fStack_4390 + (float)uStack_43b0;
        fVar85 = fStack_434c + fStack_438c + uStack_43b0._4_4_;
        fVar86 = fStack_4348 + fStack_4388 + (float)uStack_43a8;
        fVar87 = uStack_4828._4_4_ + uStack_47c8._4_4_ + uStack_43a8._4_4_;
        local_48e0 = CONCAT44(fVar81,fVar79);
        uStack_48d8 = CONCAT44(fVar83,fVar82);
        uStack_48d0 = CONCAT44(fVar85,fVar84);
        uStack_48c8 = CONCAT44(fVar87,fVar86);
        local_2160 = (float)local_48a0;
        fStack_215c = local_48a0._4_4_;
        fStack_2158 = (float)uStack_4898;
        fStack_2154 = uStack_4898._4_4_;
        fStack_2150 = (float)uStack_4890;
        fStack_214c = uStack_4890._4_4_;
        fStack_2148 = (float)uStack_4888;
        fStack_4304 = uStack_4888._4_4_;
        local_2180._0_4_ = (float)local_4ec0;
        local_2180._4_4_ = (float)((ulong)local_4ec0 >> 0x20);
        uStack_2178._0_4_ = (float)uStack_4eb8;
        uStack_2178._4_4_ = (float)((ulong)uStack_4eb8 >> 0x20);
        uStack_2170._0_4_ = (float)uStack_4eb0;
        uStack_2170._4_4_ = (float)((ulong)uStack_4eb0 >> 0x20);
        uStack_2168._0_4_ = (float)uStack_4ea8;
        local_4320 = (float)local_48a0 * (float)local_2180;
        fStack_431c = local_48a0._4_4_ * local_2180._4_4_;
        fStack_4318 = (float)uStack_4898 * (float)uStack_2178;
        fStack_4314 = uStack_4898._4_4_ * uStack_2178._4_4_;
        fStack_4310 = (float)uStack_4890 * (float)uStack_2170;
        fStack_430c = uStack_4890._4_4_ * uStack_2170._4_4_;
        fStack_4308 = (float)uStack_4888 * (float)uStack_2168;
        fVar79 = local_4320 + fVar79;
        fVar81 = fStack_431c + fVar81;
        fVar82 = fStack_4318 + fVar82;
        fVar83 = fStack_4314 + fVar83;
        fVar84 = fStack_4310 + fVar84;
        fVar85 = fStack_430c + fVar85;
        fVar86 = fStack_4308 + fVar86;
        fVar87 = uStack_4888._4_4_ + fVar87;
        local_4940 = CONCAT44(fVar81,fVar79);
        uStack_4938 = CONCAT44(fVar83,fVar82);
        uStack_4930 = CONCAT44(fVar85,fVar84);
        uStack_4928 = CONCAT44(fVar87,fVar86);
        local_2120 = (float)local_4900;
        fStack_211c = local_4900._4_4_;
        fStack_2118 = (float)uStack_48f8;
        fStack_2114 = uStack_48f8._4_4_;
        fStack_2110 = (float)uStack_48f0;
        fStack_210c = uStack_48f0._4_4_;
        fStack_2108 = (float)uStack_48e8;
        fStack_42c4 = uStack_48e8._4_4_;
        local_2140._0_4_ = (float)local_4920;
        local_2140._4_4_ = (float)((ulong)local_4920 >> 0x20);
        uStack_2138._0_4_ = (float)uStack_4918;
        uStack_2138._4_4_ = (float)((ulong)uStack_4918 >> 0x20);
        uStack_2130._0_4_ = (float)uStack_4910;
        uStack_2130._4_4_ = (float)((ulong)uStack_4910 >> 0x20);
        uStack_2128._0_4_ = (float)uStack_4908;
        local_42e0 = (float)local_4900 * (float)local_2140;
        fStack_42dc = local_4900._4_4_ * local_2140._4_4_;
        fStack_42d8 = (float)uStack_48f8 * (float)uStack_2138;
        fStack_42d4 = uStack_48f8._4_4_ * uStack_2138._4_4_;
        fStack_42d0 = (float)uStack_48f0 * (float)uStack_2130;
        fStack_42cc = uStack_48f0._4_4_ * uStack_2130._4_4_;
        fStack_42c8 = (float)uStack_48e8 * (float)uStack_2128;
        fVar79 = local_42e0 + fVar79;
        fVar81 = fStack_42dc + fVar81;
        fVar82 = fStack_42d8 + fVar82;
        fVar83 = fStack_42d4 + fVar83;
        fVar84 = fStack_42d0 + fVar84;
        fVar85 = fStack_42cc + fVar85;
        fVar86 = fStack_42c8 + fVar86;
        fVar87 = uStack_48e8._4_4_ + fVar87;
        local_49a0 = CONCAT44(fVar81,fVar79);
        uStack_4998 = CONCAT44(fVar83,fVar82);
        uStack_4990 = CONCAT44(fVar85,fVar84);
        uStack_4988 = CONCAT44(fVar87,fVar86);
        local_20e0 = (float)local_4960;
        fStack_20dc = local_4960._4_4_;
        fStack_20d8 = (float)uStack_4958;
        fStack_20d4 = uStack_4958._4_4_;
        fStack_20d0 = (float)uStack_4950;
        fStack_20cc = uStack_4950._4_4_;
        fStack_20c8 = (float)uStack_4948;
        fStack_4284 = uStack_4948._4_4_;
        local_2100._0_4_ = (float)local_4c80;
        local_2100._4_4_ = (float)((ulong)local_4c80 >> 0x20);
        uStack_20f8._0_4_ = (float)uStack_4c78;
        uStack_20f8._4_4_ = (float)((ulong)uStack_4c78 >> 0x20);
        uStack_20f0._0_4_ = (float)uStack_4c70;
        uStack_20f0._4_4_ = (float)((ulong)uStack_4c70 >> 0x20);
        uStack_20e8._0_4_ = (float)uStack_4c68;
        local_42a0 = (float)local_4960 * (float)local_2100;
        fStack_429c = local_4960._4_4_ * local_2100._4_4_;
        fStack_4298 = (float)uStack_4958 * (float)uStack_20f8;
        fStack_4294 = uStack_4958._4_4_ * uStack_20f8._4_4_;
        fStack_4290 = (float)uStack_4950 * (float)uStack_20f0;
        fStack_428c = uStack_4950._4_4_ * uStack_20f0._4_4_;
        fStack_4288 = (float)uStack_4948 * (float)uStack_20e8;
        fVar79 = local_42a0 + fVar79;
        fVar81 = fStack_429c + fVar81;
        fVar82 = fStack_4298 + fVar82;
        fVar83 = fStack_4294 + fVar83;
        fVar84 = fStack_4290 + fVar84;
        fVar85 = fStack_428c + fVar85;
        fVar86 = fStack_4288 + fVar86;
        fVar87 = uStack_4948._4_4_ + fVar87;
        local_4a00 = CONCAT44(fVar81,fVar79);
        uStack_49f8 = CONCAT44(fVar83,fVar82);
        uStack_49f0 = CONCAT44(fVar85,fVar84);
        uStack_49e8 = CONCAT44(fVar87,fVar86);
        local_20a0 = (float)local_49c0;
        fStack_209c = local_49c0._4_4_;
        fStack_2098 = (float)uStack_49b8;
        fStack_2094 = uStack_49b8._4_4_;
        fStack_2090 = (float)uStack_49b0;
        fStack_208c = uStack_49b0._4_4_;
        fStack_2088 = (float)uStack_49a8;
        fStack_4244 = uStack_49a8._4_4_;
        local_20c0._0_4_ = (float)local_4fe0;
        local_20c0._4_4_ = (float)((ulong)local_4fe0 >> 0x20);
        uStack_20b8._0_4_ = (float)uStack_4fd8;
        uStack_20b8._4_4_ = (float)((ulong)uStack_4fd8 >> 0x20);
        uStack_20b0._0_4_ = (float)uStack_4fd0;
        uStack_20b0._4_4_ = (float)((ulong)uStack_4fd0 >> 0x20);
        uStack_20a8._0_4_ = (float)uStack_4fc8;
        local_4260 = (float)local_49c0 * (float)local_20c0;
        fStack_425c = local_49c0._4_4_ * local_20c0._4_4_;
        fStack_4258 = (float)uStack_49b8 * (float)uStack_20b8;
        fStack_4254 = uStack_49b8._4_4_ * uStack_20b8._4_4_;
        fStack_4250 = (float)uStack_49b0 * (float)uStack_20b0;
        fStack_424c = uStack_49b0._4_4_ * uStack_20b0._4_4_;
        fStack_4248 = (float)uStack_49a8 * (float)uStack_20a8;
        fVar79 = local_4260 + fVar79;
        fVar81 = fStack_425c + fVar81;
        fVar82 = fStack_4258 + fVar82;
        fVar83 = fStack_4254 + fVar83;
        fVar84 = fStack_4250 + fVar84;
        fVar85 = fStack_424c + fVar85;
        fVar86 = fStack_4248 + fVar86;
        fVar87 = uStack_49a8._4_4_ + fVar87;
        local_4a60 = CONCAT44(fVar81,fVar79);
        uStack_4a58 = CONCAT44(fVar83,fVar82);
        uStack_4a50 = CONCAT44(fVar85,fVar84);
        uStack_4a48 = CONCAT44(fVar87,fVar86);
        local_2060 = (float)local_4a20;
        fStack_205c = local_4a20._4_4_;
        fStack_2058 = (float)uStack_4a18;
        fStack_2054 = uStack_4a18._4_4_;
        fStack_2050 = (float)uStack_4a10;
        fStack_204c = uStack_4a10._4_4_;
        fStack_2048 = (float)uStack_4a08;
        fStack_4204 = uStack_4a08._4_4_;
        local_2080._0_4_ = (float)local_4a40;
        local_2080._4_4_ = (float)((ulong)local_4a40 >> 0x20);
        uStack_2078._0_4_ = (float)uStack_4a38;
        uStack_2078._4_4_ = (float)((ulong)uStack_4a38 >> 0x20);
        uStack_2070._0_4_ = (float)uStack_4a30;
        uStack_2070._4_4_ = (float)((ulong)uStack_4a30 >> 0x20);
        uStack_2068._0_4_ = (float)uStack_4a28;
        local_4220 = (float)local_4a20 * (float)local_2080;
        fStack_421c = local_4a20._4_4_ * local_2080._4_4_;
        fStack_4218 = (float)uStack_4a18 * (float)uStack_2078;
        fStack_4214 = uStack_4a18._4_4_ * uStack_2078._4_4_;
        fStack_4210 = (float)uStack_4a10 * (float)uStack_2070;
        fStack_420c = uStack_4a10._4_4_ * uStack_2070._4_4_;
        fStack_4208 = (float)uStack_4a08 * (float)uStack_2068;
        fVar79 = local_4220 + fVar79;
        fVar81 = fStack_421c + fVar81;
        fVar82 = fStack_4218 + fVar82;
        fVar83 = fStack_4214 + fVar83;
        fVar84 = fStack_4210 + fVar84;
        fVar85 = fStack_420c + fVar85;
        fVar86 = fStack_4208 + fVar86;
        fVar87 = uStack_4a08._4_4_ + fVar87;
        local_4ac0 = CONCAT44(fVar81,fVar79);
        uStack_4ab8 = CONCAT44(fVar83,fVar82);
        uStack_4ab0 = CONCAT44(fVar85,fVar84);
        uStack_4aa8 = CONCAT44(fVar87,fVar86);
        local_2020 = (float)local_4a80;
        fStack_201c = local_4a80._4_4_;
        fStack_2018 = (float)uStack_4a78;
        fStack_2014 = uStack_4a78._4_4_;
        fStack_2010 = (float)uStack_4a70;
        fStack_200c = uStack_4a70._4_4_;
        fStack_2008 = (float)uStack_4a68;
        fStack_41c4 = uStack_4a68._4_4_;
        local_2040._0_4_ = (float)local_4da0;
        local_2040._4_4_ = (float)((ulong)local_4da0 >> 0x20);
        uStack_2038._0_4_ = (float)uStack_4d98;
        uStack_2038._4_4_ = (float)((ulong)uStack_4d98 >> 0x20);
        uStack_2030._0_4_ = (float)uStack_4d90;
        uStack_2030._4_4_ = (float)((ulong)uStack_4d90 >> 0x20);
        uStack_2028._0_4_ = (float)uStack_4d88;
        local_41e0 = (float)local_4a80 * (float)local_2040;
        fStack_41dc = local_4a80._4_4_ * local_2040._4_4_;
        fStack_41d8 = (float)uStack_4a78 * (float)uStack_2038;
        fStack_41d4 = uStack_4a78._4_4_ * uStack_2038._4_4_;
        fStack_41d0 = (float)uStack_4a70 * (float)uStack_2030;
        fStack_41cc = uStack_4a70._4_4_ * uStack_2030._4_4_;
        fStack_41c8 = (float)uStack_4a68 * (float)uStack_2028;
        fVar79 = local_41e0 + fVar79;
        fVar81 = fStack_41dc + fVar81;
        fVar82 = fStack_41d8 + fVar82;
        fVar83 = fStack_41d4 + fVar83;
        fVar84 = fStack_41d0 + fVar84;
        fVar85 = fStack_41cc + fVar85;
        fVar86 = fStack_41c8 + fVar86;
        fVar87 = uStack_4a68._4_4_ + fVar87;
        local_4b20 = CONCAT44(fVar81,fVar79);
        uStack_4b18 = CONCAT44(fVar83,fVar82);
        uStack_4b10 = CONCAT44(fVar85,fVar84);
        uStack_4b08 = CONCAT44(fVar87,fVar86);
        local_1fe0 = (float)local_4ae0;
        fStack_1fdc = local_4ae0._4_4_;
        fStack_1fd8 = (float)uStack_4ad8;
        fStack_1fd4 = uStack_4ad8._4_4_;
        fStack_1fd0 = (float)uStack_4ad0;
        fStack_1fcc = uStack_4ad0._4_4_;
        fStack_1fc8 = (float)uStack_4ac8;
        fStack_4184 = uStack_4ac8._4_4_;
        local_2000._0_4_ = (float)local_5100;
        local_2000._4_4_ = (float)((ulong)local_5100 >> 0x20);
        uStack_1ff8._0_4_ = (float)uStack_50f8;
        uStack_1ff8._4_4_ = (float)((ulong)uStack_50f8 >> 0x20);
        uStack_1ff0._0_4_ = (float)uStack_50f0;
        uStack_1ff0._4_4_ = (float)((ulong)uStack_50f0 >> 0x20);
        uStack_1fe8._0_4_ = (float)uStack_50e8;
        local_41a0 = (float)local_4ae0 * (float)local_2000;
        fStack_419c = local_4ae0._4_4_ * local_2000._4_4_;
        fStack_4198 = (float)uStack_4ad8 * (float)uStack_1ff8;
        fStack_4194 = uStack_4ad8._4_4_ * uStack_1ff8._4_4_;
        fStack_4190 = (float)uStack_4ad0 * (float)uStack_1ff0;
        fStack_418c = uStack_4ad0._4_4_ * uStack_1ff0._4_4_;
        fStack_4188 = (float)uStack_4ac8 * (float)uStack_1fe8;
        local_4440 = CONCAT44(fStack_419c + fVar81,local_41a0 + fVar79);
        uStack_4438 = CONCAT44(fStack_4194 + fVar83,fStack_4198 + fVar82);
        uStack_4430 = CONCAT44(fStack_418c + fVar85,fStack_4190 + fVar84);
        uStack_4428 = CONCAT44(uStack_4ac8._4_4_ + fVar87,fStack_4188 + fVar86);
        local_7b00 = local_7e10 + 0x18;
        local_5220 = *(undefined8 *)local_7b00;
        uStack_5218 = *(undefined8 *)(local_7e10 + 0x1a);
        uStack_5210 = *(undefined8 *)(local_7e10 + 0x1c);
        uStack_5208 = *(undefined8 *)(local_7e10 + 0x1e);
        local_7b08 = local_7e18 + 0x18;
        local_5340 = *(undefined8 *)local_7b08;
        uStack_5338 = *(undefined8 *)(local_7e18 + 0x1a);
        uStack_5330 = *(undefined8 *)(local_7e18 + 0x1c);
        uStack_5328 = *(undefined8 *)(local_7e18 + 0x1e);
        local_7b10 = local_7e20 + 0x18;
        local_5460 = *(undefined8 *)local_7b10;
        uStack_5458 = *(undefined8 *)(local_7e20 + 0x1a);
        uStack_5450 = *(undefined8 *)(local_7e20 + 0x1c);
        uStack_5448 = *(undefined8 *)(local_7e20 + 0x1e);
        local_4408 = local_7dc0;
        *(undefined8 *)local_7dc0 = local_4440;
        *(undefined8 *)(local_7dc0 + 2) = uStack_4438;
        *(undefined8 *)(local_7dc0 + 4) = uStack_4430;
        *(undefined8 *)(local_7dc0 + 6) = uStack_4428;
        local_4b80 = local_7da0;
        uStack_4b78 = uStack_7d98;
        uStack_4b70 = uStack_7d90;
        uStack_4b68 = uStack_7d88;
        local_1fa0 = (float)local_47e0;
        fStack_1f9c = local_47e0._4_4_;
        fStack_1f98 = (float)uStack_47d8;
        fStack_1f94 = uStack_47d8._4_4_;
        fStack_1f90 = (float)uStack_47d0;
        fStack_1f8c = uStack_47d0._4_4_;
        fStack_1f88 = (float)uStack_47c8;
        fStack_4144 = uStack_47c8._4_4_;
        local_4160 = (float)local_47e0 * (float)local_21c0;
        fStack_415c = local_47e0._4_4_ * local_21c0._4_4_;
        fStack_4158 = (float)uStack_47d8 * (float)uStack_21b8;
        fStack_4154 = uStack_47d8._4_4_ * uStack_21b8._4_4_;
        fStack_4150 = (float)uStack_47d0 * (float)uStack_21b0;
        fStack_414c = uStack_47d0._4_4_ * uStack_21b0._4_4_;
        fStack_4148 = (float)uStack_47c8 * (float)uStack_21a8;
        local_4180 = local_7da0;
        uStack_4178 = uStack_7d98;
        uStack_4170 = uStack_7d90;
        uStack_4168 = uStack_7d88;
        local_4be0 = CONCAT44(fStack_415c + local_43c0._4_4_,local_4160 + (float)local_43c0);
        uStack_4bd8 = CONCAT44(fStack_4154 + uStack_43b8._4_4_,fStack_4158 + (float)uStack_43b8);
        uStack_4bd0 = CONCAT44(fStack_414c + uStack_43b0._4_4_,fStack_4150 + (float)uStack_43b0);
        uStack_4bc8 = CONCAT44(uStack_47c8._4_4_ + uStack_43a8._4_4_,
                               fStack_4148 + (float)uStack_43a8);
        local_1f60 = (float)local_4840;
        fStack_1f5c = local_4840._4_4_;
        fStack_1f58 = (float)uStack_4838;
        fStack_1f54 = uStack_4838._4_4_;
        fStack_1f50 = (float)uStack_4830;
        fStack_1f4c = uStack_4830._4_4_;
        fStack_1f48 = (float)uStack_4828;
        fStack_4104 = uStack_4828._4_4_;
        local_4120 = (float)local_4840 * (float)local_2180;
        fStack_411c = local_4840._4_4_ * local_2180._4_4_;
        fStack_4118 = (float)uStack_4838 * (float)uStack_2178;
        fStack_4114 = uStack_4838._4_4_ * uStack_2178._4_4_;
        fStack_4110 = (float)uStack_4830 * (float)uStack_2170;
        fStack_410c = uStack_4830._4_4_ * uStack_2170._4_4_;
        fStack_4108 = (float)uStack_4828 * (float)uStack_2168;
        fVar79 = local_4120 + local_4160 + (float)local_43c0;
        fVar81 = fStack_411c + fStack_415c + local_43c0._4_4_;
        fVar82 = fStack_4118 + fStack_4158 + (float)uStack_43b8;
        fVar83 = fStack_4114 + fStack_4154 + uStack_43b8._4_4_;
        fVar84 = fStack_4110 + fStack_4150 + (float)uStack_43b0;
        fVar85 = fStack_410c + fStack_414c + uStack_43b0._4_4_;
        fVar86 = fStack_4108 + fStack_4148 + (float)uStack_43a8;
        fVar87 = uStack_4828._4_4_ + uStack_47c8._4_4_ + uStack_43a8._4_4_;
        local_4c40 = CONCAT44(fVar81,fVar79);
        uStack_4c38 = CONCAT44(fVar83,fVar82);
        uStack_4c30 = CONCAT44(fVar85,fVar84);
        uStack_4c28 = CONCAT44(fVar87,fVar86);
        local_1f20 = (float)local_48a0;
        fStack_1f1c = local_48a0._4_4_;
        fStack_1f18 = (float)uStack_4898;
        fStack_1f14 = uStack_4898._4_4_;
        fStack_1f10 = (float)uStack_4890;
        fStack_1f0c = uStack_4890._4_4_;
        fStack_1f08 = (float)uStack_4888;
        fStack_40c4 = uStack_4888._4_4_;
        local_1f40._0_4_ = (float)local_5220;
        local_1f40._4_4_ = (float)((ulong)local_5220 >> 0x20);
        uStack_1f38._0_4_ = (float)uStack_5218;
        uStack_1f38._4_4_ = (float)((ulong)uStack_5218 >> 0x20);
        uStack_1f30._0_4_ = (float)uStack_5210;
        uStack_1f30._4_4_ = (float)((ulong)uStack_5210 >> 0x20);
        uStack_1f28._0_4_ = (float)uStack_5208;
        local_40e0 = (float)local_48a0 * (float)local_1f40;
        fStack_40dc = local_48a0._4_4_ * local_1f40._4_4_;
        fStack_40d8 = (float)uStack_4898 * (float)uStack_1f38;
        fStack_40d4 = uStack_4898._4_4_ * uStack_1f38._4_4_;
        fStack_40d0 = (float)uStack_4890 * (float)uStack_1f30;
        fStack_40cc = uStack_4890._4_4_ * uStack_1f30._4_4_;
        fStack_40c8 = (float)uStack_4888 * (float)uStack_1f28;
        fVar79 = local_40e0 + fVar79;
        fVar81 = fStack_40dc + fVar81;
        fVar82 = fStack_40d8 + fVar82;
        fVar83 = fStack_40d4 + fVar83;
        fVar84 = fStack_40d0 + fVar84;
        fVar85 = fStack_40cc + fVar85;
        fVar86 = fStack_40c8 + fVar86;
        fVar87 = uStack_4888._4_4_ + fVar87;
        local_4ca0 = CONCAT44(fVar81,fVar79);
        uStack_4c98 = CONCAT44(fVar83,fVar82);
        uStack_4c90 = CONCAT44(fVar85,fVar84);
        uStack_4c88 = CONCAT44(fVar87,fVar86);
        local_1ee0 = (float)local_4900;
        fStack_1edc = local_4900._4_4_;
        fStack_1ed8 = (float)uStack_48f8;
        fStack_1ed4 = uStack_48f8._4_4_;
        fStack_1ed0 = (float)uStack_48f0;
        fStack_1ecc = uStack_48f0._4_4_;
        fStack_1ec8 = (float)uStack_48e8;
        fStack_4084 = uStack_48e8._4_4_;
        local_40a0 = (float)local_4900 * (float)local_2100;
        fStack_409c = local_4900._4_4_ * local_2100._4_4_;
        fStack_4098 = (float)uStack_48f8 * (float)uStack_20f8;
        fStack_4094 = uStack_48f8._4_4_ * uStack_20f8._4_4_;
        fStack_4090 = (float)uStack_48f0 * (float)uStack_20f0;
        fStack_408c = uStack_48f0._4_4_ * uStack_20f0._4_4_;
        fStack_4088 = (float)uStack_48e8 * (float)uStack_20e8;
        fVar79 = local_40a0 + fVar79;
        fVar81 = fStack_409c + fVar81;
        fVar82 = fStack_4098 + fVar82;
        fVar83 = fStack_4094 + fVar83;
        fVar84 = fStack_4090 + fVar84;
        fVar85 = fStack_408c + fVar85;
        fVar86 = fStack_4088 + fVar86;
        fVar87 = uStack_48e8._4_4_ + fVar87;
        local_4d00 = CONCAT44(fVar81,fVar79);
        uStack_4cf8 = CONCAT44(fVar83,fVar82);
        uStack_4cf0 = CONCAT44(fVar85,fVar84);
        uStack_4ce8 = CONCAT44(fVar87,fVar86);
        local_1ea0 = (float)local_4960;
        fStack_1e9c = local_4960._4_4_;
        fStack_1e98 = (float)uStack_4958;
        fStack_1e94 = uStack_4958._4_4_;
        fStack_1e90 = (float)uStack_4950;
        fStack_1e8c = uStack_4950._4_4_;
        fStack_1e88 = (float)uStack_4948;
        fStack_4044 = uStack_4948._4_4_;
        local_4060 = (float)local_4960 * (float)local_20c0;
        fStack_405c = local_4960._4_4_ * local_20c0._4_4_;
        fStack_4058 = (float)uStack_4958 * (float)uStack_20b8;
        fStack_4054 = uStack_4958._4_4_ * uStack_20b8._4_4_;
        fStack_4050 = (float)uStack_4950 * (float)uStack_20b0;
        fStack_404c = uStack_4950._4_4_ * uStack_20b0._4_4_;
        fStack_4048 = (float)uStack_4948 * (float)uStack_20a8;
        fVar79 = local_4060 + fVar79;
        fVar81 = fStack_405c + fVar81;
        fVar82 = fStack_4058 + fVar82;
        fVar83 = fStack_4054 + fVar83;
        fVar84 = fStack_4050 + fVar84;
        fVar85 = fStack_404c + fVar85;
        fVar86 = fStack_4048 + fVar86;
        fVar87 = uStack_4948._4_4_ + fVar87;
        local_4d60 = CONCAT44(fVar81,fVar79);
        uStack_4d58 = CONCAT44(fVar83,fVar82);
        uStack_4d50 = CONCAT44(fVar85,fVar84);
        uStack_4d48 = CONCAT44(fVar87,fVar86);
        local_1e60 = (float)local_49c0;
        fStack_1e5c = local_49c0._4_4_;
        fStack_1e58 = (float)uStack_49b8;
        fStack_1e54 = uStack_49b8._4_4_;
        fStack_1e50 = (float)uStack_49b0;
        fStack_1e4c = uStack_49b0._4_4_;
        fStack_1e48 = (float)uStack_49a8;
        fStack_4004 = uStack_49a8._4_4_;
        local_1e80._0_4_ = (float)local_5340;
        local_1e80._4_4_ = (float)((ulong)local_5340 >> 0x20);
        uStack_1e78._0_4_ = (float)uStack_5338;
        uStack_1e78._4_4_ = (float)((ulong)uStack_5338 >> 0x20);
        uStack_1e70._0_4_ = (float)uStack_5330;
        uStack_1e70._4_4_ = (float)((ulong)uStack_5330 >> 0x20);
        uStack_1e68._0_4_ = (float)uStack_5328;
        local_4020 = (float)local_49c0 * (float)local_1e80;
        fStack_401c = local_49c0._4_4_ * local_1e80._4_4_;
        fStack_4018 = (float)uStack_49b8 * (float)uStack_1e78;
        fStack_4014 = uStack_49b8._4_4_ * uStack_1e78._4_4_;
        fStack_4010 = (float)uStack_49b0 * (float)uStack_1e70;
        fStack_400c = uStack_49b0._4_4_ * uStack_1e70._4_4_;
        fStack_4008 = (float)uStack_49a8 * (float)uStack_1e68;
        fVar79 = local_4020 + fVar79;
        fVar81 = fStack_401c + fVar81;
        fVar82 = fStack_4018 + fVar82;
        fVar83 = fStack_4014 + fVar83;
        fVar84 = fStack_4010 + fVar84;
        fVar85 = fStack_400c + fVar85;
        fVar86 = fStack_4008 + fVar86;
        fVar87 = uStack_49a8._4_4_ + fVar87;
        local_4dc0 = CONCAT44(fVar81,fVar79);
        uStack_4db8 = CONCAT44(fVar83,fVar82);
        uStack_4db0 = CONCAT44(fVar85,fVar84);
        uStack_4da8 = CONCAT44(fVar87,fVar86);
        local_1e20 = (float)local_4a20;
        fStack_1e1c = local_4a20._4_4_;
        fStack_1e18 = (float)uStack_4a18;
        fStack_1e14 = uStack_4a18._4_4_;
        fStack_1e10 = (float)uStack_4a10;
        fStack_1e0c = uStack_4a10._4_4_;
        fStack_1e08 = (float)uStack_4a08;
        fStack_3fc4 = uStack_4a08._4_4_;
        local_3fe0 = (float)local_4a20 * (float)local_2040;
        fStack_3fdc = local_4a20._4_4_ * local_2040._4_4_;
        fStack_3fd8 = (float)uStack_4a18 * (float)uStack_2038;
        fStack_3fd4 = uStack_4a18._4_4_ * uStack_2038._4_4_;
        fStack_3fd0 = (float)uStack_4a10 * (float)uStack_2030;
        fStack_3fcc = uStack_4a10._4_4_ * uStack_2030._4_4_;
        fStack_3fc8 = (float)uStack_4a08 * (float)uStack_2028;
        fVar79 = local_3fe0 + fVar79;
        fVar81 = fStack_3fdc + fVar81;
        fVar82 = fStack_3fd8 + fVar82;
        fVar83 = fStack_3fd4 + fVar83;
        fVar84 = fStack_3fd0 + fVar84;
        fVar85 = fStack_3fcc + fVar85;
        fVar86 = fStack_3fc8 + fVar86;
        fVar87 = uStack_4a08._4_4_ + fVar87;
        local_4e20 = CONCAT44(fVar81,fVar79);
        uStack_4e18 = CONCAT44(fVar83,fVar82);
        uStack_4e10 = CONCAT44(fVar85,fVar84);
        uStack_4e08 = CONCAT44(fVar87,fVar86);
        local_1de0 = (float)local_4a80;
        fStack_1ddc = local_4a80._4_4_;
        fStack_1dd8 = (float)uStack_4a78;
        fStack_1dd4 = uStack_4a78._4_4_;
        fStack_1dd0 = (float)uStack_4a70;
        fStack_1dcc = uStack_4a70._4_4_;
        fStack_1dc8 = (float)uStack_4a68;
        fStack_3f84 = uStack_4a68._4_4_;
        local_3fa0 = (float)local_4a80 * (float)local_2000;
        fStack_3f9c = local_4a80._4_4_ * local_2000._4_4_;
        fStack_3f98 = (float)uStack_4a78 * (float)uStack_1ff8;
        fStack_3f94 = uStack_4a78._4_4_ * uStack_1ff8._4_4_;
        fStack_3f90 = (float)uStack_4a70 * (float)uStack_1ff0;
        fStack_3f8c = uStack_4a70._4_4_ * uStack_1ff0._4_4_;
        fStack_3f88 = (float)uStack_4a68 * (float)uStack_1fe8;
        fVar79 = local_3fa0 + fVar79;
        fVar81 = fStack_3f9c + fVar81;
        fVar82 = fStack_3f98 + fVar82;
        fVar83 = fStack_3f94 + fVar83;
        fVar84 = fStack_3f90 + fVar84;
        fVar85 = fStack_3f8c + fVar85;
        fVar86 = fStack_3f88 + fVar86;
        fVar87 = uStack_4a68._4_4_ + fVar87;
        local_4e80 = CONCAT44(fVar81,fVar79);
        uStack_4e78 = CONCAT44(fVar83,fVar82);
        uStack_4e70 = CONCAT44(fVar85,fVar84);
        uStack_4e68 = CONCAT44(fVar87,fVar86);
        local_1da0 = (float)local_4ae0;
        fStack_1d9c = local_4ae0._4_4_;
        fStack_1d98 = (float)uStack_4ad8;
        fStack_1d94 = uStack_4ad8._4_4_;
        fStack_1d90 = (float)uStack_4ad0;
        fStack_1d8c = uStack_4ad0._4_4_;
        fStack_1d88 = (float)uStack_4ac8;
        fStack_3f44 = uStack_4ac8._4_4_;
        local_1dc0._0_4_ = (float)local_5460;
        local_1dc0._4_4_ = (float)((ulong)local_5460 >> 0x20);
        uStack_1db8._0_4_ = (float)uStack_5458;
        uStack_1db8._4_4_ = (float)((ulong)uStack_5458 >> 0x20);
        uStack_1db0._0_4_ = (float)uStack_5450;
        uStack_1db0._4_4_ = (float)((ulong)uStack_5450 >> 0x20);
        uStack_1da8._0_4_ = (float)uStack_5448;
        local_3f60 = (float)local_4ae0 * (float)local_1dc0;
        fStack_3f5c = local_4ae0._4_4_ * local_1dc0._4_4_;
        fStack_3f58 = (float)uStack_4ad8 * (float)uStack_1db8;
        fStack_3f54 = uStack_4ad8._4_4_ * uStack_1db8._4_4_;
        fStack_3f50 = (float)uStack_4ad0 * (float)uStack_1db0;
        fStack_3f4c = uStack_4ad0._4_4_ * uStack_1db0._4_4_;
        fStack_3f48 = (float)uStack_4ac8 * (float)uStack_1da8;
        local_4480 = CONCAT44(fStack_3f5c + fVar81,local_3f60 + fVar79);
        uStack_4478 = CONCAT44(fStack_3f54 + fVar83,fStack_3f58 + fVar82);
        uStack_4470 = CONCAT44(fStack_3f4c + fVar85,fStack_3f50 + fVar84);
        uStack_4468 = CONCAT44(uStack_4ac8._4_4_ + fVar87,fStack_3f48 + fVar86);
        local_7b18 = local_7e10 + 0x20;
        local_5580 = *(undefined8 *)local_7b18;
        uStack_5578 = *(undefined8 *)(local_7e10 + 0x22);
        uStack_5570 = *(undefined8 *)(local_7e10 + 0x24);
        uStack_5568 = *(undefined8 *)(local_7e10 + 0x26);
        local_7b20 = local_7e18 + 0x20;
        local_56a0 = *(undefined8 *)local_7b20;
        uStack_5698 = *(undefined8 *)(local_7e18 + 0x22);
        uStack_5690 = *(undefined8 *)(local_7e18 + 0x24);
        uStack_5688 = *(undefined8 *)(local_7e18 + 0x26);
        local_7b28 = local_7e20 + 0x20;
        local_57c0 = *(undefined8 *)local_7b28;
        uStack_57b8 = *(undefined8 *)(local_7e20 + 0x22);
        uStack_57b0 = *(undefined8 *)(local_7e20 + 0x24);
        uStack_57a8 = *(undefined8 *)(local_7e20 + 0x26);
        local_4448 = local_7dc0 + 8;
        *(undefined8 *)local_4448 = local_4480;
        *(undefined8 *)(local_7dc0 + 10) = uStack_4478;
        *(undefined8 *)(local_7dc0 + 0xc) = uStack_4470;
        *(undefined8 *)(local_7dc0 + 0xe) = uStack_4468;
        local_4ee0 = local_7da0;
        uStack_4ed8 = uStack_7d98;
        uStack_4ed0 = uStack_7d90;
        uStack_4ec8 = uStack_7d88;
        local_1d60 = (float)local_47e0;
        fStack_1d5c = local_47e0._4_4_;
        fStack_1d58 = (float)uStack_47d8;
        fStack_1d54 = uStack_47d8._4_4_;
        fStack_1d50 = (float)uStack_47d0;
        fStack_1d4c = uStack_47d0._4_4_;
        fStack_1d48 = (float)uStack_47c8;
        fStack_3f04 = uStack_47c8._4_4_;
        local_3f20 = (float)local_47e0 * (float)local_2180;
        fStack_3f1c = local_47e0._4_4_ * local_2180._4_4_;
        fStack_3f18 = (float)uStack_47d8 * (float)uStack_2178;
        fStack_3f14 = uStack_47d8._4_4_ * uStack_2178._4_4_;
        fStack_3f10 = (float)uStack_47d0 * (float)uStack_2170;
        fStack_3f0c = uStack_47d0._4_4_ * uStack_2170._4_4_;
        fStack_3f08 = (float)uStack_47c8 * (float)uStack_2168;
        local_3f40 = local_7da0;
        uStack_3f38 = uStack_7d98;
        uStack_3f30 = uStack_7d90;
        uStack_3f28 = uStack_7d88;
        local_4f40 = CONCAT44(fStack_3f1c + local_43c0._4_4_,local_3f20 + (float)local_43c0);
        uStack_4f38 = CONCAT44(fStack_3f14 + uStack_43b8._4_4_,fStack_3f18 + (float)uStack_43b8);
        uStack_4f30 = CONCAT44(fStack_3f0c + uStack_43b0._4_4_,fStack_3f10 + (float)uStack_43b0);
        uStack_4f28 = CONCAT44(uStack_47c8._4_4_ + uStack_43a8._4_4_,
                               fStack_3f08 + (float)uStack_43a8);
        local_1d20 = (float)local_4840;
        fStack_1d1c = local_4840._4_4_;
        fStack_1d18 = (float)uStack_4838;
        fStack_1d14 = uStack_4838._4_4_;
        fStack_1d10 = (float)uStack_4830;
        fStack_1d0c = uStack_4830._4_4_;
        fStack_1d08 = (float)uStack_4828;
        fStack_3ec4 = uStack_4828._4_4_;
        local_3ee0 = (float)local_4840 * (float)local_1f40;
        fStack_3edc = local_4840._4_4_ * local_1f40._4_4_;
        fStack_3ed8 = (float)uStack_4838 * (float)uStack_1f38;
        fStack_3ed4 = uStack_4838._4_4_ * uStack_1f38._4_4_;
        fStack_3ed0 = (float)uStack_4830 * (float)uStack_1f30;
        fStack_3ecc = uStack_4830._4_4_ * uStack_1f30._4_4_;
        fStack_3ec8 = (float)uStack_4828 * (float)uStack_1f28;
        fVar79 = local_3ee0 + local_3f20 + (float)local_43c0;
        fVar81 = fStack_3edc + fStack_3f1c + local_43c0._4_4_;
        fVar82 = fStack_3ed8 + fStack_3f18 + (float)uStack_43b8;
        fVar83 = fStack_3ed4 + fStack_3f14 + uStack_43b8._4_4_;
        fVar84 = fStack_3ed0 + fStack_3f10 + (float)uStack_43b0;
        fVar85 = fStack_3ecc + fStack_3f0c + uStack_43b0._4_4_;
        fVar86 = fStack_3ec8 + fStack_3f08 + (float)uStack_43a8;
        fVar87 = uStack_4828._4_4_ + uStack_47c8._4_4_ + uStack_43a8._4_4_;
        local_4fa0 = CONCAT44(fVar81,fVar79);
        uStack_4f98 = CONCAT44(fVar83,fVar82);
        uStack_4f90 = CONCAT44(fVar85,fVar84);
        uStack_4f88 = CONCAT44(fVar87,fVar86);
        local_1ce0 = (float)local_48a0;
        fStack_1cdc = local_48a0._4_4_;
        fStack_1cd8 = (float)uStack_4898;
        fStack_1cd4 = uStack_4898._4_4_;
        fStack_1cd0 = (float)uStack_4890;
        fStack_1ccc = uStack_4890._4_4_;
        fStack_1cc8 = (float)uStack_4888;
        fStack_3e84 = uStack_4888._4_4_;
        local_1d00._0_4_ = (float)local_5580;
        local_1d00._4_4_ = (float)((ulong)local_5580 >> 0x20);
        uStack_1cf8._0_4_ = (float)uStack_5578;
        uStack_1cf8._4_4_ = (float)((ulong)uStack_5578 >> 0x20);
        uStack_1cf0._0_4_ = (float)uStack_5570;
        uStack_1cf0._4_4_ = (float)((ulong)uStack_5570 >> 0x20);
        uStack_1ce8._0_4_ = (float)uStack_5568;
        local_3ea0 = (float)local_48a0 * (float)local_1d00;
        fStack_3e9c = local_48a0._4_4_ * local_1d00._4_4_;
        fStack_3e98 = (float)uStack_4898 * (float)uStack_1cf8;
        fStack_3e94 = uStack_4898._4_4_ * uStack_1cf8._4_4_;
        fStack_3e90 = (float)uStack_4890 * (float)uStack_1cf0;
        fStack_3e8c = uStack_4890._4_4_ * uStack_1cf0._4_4_;
        fStack_3e88 = (float)uStack_4888 * (float)uStack_1ce8;
        fVar79 = local_3ea0 + fVar79;
        fVar81 = fStack_3e9c + fVar81;
        fVar82 = fStack_3e98 + fVar82;
        fVar83 = fStack_3e94 + fVar83;
        fVar84 = fStack_3e90 + fVar84;
        fVar85 = fStack_3e8c + fVar85;
        fVar86 = fStack_3e88 + fVar86;
        fVar87 = uStack_4888._4_4_ + fVar87;
        local_5000 = CONCAT44(fVar81,fVar79);
        uStack_4ff8 = CONCAT44(fVar83,fVar82);
        uStack_4ff0 = CONCAT44(fVar85,fVar84);
        uStack_4fe8 = CONCAT44(fVar87,fVar86);
        local_1ca0 = (float)local_4900;
        fStack_1c9c = local_4900._4_4_;
        fStack_1c98 = (float)uStack_48f8;
        fStack_1c94 = uStack_48f8._4_4_;
        fStack_1c90 = (float)uStack_48f0;
        fStack_1c8c = uStack_48f0._4_4_;
        fStack_1c88 = (float)uStack_48e8;
        fStack_3e44 = uStack_48e8._4_4_;
        local_3e60 = (float)local_4900 * (float)local_20c0;
        fStack_3e5c = local_4900._4_4_ * local_20c0._4_4_;
        fStack_3e58 = (float)uStack_48f8 * (float)uStack_20b8;
        fStack_3e54 = uStack_48f8._4_4_ * uStack_20b8._4_4_;
        fStack_3e50 = (float)uStack_48f0 * (float)uStack_20b0;
        fStack_3e4c = uStack_48f0._4_4_ * uStack_20b0._4_4_;
        fStack_3e48 = (float)uStack_48e8 * (float)uStack_20a8;
        fVar79 = local_3e60 + fVar79;
        fVar81 = fStack_3e5c + fVar81;
        fVar82 = fStack_3e58 + fVar82;
        fVar83 = fStack_3e54 + fVar83;
        fVar84 = fStack_3e50 + fVar84;
        fVar85 = fStack_3e4c + fVar85;
        fVar86 = fStack_3e48 + fVar86;
        fVar87 = uStack_48e8._4_4_ + fVar87;
        local_5060 = CONCAT44(fVar81,fVar79);
        uStack_5058 = CONCAT44(fVar83,fVar82);
        uStack_5050 = CONCAT44(fVar85,fVar84);
        uStack_5048 = CONCAT44(fVar87,fVar86);
        local_1c60 = (float)local_4960;
        fStack_1c5c = local_4960._4_4_;
        fStack_1c58 = (float)uStack_4958;
        fStack_1c54 = uStack_4958._4_4_;
        fStack_1c50 = (float)uStack_4950;
        fStack_1c4c = uStack_4950._4_4_;
        fStack_1c48 = (float)uStack_4948;
        fStack_3e04 = uStack_4948._4_4_;
        local_3e20 = (float)local_4960 * (float)local_1e80;
        fStack_3e1c = local_4960._4_4_ * local_1e80._4_4_;
        fStack_3e18 = (float)uStack_4958 * (float)uStack_1e78;
        fStack_3e14 = uStack_4958._4_4_ * uStack_1e78._4_4_;
        fStack_3e10 = (float)uStack_4950 * (float)uStack_1e70;
        fStack_3e0c = uStack_4950._4_4_ * uStack_1e70._4_4_;
        fStack_3e08 = (float)uStack_4948 * (float)uStack_1e68;
        fVar79 = local_3e20 + fVar79;
        fVar81 = fStack_3e1c + fVar81;
        fVar82 = fStack_3e18 + fVar82;
        fVar83 = fStack_3e14 + fVar83;
        fVar84 = fStack_3e10 + fVar84;
        fVar85 = fStack_3e0c + fVar85;
        fVar86 = fStack_3e08 + fVar86;
        fVar87 = uStack_4948._4_4_ + fVar87;
        local_50c0 = CONCAT44(fVar81,fVar79);
        uStack_50b8 = CONCAT44(fVar83,fVar82);
        uStack_50b0 = CONCAT44(fVar85,fVar84);
        uStack_50a8 = CONCAT44(fVar87,fVar86);
        local_1c20 = (float)local_49c0;
        fStack_1c1c = local_49c0._4_4_;
        fStack_1c18 = (float)uStack_49b8;
        fStack_1c14 = uStack_49b8._4_4_;
        fStack_1c10 = (float)uStack_49b0;
        fStack_1c0c = uStack_49b0._4_4_;
        fStack_1c08 = (float)uStack_49a8;
        fStack_3dc4 = uStack_49a8._4_4_;
        local_1c40._0_4_ = (float)local_56a0;
        local_1c40._4_4_ = (float)((ulong)local_56a0 >> 0x20);
        uStack_1c38._0_4_ = (float)uStack_5698;
        uStack_1c38._4_4_ = (float)((ulong)uStack_5698 >> 0x20);
        uStack_1c30._0_4_ = (float)uStack_5690;
        uStack_1c30._4_4_ = (float)((ulong)uStack_5690 >> 0x20);
        uStack_1c28._0_4_ = (float)uStack_5688;
        local_3de0 = (float)local_49c0 * (float)local_1c40;
        fStack_3ddc = local_49c0._4_4_ * local_1c40._4_4_;
        fStack_3dd8 = (float)uStack_49b8 * (float)uStack_1c38;
        fStack_3dd4 = uStack_49b8._4_4_ * uStack_1c38._4_4_;
        fStack_3dd0 = (float)uStack_49b0 * (float)uStack_1c30;
        fStack_3dcc = uStack_49b0._4_4_ * uStack_1c30._4_4_;
        fStack_3dc8 = (float)uStack_49a8 * (float)uStack_1c28;
        fVar79 = local_3de0 + fVar79;
        fVar81 = fStack_3ddc + fVar81;
        fVar82 = fStack_3dd8 + fVar82;
        fVar83 = fStack_3dd4 + fVar83;
        fVar84 = fStack_3dd0 + fVar84;
        fVar85 = fStack_3dcc + fVar85;
        fVar86 = fStack_3dc8 + fVar86;
        fVar87 = uStack_49a8._4_4_ + fVar87;
        local_5120 = CONCAT44(fVar81,fVar79);
        uStack_5118 = CONCAT44(fVar83,fVar82);
        uStack_5110 = CONCAT44(fVar85,fVar84);
        uStack_5108 = CONCAT44(fVar87,fVar86);
        local_1be0 = (float)local_4a20;
        fStack_1bdc = local_4a20._4_4_;
        fStack_1bd8 = (float)uStack_4a18;
        fStack_1bd4 = uStack_4a18._4_4_;
        fStack_1bd0 = (float)uStack_4a10;
        fStack_1bcc = uStack_4a10._4_4_;
        fStack_1bc8 = (float)uStack_4a08;
        fStack_3d84 = uStack_4a08._4_4_;
        local_3da0 = (float)local_4a20 * (float)local_2000;
        fStack_3d9c = local_4a20._4_4_ * local_2000._4_4_;
        fStack_3d98 = (float)uStack_4a18 * (float)uStack_1ff8;
        fStack_3d94 = uStack_4a18._4_4_ * uStack_1ff8._4_4_;
        fStack_3d90 = (float)uStack_4a10 * (float)uStack_1ff0;
        fStack_3d8c = uStack_4a10._4_4_ * uStack_1ff0._4_4_;
        fStack_3d88 = (float)uStack_4a08 * (float)uStack_1fe8;
        fVar79 = local_3da0 + fVar79;
        fVar81 = fStack_3d9c + fVar81;
        fVar82 = fStack_3d98 + fVar82;
        fVar83 = fStack_3d94 + fVar83;
        fVar84 = fStack_3d90 + fVar84;
        fVar85 = fStack_3d8c + fVar85;
        fVar86 = fStack_3d88 + fVar86;
        fVar87 = uStack_4a08._4_4_ + fVar87;
        local_5180 = CONCAT44(fVar81,fVar79);
        uStack_5178 = CONCAT44(fVar83,fVar82);
        uStack_5170 = CONCAT44(fVar85,fVar84);
        uStack_5168 = CONCAT44(fVar87,fVar86);
        local_1ba0 = (float)local_4a80;
        fStack_1b9c = local_4a80._4_4_;
        fStack_1b98 = (float)uStack_4a78;
        fStack_1b94 = uStack_4a78._4_4_;
        fStack_1b90 = (float)uStack_4a70;
        fStack_1b8c = uStack_4a70._4_4_;
        fStack_1b88 = (float)uStack_4a68;
        fStack_3d44 = uStack_4a68._4_4_;
        local_3d60 = (float)local_4a80 * (float)local_1dc0;
        fStack_3d5c = local_4a80._4_4_ * local_1dc0._4_4_;
        fStack_3d58 = (float)uStack_4a78 * (float)uStack_1db8;
        fStack_3d54 = uStack_4a78._4_4_ * uStack_1db8._4_4_;
        fStack_3d50 = (float)uStack_4a70 * (float)uStack_1db0;
        fStack_3d4c = uStack_4a70._4_4_ * uStack_1db0._4_4_;
        fStack_3d48 = (float)uStack_4a68 * (float)uStack_1da8;
        fVar79 = local_3d60 + fVar79;
        fVar81 = fStack_3d5c + fVar81;
        fVar82 = fStack_3d58 + fVar82;
        fVar83 = fStack_3d54 + fVar83;
        fVar84 = fStack_3d50 + fVar84;
        fVar85 = fStack_3d4c + fVar85;
        fVar86 = fStack_3d48 + fVar86;
        fVar87 = uStack_4a68._4_4_ + fVar87;
        local_51e0 = CONCAT44(fVar81,fVar79);
        uStack_51d8 = CONCAT44(fVar83,fVar82);
        uStack_51d0 = CONCAT44(fVar85,fVar84);
        uStack_51c8 = CONCAT44(fVar87,fVar86);
        local_1b60 = (float)local_4ae0;
        fStack_1b5c = local_4ae0._4_4_;
        fStack_1b58 = (float)uStack_4ad8;
        fStack_1b54 = uStack_4ad8._4_4_;
        fStack_1b50 = (float)uStack_4ad0;
        fStack_1b4c = uStack_4ad0._4_4_;
        fStack_1b48 = (float)uStack_4ac8;
        fStack_3d04 = uStack_4ac8._4_4_;
        local_1b80._0_4_ = (float)local_57c0;
        local_1b80._4_4_ = (float)((ulong)local_57c0 >> 0x20);
        uStack_1b78._0_4_ = (float)uStack_57b8;
        uStack_1b78._4_4_ = (float)((ulong)uStack_57b8 >> 0x20);
        uStack_1b70._0_4_ = (float)uStack_57b0;
        uStack_1b70._4_4_ = (float)((ulong)uStack_57b0 >> 0x20);
        uStack_1b68._0_4_ = (float)uStack_57a8;
        local_3d20 = (float)local_4ae0 * (float)local_1b80;
        fStack_3d1c = local_4ae0._4_4_ * local_1b80._4_4_;
        fStack_3d18 = (float)uStack_4ad8 * (float)uStack_1b78;
        fStack_3d14 = uStack_4ad8._4_4_ * uStack_1b78._4_4_;
        fStack_3d10 = (float)uStack_4ad0 * (float)uStack_1b70;
        fStack_3d0c = uStack_4ad0._4_4_ * uStack_1b70._4_4_;
        fStack_3d08 = (float)uStack_4ac8 * (float)uStack_1b68;
        local_44c0 = CONCAT44(fStack_3d1c + fVar81,local_3d20 + fVar79);
        uStack_44b8 = CONCAT44(fStack_3d14 + fVar83,fStack_3d18 + fVar82);
        uStack_44b0 = CONCAT44(fStack_3d0c + fVar85,fStack_3d10 + fVar84);
        uStack_44a8 = CONCAT44(uStack_4ac8._4_4_ + fVar87,fStack_3d08 + fVar86);
        local_7b30 = local_7e10 + 0x28;
        local_58e0 = *(undefined8 *)local_7b30;
        uStack_58d8 = *(undefined8 *)(local_7e10 + 0x2a);
        uStack_58d0 = *(undefined8 *)(local_7e10 + 0x2c);
        uStack_58c8 = *(undefined8 *)(local_7e10 + 0x2e);
        local_7b38 = local_7e18 + 0x28;
        local_5a00 = *(undefined8 *)local_7b38;
        uStack_59f8 = *(undefined8 *)(local_7e18 + 0x2a);
        uStack_59f0 = *(undefined8 *)(local_7e18 + 0x2c);
        uStack_59e8 = *(undefined8 *)(local_7e18 + 0x2e);
        local_7b40 = local_7e20 + 0x28;
        local_5b20 = *(undefined8 *)local_7b40;
        uStack_5b18 = *(undefined8 *)(local_7e20 + 0x2a);
        uStack_5b10 = *(undefined8 *)(local_7e20 + 0x2c);
        uStack_5b08 = *(undefined8 *)(local_7e20 + 0x2e);
        local_4488 = local_7dc0 + 0x10;
        *(undefined8 *)local_4488 = local_44c0;
        *(undefined8 *)(local_7dc0 + 0x12) = uStack_44b8;
        *(undefined8 *)(local_7dc0 + 0x14) = uStack_44b0;
        *(undefined8 *)(local_7dc0 + 0x16) = uStack_44a8;
        local_5240 = local_7da0;
        uStack_5238 = uStack_7d98;
        uStack_5230 = uStack_7d90;
        uStack_5228 = uStack_7d88;
        local_1b20 = (float)local_47e0;
        fStack_1b1c = local_47e0._4_4_;
        fStack_1b18 = (float)uStack_47d8;
        fStack_1b14 = uStack_47d8._4_4_;
        fStack_1b10 = (float)uStack_47d0;
        fStack_1b0c = uStack_47d0._4_4_;
        fStack_1b08 = (float)uStack_47c8;
        fStack_3cc4 = uStack_47c8._4_4_;
        local_3ce0 = (float)local_47e0 * (float)local_1f40;
        fStack_3cdc = local_47e0._4_4_ * local_1f40._4_4_;
        fStack_3cd8 = (float)uStack_47d8 * (float)uStack_1f38;
        fStack_3cd4 = uStack_47d8._4_4_ * uStack_1f38._4_4_;
        fStack_3cd0 = (float)uStack_47d0 * (float)uStack_1f30;
        fStack_3ccc = uStack_47d0._4_4_ * uStack_1f30._4_4_;
        fStack_3cc8 = (float)uStack_47c8 * (float)uStack_1f28;
        local_3d00 = local_7da0;
        uStack_3cf8 = uStack_7d98;
        uStack_3cf0 = uStack_7d90;
        uStack_3ce8 = uStack_7d88;
        local_52a0 = CONCAT44(fStack_3cdc + local_43c0._4_4_,local_3ce0 + (float)local_43c0);
        uStack_5298 = CONCAT44(fStack_3cd4 + uStack_43b8._4_4_,fStack_3cd8 + (float)uStack_43b8);
        uStack_5290 = CONCAT44(fStack_3ccc + uStack_43b0._4_4_,fStack_3cd0 + (float)uStack_43b0);
        uStack_5288 = CONCAT44(uStack_47c8._4_4_ + uStack_43a8._4_4_,
                               fStack_3cc8 + (float)uStack_43a8);
        local_1ae0 = (float)local_4840;
        fStack_1adc = local_4840._4_4_;
        fStack_1ad8 = (float)uStack_4838;
        fStack_1ad4 = uStack_4838._4_4_;
        fStack_1ad0 = (float)uStack_4830;
        fStack_1acc = uStack_4830._4_4_;
        fStack_1ac8 = (float)uStack_4828;
        fStack_3c84 = uStack_4828._4_4_;
        local_3ca0 = (float)local_4840 * (float)local_1d00;
        fStack_3c9c = local_4840._4_4_ * local_1d00._4_4_;
        fStack_3c98 = (float)uStack_4838 * (float)uStack_1cf8;
        fStack_3c94 = uStack_4838._4_4_ * uStack_1cf8._4_4_;
        fStack_3c90 = (float)uStack_4830 * (float)uStack_1cf0;
        fStack_3c8c = uStack_4830._4_4_ * uStack_1cf0._4_4_;
        fStack_3c88 = (float)uStack_4828 * (float)uStack_1ce8;
        fVar79 = local_3ca0 + local_3ce0 + (float)local_43c0;
        fVar81 = fStack_3c9c + fStack_3cdc + local_43c0._4_4_;
        fVar82 = fStack_3c98 + fStack_3cd8 + (float)uStack_43b8;
        fVar83 = fStack_3c94 + fStack_3cd4 + uStack_43b8._4_4_;
        fVar84 = fStack_3c90 + fStack_3cd0 + (float)uStack_43b0;
        fVar85 = fStack_3c8c + fStack_3ccc + uStack_43b0._4_4_;
        fVar86 = fStack_3c88 + fStack_3cc8 + (float)uStack_43a8;
        fVar87 = uStack_4828._4_4_ + uStack_47c8._4_4_ + uStack_43a8._4_4_;
        local_5300 = CONCAT44(fVar81,fVar79);
        uStack_52f8 = CONCAT44(fVar83,fVar82);
        uStack_52f0 = CONCAT44(fVar85,fVar84);
        uStack_52e8 = CONCAT44(fVar87,fVar86);
        local_1aa0 = (float)local_48a0;
        fStack_1a9c = local_48a0._4_4_;
        fStack_1a98 = (float)uStack_4898;
        fStack_1a94 = uStack_4898._4_4_;
        fStack_1a90 = (float)uStack_4890;
        fStack_1a8c = uStack_4890._4_4_;
        fStack_1a88 = (float)uStack_4888;
        fStack_3c44 = uStack_4888._4_4_;
        local_1ac0._0_4_ = (float)local_58e0;
        local_1ac0._4_4_ = (float)((ulong)local_58e0 >> 0x20);
        uStack_1ab8._0_4_ = (float)uStack_58d8;
        uStack_1ab8._4_4_ = (float)((ulong)uStack_58d8 >> 0x20);
        uStack_1ab0._0_4_ = (float)uStack_58d0;
        uStack_1ab0._4_4_ = (float)((ulong)uStack_58d0 >> 0x20);
        uStack_1aa8._0_4_ = (float)uStack_58c8;
        local_3c60 = (float)local_48a0 * (float)local_1ac0;
        fStack_3c5c = local_48a0._4_4_ * local_1ac0._4_4_;
        fStack_3c58 = (float)uStack_4898 * (float)uStack_1ab8;
        fStack_3c54 = uStack_4898._4_4_ * uStack_1ab8._4_4_;
        fStack_3c50 = (float)uStack_4890 * (float)uStack_1ab0;
        fStack_3c4c = uStack_4890._4_4_ * uStack_1ab0._4_4_;
        fStack_3c48 = (float)uStack_4888 * (float)uStack_1aa8;
        fVar79 = local_3c60 + fVar79;
        fVar81 = fStack_3c5c + fVar81;
        fVar82 = fStack_3c58 + fVar82;
        fVar83 = fStack_3c54 + fVar83;
        fVar84 = fStack_3c50 + fVar84;
        fVar85 = fStack_3c4c + fVar85;
        fVar86 = fStack_3c48 + fVar86;
        fVar87 = uStack_4888._4_4_ + fVar87;
        local_5360 = CONCAT44(fVar81,fVar79);
        uStack_5358 = CONCAT44(fVar83,fVar82);
        uStack_5350 = CONCAT44(fVar85,fVar84);
        uStack_5348 = CONCAT44(fVar87,fVar86);
        local_1a60 = (float)local_4900;
        fStack_1a5c = local_4900._4_4_;
        fStack_1a58 = (float)uStack_48f8;
        fStack_1a54 = uStack_48f8._4_4_;
        fStack_1a50 = (float)uStack_48f0;
        fStack_1a4c = uStack_48f0._4_4_;
        fStack_1a48 = (float)uStack_48e8;
        fStack_3c04 = uStack_48e8._4_4_;
        local_3c20 = (float)local_4900 * (float)local_1e80;
        fStack_3c1c = local_4900._4_4_ * local_1e80._4_4_;
        fStack_3c18 = (float)uStack_48f8 * (float)uStack_1e78;
        fStack_3c14 = uStack_48f8._4_4_ * uStack_1e78._4_4_;
        fStack_3c10 = (float)uStack_48f0 * (float)uStack_1e70;
        fStack_3c0c = uStack_48f0._4_4_ * uStack_1e70._4_4_;
        fStack_3c08 = (float)uStack_48e8 * (float)uStack_1e68;
        fVar79 = local_3c20 + fVar79;
        fVar81 = fStack_3c1c + fVar81;
        fVar82 = fStack_3c18 + fVar82;
        fVar83 = fStack_3c14 + fVar83;
        fVar84 = fStack_3c10 + fVar84;
        fVar85 = fStack_3c0c + fVar85;
        fVar86 = fStack_3c08 + fVar86;
        fVar87 = uStack_48e8._4_4_ + fVar87;
        local_53c0 = CONCAT44(fVar81,fVar79);
        uStack_53b8 = CONCAT44(fVar83,fVar82);
        uStack_53b0 = CONCAT44(fVar85,fVar84);
        uStack_53a8 = CONCAT44(fVar87,fVar86);
        local_1a20 = (float)local_4960;
        fStack_1a1c = local_4960._4_4_;
        fStack_1a18 = (float)uStack_4958;
        fStack_1a14 = uStack_4958._4_4_;
        fStack_1a10 = (float)uStack_4950;
        fStack_1a0c = uStack_4950._4_4_;
        fStack_1a08 = (float)uStack_4948;
        fStack_3bc4 = uStack_4948._4_4_;
        local_3be0 = (float)local_4960 * (float)local_1c40;
        fStack_3bdc = local_4960._4_4_ * local_1c40._4_4_;
        fStack_3bd8 = (float)uStack_4958 * (float)uStack_1c38;
        fStack_3bd4 = uStack_4958._4_4_ * uStack_1c38._4_4_;
        fStack_3bd0 = (float)uStack_4950 * (float)uStack_1c30;
        fStack_3bcc = uStack_4950._4_4_ * uStack_1c30._4_4_;
        fStack_3bc8 = (float)uStack_4948 * (float)uStack_1c28;
        fVar79 = local_3be0 + fVar79;
        fVar81 = fStack_3bdc + fVar81;
        fVar82 = fStack_3bd8 + fVar82;
        fVar83 = fStack_3bd4 + fVar83;
        fVar84 = fStack_3bd0 + fVar84;
        fVar85 = fStack_3bcc + fVar85;
        fVar86 = fStack_3bc8 + fVar86;
        fVar87 = uStack_4948._4_4_ + fVar87;
        local_5420 = CONCAT44(fVar81,fVar79);
        uStack_5418 = CONCAT44(fVar83,fVar82);
        uStack_5410 = CONCAT44(fVar85,fVar84);
        uStack_5408 = CONCAT44(fVar87,fVar86);
        local_19e0 = (float)local_49c0;
        fStack_19dc = local_49c0._4_4_;
        fStack_19d8 = (float)uStack_49b8;
        fStack_19d4 = uStack_49b8._4_4_;
        fStack_19d0 = (float)uStack_49b0;
        fStack_19cc = uStack_49b0._4_4_;
        fStack_19c8 = (float)uStack_49a8;
        fStack_3b84 = uStack_49a8._4_4_;
        local_1a00._0_4_ = (float)local_5a00;
        local_1a00._4_4_ = (float)((ulong)local_5a00 >> 0x20);
        uStack_19f8._0_4_ = (float)uStack_59f8;
        uStack_19f8._4_4_ = (float)((ulong)uStack_59f8 >> 0x20);
        uStack_19f0._0_4_ = (float)uStack_59f0;
        uStack_19f0._4_4_ = (float)((ulong)uStack_59f0 >> 0x20);
        uStack_19e8._0_4_ = (float)uStack_59e8;
        local_3ba0 = (float)local_49c0 * (float)local_1a00;
        fStack_3b9c = local_49c0._4_4_ * local_1a00._4_4_;
        fStack_3b98 = (float)uStack_49b8 * (float)uStack_19f8;
        fStack_3b94 = uStack_49b8._4_4_ * uStack_19f8._4_4_;
        fStack_3b90 = (float)uStack_49b0 * (float)uStack_19f0;
        fStack_3b8c = uStack_49b0._4_4_ * uStack_19f0._4_4_;
        fStack_3b88 = (float)uStack_49a8 * (float)uStack_19e8;
        fVar79 = local_3ba0 + fVar79;
        fVar81 = fStack_3b9c + fVar81;
        fVar82 = fStack_3b98 + fVar82;
        fVar83 = fStack_3b94 + fVar83;
        fVar84 = fStack_3b90 + fVar84;
        fVar85 = fStack_3b8c + fVar85;
        fVar86 = fStack_3b88 + fVar86;
        fVar87 = uStack_49a8._4_4_ + fVar87;
        local_5480 = CONCAT44(fVar81,fVar79);
        uStack_5478 = CONCAT44(fVar83,fVar82);
        uStack_5470 = CONCAT44(fVar85,fVar84);
        uStack_5468 = CONCAT44(fVar87,fVar86);
        local_19a0 = (float)local_4a20;
        fStack_199c = local_4a20._4_4_;
        fStack_1998 = (float)uStack_4a18;
        fStack_1994 = uStack_4a18._4_4_;
        fStack_1990 = (float)uStack_4a10;
        fStack_198c = uStack_4a10._4_4_;
        fStack_1988 = (float)uStack_4a08;
        fStack_3b44 = uStack_4a08._4_4_;
        local_3b60 = (float)local_4a20 * (float)local_1dc0;
        fStack_3b5c = local_4a20._4_4_ * local_1dc0._4_4_;
        fStack_3b58 = (float)uStack_4a18 * (float)uStack_1db8;
        fStack_3b54 = uStack_4a18._4_4_ * uStack_1db8._4_4_;
        fStack_3b50 = (float)uStack_4a10 * (float)uStack_1db0;
        fStack_3b4c = uStack_4a10._4_4_ * uStack_1db0._4_4_;
        fStack_3b48 = (float)uStack_4a08 * (float)uStack_1da8;
        fVar79 = local_3b60 + fVar79;
        fVar81 = fStack_3b5c + fVar81;
        fVar82 = fStack_3b58 + fVar82;
        fVar83 = fStack_3b54 + fVar83;
        fVar84 = fStack_3b50 + fVar84;
        fVar85 = fStack_3b4c + fVar85;
        fVar86 = fStack_3b48 + fVar86;
        fVar87 = uStack_4a08._4_4_ + fVar87;
        local_54e0 = CONCAT44(fVar81,fVar79);
        uStack_54d8 = CONCAT44(fVar83,fVar82);
        uStack_54d0 = CONCAT44(fVar85,fVar84);
        uStack_54c8 = CONCAT44(fVar87,fVar86);
        local_1960 = (float)local_4a80;
        fStack_195c = local_4a80._4_4_;
        fStack_1958 = (float)uStack_4a78;
        fStack_1954 = uStack_4a78._4_4_;
        fStack_1950 = (float)uStack_4a70;
        fStack_194c = uStack_4a70._4_4_;
        fStack_1948 = (float)uStack_4a68;
        fStack_3b04 = uStack_4a68._4_4_;
        local_3b20 = (float)local_4a80 * (float)local_1b80;
        fStack_3b1c = local_4a80._4_4_ * local_1b80._4_4_;
        fStack_3b18 = (float)uStack_4a78 * (float)uStack_1b78;
        fStack_3b14 = uStack_4a78._4_4_ * uStack_1b78._4_4_;
        fStack_3b10 = (float)uStack_4a70 * (float)uStack_1b70;
        fStack_3b0c = uStack_4a70._4_4_ * uStack_1b70._4_4_;
        fStack_3b08 = (float)uStack_4a68 * (float)uStack_1b68;
        fVar79 = local_3b20 + fVar79;
        fVar81 = fStack_3b1c + fVar81;
        fVar82 = fStack_3b18 + fVar82;
        fVar83 = fStack_3b14 + fVar83;
        fVar84 = fStack_3b10 + fVar84;
        fVar85 = fStack_3b0c + fVar85;
        fVar86 = fStack_3b08 + fVar86;
        fVar87 = uStack_4a68._4_4_ + fVar87;
        local_5540 = CONCAT44(fVar81,fVar79);
        uStack_5538 = CONCAT44(fVar83,fVar82);
        uStack_5530 = CONCAT44(fVar85,fVar84);
        uStack_5528 = CONCAT44(fVar87,fVar86);
        local_1920 = (float)local_4ae0;
        fStack_191c = local_4ae0._4_4_;
        fStack_1918 = (float)uStack_4ad8;
        fStack_1914 = uStack_4ad8._4_4_;
        fStack_1910 = (float)uStack_4ad0;
        fStack_190c = uStack_4ad0._4_4_;
        fStack_1908 = (float)uStack_4ac8;
        fStack_3ac4 = uStack_4ac8._4_4_;
        local_1940._0_4_ = (float)local_5b20;
        local_1940._4_4_ = (float)((ulong)local_5b20 >> 0x20);
        uStack_1938._0_4_ = (float)uStack_5b18;
        uStack_1938._4_4_ = (float)((ulong)uStack_5b18 >> 0x20);
        uStack_1930._0_4_ = (float)uStack_5b10;
        uStack_1930._4_4_ = (float)((ulong)uStack_5b10 >> 0x20);
        uStack_1928._0_4_ = (float)uStack_5b08;
        local_3ae0 = (float)local_4ae0 * (float)local_1940;
        fStack_3adc = local_4ae0._4_4_ * local_1940._4_4_;
        fStack_3ad8 = (float)uStack_4ad8 * (float)uStack_1938;
        fStack_3ad4 = uStack_4ad8._4_4_ * uStack_1938._4_4_;
        fStack_3ad0 = (float)uStack_4ad0 * (float)uStack_1930;
        fStack_3acc = uStack_4ad0._4_4_ * uStack_1930._4_4_;
        fStack_3ac8 = (float)uStack_4ac8 * (float)uStack_1928;
        local_4500 = CONCAT44(fStack_3adc + fVar81,local_3ae0 + fVar79);
        uStack_44f8 = CONCAT44(fStack_3ad4 + fVar83,fStack_3ad8 + fVar82);
        uStack_44f0 = CONCAT44(fStack_3acc + fVar85,fStack_3ad0 + fVar84);
        uStack_44e8 = CONCAT44(uStack_4ac8._4_4_ + fVar87,fStack_3ac8 + fVar86);
        local_7b48 = local_7e10 + 0x30;
        local_5c40 = *(undefined8 *)local_7b48;
        uStack_5c38 = *(undefined8 *)(local_7e10 + 0x32);
        uStack_5c30 = *(undefined8 *)(local_7e10 + 0x34);
        uStack_5c28 = *(undefined8 *)(local_7e10 + 0x36);
        local_7b50 = local_7e18 + 0x30;
        local_5d60 = *(undefined8 *)local_7b50;
        uStack_5d58 = *(undefined8 *)(local_7e18 + 0x32);
        uStack_5d50 = *(undefined8 *)(local_7e18 + 0x34);
        uStack_5d48 = *(undefined8 *)(local_7e18 + 0x36);
        local_7b58 = local_7e20 + 0x30;
        local_5e80 = *(undefined8 *)local_7b58;
        uStack_5e78 = *(undefined8 *)(local_7e20 + 0x32);
        uStack_5e70 = *(undefined8 *)(local_7e20 + 0x34);
        uStack_5e68 = *(undefined8 *)(local_7e20 + 0x36);
        local_44c8 = local_7dc0 + 0x18;
        *(undefined8 *)local_44c8 = local_4500;
        *(undefined8 *)(local_7dc0 + 0x1a) = uStack_44f8;
        *(undefined8 *)(local_7dc0 + 0x1c) = uStack_44f0;
        *(undefined8 *)(local_7dc0 + 0x1e) = uStack_44e8;
        local_55a0 = local_7da0;
        uStack_5598 = uStack_7d98;
        uStack_5590 = uStack_7d90;
        uStack_5588 = uStack_7d88;
        local_18e0 = (float)local_47e0;
        fStack_18dc = local_47e0._4_4_;
        fStack_18d8 = (float)uStack_47d8;
        fStack_18d4 = uStack_47d8._4_4_;
        fStack_18d0 = (float)uStack_47d0;
        fStack_18cc = uStack_47d0._4_4_;
        fStack_18c8 = (float)uStack_47c8;
        fStack_3a84 = uStack_47c8._4_4_;
        local_3aa0 = (float)local_47e0 * (float)local_1d00;
        fStack_3a9c = local_47e0._4_4_ * local_1d00._4_4_;
        fStack_3a98 = (float)uStack_47d8 * (float)uStack_1cf8;
        fStack_3a94 = uStack_47d8._4_4_ * uStack_1cf8._4_4_;
        fStack_3a90 = (float)uStack_47d0 * (float)uStack_1cf0;
        fStack_3a8c = uStack_47d0._4_4_ * uStack_1cf0._4_4_;
        fStack_3a88 = (float)uStack_47c8 * (float)uStack_1ce8;
        local_3ac0 = local_7da0;
        uStack_3ab8 = uStack_7d98;
        uStack_3ab0 = uStack_7d90;
        uStack_3aa8 = uStack_7d88;
        local_5600 = CONCAT44(fStack_3a9c + local_43c0._4_4_,local_3aa0 + (float)local_43c0);
        uStack_55f8 = CONCAT44(fStack_3a94 + uStack_43b8._4_4_,fStack_3a98 + (float)uStack_43b8);
        uStack_55f0 = CONCAT44(fStack_3a8c + uStack_43b0._4_4_,fStack_3a90 + (float)uStack_43b0);
        uStack_55e8 = CONCAT44(uStack_47c8._4_4_ + uStack_43a8._4_4_,
                               fStack_3a88 + (float)uStack_43a8);
        local_18a0 = (float)local_4840;
        fStack_189c = local_4840._4_4_;
        fStack_1898 = (float)uStack_4838;
        fStack_1894 = uStack_4838._4_4_;
        fStack_1890 = (float)uStack_4830;
        fStack_188c = uStack_4830._4_4_;
        fStack_1888 = (float)uStack_4828;
        fStack_3a44 = uStack_4828._4_4_;
        local_3a60 = (float)local_4840 * (float)local_1ac0;
        fStack_3a5c = local_4840._4_4_ * local_1ac0._4_4_;
        fStack_3a58 = (float)uStack_4838 * (float)uStack_1ab8;
        fStack_3a54 = uStack_4838._4_4_ * uStack_1ab8._4_4_;
        fStack_3a50 = (float)uStack_4830 * (float)uStack_1ab0;
        fStack_3a4c = uStack_4830._4_4_ * uStack_1ab0._4_4_;
        fStack_3a48 = (float)uStack_4828 * (float)uStack_1aa8;
        fVar79 = local_3a60 + local_3aa0 + (float)local_43c0;
        fVar81 = fStack_3a5c + fStack_3a9c + local_43c0._4_4_;
        fVar82 = fStack_3a58 + fStack_3a98 + (float)uStack_43b8;
        fVar83 = fStack_3a54 + fStack_3a94 + uStack_43b8._4_4_;
        fVar84 = fStack_3a50 + fStack_3a90 + (float)uStack_43b0;
        fVar85 = fStack_3a4c + fStack_3a8c + uStack_43b0._4_4_;
        fVar86 = fStack_3a48 + fStack_3a88 + (float)uStack_43a8;
        fVar87 = uStack_4828._4_4_ + uStack_47c8._4_4_ + uStack_43a8._4_4_;
        local_5660 = CONCAT44(fVar81,fVar79);
        uStack_5658 = CONCAT44(fVar83,fVar82);
        uStack_5650 = CONCAT44(fVar85,fVar84);
        uStack_5648 = CONCAT44(fVar87,fVar86);
        local_1860 = (float)local_48a0;
        fStack_185c = local_48a0._4_4_;
        fStack_1858 = (float)uStack_4898;
        fStack_1854 = uStack_4898._4_4_;
        fStack_1850 = (float)uStack_4890;
        fStack_184c = uStack_4890._4_4_;
        fStack_1848 = (float)uStack_4888;
        fStack_3a04 = uStack_4888._4_4_;
        local_1880._0_4_ = (float)local_5c40;
        local_1880._4_4_ = (float)((ulong)local_5c40 >> 0x20);
        uStack_1878._0_4_ = (float)uStack_5c38;
        uStack_1878._4_4_ = (float)((ulong)uStack_5c38 >> 0x20);
        uStack_1870._0_4_ = (float)uStack_5c30;
        uStack_1870._4_4_ = (float)((ulong)uStack_5c30 >> 0x20);
        uStack_1868._0_4_ = (float)uStack_5c28;
        local_3a20 = (float)local_48a0 * (float)local_1880;
        fStack_3a1c = local_48a0._4_4_ * local_1880._4_4_;
        fStack_3a18 = (float)uStack_4898 * (float)uStack_1878;
        fStack_3a14 = uStack_4898._4_4_ * uStack_1878._4_4_;
        fStack_3a10 = (float)uStack_4890 * (float)uStack_1870;
        fStack_3a0c = uStack_4890._4_4_ * uStack_1870._4_4_;
        fStack_3a08 = (float)uStack_4888 * (float)uStack_1868;
        fVar79 = local_3a20 + fVar79;
        fVar81 = fStack_3a1c + fVar81;
        fVar82 = fStack_3a18 + fVar82;
        fVar83 = fStack_3a14 + fVar83;
        fVar84 = fStack_3a10 + fVar84;
        fVar85 = fStack_3a0c + fVar85;
        fVar86 = fStack_3a08 + fVar86;
        fVar87 = uStack_4888._4_4_ + fVar87;
        local_56c0 = CONCAT44(fVar81,fVar79);
        uStack_56b8 = CONCAT44(fVar83,fVar82);
        uStack_56b0 = CONCAT44(fVar85,fVar84);
        uStack_56a8 = CONCAT44(fVar87,fVar86);
        local_1820 = (float)local_4900;
        fStack_181c = local_4900._4_4_;
        fStack_1818 = (float)uStack_48f8;
        fStack_1814 = uStack_48f8._4_4_;
        fStack_1810 = (float)uStack_48f0;
        fStack_180c = uStack_48f0._4_4_;
        fStack_1808 = (float)uStack_48e8;
        fStack_39c4 = uStack_48e8._4_4_;
        local_39e0 = (float)local_4900 * (float)local_1c40;
        fStack_39dc = local_4900._4_4_ * local_1c40._4_4_;
        fStack_39d8 = (float)uStack_48f8 * (float)uStack_1c38;
        fStack_39d4 = uStack_48f8._4_4_ * uStack_1c38._4_4_;
        fStack_39d0 = (float)uStack_48f0 * (float)uStack_1c30;
        fStack_39cc = uStack_48f0._4_4_ * uStack_1c30._4_4_;
        fStack_39c8 = (float)uStack_48e8 * (float)uStack_1c28;
        fVar79 = local_39e0 + fVar79;
        fVar81 = fStack_39dc + fVar81;
        fVar82 = fStack_39d8 + fVar82;
        fVar83 = fStack_39d4 + fVar83;
        fVar84 = fStack_39d0 + fVar84;
        fVar85 = fStack_39cc + fVar85;
        fVar86 = fStack_39c8 + fVar86;
        fVar87 = uStack_48e8._4_4_ + fVar87;
        local_5720 = CONCAT44(fVar81,fVar79);
        uStack_5718 = CONCAT44(fVar83,fVar82);
        uStack_5710 = CONCAT44(fVar85,fVar84);
        uStack_5708 = CONCAT44(fVar87,fVar86);
        local_17e0 = (float)local_4960;
        fStack_17dc = local_4960._4_4_;
        fStack_17d8 = (float)uStack_4958;
        fStack_17d4 = uStack_4958._4_4_;
        fStack_17d0 = (float)uStack_4950;
        fStack_17cc = uStack_4950._4_4_;
        fStack_17c8 = (float)uStack_4948;
        fStack_3984 = uStack_4948._4_4_;
        local_39a0 = (float)local_4960 * (float)local_1a00;
        fStack_399c = local_4960._4_4_ * local_1a00._4_4_;
        fStack_3998 = (float)uStack_4958 * (float)uStack_19f8;
        fStack_3994 = uStack_4958._4_4_ * uStack_19f8._4_4_;
        fStack_3990 = (float)uStack_4950 * (float)uStack_19f0;
        fStack_398c = uStack_4950._4_4_ * uStack_19f0._4_4_;
        fStack_3988 = (float)uStack_4948 * (float)uStack_19e8;
        fVar79 = local_39a0 + fVar79;
        fVar81 = fStack_399c + fVar81;
        fVar82 = fStack_3998 + fVar82;
        fVar83 = fStack_3994 + fVar83;
        fVar84 = fStack_3990 + fVar84;
        fVar85 = fStack_398c + fVar85;
        fVar86 = fStack_3988 + fVar86;
        fVar87 = uStack_4948._4_4_ + fVar87;
        local_5780 = CONCAT44(fVar81,fVar79);
        uStack_5778 = CONCAT44(fVar83,fVar82);
        uStack_5770 = CONCAT44(fVar85,fVar84);
        uStack_5768 = CONCAT44(fVar87,fVar86);
        local_17a0 = (float)local_49c0;
        fStack_179c = local_49c0._4_4_;
        fStack_1798 = (float)uStack_49b8;
        fStack_1794 = uStack_49b8._4_4_;
        fStack_1790 = (float)uStack_49b0;
        fStack_178c = uStack_49b0._4_4_;
        fStack_1788 = (float)uStack_49a8;
        fStack_3944 = uStack_49a8._4_4_;
        local_17c0._0_4_ = (float)local_5d60;
        local_17c0._4_4_ = (float)((ulong)local_5d60 >> 0x20);
        uStack_17b8._0_4_ = (float)uStack_5d58;
        uStack_17b8._4_4_ = (float)((ulong)uStack_5d58 >> 0x20);
        uStack_17b0._0_4_ = (float)uStack_5d50;
        uStack_17b0._4_4_ = (float)((ulong)uStack_5d50 >> 0x20);
        uStack_17a8._0_4_ = (float)uStack_5d48;
        local_3960 = (float)local_49c0 * (float)local_17c0;
        fStack_395c = local_49c0._4_4_ * local_17c0._4_4_;
        fStack_3958 = (float)uStack_49b8 * (float)uStack_17b8;
        fStack_3954 = uStack_49b8._4_4_ * uStack_17b8._4_4_;
        fStack_3950 = (float)uStack_49b0 * (float)uStack_17b0;
        fStack_394c = uStack_49b0._4_4_ * uStack_17b0._4_4_;
        fStack_3948 = (float)uStack_49a8 * (float)uStack_17a8;
        fVar79 = local_3960 + fVar79;
        fVar81 = fStack_395c + fVar81;
        fVar82 = fStack_3958 + fVar82;
        fVar83 = fStack_3954 + fVar83;
        fVar84 = fStack_3950 + fVar84;
        fVar85 = fStack_394c + fVar85;
        fVar86 = fStack_3948 + fVar86;
        fVar87 = uStack_49a8._4_4_ + fVar87;
        local_57e0 = CONCAT44(fVar81,fVar79);
        uStack_57d8 = CONCAT44(fVar83,fVar82);
        uStack_57d0 = CONCAT44(fVar85,fVar84);
        uStack_57c8 = CONCAT44(fVar87,fVar86);
        local_1760 = (float)local_4a20;
        fStack_175c = local_4a20._4_4_;
        fStack_1758 = (float)uStack_4a18;
        fStack_1754 = uStack_4a18._4_4_;
        fStack_1750 = (float)uStack_4a10;
        fStack_174c = uStack_4a10._4_4_;
        fStack_1748 = (float)uStack_4a08;
        fStack_3904 = uStack_4a08._4_4_;
        local_3920 = (float)local_4a20 * (float)local_1b80;
        fStack_391c = local_4a20._4_4_ * local_1b80._4_4_;
        fStack_3918 = (float)uStack_4a18 * (float)uStack_1b78;
        fStack_3914 = uStack_4a18._4_4_ * uStack_1b78._4_4_;
        fStack_3910 = (float)uStack_4a10 * (float)uStack_1b70;
        fStack_390c = uStack_4a10._4_4_ * uStack_1b70._4_4_;
        fStack_3908 = (float)uStack_4a08 * (float)uStack_1b68;
        fVar79 = local_3920 + fVar79;
        fVar81 = fStack_391c + fVar81;
        fVar82 = fStack_3918 + fVar82;
        fVar83 = fStack_3914 + fVar83;
        fVar84 = fStack_3910 + fVar84;
        fVar85 = fStack_390c + fVar85;
        fVar86 = fStack_3908 + fVar86;
        fVar87 = uStack_4a08._4_4_ + fVar87;
        local_5840 = CONCAT44(fVar81,fVar79);
        uStack_5838 = CONCAT44(fVar83,fVar82);
        uStack_5830 = CONCAT44(fVar85,fVar84);
        uStack_5828 = CONCAT44(fVar87,fVar86);
        local_1720 = (float)local_4a80;
        fStack_171c = local_4a80._4_4_;
        fStack_1718 = (float)uStack_4a78;
        fStack_1714 = uStack_4a78._4_4_;
        fStack_1710 = (float)uStack_4a70;
        fStack_170c = uStack_4a70._4_4_;
        fStack_1708 = (float)uStack_4a68;
        fStack_38c4 = uStack_4a68._4_4_;
        local_38e0 = (float)local_4a80 * (float)local_1940;
        fStack_38dc = local_4a80._4_4_ * local_1940._4_4_;
        fStack_38d8 = (float)uStack_4a78 * (float)uStack_1938;
        fStack_38d4 = uStack_4a78._4_4_ * uStack_1938._4_4_;
        fStack_38d0 = (float)uStack_4a70 * (float)uStack_1930;
        fStack_38cc = uStack_4a70._4_4_ * uStack_1930._4_4_;
        fStack_38c8 = (float)uStack_4a68 * (float)uStack_1928;
        fVar79 = local_38e0 + fVar79;
        fVar81 = fStack_38dc + fVar81;
        fVar82 = fStack_38d8 + fVar82;
        fVar83 = fStack_38d4 + fVar83;
        fVar84 = fStack_38d0 + fVar84;
        fVar85 = fStack_38cc + fVar85;
        fVar86 = fStack_38c8 + fVar86;
        fVar87 = uStack_4a68._4_4_ + fVar87;
        local_58a0 = CONCAT44(fVar81,fVar79);
        uStack_5898 = CONCAT44(fVar83,fVar82);
        uStack_5890 = CONCAT44(fVar85,fVar84);
        uStack_5888 = CONCAT44(fVar87,fVar86);
        local_16e0 = (float)local_4ae0;
        fStack_16dc = local_4ae0._4_4_;
        fStack_16d8 = (float)uStack_4ad8;
        fStack_16d4 = uStack_4ad8._4_4_;
        fStack_16d0 = (float)uStack_4ad0;
        fStack_16cc = uStack_4ad0._4_4_;
        fStack_16c8 = (float)uStack_4ac8;
        fStack_3884 = uStack_4ac8._4_4_;
        local_1700._0_4_ = (float)local_5e80;
        local_1700._4_4_ = (float)((ulong)local_5e80 >> 0x20);
        uStack_16f8._0_4_ = (float)uStack_5e78;
        uStack_16f8._4_4_ = (float)((ulong)uStack_5e78 >> 0x20);
        uStack_16f0._0_4_ = (float)uStack_5e70;
        uStack_16f0._4_4_ = (float)((ulong)uStack_5e70 >> 0x20);
        uStack_16e8._0_4_ = (float)uStack_5e68;
        local_38a0 = (float)local_4ae0 * (float)local_1700;
        fStack_389c = local_4ae0._4_4_ * local_1700._4_4_;
        fStack_3898 = (float)uStack_4ad8 * (float)uStack_16f8;
        fStack_3894 = uStack_4ad8._4_4_ * uStack_16f8._4_4_;
        fStack_3890 = (float)uStack_4ad0 * (float)uStack_16f0;
        fStack_388c = uStack_4ad0._4_4_ * uStack_16f0._4_4_;
        fStack_3888 = (float)uStack_4ac8 * (float)uStack_16e8;
        local_4540 = CONCAT44(fStack_389c + fVar81,local_38a0 + fVar79);
        uStack_4538 = CONCAT44(fStack_3894 + fVar83,fStack_3898 + fVar82);
        uStack_4530 = CONCAT44(fStack_388c + fVar85,fStack_3890 + fVar84);
        uStack_4528 = CONCAT44(uStack_4ac8._4_4_ + fVar87,fStack_3888 + fVar86);
        local_7b60 = local_7e10 + 0x38;
        local_5fa0 = *(undefined8 *)local_7b60;
        uStack_5f98 = *(undefined8 *)(local_7e10 + 0x3a);
        uStack_5f90 = *(undefined8 *)(local_7e10 + 0x3c);
        uStack_5f88 = *(undefined8 *)(local_7e10 + 0x3e);
        local_7b68 = local_7e18 + 0x38;
        local_60c0 = *(undefined8 *)local_7b68;
        uStack_60b8 = *(undefined8 *)(local_7e18 + 0x3a);
        uStack_60b0 = *(undefined8 *)(local_7e18 + 0x3c);
        uStack_60a8 = *(undefined8 *)(local_7e18 + 0x3e);
        local_7b70 = local_7e20 + 0x38;
        local_61e0 = *(undefined8 *)local_7b70;
        uStack_61d8 = *(undefined8 *)(local_7e20 + 0x3a);
        uStack_61d0 = *(undefined8 *)(local_7e20 + 0x3c);
        uStack_61c8 = *(undefined8 *)(local_7e20 + 0x3e);
        local_4508 = local_7dc0 + 0x20;
        *(undefined8 *)local_4508 = local_4540;
        *(undefined8 *)(local_7dc0 + 0x22) = uStack_4538;
        *(undefined8 *)(local_7dc0 + 0x24) = uStack_4530;
        *(undefined8 *)(local_7dc0 + 0x26) = uStack_4528;
        local_5900 = local_7da0;
        uStack_58f8 = uStack_7d98;
        uStack_58f0 = uStack_7d90;
        uStack_58e8 = uStack_7d88;
        local_16a0 = (float)local_47e0;
        fStack_169c = local_47e0._4_4_;
        fStack_1698 = (float)uStack_47d8;
        fStack_1694 = uStack_47d8._4_4_;
        fStack_1690 = (float)uStack_47d0;
        fStack_168c = uStack_47d0._4_4_;
        fStack_1688 = (float)uStack_47c8;
        fStack_3844 = uStack_47c8._4_4_;
        local_3860 = (float)local_47e0 * (float)local_1ac0;
        fStack_385c = local_47e0._4_4_ * local_1ac0._4_4_;
        fStack_3858 = (float)uStack_47d8 * (float)uStack_1ab8;
        fStack_3854 = uStack_47d8._4_4_ * uStack_1ab8._4_4_;
        fStack_3850 = (float)uStack_47d0 * (float)uStack_1ab0;
        fStack_384c = uStack_47d0._4_4_ * uStack_1ab0._4_4_;
        fStack_3848 = (float)uStack_47c8 * (float)uStack_1aa8;
        local_3880 = local_7da0;
        uStack_3878 = uStack_7d98;
        uStack_3870 = uStack_7d90;
        uStack_3868 = uStack_7d88;
        local_5960 = CONCAT44(fStack_385c + local_43c0._4_4_,local_3860 + (float)local_43c0);
        uStack_5958 = CONCAT44(fStack_3854 + uStack_43b8._4_4_,fStack_3858 + (float)uStack_43b8);
        uStack_5950 = CONCAT44(fStack_384c + uStack_43b0._4_4_,fStack_3850 + (float)uStack_43b0);
        uStack_5948 = CONCAT44(uStack_47c8._4_4_ + uStack_43a8._4_4_,
                               fStack_3848 + (float)uStack_43a8);
        local_1660 = (float)local_4840;
        fStack_165c = local_4840._4_4_;
        fStack_1658 = (float)uStack_4838;
        fStack_1654 = uStack_4838._4_4_;
        fStack_1650 = (float)uStack_4830;
        fStack_164c = uStack_4830._4_4_;
        fStack_1648 = (float)uStack_4828;
        fStack_3804 = uStack_4828._4_4_;
        local_3820 = (float)local_4840 * (float)local_1880;
        fStack_381c = local_4840._4_4_ * local_1880._4_4_;
        fStack_3818 = (float)uStack_4838 * (float)uStack_1878;
        fStack_3814 = uStack_4838._4_4_ * uStack_1878._4_4_;
        fStack_3810 = (float)uStack_4830 * (float)uStack_1870;
        fStack_380c = uStack_4830._4_4_ * uStack_1870._4_4_;
        fStack_3808 = (float)uStack_4828 * (float)uStack_1868;
        fVar79 = local_3820 + local_3860 + (float)local_43c0;
        fVar81 = fStack_381c + fStack_385c + local_43c0._4_4_;
        fVar82 = fStack_3818 + fStack_3858 + (float)uStack_43b8;
        fVar83 = fStack_3814 + fStack_3854 + uStack_43b8._4_4_;
        fVar84 = fStack_3810 + fStack_3850 + (float)uStack_43b0;
        fVar85 = fStack_380c + fStack_384c + uStack_43b0._4_4_;
        fVar86 = fStack_3808 + fStack_3848 + (float)uStack_43a8;
        fVar87 = uStack_4828._4_4_ + uStack_47c8._4_4_ + uStack_43a8._4_4_;
        local_59c0 = CONCAT44(fVar81,fVar79);
        uStack_59b8 = CONCAT44(fVar83,fVar82);
        uStack_59b0 = CONCAT44(fVar85,fVar84);
        uStack_59a8 = CONCAT44(fVar87,fVar86);
        local_1620 = (float)local_48a0;
        fStack_161c = local_48a0._4_4_;
        fStack_1618 = (float)uStack_4898;
        fStack_1614 = uStack_4898._4_4_;
        fStack_1610 = (float)uStack_4890;
        fStack_160c = uStack_4890._4_4_;
        fStack_1608 = (float)uStack_4888;
        fStack_37c4 = uStack_4888._4_4_;
        local_1640._0_4_ = (float)local_5fa0;
        local_1640._4_4_ = (float)((ulong)local_5fa0 >> 0x20);
        uStack_1638._0_4_ = (float)uStack_5f98;
        uStack_1638._4_4_ = (float)((ulong)uStack_5f98 >> 0x20);
        uStack_1630._0_4_ = (float)uStack_5f90;
        uStack_1630._4_4_ = (float)((ulong)uStack_5f90 >> 0x20);
        uStack_1628._0_4_ = (float)uStack_5f88;
        local_37e0 = (float)local_48a0 * (float)local_1640;
        fStack_37dc = local_48a0._4_4_ * local_1640._4_4_;
        fStack_37d8 = (float)uStack_4898 * (float)uStack_1638;
        fStack_37d4 = uStack_4898._4_4_ * uStack_1638._4_4_;
        fStack_37d0 = (float)uStack_4890 * (float)uStack_1630;
        fStack_37cc = uStack_4890._4_4_ * uStack_1630._4_4_;
        fStack_37c8 = (float)uStack_4888 * (float)uStack_1628;
        fVar79 = local_37e0 + fVar79;
        fVar81 = fStack_37dc + fVar81;
        fVar82 = fStack_37d8 + fVar82;
        fVar83 = fStack_37d4 + fVar83;
        fVar84 = fStack_37d0 + fVar84;
        fVar85 = fStack_37cc + fVar85;
        fVar86 = fStack_37c8 + fVar86;
        fVar87 = uStack_4888._4_4_ + fVar87;
        local_5a20 = CONCAT44(fVar81,fVar79);
        uStack_5a18 = CONCAT44(fVar83,fVar82);
        uStack_5a10 = CONCAT44(fVar85,fVar84);
        uStack_5a08 = CONCAT44(fVar87,fVar86);
        local_15e0 = (float)local_4900;
        fStack_15dc = local_4900._4_4_;
        fStack_15d8 = (float)uStack_48f8;
        fStack_15d4 = uStack_48f8._4_4_;
        fStack_15d0 = (float)uStack_48f0;
        fStack_15cc = uStack_48f0._4_4_;
        fStack_15c8 = (float)uStack_48e8;
        fStack_3784 = uStack_48e8._4_4_;
        local_37a0 = (float)local_4900 * (float)local_1a00;
        fStack_379c = local_4900._4_4_ * local_1a00._4_4_;
        fStack_3798 = (float)uStack_48f8 * (float)uStack_19f8;
        fStack_3794 = uStack_48f8._4_4_ * uStack_19f8._4_4_;
        fStack_3790 = (float)uStack_48f0 * (float)uStack_19f0;
        fStack_378c = uStack_48f0._4_4_ * uStack_19f0._4_4_;
        fStack_3788 = (float)uStack_48e8 * (float)uStack_19e8;
        fVar79 = local_37a0 + fVar79;
        fVar81 = fStack_379c + fVar81;
        fVar82 = fStack_3798 + fVar82;
        fVar83 = fStack_3794 + fVar83;
        fVar84 = fStack_3790 + fVar84;
        fVar85 = fStack_378c + fVar85;
        fVar86 = fStack_3788 + fVar86;
        fVar87 = uStack_48e8._4_4_ + fVar87;
        local_5a80 = CONCAT44(fVar81,fVar79);
        uStack_5a78 = CONCAT44(fVar83,fVar82);
        uStack_5a70 = CONCAT44(fVar85,fVar84);
        uStack_5a68 = CONCAT44(fVar87,fVar86);
        local_15a0 = (float)local_4960;
        fStack_159c = local_4960._4_4_;
        fStack_1598 = (float)uStack_4958;
        fStack_1594 = uStack_4958._4_4_;
        fStack_1590 = (float)uStack_4950;
        fStack_158c = uStack_4950._4_4_;
        fStack_1588 = (float)uStack_4948;
        fStack_3744 = uStack_4948._4_4_;
        local_3760 = (float)local_4960 * (float)local_17c0;
        fStack_375c = local_4960._4_4_ * local_17c0._4_4_;
        fStack_3758 = (float)uStack_4958 * (float)uStack_17b8;
        fStack_3754 = uStack_4958._4_4_ * uStack_17b8._4_4_;
        fStack_3750 = (float)uStack_4950 * (float)uStack_17b0;
        fStack_374c = uStack_4950._4_4_ * uStack_17b0._4_4_;
        fStack_3748 = (float)uStack_4948 * (float)uStack_17a8;
        fVar79 = local_3760 + fVar79;
        fVar81 = fStack_375c + fVar81;
        fVar82 = fStack_3758 + fVar82;
        fVar83 = fStack_3754 + fVar83;
        fVar84 = fStack_3750 + fVar84;
        fVar85 = fStack_374c + fVar85;
        fVar86 = fStack_3748 + fVar86;
        fVar87 = uStack_4948._4_4_ + fVar87;
        local_5ae0 = CONCAT44(fVar81,fVar79);
        uStack_5ad8 = CONCAT44(fVar83,fVar82);
        uStack_5ad0 = CONCAT44(fVar85,fVar84);
        uStack_5ac8 = CONCAT44(fVar87,fVar86);
        local_1560 = (float)local_49c0;
        fStack_155c = local_49c0._4_4_;
        fStack_1558 = (float)uStack_49b8;
        fStack_1554 = uStack_49b8._4_4_;
        fStack_1550 = (float)uStack_49b0;
        fStack_154c = uStack_49b0._4_4_;
        fStack_1548 = (float)uStack_49a8;
        fStack_3704 = uStack_49a8._4_4_;
        local_1580._0_4_ = (float)local_60c0;
        local_1580._4_4_ = (float)((ulong)local_60c0 >> 0x20);
        uStack_1578._0_4_ = (float)uStack_60b8;
        uStack_1578._4_4_ = (float)((ulong)uStack_60b8 >> 0x20);
        uStack_1570._0_4_ = (float)uStack_60b0;
        uStack_1570._4_4_ = (float)((ulong)uStack_60b0 >> 0x20);
        uStack_1568._0_4_ = (float)uStack_60a8;
        local_3720 = (float)local_49c0 * (float)local_1580;
        fStack_371c = local_49c0._4_4_ * local_1580._4_4_;
        fStack_3718 = (float)uStack_49b8 * (float)uStack_1578;
        fStack_3714 = uStack_49b8._4_4_ * uStack_1578._4_4_;
        fStack_3710 = (float)uStack_49b0 * (float)uStack_1570;
        fStack_370c = uStack_49b0._4_4_ * uStack_1570._4_4_;
        fStack_3708 = (float)uStack_49a8 * (float)uStack_1568;
        fVar79 = local_3720 + fVar79;
        fVar81 = fStack_371c + fVar81;
        fVar82 = fStack_3718 + fVar82;
        fVar83 = fStack_3714 + fVar83;
        fVar84 = fStack_3710 + fVar84;
        fVar85 = fStack_370c + fVar85;
        fVar86 = fStack_3708 + fVar86;
        fVar87 = uStack_49a8._4_4_ + fVar87;
        local_5b40 = CONCAT44(fVar81,fVar79);
        uStack_5b38 = CONCAT44(fVar83,fVar82);
        uStack_5b30 = CONCAT44(fVar85,fVar84);
        uStack_5b28 = CONCAT44(fVar87,fVar86);
        local_1520 = (float)local_4a20;
        fStack_151c = local_4a20._4_4_;
        fStack_1518 = (float)uStack_4a18;
        fStack_1514 = uStack_4a18._4_4_;
        fStack_1510 = (float)uStack_4a10;
        fStack_150c = uStack_4a10._4_4_;
        fStack_1508 = (float)uStack_4a08;
        fStack_36c4 = uStack_4a08._4_4_;
        local_36e0 = (float)local_4a20 * (float)local_1940;
        fStack_36dc = local_4a20._4_4_ * local_1940._4_4_;
        fStack_36d8 = (float)uStack_4a18 * (float)uStack_1938;
        fStack_36d4 = uStack_4a18._4_4_ * uStack_1938._4_4_;
        fStack_36d0 = (float)uStack_4a10 * (float)uStack_1930;
        fStack_36cc = uStack_4a10._4_4_ * uStack_1930._4_4_;
        fStack_36c8 = (float)uStack_4a08 * (float)uStack_1928;
        fVar79 = local_36e0 + fVar79;
        fVar81 = fStack_36dc + fVar81;
        fVar82 = fStack_36d8 + fVar82;
        fVar83 = fStack_36d4 + fVar83;
        fVar84 = fStack_36d0 + fVar84;
        fVar85 = fStack_36cc + fVar85;
        fVar86 = fStack_36c8 + fVar86;
        fVar87 = uStack_4a08._4_4_ + fVar87;
        local_5ba0 = CONCAT44(fVar81,fVar79);
        uStack_5b98 = CONCAT44(fVar83,fVar82);
        uStack_5b90 = CONCAT44(fVar85,fVar84);
        uStack_5b88 = CONCAT44(fVar87,fVar86);
        local_14e0 = (float)local_4a80;
        fStack_14dc = local_4a80._4_4_;
        fStack_14d8 = (float)uStack_4a78;
        fStack_14d4 = uStack_4a78._4_4_;
        fStack_14d0 = (float)uStack_4a70;
        fStack_14cc = uStack_4a70._4_4_;
        fStack_14c8 = (float)uStack_4a68;
        fStack_3684 = uStack_4a68._4_4_;
        local_36a0 = (float)local_4a80 * (float)local_1700;
        fStack_369c = local_4a80._4_4_ * local_1700._4_4_;
        fStack_3698 = (float)uStack_4a78 * (float)uStack_16f8;
        fStack_3694 = uStack_4a78._4_4_ * uStack_16f8._4_4_;
        fStack_3690 = (float)uStack_4a70 * (float)uStack_16f0;
        fStack_368c = uStack_4a70._4_4_ * uStack_16f0._4_4_;
        fStack_3688 = (float)uStack_4a68 * (float)uStack_16e8;
        fVar79 = local_36a0 + fVar79;
        fVar81 = fStack_369c + fVar81;
        fVar82 = fStack_3698 + fVar82;
        fVar83 = fStack_3694 + fVar83;
        fVar84 = fStack_3690 + fVar84;
        fVar85 = fStack_368c + fVar85;
        fVar86 = fStack_3688 + fVar86;
        fVar87 = uStack_4a68._4_4_ + fVar87;
        local_5c00 = CONCAT44(fVar81,fVar79);
        uStack_5bf8 = CONCAT44(fVar83,fVar82);
        uStack_5bf0 = CONCAT44(fVar85,fVar84);
        uStack_5be8 = CONCAT44(fVar87,fVar86);
        local_14a0 = (float)local_4ae0;
        fStack_149c = local_4ae0._4_4_;
        fStack_1498 = (float)uStack_4ad8;
        fStack_1494 = uStack_4ad8._4_4_;
        fStack_1490 = (float)uStack_4ad0;
        fStack_148c = uStack_4ad0._4_4_;
        fStack_1488 = (float)uStack_4ac8;
        fStack_3644 = uStack_4ac8._4_4_;
        local_14c0._0_4_ = (float)local_61e0;
        local_14c0._4_4_ = (float)((ulong)local_61e0 >> 0x20);
        uStack_14b8._0_4_ = (float)uStack_61d8;
        uStack_14b8._4_4_ = (float)((ulong)uStack_61d8 >> 0x20);
        uStack_14b0._0_4_ = (float)uStack_61d0;
        uStack_14b0._4_4_ = (float)((ulong)uStack_61d0 >> 0x20);
        uStack_14a8._0_4_ = (float)uStack_61c8;
        local_3660 = (float)local_4ae0 * (float)local_14c0;
        fStack_365c = local_4ae0._4_4_ * local_14c0._4_4_;
        fStack_3658 = (float)uStack_4ad8 * (float)uStack_14b8;
        fStack_3654 = uStack_4ad8._4_4_ * uStack_14b8._4_4_;
        fStack_3650 = (float)uStack_4ad0 * (float)uStack_14b0;
        fStack_364c = uStack_4ad0._4_4_ * uStack_14b0._4_4_;
        fStack_3648 = (float)uStack_4ac8 * (float)uStack_14a8;
        local_4580 = CONCAT44(fStack_365c + fVar81,local_3660 + fVar79);
        uStack_4578 = CONCAT44(fStack_3654 + fVar83,fStack_3658 + fVar82);
        uStack_4570 = CONCAT44(fStack_364c + fVar85,fStack_3650 + fVar84);
        uStack_4568 = CONCAT44(uStack_4ac8._4_4_ + fVar87,fStack_3648 + fVar86);
        local_7b78 = local_7e10 + 0x40;
        local_6000 = *(undefined8 *)local_7b78;
        uStack_5ff8 = *(undefined8 *)(local_7e10 + 0x42);
        uStack_5ff0 = *(undefined8 *)(local_7e10 + 0x44);
        uStack_5fe8 = *(undefined8 *)(local_7e10 + 0x46);
        local_7b80 = local_7e18 + 0x40;
        local_6120 = *(undefined8 *)local_7b80;
        uStack_6118 = *(undefined8 *)(local_7e18 + 0x42);
        uStack_6110 = *(undefined8 *)(local_7e18 + 0x44);
        uStack_6108 = *(undefined8 *)(local_7e18 + 0x46);
        local_7b88 = local_7e20 + 0x40;
        local_6240 = *(undefined8 *)local_7b88;
        uStack_6238 = *(undefined8 *)(local_7e20 + 0x42);
        uStack_6230 = *(undefined8 *)(local_7e20 + 0x44);
        uStack_6228 = *(undefined8 *)(local_7e20 + 0x46);
        local_4548 = local_7dc0 + 0x28;
        *(undefined8 *)local_4548 = local_4580;
        *(undefined8 *)(local_7dc0 + 0x2a) = uStack_4578;
        *(undefined8 *)(local_7dc0 + 0x2c) = uStack_4570;
        *(undefined8 *)(local_7dc0 + 0x2e) = uStack_4568;
        local_5c60 = local_7da0;
        uStack_5c58 = uStack_7d98;
        uStack_5c50 = uStack_7d90;
        uStack_5c48 = uStack_7d88;
        local_1460 = (float)local_47e0;
        fStack_145c = local_47e0._4_4_;
        fStack_1458 = (float)uStack_47d8;
        fStack_1454 = uStack_47d8._4_4_;
        fStack_1450 = (float)uStack_47d0;
        fStack_144c = uStack_47d0._4_4_;
        fStack_1448 = (float)uStack_47c8;
        fStack_3604 = uStack_47c8._4_4_;
        local_3620 = (float)local_47e0 * (float)local_1880;
        fStack_361c = local_47e0._4_4_ * local_1880._4_4_;
        fStack_3618 = (float)uStack_47d8 * (float)uStack_1878;
        fStack_3614 = uStack_47d8._4_4_ * uStack_1878._4_4_;
        fStack_3610 = (float)uStack_47d0 * (float)uStack_1870;
        fStack_360c = uStack_47d0._4_4_ * uStack_1870._4_4_;
        fStack_3608 = (float)uStack_47c8 * (float)uStack_1868;
        local_3640 = local_7da0;
        uStack_3638 = uStack_7d98;
        uStack_3630 = uStack_7d90;
        uStack_3628 = uStack_7d88;
        local_5cc0 = CONCAT44(fStack_361c + local_43c0._4_4_,local_3620 + (float)local_43c0);
        uStack_5cb8 = CONCAT44(fStack_3614 + uStack_43b8._4_4_,fStack_3618 + (float)uStack_43b8);
        uStack_5cb0 = CONCAT44(fStack_360c + uStack_43b0._4_4_,fStack_3610 + (float)uStack_43b0);
        uStack_5ca8 = CONCAT44(uStack_47c8._4_4_ + uStack_43a8._4_4_,
                               fStack_3608 + (float)uStack_43a8);
        local_1420 = (float)local_4840;
        fStack_141c = local_4840._4_4_;
        fStack_1418 = (float)uStack_4838;
        fStack_1414 = uStack_4838._4_4_;
        fStack_1410 = (float)uStack_4830;
        fStack_140c = uStack_4830._4_4_;
        fStack_1408 = (float)uStack_4828;
        fStack_35c4 = uStack_4828._4_4_;
        local_35e0 = (float)local_4840 * (float)local_1640;
        fStack_35dc = local_4840._4_4_ * local_1640._4_4_;
        fStack_35d8 = (float)uStack_4838 * (float)uStack_1638;
        fStack_35d4 = uStack_4838._4_4_ * uStack_1638._4_4_;
        fStack_35d0 = (float)uStack_4830 * (float)uStack_1630;
        fStack_35cc = uStack_4830._4_4_ * uStack_1630._4_4_;
        fStack_35c8 = (float)uStack_4828 * (float)uStack_1628;
        fVar79 = local_35e0 + local_3620 + (float)local_43c0;
        fVar81 = fStack_35dc + fStack_361c + local_43c0._4_4_;
        fVar82 = fStack_35d8 + fStack_3618 + (float)uStack_43b8;
        fVar83 = fStack_35d4 + fStack_3614 + uStack_43b8._4_4_;
        fVar84 = fStack_35d0 + fStack_3610 + (float)uStack_43b0;
        fVar85 = fStack_35cc + fStack_360c + uStack_43b0._4_4_;
        fVar86 = fStack_35c8 + fStack_3608 + (float)uStack_43a8;
        fVar87 = uStack_4828._4_4_ + uStack_47c8._4_4_ + uStack_43a8._4_4_;
        local_5d20 = CONCAT44(fVar81,fVar79);
        uStack_5d18 = CONCAT44(fVar83,fVar82);
        uStack_5d10 = CONCAT44(fVar85,fVar84);
        uStack_5d08 = CONCAT44(fVar87,fVar86);
        local_13e0 = (float)local_48a0;
        fStack_13dc = local_48a0._4_4_;
        fStack_13d8 = (float)uStack_4898;
        fStack_13d4 = uStack_4898._4_4_;
        fStack_13d0 = (float)uStack_4890;
        fStack_13cc = uStack_4890._4_4_;
        fStack_13c8 = (float)uStack_4888;
        fStack_3584 = uStack_4888._4_4_;
        local_1400._0_4_ = (float)local_6000;
        local_1400._4_4_ = (float)((ulong)local_6000 >> 0x20);
        uStack_13f8._0_4_ = (float)uStack_5ff8;
        uStack_13f8._4_4_ = (float)((ulong)uStack_5ff8 >> 0x20);
        uStack_13f0._0_4_ = (float)uStack_5ff0;
        uStack_13f0._4_4_ = (float)((ulong)uStack_5ff0 >> 0x20);
        uStack_13e8._0_4_ = (float)uStack_5fe8;
        local_35a0 = (float)local_48a0 * (float)local_1400;
        fStack_359c = local_48a0._4_4_ * local_1400._4_4_;
        fStack_3598 = (float)uStack_4898 * (float)uStack_13f8;
        fStack_3594 = uStack_4898._4_4_ * uStack_13f8._4_4_;
        fStack_3590 = (float)uStack_4890 * (float)uStack_13f0;
        fStack_358c = uStack_4890._4_4_ * uStack_13f0._4_4_;
        fStack_3588 = (float)uStack_4888 * (float)uStack_13e8;
        fVar79 = local_35a0 + fVar79;
        fVar81 = fStack_359c + fVar81;
        fVar82 = fStack_3598 + fVar82;
        fVar83 = fStack_3594 + fVar83;
        fVar84 = fStack_3590 + fVar84;
        fVar85 = fStack_358c + fVar85;
        fVar86 = fStack_3588 + fVar86;
        fVar87 = uStack_4888._4_4_ + fVar87;
        local_5d80 = CONCAT44(fVar81,fVar79);
        uStack_5d78 = CONCAT44(fVar83,fVar82);
        uStack_5d70 = CONCAT44(fVar85,fVar84);
        uStack_5d68 = CONCAT44(fVar87,fVar86);
        local_13a0 = (float)local_4900;
        fStack_139c = local_4900._4_4_;
        fStack_1398 = (float)uStack_48f8;
        fStack_1394 = uStack_48f8._4_4_;
        fStack_1390 = (float)uStack_48f0;
        fStack_138c = uStack_48f0._4_4_;
        fStack_1388 = (float)uStack_48e8;
        fStack_3544 = uStack_48e8._4_4_;
        local_3560 = (float)local_4900 * (float)local_17c0;
        fStack_355c = local_4900._4_4_ * local_17c0._4_4_;
        fStack_3558 = (float)uStack_48f8 * (float)uStack_17b8;
        fStack_3554 = uStack_48f8._4_4_ * uStack_17b8._4_4_;
        fStack_3550 = (float)uStack_48f0 * (float)uStack_17b0;
        fStack_354c = uStack_48f0._4_4_ * uStack_17b0._4_4_;
        fStack_3548 = (float)uStack_48e8 * (float)uStack_17a8;
        fVar79 = local_3560 + fVar79;
        fVar81 = fStack_355c + fVar81;
        fVar82 = fStack_3558 + fVar82;
        fVar83 = fStack_3554 + fVar83;
        fVar84 = fStack_3550 + fVar84;
        fVar85 = fStack_354c + fVar85;
        fVar86 = fStack_3548 + fVar86;
        fVar87 = uStack_48e8._4_4_ + fVar87;
        local_5de0 = CONCAT44(fVar81,fVar79);
        uStack_5dd8 = CONCAT44(fVar83,fVar82);
        uStack_5dd0 = CONCAT44(fVar85,fVar84);
        uStack_5dc8 = CONCAT44(fVar87,fVar86);
        local_1360 = (float)local_4960;
        fStack_135c = local_4960._4_4_;
        fStack_1358 = (float)uStack_4958;
        fStack_1354 = uStack_4958._4_4_;
        fStack_1350 = (float)uStack_4950;
        fStack_134c = uStack_4950._4_4_;
        fStack_1348 = (float)uStack_4948;
        fStack_3504 = uStack_4948._4_4_;
        local_3520 = (float)local_4960 * (float)local_1580;
        fStack_351c = local_4960._4_4_ * local_1580._4_4_;
        fStack_3518 = (float)uStack_4958 * (float)uStack_1578;
        fStack_3514 = uStack_4958._4_4_ * uStack_1578._4_4_;
        fStack_3510 = (float)uStack_4950 * (float)uStack_1570;
        fStack_350c = uStack_4950._4_4_ * uStack_1570._4_4_;
        fStack_3508 = (float)uStack_4948 * (float)uStack_1568;
        fVar79 = local_3520 + fVar79;
        fVar81 = fStack_351c + fVar81;
        fVar82 = fStack_3518 + fVar82;
        fVar83 = fStack_3514 + fVar83;
        fVar84 = fStack_3510 + fVar84;
        fVar85 = fStack_350c + fVar85;
        fVar86 = fStack_3508 + fVar86;
        fVar87 = uStack_4948._4_4_ + fVar87;
        local_5e40 = CONCAT44(fVar81,fVar79);
        uStack_5e38 = CONCAT44(fVar83,fVar82);
        uStack_5e30 = CONCAT44(fVar85,fVar84);
        uStack_5e28 = CONCAT44(fVar87,fVar86);
        local_1320 = (float)local_49c0;
        fStack_131c = local_49c0._4_4_;
        fStack_1318 = (float)uStack_49b8;
        fStack_1314 = uStack_49b8._4_4_;
        fStack_1310 = (float)uStack_49b0;
        fStack_130c = uStack_49b0._4_4_;
        fStack_1308 = (float)uStack_49a8;
        fStack_34c4 = uStack_49a8._4_4_;
        local_1340._0_4_ = (float)local_6120;
        local_1340._4_4_ = (float)((ulong)local_6120 >> 0x20);
        uStack_1338._0_4_ = (float)uStack_6118;
        uStack_1338._4_4_ = (float)((ulong)uStack_6118 >> 0x20);
        uStack_1330._0_4_ = (float)uStack_6110;
        uStack_1330._4_4_ = (float)((ulong)uStack_6110 >> 0x20);
        uStack_1328._0_4_ = (float)uStack_6108;
        local_34e0 = (float)local_49c0 * (float)local_1340;
        fStack_34dc = local_49c0._4_4_ * local_1340._4_4_;
        fStack_34d8 = (float)uStack_49b8 * (float)uStack_1338;
        fStack_34d4 = uStack_49b8._4_4_ * uStack_1338._4_4_;
        fStack_34d0 = (float)uStack_49b0 * (float)uStack_1330;
        fStack_34cc = uStack_49b0._4_4_ * uStack_1330._4_4_;
        fStack_34c8 = (float)uStack_49a8 * (float)uStack_1328;
        fVar79 = local_34e0 + fVar79;
        fVar81 = fStack_34dc + fVar81;
        fVar82 = fStack_34d8 + fVar82;
        fVar83 = fStack_34d4 + fVar83;
        fVar84 = fStack_34d0 + fVar84;
        fVar85 = fStack_34cc + fVar85;
        fVar86 = fStack_34c8 + fVar86;
        fVar87 = uStack_49a8._4_4_ + fVar87;
        local_5ea0 = CONCAT44(fVar81,fVar79);
        uStack_5e98 = CONCAT44(fVar83,fVar82);
        uStack_5e90 = CONCAT44(fVar85,fVar84);
        uStack_5e88 = CONCAT44(fVar87,fVar86);
        local_12e0 = (float)local_4a20;
        fStack_12dc = local_4a20._4_4_;
        fStack_12d8 = (float)uStack_4a18;
        fStack_12d4 = uStack_4a18._4_4_;
        fStack_12d0 = (float)uStack_4a10;
        fStack_12cc = uStack_4a10._4_4_;
        fStack_12c8 = (float)uStack_4a08;
        fStack_3484 = uStack_4a08._4_4_;
        local_34a0 = (float)local_4a20 * (float)local_1700;
        fStack_349c = local_4a20._4_4_ * local_1700._4_4_;
        fStack_3498 = (float)uStack_4a18 * (float)uStack_16f8;
        fStack_3494 = uStack_4a18._4_4_ * uStack_16f8._4_4_;
        fStack_3490 = (float)uStack_4a10 * (float)uStack_16f0;
        fStack_348c = uStack_4a10._4_4_ * uStack_16f0._4_4_;
        fStack_3488 = (float)uStack_4a08 * (float)uStack_16e8;
        fVar79 = local_34a0 + fVar79;
        fVar81 = fStack_349c + fVar81;
        fVar82 = fStack_3498 + fVar82;
        fVar83 = fStack_3494 + fVar83;
        fVar84 = fStack_3490 + fVar84;
        fVar85 = fStack_348c + fVar85;
        fVar86 = fStack_3488 + fVar86;
        fVar87 = uStack_4a08._4_4_ + fVar87;
        local_5f00 = CONCAT44(fVar81,fVar79);
        uStack_5ef8 = CONCAT44(fVar83,fVar82);
        uStack_5ef0 = CONCAT44(fVar85,fVar84);
        uStack_5ee8 = CONCAT44(fVar87,fVar86);
        local_12a0 = (float)local_4a80;
        fStack_129c = local_4a80._4_4_;
        fStack_1298 = (float)uStack_4a78;
        fStack_1294 = uStack_4a78._4_4_;
        fStack_1290 = (float)uStack_4a70;
        fStack_128c = uStack_4a70._4_4_;
        fStack_1288 = (float)uStack_4a68;
        fStack_3444 = uStack_4a68._4_4_;
        local_3460 = (float)local_4a80 * (float)local_14c0;
        fStack_345c = local_4a80._4_4_ * local_14c0._4_4_;
        fStack_3458 = (float)uStack_4a78 * (float)uStack_14b8;
        fStack_3454 = uStack_4a78._4_4_ * uStack_14b8._4_4_;
        fStack_3450 = (float)uStack_4a70 * (float)uStack_14b0;
        fStack_344c = uStack_4a70._4_4_ * uStack_14b0._4_4_;
        fStack_3448 = (float)uStack_4a68 * (float)uStack_14a8;
        fVar79 = local_3460 + fVar79;
        fVar81 = fStack_345c + fVar81;
        fVar82 = fStack_3458 + fVar82;
        fVar83 = fStack_3454 + fVar83;
        fVar84 = fStack_3450 + fVar84;
        fVar85 = fStack_344c + fVar85;
        fVar86 = fStack_3448 + fVar86;
        fVar87 = uStack_4a68._4_4_ + fVar87;
        local_5f60 = CONCAT44(fVar81,fVar79);
        uStack_5f58 = CONCAT44(fVar83,fVar82);
        uStack_5f50 = CONCAT44(fVar85,fVar84);
        uStack_5f48 = CONCAT44(fVar87,fVar86);
        local_1260 = (float)local_4ae0;
        fStack_125c = local_4ae0._4_4_;
        fStack_1258 = (float)uStack_4ad8;
        fStack_1254 = uStack_4ad8._4_4_;
        fStack_1250 = (float)uStack_4ad0;
        fStack_124c = uStack_4ad0._4_4_;
        fStack_1248 = (float)uStack_4ac8;
        fStack_3404 = uStack_4ac8._4_4_;
        local_1280._0_4_ = (float)local_6240;
        local_1280._4_4_ = (float)((ulong)local_6240 >> 0x20);
        uStack_1278._0_4_ = (float)uStack_6238;
        uStack_1278._4_4_ = (float)((ulong)uStack_6238 >> 0x20);
        uStack_1270._0_4_ = (float)uStack_6230;
        uStack_1270._4_4_ = (float)((ulong)uStack_6230 >> 0x20);
        uStack_1268._0_4_ = (float)uStack_6228;
        local_3420 = (float)local_4ae0 * (float)local_1280;
        fStack_341c = local_4ae0._4_4_ * local_1280._4_4_;
        fStack_3418 = (float)uStack_4ad8 * (float)uStack_1278;
        fStack_3414 = uStack_4ad8._4_4_ * uStack_1278._4_4_;
        fStack_3410 = (float)uStack_4ad0 * (float)uStack_1270;
        fStack_340c = uStack_4ad0._4_4_ * uStack_1270._4_4_;
        fStack_3408 = (float)uStack_4ac8 * (float)uStack_1268;
        local_45c0 = CONCAT44(fStack_341c + fVar81,local_3420 + fVar79);
        uStack_45b8 = CONCAT44(fStack_3414 + fVar83,fStack_3418 + fVar82);
        uStack_45b0 = CONCAT44(fStack_340c + fVar85,fStack_3410 + fVar84);
        uStack_45a8 = CONCAT44(uStack_4ac8._4_4_ + fVar87,fStack_3408 + fVar86);
        local_7b90 = local_7e10 + 0x48;
        local_6060 = *(undefined8 *)local_7b90;
        uStack_6058 = *(undefined8 *)(local_7e10 + 0x4a);
        uStack_6050 = *(undefined8 *)(local_7e10 + 0x4c);
        uStack_6048 = *(undefined8 *)(local_7e10 + 0x4e);
        local_7b98 = local_7e18 + 0x48;
        local_6180 = *(undefined8 *)local_7b98;
        uStack_6178 = *(undefined8 *)(local_7e18 + 0x4a);
        uStack_6170 = *(undefined8 *)(local_7e18 + 0x4c);
        uStack_6168 = *(undefined8 *)(local_7e18 + 0x4e);
        local_7ba0 = local_7e20 + 0x48;
        local_62a0 = *(undefined8 *)local_7ba0;
        uStack_6298 = *(undefined8 *)(local_7e20 + 0x4a);
        uStack_6290 = *(undefined8 *)(local_7e20 + 0x4c);
        uStack_6288 = *(undefined8 *)(local_7e20 + 0x4e);
        local_4588 = local_7dc0 + 0x30;
        *(undefined8 *)local_4588 = local_45c0;
        *(undefined8 *)(local_7dc0 + 0x32) = uStack_45b8;
        *(undefined8 *)(local_7dc0 + 0x34) = uStack_45b0;
        *(undefined8 *)(local_7dc0 + 0x36) = uStack_45a8;
        local_5fc0 = local_7da0;
        uStack_5fb8 = uStack_7d98;
        uStack_5fb0 = uStack_7d90;
        uStack_5fa8 = uStack_7d88;
        local_1220 = (float)local_47e0;
        fStack_121c = local_47e0._4_4_;
        fStack_1218 = (float)uStack_47d8;
        fStack_1214 = uStack_47d8._4_4_;
        fStack_1210 = (float)uStack_47d0;
        fStack_120c = uStack_47d0._4_4_;
        fStack_1208 = (float)uStack_47c8;
        fStack_33c4 = uStack_47c8._4_4_;
        local_33e0 = (float)local_47e0 * (float)local_1640;
        fStack_33dc = local_47e0._4_4_ * local_1640._4_4_;
        fStack_33d8 = (float)uStack_47d8 * (float)uStack_1638;
        fStack_33d4 = uStack_47d8._4_4_ * uStack_1638._4_4_;
        fStack_33d0 = (float)uStack_47d0 * (float)uStack_1630;
        fStack_33cc = uStack_47d0._4_4_ * uStack_1630._4_4_;
        fStack_33c8 = (float)uStack_47c8 * (float)uStack_1628;
        local_3400 = local_7da0;
        uStack_33f8 = uStack_7d98;
        uStack_33f0 = uStack_7d90;
        uStack_33e8 = uStack_7d88;
        local_6020 = CONCAT44(fStack_33dc + local_43c0._4_4_,local_33e0 + (float)local_43c0);
        uStack_6018 = CONCAT44(fStack_33d4 + uStack_43b8._4_4_,fStack_33d8 + (float)uStack_43b8);
        uStack_6010 = CONCAT44(fStack_33cc + uStack_43b0._4_4_,fStack_33d0 + (float)uStack_43b0);
        uStack_6008 = CONCAT44(uStack_47c8._4_4_ + uStack_43a8._4_4_,
                               fStack_33c8 + (float)uStack_43a8);
        local_11e0 = (float)local_4840;
        fStack_11dc = local_4840._4_4_;
        fStack_11d8 = (float)uStack_4838;
        fStack_11d4 = uStack_4838._4_4_;
        fStack_11d0 = (float)uStack_4830;
        fStack_11cc = uStack_4830._4_4_;
        fStack_11c8 = (float)uStack_4828;
        fStack_3384 = uStack_4828._4_4_;
        local_33a0 = (float)local_4840 * (float)local_1400;
        fStack_339c = local_4840._4_4_ * local_1400._4_4_;
        fStack_3398 = (float)uStack_4838 * (float)uStack_13f8;
        fStack_3394 = uStack_4838._4_4_ * uStack_13f8._4_4_;
        fStack_3390 = (float)uStack_4830 * (float)uStack_13f0;
        fStack_338c = uStack_4830._4_4_ * uStack_13f0._4_4_;
        fStack_3388 = (float)uStack_4828 * (float)uStack_13e8;
        fVar79 = local_33a0 + local_33e0 + (float)local_43c0;
        fVar81 = fStack_339c + fStack_33dc + local_43c0._4_4_;
        fVar82 = fStack_3398 + fStack_33d8 + (float)uStack_43b8;
        fVar83 = fStack_3394 + fStack_33d4 + uStack_43b8._4_4_;
        fVar84 = fStack_3390 + fStack_33d0 + (float)uStack_43b0;
        fVar85 = fStack_338c + fStack_33cc + uStack_43b0._4_4_;
        fVar86 = fStack_3388 + fStack_33c8 + (float)uStack_43a8;
        uStack_4828._4_4_ = uStack_4828._4_4_ + uStack_47c8._4_4_ + uStack_43a8._4_4_;
        local_6080 = CONCAT44(fVar81,fVar79);
        uStack_6078 = CONCAT44(fVar83,fVar82);
        uStack_6070 = CONCAT44(fVar85,fVar84);
        uStack_6068 = CONCAT44(uStack_4828._4_4_,fVar86);
        local_11a0 = (float)local_48a0;
        fStack_119c = local_48a0._4_4_;
        fStack_1198 = (float)uStack_4898;
        fStack_1194 = uStack_4898._4_4_;
        fStack_1190 = (float)uStack_4890;
        fStack_118c = uStack_4890._4_4_;
        fStack_1188 = (float)uStack_4888;
        fStack_3344 = uStack_4888._4_4_;
        local_11c0._0_4_ = (float)local_6060;
        local_11c0._4_4_ = (float)((ulong)local_6060 >> 0x20);
        uStack_11b8._0_4_ = (float)uStack_6058;
        uStack_11b8._4_4_ = (float)((ulong)uStack_6058 >> 0x20);
        uStack_11b0._0_4_ = (float)uStack_6050;
        uStack_11b0._4_4_ = (float)((ulong)uStack_6050 >> 0x20);
        uStack_11a8._0_4_ = (float)uStack_6048;
        local_3360 = (float)local_48a0 * (float)local_11c0;
        fStack_335c = local_48a0._4_4_ * local_11c0._4_4_;
        fStack_3358 = (float)uStack_4898 * (float)uStack_11b8;
        fStack_3354 = uStack_4898._4_4_ * uStack_11b8._4_4_;
        fStack_3350 = (float)uStack_4890 * (float)uStack_11b0;
        fStack_334c = uStack_4890._4_4_ * uStack_11b0._4_4_;
        fStack_3348 = (float)uStack_4888 * (float)uStack_11a8;
        fVar79 = local_3360 + fVar79;
        fVar81 = fStack_335c + fVar81;
        fVar82 = fStack_3358 + fVar82;
        fVar83 = fStack_3354 + fVar83;
        fVar84 = fStack_3350 + fVar84;
        fVar85 = fStack_334c + fVar85;
        fVar86 = fStack_3348 + fVar86;
        uStack_4888._4_4_ = uStack_4888._4_4_ + uStack_4828._4_4_;
        local_60e0 = CONCAT44(fVar81,fVar79);
        uStack_60d8 = CONCAT44(fVar83,fVar82);
        uStack_60d0 = CONCAT44(fVar85,fVar84);
        uStack_60c8 = CONCAT44(uStack_4888._4_4_,fVar86);
        local_1160 = (float)local_4900;
        fStack_115c = local_4900._4_4_;
        fStack_1158 = (float)uStack_48f8;
        fStack_1154 = uStack_48f8._4_4_;
        fStack_1150 = (float)uStack_48f0;
        fStack_114c = uStack_48f0._4_4_;
        fStack_1148 = (float)uStack_48e8;
        fStack_3304 = uStack_48e8._4_4_;
        local_3320 = (float)local_4900 * (float)local_1580;
        fStack_331c = local_4900._4_4_ * local_1580._4_4_;
        fStack_3318 = (float)uStack_48f8 * (float)uStack_1578;
        fStack_3314 = uStack_48f8._4_4_ * uStack_1578._4_4_;
        fStack_3310 = (float)uStack_48f0 * (float)uStack_1570;
        fStack_330c = uStack_48f0._4_4_ * uStack_1570._4_4_;
        fStack_3308 = (float)uStack_48e8 * (float)uStack_1568;
        fVar79 = local_3320 + fVar79;
        fVar81 = fStack_331c + fVar81;
        fVar82 = fStack_3318 + fVar82;
        fVar83 = fStack_3314 + fVar83;
        fVar84 = fStack_3310 + fVar84;
        fVar85 = fStack_330c + fVar85;
        fVar86 = fStack_3308 + fVar86;
        uStack_48e8._4_4_ = uStack_48e8._4_4_ + uStack_4888._4_4_;
        local_6140 = CONCAT44(fVar81,fVar79);
        uStack_6138 = CONCAT44(fVar83,fVar82);
        uStack_6130 = CONCAT44(fVar85,fVar84);
        uStack_6128 = CONCAT44(uStack_48e8._4_4_,fVar86);
        local_1120 = (float)local_4960;
        fStack_111c = local_4960._4_4_;
        fStack_1118 = (float)uStack_4958;
        fStack_1114 = uStack_4958._4_4_;
        fStack_1110 = (float)uStack_4950;
        fStack_110c = uStack_4950._4_4_;
        fStack_1108 = (float)uStack_4948;
        fStack_32c4 = uStack_4948._4_4_;
        local_32e0 = (float)local_4960 * (float)local_1340;
        fStack_32dc = local_4960._4_4_ * local_1340._4_4_;
        fStack_32d8 = (float)uStack_4958 * (float)uStack_1338;
        fStack_32d4 = uStack_4958._4_4_ * uStack_1338._4_4_;
        fStack_32d0 = (float)uStack_4950 * (float)uStack_1330;
        fStack_32cc = uStack_4950._4_4_ * uStack_1330._4_4_;
        fStack_32c8 = (float)uStack_4948 * (float)uStack_1328;
        fVar79 = local_32e0 + fVar79;
        fVar81 = fStack_32dc + fVar81;
        fVar82 = fStack_32d8 + fVar82;
        fVar83 = fStack_32d4 + fVar83;
        fVar84 = fStack_32d0 + fVar84;
        fVar85 = fStack_32cc + fVar85;
        fVar86 = fStack_32c8 + fVar86;
        uStack_4948._4_4_ = uStack_4948._4_4_ + uStack_48e8._4_4_;
        local_61a0 = CONCAT44(fVar81,fVar79);
        uStack_6198 = CONCAT44(fVar83,fVar82);
        uStack_6190 = CONCAT44(fVar85,fVar84);
        uStack_6188 = CONCAT44(uStack_4948._4_4_,fVar86);
        local_10e0 = (float)local_49c0;
        fStack_10dc = local_49c0._4_4_;
        fStack_10d8 = (float)uStack_49b8;
        fStack_10d4 = uStack_49b8._4_4_;
        fStack_10d0 = (float)uStack_49b0;
        fStack_10cc = uStack_49b0._4_4_;
        fStack_10c8 = (float)uStack_49a8;
        fStack_3284 = uStack_49a8._4_4_;
        local_1100._0_4_ = (float)local_6180;
        local_1100._4_4_ = (float)((ulong)local_6180 >> 0x20);
        uStack_10f8._0_4_ = (float)uStack_6178;
        uStack_10f8._4_4_ = (float)((ulong)uStack_6178 >> 0x20);
        uStack_10f0._0_4_ = (float)uStack_6170;
        uStack_10f0._4_4_ = (float)((ulong)uStack_6170 >> 0x20);
        uStack_10e8._0_4_ = (float)uStack_6168;
        local_32a0 = (float)local_49c0 * (float)local_1100;
        fStack_329c = local_49c0._4_4_ * local_1100._4_4_;
        fStack_3298 = (float)uStack_49b8 * (float)uStack_10f8;
        fStack_3294 = uStack_49b8._4_4_ * uStack_10f8._4_4_;
        fStack_3290 = (float)uStack_49b0 * (float)uStack_10f0;
        fStack_328c = uStack_49b0._4_4_ * uStack_10f0._4_4_;
        fStack_3288 = (float)uStack_49a8 * (float)uStack_10e8;
        fVar79 = local_32a0 + fVar79;
        fVar81 = fStack_329c + fVar81;
        fVar82 = fStack_3298 + fVar82;
        fVar83 = fStack_3294 + fVar83;
        fVar84 = fStack_3290 + fVar84;
        fVar85 = fStack_328c + fVar85;
        fVar86 = fStack_3288 + fVar86;
        uStack_49a8._4_4_ = uStack_49a8._4_4_ + uStack_4948._4_4_;
        local_6200 = CONCAT44(fVar81,fVar79);
        uStack_61f8 = CONCAT44(fVar83,fVar82);
        uStack_61f0 = CONCAT44(fVar85,fVar84);
        uStack_61e8 = CONCAT44(uStack_49a8._4_4_,fVar86);
        local_10a0 = (float)local_4a20;
        fStack_109c = local_4a20._4_4_;
        fStack_1098 = (float)uStack_4a18;
        fStack_1094 = uStack_4a18._4_4_;
        fStack_1090 = (float)uStack_4a10;
        fStack_108c = uStack_4a10._4_4_;
        fStack_1088 = (float)uStack_4a08;
        fStack_3244 = uStack_4a08._4_4_;
        local_3260 = (float)local_4a20 * (float)local_14c0;
        fStack_325c = local_4a20._4_4_ * local_14c0._4_4_;
        fStack_3258 = (float)uStack_4a18 * (float)uStack_14b8;
        fStack_3254 = uStack_4a18._4_4_ * uStack_14b8._4_4_;
        fStack_3250 = (float)uStack_4a10 * (float)uStack_14b0;
        fStack_324c = uStack_4a10._4_4_ * uStack_14b0._4_4_;
        fStack_3248 = (float)uStack_4a08 * (float)uStack_14a8;
        fVar79 = local_3260 + fVar79;
        fVar81 = fStack_325c + fVar81;
        fVar82 = fStack_3258 + fVar82;
        fVar83 = fStack_3254 + fVar83;
        fVar84 = fStack_3250 + fVar84;
        fVar85 = fStack_324c + fVar85;
        fVar86 = fStack_3248 + fVar86;
        uStack_4a08._4_4_ = uStack_4a08._4_4_ + uStack_49a8._4_4_;
        local_6260 = CONCAT44(fVar81,fVar79);
        uStack_6258 = CONCAT44(fVar83,fVar82);
        uStack_6250 = CONCAT44(fVar85,fVar84);
        uStack_6248 = CONCAT44(uStack_4a08._4_4_,fVar86);
        local_1060 = (float)local_4a80;
        fStack_105c = local_4a80._4_4_;
        fStack_1058 = (float)uStack_4a78;
        fStack_1054 = uStack_4a78._4_4_;
        fStack_1050 = (float)uStack_4a70;
        fStack_104c = uStack_4a70._4_4_;
        fStack_1048 = (float)uStack_4a68;
        fStack_3204 = uStack_4a68._4_4_;
        local_3220 = (float)local_4a80 * (float)local_1280;
        fStack_321c = local_4a80._4_4_ * local_1280._4_4_;
        fStack_3218 = (float)uStack_4a78 * (float)uStack_1278;
        fStack_3214 = uStack_4a78._4_4_ * uStack_1278._4_4_;
        fStack_3210 = (float)uStack_4a70 * (float)uStack_1270;
        fStack_320c = uStack_4a70._4_4_ * uStack_1270._4_4_;
        fStack_3208 = (float)uStack_4a68 * (float)uStack_1268;
        fVar79 = local_3220 + fVar79;
        fVar81 = fStack_321c + fVar81;
        fVar82 = fStack_3218 + fVar82;
        fVar83 = fStack_3214 + fVar83;
        fVar84 = fStack_3210 + fVar84;
        fVar85 = fStack_320c + fVar85;
        fVar86 = fStack_3208 + fVar86;
        uStack_4a68._4_4_ = uStack_4a68._4_4_ + uStack_4a08._4_4_;
        local_62c0 = CONCAT44(fVar81,fVar79);
        uStack_62b8 = CONCAT44(fVar83,fVar82);
        uStack_62b0 = CONCAT44(fVar85,fVar84);
        uStack_62a8 = CONCAT44(uStack_4a68._4_4_,fVar86);
        local_1020 = (float)local_4ae0;
        fStack_101c = local_4ae0._4_4_;
        fStack_1018 = (float)uStack_4ad8;
        fStack_1014 = uStack_4ad8._4_4_;
        fStack_1010 = (float)uStack_4ad0;
        fStack_100c = uStack_4ad0._4_4_;
        fStack_1008 = (float)uStack_4ac8;
        fStack_31c4 = uStack_4ac8._4_4_;
        local_1040._0_4_ = (float)local_62a0;
        local_1040._4_4_ = (float)((ulong)local_62a0 >> 0x20);
        uStack_1038._0_4_ = (float)uStack_6298;
        uStack_1038._4_4_ = (float)((ulong)uStack_6298 >> 0x20);
        uStack_1030._0_4_ = (float)uStack_6290;
        uStack_1030._4_4_ = (float)((ulong)uStack_6290 >> 0x20);
        uStack_1028._0_4_ = (float)uStack_6288;
        local_31e0 = (float)local_4ae0 * (float)local_1040;
        fStack_31dc = local_4ae0._4_4_ * local_1040._4_4_;
        fStack_31d8 = (float)uStack_4ad8 * (float)uStack_1038;
        fStack_31d4 = uStack_4ad8._4_4_ * uStack_1038._4_4_;
        fStack_31d0 = (float)uStack_4ad0 * (float)uStack_1030;
        fStack_31cc = uStack_4ad0._4_4_ * uStack_1030._4_4_;
        fStack_31c8 = (float)uStack_4ac8 * (float)uStack_1028;
        local_4600 = CONCAT44(fStack_31dc + fVar81,local_31e0 + fVar79);
        uStack_45f8 = CONCAT44(fStack_31d4 + fVar83,fStack_31d8 + fVar82);
        uStack_45f0 = CONCAT44(fStack_31cc + fVar85,fStack_31d0 + fVar84);
        uStack_45e8 = CONCAT44(uStack_4ac8._4_4_ + uStack_4a68._4_4_,fStack_31c8 + fVar86);
        local_45c8 = local_7dc0 + 0x38;
        *(undefined8 *)local_45c8 = local_4600;
        *(undefined8 *)(local_7dc0 + 0x3a) = uStack_45f8;
        *(undefined8 *)(local_7dc0 + 0x3c) = uStack_45f0;
        *(undefined8 *)(local_7dc0 + 0x3e) = uStack_45e8;
        local_7e10 = local_7e10 + 0x40;
        local_7e18 = local_7e18 + 0x40;
        local_7e20 = local_7e20 + 0x40;
        local_7dc0 = local_7dc0 + 0x40;
        local_7f48 = local_7f48 + 8;
        local_6280 = uVar35;
        uStack_6278 = uVar36;
        uStack_6270 = uVar37;
        uStack_6268 = uVar38;
        local_6220 = uVar31;
        uStack_6218 = uVar32;
        uStack_6210 = uVar33;
        uStack_6208 = uVar34;
        local_61c0 = uVar27;
        uStack_61b8 = uVar28;
        uStack_61b0 = uVar29;
        uStack_61a8 = uVar30;
        local_6160 = uVar23;
        uStack_6158 = uVar24;
        uStack_6150 = uVar25;
        uStack_6148 = uVar26;
        local_6100 = uVar19;
        uStack_60f8 = uVar20;
        uStack_60f0 = uVar21;
        uStack_60e8 = uVar22;
        local_60a0 = uVar15;
        uStack_6098 = uVar16;
        uStack_6090 = uVar17;
        uStack_6088 = uVar18;
        local_6040 = uVar11;
        uStack_6038 = uVar12;
        uStack_6030 = uVar13;
        uStack_6028 = uVar14;
        local_5fe0 = uVar7;
        uStack_5fd8 = uVar8;
        uStack_5fd0 = uVar9;
        uStack_5fc8 = uVar10;
        local_5f80 = uVar3;
        uStack_5f78 = uVar4;
        uStack_5f70 = uVar5;
        uStack_5f68 = uVar6;
        local_5f40 = local_6240;
        uStack_5f38 = uStack_6238;
        uStack_5f30 = uStack_6230;
        uStack_5f28 = uStack_6228;
        local_5f20 = uVar35;
        uStack_5f18 = uVar36;
        uStack_5f10 = uVar37;
        uStack_5f08 = uVar38;
        local_5ee0 = local_61e0;
        uStack_5ed8 = uStack_61d8;
        uStack_5ed0 = uStack_61d0;
        uStack_5ec8 = uStack_61c8;
        local_5ec0 = uVar31;
        uStack_5eb8 = uVar32;
        uStack_5eb0 = uVar33;
        uStack_5ea8 = uVar34;
        local_5e60 = uVar27;
        uStack_5e58 = uVar28;
        uStack_5e50 = uVar29;
        uStack_5e48 = uVar30;
        local_5e20 = local_6120;
        uStack_5e18 = uStack_6118;
        uStack_5e10 = uStack_6110;
        uStack_5e08 = uStack_6108;
        local_5e00 = uVar23;
        uStack_5df8 = uVar24;
        uStack_5df0 = uVar25;
        uStack_5de8 = uVar26;
        local_5dc0 = local_60c0;
        uStack_5db8 = uStack_60b8;
        uStack_5db0 = uStack_60b0;
        uStack_5da8 = uStack_60a8;
        local_5da0 = uVar19;
        uStack_5d98 = uVar20;
        uStack_5d90 = uVar21;
        uStack_5d88 = uVar22;
        local_5d40 = uVar15;
        uStack_5d38 = uVar16;
        uStack_5d30 = uVar17;
        uStack_5d28 = uVar18;
        local_5d00 = local_6000;
        uStack_5cf8 = uStack_5ff8;
        uStack_5cf0 = uStack_5ff0;
        uStack_5ce8 = uStack_5fe8;
        local_5ce0 = uVar11;
        uStack_5cd8 = uVar12;
        uStack_5cd0 = uVar13;
        uStack_5cc8 = uVar14;
        local_5ca0 = local_5fa0;
        uStack_5c98 = uStack_5f98;
        uStack_5c90 = uStack_5f90;
        uStack_5c88 = uStack_5f88;
        local_5c80 = uVar7;
        uStack_5c78 = uVar8;
        uStack_5c70 = uVar9;
        uStack_5c68 = uVar10;
        local_5c20 = uVar3;
        uStack_5c18 = uVar4;
        uStack_5c10 = uVar5;
        uStack_5c08 = uVar6;
        local_5be0 = local_61e0;
        uStack_5bd8 = uStack_61d8;
        uStack_5bd0 = uStack_61d0;
        uStack_5bc8 = uStack_61c8;
        local_5bc0 = uVar35;
        uStack_5bb8 = uVar36;
        uStack_5bb0 = uVar37;
        uStack_5ba8 = uVar38;
        local_5b80 = local_5e80;
        uStack_5b78 = uStack_5e78;
        uStack_5b70 = uStack_5e70;
        uStack_5b68 = uStack_5e68;
        local_5b60 = uVar31;
        uStack_5b58 = uVar32;
        uStack_5b50 = uVar33;
        uStack_5b48 = uVar34;
        local_5b00 = uVar27;
        uStack_5af8 = uVar28;
        uStack_5af0 = uVar29;
        uStack_5ae8 = uVar30;
        local_5ac0 = local_60c0;
        uStack_5ab8 = uStack_60b8;
        uStack_5ab0 = uStack_60b0;
        uStack_5aa8 = uStack_60a8;
        local_5aa0 = uVar23;
        uStack_5a98 = uVar24;
        uStack_5a90 = uVar25;
        uStack_5a88 = uVar26;
        local_5a60 = local_5d60;
        uStack_5a58 = uStack_5d58;
        uStack_5a50 = uStack_5d50;
        uStack_5a48 = uStack_5d48;
        local_5a40 = uVar19;
        uStack_5a38 = uVar20;
        uStack_5a30 = uVar21;
        uStack_5a28 = uVar22;
        local_59e0 = uVar15;
        uStack_59d8 = uVar16;
        uStack_59d0 = uVar17;
        uStack_59c8 = uVar18;
        local_59a0 = local_5fa0;
        uStack_5998 = uStack_5f98;
        uStack_5990 = uStack_5f90;
        uStack_5988 = uStack_5f88;
        local_5980 = uVar11;
        uStack_5978 = uVar12;
        uStack_5970 = uVar13;
        uStack_5968 = uVar14;
        local_5940 = local_5c40;
        uStack_5938 = uStack_5c38;
        uStack_5930 = uStack_5c30;
        uStack_5928 = uStack_5c28;
        local_5920 = uVar7;
        uStack_5918 = uVar8;
        uStack_5910 = uVar9;
        uStack_5908 = uVar10;
        local_58c0 = uVar3;
        uStack_58b8 = uVar4;
        uStack_58b0 = uVar5;
        uStack_58a8 = uVar6;
        local_5880 = local_5e80;
        uStack_5878 = uStack_5e78;
        uStack_5870 = uStack_5e70;
        uStack_5868 = uStack_5e68;
        local_5860 = uVar35;
        uStack_5858 = uVar36;
        uStack_5850 = uVar37;
        uStack_5848 = uVar38;
        local_5820 = local_5b20;
        uStack_5818 = uStack_5b18;
        uStack_5810 = uStack_5b10;
        uStack_5808 = uStack_5b08;
        local_5800 = uVar31;
        uStack_57f8 = uVar32;
        uStack_57f0 = uVar33;
        uStack_57e8 = uVar34;
        local_57a0 = uVar27;
        uStack_5798 = uVar28;
        uStack_5790 = uVar29;
        uStack_5788 = uVar30;
        local_5760 = local_5d60;
        uStack_5758 = uStack_5d58;
        uStack_5750 = uStack_5d50;
        uStack_5748 = uStack_5d48;
        local_5740 = uVar23;
        uStack_5738 = uVar24;
        uStack_5730 = uVar25;
        uStack_5728 = uVar26;
        local_5700 = local_5a00;
        uStack_56f8 = uStack_59f8;
        uStack_56f0 = uStack_59f0;
        uStack_56e8 = uStack_59e8;
        local_56e0 = uVar19;
        uStack_56d8 = uVar20;
        uStack_56d0 = uVar21;
        uStack_56c8 = uVar22;
        local_5680 = uVar15;
        uStack_5678 = uVar16;
        uStack_5670 = uVar17;
        uStack_5668 = uVar18;
        local_5640 = local_5c40;
        uStack_5638 = uStack_5c38;
        uStack_5630 = uStack_5c30;
        uStack_5628 = uStack_5c28;
        local_5620 = uVar11;
        uStack_5618 = uVar12;
        uStack_5610 = uVar13;
        uStack_5608 = uVar14;
        local_55e0 = local_58e0;
        uStack_55d8 = uStack_58d8;
        uStack_55d0 = uStack_58d0;
        uStack_55c8 = uStack_58c8;
        local_55c0 = uVar7;
        uStack_55b8 = uVar8;
        uStack_55b0 = uVar9;
        uStack_55a8 = uVar10;
        local_5560 = uVar3;
        uStack_5558 = uVar4;
        uStack_5550 = uVar5;
        uStack_5548 = uVar6;
        local_5520 = local_5b20;
        uStack_5518 = uStack_5b18;
        uStack_5510 = uStack_5b10;
        uStack_5508 = uStack_5b08;
        local_5500 = uVar35;
        uStack_54f8 = uVar36;
        uStack_54f0 = uVar37;
        uStack_54e8 = uVar38;
        local_54c0 = local_57c0;
        uStack_54b8 = uStack_57b8;
        uStack_54b0 = uStack_57b0;
        uStack_54a8 = uStack_57a8;
        local_54a0 = uVar31;
        uStack_5498 = uVar32;
        uStack_5490 = uVar33;
        uStack_5488 = uVar34;
        local_5440 = uVar27;
        uStack_5438 = uVar28;
        uStack_5430 = uVar29;
        uStack_5428 = uVar30;
        local_5400 = local_5a00;
        uStack_53f8 = uStack_59f8;
        uStack_53f0 = uStack_59f0;
        uStack_53e8 = uStack_59e8;
        local_53e0 = uVar23;
        uStack_53d8 = uVar24;
        uStack_53d0 = uVar25;
        uStack_53c8 = uVar26;
        local_53a0 = local_56a0;
        uStack_5398 = uStack_5698;
        uStack_5390 = uStack_5690;
        uStack_5388 = uStack_5688;
        local_5380 = uVar19;
        uStack_5378 = uVar20;
        uStack_5370 = uVar21;
        uStack_5368 = uVar22;
        local_5320 = uVar15;
        uStack_5318 = uVar16;
        uStack_5310 = uVar17;
        uStack_5308 = uVar18;
        local_52e0 = local_58e0;
        uStack_52d8 = uStack_58d8;
        uStack_52d0 = uStack_58d0;
        uStack_52c8 = uStack_58c8;
        local_52c0 = uVar11;
        uStack_52b8 = uVar12;
        uStack_52b0 = uVar13;
        uStack_52a8 = uVar14;
        local_5280 = local_5580;
        uStack_5278 = uStack_5578;
        uStack_5270 = uStack_5570;
        uStack_5268 = uStack_5568;
        local_5260 = uVar7;
        uStack_5258 = uVar8;
        uStack_5250 = uVar9;
        uStack_5248 = uVar10;
        local_5200 = uVar3;
        uStack_51f8 = uVar4;
        uStack_51f0 = uVar5;
        uStack_51e8 = uVar6;
        local_51c0 = local_57c0;
        uStack_51b8 = uStack_57b8;
        uStack_51b0 = uStack_57b0;
        uStack_51a8 = uStack_57a8;
        local_51a0 = uVar35;
        uStack_5198 = uVar36;
        uStack_5190 = uVar37;
        uStack_5188 = uVar38;
        local_5160 = local_5460;
        uStack_5158 = uStack_5458;
        uStack_5150 = uStack_5450;
        uStack_5148 = uStack_5448;
        local_5140 = uVar31;
        uStack_5138 = uVar32;
        uStack_5130 = uVar33;
        uStack_5128 = uVar34;
        local_50e0 = uVar27;
        uStack_50d8 = uVar28;
        uStack_50d0 = uVar29;
        uStack_50c8 = uVar30;
        local_50a0 = local_56a0;
        uStack_5098 = uStack_5698;
        uStack_5090 = uStack_5690;
        uStack_5088 = uStack_5688;
        local_5080 = uVar23;
        uStack_5078 = uVar24;
        uStack_5070 = uVar25;
        uStack_5068 = uVar26;
        local_5040 = local_5340;
        uStack_5038 = uStack_5338;
        uStack_5030 = uStack_5330;
        uStack_5028 = uStack_5328;
        local_5020 = uVar19;
        uStack_5018 = uVar20;
        uStack_5010 = uVar21;
        uStack_5008 = uVar22;
        local_4fc0 = uVar15;
        uStack_4fb8 = uVar16;
        uStack_4fb0 = uVar17;
        uStack_4fa8 = uVar18;
        local_4f80 = local_5580;
        uStack_4f78 = uStack_5578;
        uStack_4f70 = uStack_5570;
        uStack_4f68 = uStack_5568;
        local_4f60 = uVar11;
        uStack_4f58 = uVar12;
        uStack_4f50 = uVar13;
        uStack_4f48 = uVar14;
        local_4f20 = local_5220;
        uStack_4f18 = uStack_5218;
        uStack_4f10 = uStack_5210;
        uStack_4f08 = uStack_5208;
        local_4f00 = uVar7;
        uStack_4ef8 = uVar8;
        uStack_4ef0 = uVar9;
        uStack_4ee8 = uVar10;
        local_4ea0 = uVar3;
        uStack_4e98 = uVar4;
        uStack_4e90 = uVar5;
        uStack_4e88 = uVar6;
        local_4e60 = local_5460;
        uStack_4e58 = uStack_5458;
        uStack_4e50 = uStack_5450;
        uStack_4e48 = uStack_5448;
        local_4e40 = uVar35;
        uStack_4e38 = uVar36;
        uStack_4e30 = uVar37;
        uStack_4e28 = uVar38;
        local_4e00 = local_5100;
        uStack_4df8 = uStack_50f8;
        uStack_4df0 = uStack_50f0;
        uStack_4de8 = uStack_50e8;
        local_4de0 = uVar31;
        uStack_4dd8 = uVar32;
        uStack_4dd0 = uVar33;
        uStack_4dc8 = uVar34;
        local_4d80 = uVar27;
        uStack_4d78 = uVar28;
        uStack_4d70 = uVar29;
        uStack_4d68 = uVar30;
        local_4d40 = local_5340;
        uStack_4d38 = uStack_5338;
        uStack_4d30 = uStack_5330;
        uStack_4d28 = uStack_5328;
        local_4d20 = uVar23;
        uStack_4d18 = uVar24;
        uStack_4d10 = uVar25;
        uStack_4d08 = uVar26;
        local_4ce0 = local_4fe0;
        uStack_4cd8 = uStack_4fd8;
        uStack_4cd0 = uStack_4fd0;
        uStack_4cc8 = uStack_4fc8;
        local_4cc0 = uVar19;
        uStack_4cb8 = uVar20;
        uStack_4cb0 = uVar21;
        uStack_4ca8 = uVar22;
        local_4c60 = uVar15;
        uStack_4c58 = uVar16;
        uStack_4c50 = uVar17;
        uStack_4c48 = uVar18;
        local_4c20 = local_5220;
        uStack_4c18 = uStack_5218;
        uStack_4c10 = uStack_5210;
        uStack_4c08 = uStack_5208;
        local_4c00 = uVar11;
        uStack_4bf8 = uVar12;
        uStack_4bf0 = uVar13;
        uStack_4be8 = uVar14;
        local_4bc0 = local_4ec0;
        uStack_4bb8 = uStack_4eb8;
        uStack_4bb0 = uStack_4eb0;
        uStack_4ba8 = uStack_4ea8;
        local_4ba0 = uVar7;
        uStack_4b98 = uVar8;
        uStack_4b90 = uVar9;
        uStack_4b88 = uVar10;
        local_4b40 = uVar3;
        uStack_4b38 = uVar4;
        uStack_4b30 = uVar5;
        uStack_4b28 = uVar6;
        local_4b00 = local_5100;
        uStack_4af8 = uStack_50f8;
        uStack_4af0 = uStack_50f0;
        uStack_4ae8 = uStack_50e8;
        local_4ae0 = uVar35;
        uStack_4ad8 = uVar36;
        uStack_4ad0 = uVar37;
        uStack_4ac8 = uVar38;
        local_4aa0 = local_4da0;
        uStack_4a98 = uStack_4d98;
        uStack_4a90 = uStack_4d90;
        uStack_4a88 = uStack_4d88;
        local_4a80 = uVar31;
        uStack_4a78 = uVar32;
        uStack_4a70 = uVar33;
        uStack_4a68 = uVar34;
        local_4a20 = uVar27;
        uStack_4a18 = uVar28;
        uStack_4a10 = uVar29;
        uStack_4a08 = uVar30;
        local_49e0 = local_4fe0;
        uStack_49d8 = uStack_4fd8;
        uStack_49d0 = uStack_4fd0;
        uStack_49c8 = uStack_4fc8;
        local_49c0 = uVar23;
        uStack_49b8 = uVar24;
        uStack_49b0 = uVar25;
        uStack_49a8 = uVar26;
        local_4980 = local_4c80;
        uStack_4978 = uStack_4c78;
        uStack_4970 = uStack_4c70;
        uStack_4968 = uStack_4c68;
        local_4960 = uVar19;
        uStack_4958 = uVar20;
        uStack_4950 = uVar21;
        uStack_4948 = uVar22;
        local_4900 = uVar15;
        uStack_48f8 = uVar16;
        uStack_48f0 = uVar17;
        uStack_48e8 = uVar18;
        local_48c0 = local_4ec0;
        uStack_48b8 = uStack_4eb8;
        uStack_48b0 = uStack_4eb0;
        uStack_48a8 = uStack_4ea8;
        local_48a0 = uVar11;
        uStack_4898 = uVar12;
        uStack_4890 = uVar13;
        uStack_4888 = uVar14;
        local_4860 = local_4b60;
        uStack_4858 = uStack_4b58;
        uStack_4850 = uStack_4b50;
        uStack_4848 = uStack_4b48;
        local_4840 = uVar7;
        uStack_4838 = uVar8;
        uStack_4830 = uVar9;
        uStack_4828 = uVar10;
        local_47e0 = uVar3;
        uStack_47d8 = uVar4;
        uStack_47d0 = uVar5;
        uStack_47c8 = uVar6;
        local_43c0 = local_7da0;
        uStack_43b8 = uStack_7d98;
        uStack_43b0 = uStack_7d90;
        uStack_43a8 = uStack_7d88;
        local_4380 = local_4880;
        uStack_4378 = uStack_4878;
        uStack_4370 = uStack_4870;
        uStack_4368 = uStack_4868;
        local_4340 = local_48e0;
        uStack_4338 = uStack_48d8;
        uStack_4330 = uStack_48d0;
        uStack_4328 = uStack_48c8;
        local_4300 = local_4940;
        uStack_42f8 = uStack_4938;
        uStack_42f0 = uStack_4930;
        uStack_42e8 = uStack_4928;
        local_42c0 = local_49a0;
        uStack_42b8 = uStack_4998;
        uStack_42b0 = uStack_4990;
        uStack_42a8 = uStack_4988;
        local_4280 = local_4a00;
        uStack_4278 = uStack_49f8;
        uStack_4270 = uStack_49f0;
        uStack_4268 = uStack_49e8;
        local_4240 = local_4a60;
        uStack_4238 = uStack_4a58;
        uStack_4230 = uStack_4a50;
        uStack_4228 = uStack_4a48;
        local_4200 = local_4ac0;
        uStack_41f8 = uStack_4ab8;
        uStack_41f0 = uStack_4ab0;
        uStack_41e8 = uStack_4aa8;
        local_41c0 = local_4b20;
        uStack_41b8 = uStack_4b18;
        uStack_41b0 = uStack_4b10;
        uStack_41a8 = uStack_4b08;
        local_4140 = local_4be0;
        uStack_4138 = uStack_4bd8;
        uStack_4130 = uStack_4bd0;
        uStack_4128 = uStack_4bc8;
        local_4100 = local_4c40;
        uStack_40f8 = uStack_4c38;
        uStack_40f0 = uStack_4c30;
        uStack_40e8 = uStack_4c28;
        local_40c0 = local_4ca0;
        uStack_40b8 = uStack_4c98;
        uStack_40b0 = uStack_4c90;
        uStack_40a8 = uStack_4c88;
        local_4080 = local_4d00;
        uStack_4078 = uStack_4cf8;
        uStack_4070 = uStack_4cf0;
        uStack_4068 = uStack_4ce8;
        local_4040 = local_4d60;
        uStack_4038 = uStack_4d58;
        uStack_4030 = uStack_4d50;
        uStack_4028 = uStack_4d48;
        local_4000 = local_4dc0;
        uStack_3ff8 = uStack_4db8;
        uStack_3ff0 = uStack_4db0;
        uStack_3fe8 = uStack_4da8;
        local_3fc0 = local_4e20;
        uStack_3fb8 = uStack_4e18;
        uStack_3fb0 = uStack_4e10;
        uStack_3fa8 = uStack_4e08;
        local_3f80 = local_4e80;
        uStack_3f78 = uStack_4e78;
        uStack_3f70 = uStack_4e70;
        uStack_3f68 = uStack_4e68;
        local_3f00 = local_4f40;
        uStack_3ef8 = uStack_4f38;
        uStack_3ef0 = uStack_4f30;
        uStack_3ee8 = uStack_4f28;
        local_3ec0 = local_4fa0;
        uStack_3eb8 = uStack_4f98;
        uStack_3eb0 = uStack_4f90;
        uStack_3ea8 = uStack_4f88;
        local_3e80 = local_5000;
        uStack_3e78 = uStack_4ff8;
        uStack_3e70 = uStack_4ff0;
        uStack_3e68 = uStack_4fe8;
        local_3e40 = local_5060;
        uStack_3e38 = uStack_5058;
        uStack_3e30 = uStack_5050;
        uStack_3e28 = uStack_5048;
        local_3e00 = local_50c0;
        uStack_3df8 = uStack_50b8;
        uStack_3df0 = uStack_50b0;
        uStack_3de8 = uStack_50a8;
        local_3dc0 = local_5120;
        uStack_3db8 = uStack_5118;
        uStack_3db0 = uStack_5110;
        uStack_3da8 = uStack_5108;
        local_3d80 = local_5180;
        uStack_3d78 = uStack_5178;
        uStack_3d70 = uStack_5170;
        uStack_3d68 = uStack_5168;
        local_3d40 = local_51e0;
        uStack_3d38 = uStack_51d8;
        uStack_3d30 = uStack_51d0;
        uStack_3d28 = uStack_51c8;
        local_3cc0 = local_52a0;
        uStack_3cb8 = uStack_5298;
        uStack_3cb0 = uStack_5290;
        uStack_3ca8 = uStack_5288;
        local_3c80 = local_5300;
        uStack_3c78 = uStack_52f8;
        uStack_3c70 = uStack_52f0;
        uStack_3c68 = uStack_52e8;
        local_3c40 = local_5360;
        uStack_3c38 = uStack_5358;
        uStack_3c30 = uStack_5350;
        uStack_3c28 = uStack_5348;
        local_3c00 = local_53c0;
        uStack_3bf8 = uStack_53b8;
        uStack_3bf0 = uStack_53b0;
        uStack_3be8 = uStack_53a8;
        local_3bc0 = local_5420;
        uStack_3bb8 = uStack_5418;
        uStack_3bb0 = uStack_5410;
        uStack_3ba8 = uStack_5408;
        local_3b80 = local_5480;
        uStack_3b78 = uStack_5478;
        uStack_3b70 = uStack_5470;
        uStack_3b68 = uStack_5468;
        local_3b40 = local_54e0;
        uStack_3b38 = uStack_54d8;
        uStack_3b30 = uStack_54d0;
        uStack_3b28 = uStack_54c8;
        local_3b00 = local_5540;
        uStack_3af8 = uStack_5538;
        uStack_3af0 = uStack_5530;
        uStack_3ae8 = uStack_5528;
        local_3a80 = local_5600;
        uStack_3a78 = uStack_55f8;
        uStack_3a70 = uStack_55f0;
        uStack_3a68 = uStack_55e8;
        local_3a40 = local_5660;
        uStack_3a38 = uStack_5658;
        uStack_3a30 = uStack_5650;
        uStack_3a28 = uStack_5648;
        local_3a00 = local_56c0;
        uStack_39f8 = uStack_56b8;
        uStack_39f0 = uStack_56b0;
        uStack_39e8 = uStack_56a8;
        local_39c0 = local_5720;
        uStack_39b8 = uStack_5718;
        uStack_39b0 = uStack_5710;
        uStack_39a8 = uStack_5708;
        local_3980 = local_5780;
        uStack_3978 = uStack_5778;
        uStack_3970 = uStack_5770;
        uStack_3968 = uStack_5768;
        local_3940 = local_57e0;
        uStack_3938 = uStack_57d8;
        uStack_3930 = uStack_57d0;
        uStack_3928 = uStack_57c8;
        local_3900 = local_5840;
        uStack_38f8 = uStack_5838;
        uStack_38f0 = uStack_5830;
        uStack_38e8 = uStack_5828;
        local_38c0 = local_58a0;
        uStack_38b8 = uStack_5898;
        uStack_38b0 = uStack_5890;
        uStack_38a8 = uStack_5888;
        local_3840 = local_5960;
        uStack_3838 = uStack_5958;
        uStack_3830 = uStack_5950;
        uStack_3828 = uStack_5948;
        local_3800 = local_59c0;
        uStack_37f8 = uStack_59b8;
        uStack_37f0 = uStack_59b0;
        uStack_37e8 = uStack_59a8;
        local_37c0 = local_5a20;
        uStack_37b8 = uStack_5a18;
        uStack_37b0 = uStack_5a10;
        uStack_37a8 = uStack_5a08;
        local_3780 = local_5a80;
        uStack_3778 = uStack_5a78;
        uStack_3770 = uStack_5a70;
        uStack_3768 = uStack_5a68;
        local_3740 = local_5ae0;
        uStack_3738 = uStack_5ad8;
        uStack_3730 = uStack_5ad0;
        uStack_3728 = uStack_5ac8;
        local_3700 = local_5b40;
        uStack_36f8 = uStack_5b38;
        uStack_36f0 = uStack_5b30;
        uStack_36e8 = uStack_5b28;
        local_36c0 = local_5ba0;
        uStack_36b8 = uStack_5b98;
        uStack_36b0 = uStack_5b90;
        uStack_36a8 = uStack_5b88;
        local_3680 = local_5c00;
        uStack_3678 = uStack_5bf8;
        uStack_3670 = uStack_5bf0;
        uStack_3668 = uStack_5be8;
        local_3600 = local_5cc0;
        uStack_35f8 = uStack_5cb8;
        uStack_35f0 = uStack_5cb0;
        uStack_35e8 = uStack_5ca8;
        local_35c0 = local_5d20;
        uStack_35b8 = uStack_5d18;
        uStack_35b0 = uStack_5d10;
        uStack_35a8 = uStack_5d08;
        local_3580 = local_5d80;
        uStack_3578 = uStack_5d78;
        uStack_3570 = uStack_5d70;
        uStack_3568 = uStack_5d68;
        local_3540 = local_5de0;
        uStack_3538 = uStack_5dd8;
        uStack_3530 = uStack_5dd0;
        uStack_3528 = uStack_5dc8;
        local_3500 = local_5e40;
        uStack_34f8 = uStack_5e38;
        uStack_34f0 = uStack_5e30;
        uStack_34e8 = uStack_5e28;
        local_34c0 = local_5ea0;
        uStack_34b8 = uStack_5e98;
        uStack_34b0 = uStack_5e90;
        uStack_34a8 = uStack_5e88;
        local_3480 = local_5f00;
        uStack_3478 = uStack_5ef8;
        uStack_3470 = uStack_5ef0;
        uStack_3468 = uStack_5ee8;
        local_3440 = local_5f60;
        uStack_3438 = uStack_5f58;
        uStack_3430 = uStack_5f50;
        uStack_3428 = uStack_5f48;
        local_33c0 = local_6020;
        uStack_33b8 = uStack_6018;
        uStack_33b0 = uStack_6010;
        uStack_33a8 = uStack_6008;
        local_3380 = local_6080;
        uStack_3378 = uStack_6078;
        uStack_3370 = uStack_6070;
        uStack_3368 = uStack_6068;
        local_3340 = local_60e0;
        uStack_3338 = uStack_60d8;
        uStack_3330 = uStack_60d0;
        uStack_3328 = uStack_60c8;
        local_3300 = local_6140;
        uStack_32f8 = uStack_6138;
        uStack_32f0 = uStack_6130;
        uStack_32e8 = uStack_6128;
        local_32c0 = local_61a0;
        uStack_32b8 = uStack_6198;
        uStack_32b0 = uStack_6190;
        uStack_32a8 = uStack_6188;
        local_3280 = local_6200;
        uStack_3278 = uStack_61f8;
        uStack_3270 = uStack_61f0;
        uStack_3268 = uStack_61e8;
        local_3240 = local_6260;
        uStack_3238 = uStack_6258;
        uStack_3230 = uStack_6250;
        uStack_3228 = uStack_6248;
        local_3200 = local_62c0;
        uStack_31f8 = uStack_62b8;
        uStack_31f0 = uStack_62b0;
        uStack_31e8 = uStack_62a8;
        local_2200 = local_4800;
        uStack_21f8 = uStack_47f8;
        uStack_21f0 = uStack_47f0;
        uStack_21e8 = uStack_47e8;
        fStack_21c4 = fStack_4384;
        local_21c0 = local_4b60;
        uStack_21b8 = uStack_4b58;
        uStack_21b0 = uStack_4b50;
        uStack_21a8 = uStack_4b48;
        fStack_2184 = fStack_4344;
        local_2180 = local_4ec0;
        uStack_2178 = uStack_4eb8;
        uStack_2170 = uStack_4eb0;
        uStack_2168 = uStack_4ea8;
        fStack_2144 = fStack_4304;
        local_2140 = local_4920;
        uStack_2138 = uStack_4918;
        uStack_2130 = uStack_4910;
        uStack_2128 = uStack_4908;
        fStack_2104 = fStack_42c4;
        local_2100 = local_4c80;
        uStack_20f8 = uStack_4c78;
        uStack_20f0 = uStack_4c70;
        uStack_20e8 = uStack_4c68;
        fStack_20c4 = fStack_4284;
        local_20c0 = local_4fe0;
        uStack_20b8 = uStack_4fd8;
        uStack_20b0 = uStack_4fd0;
        uStack_20a8 = uStack_4fc8;
        fStack_2084 = fStack_4244;
        local_2080 = local_4a40;
        uStack_2078 = uStack_4a38;
        uStack_2070 = uStack_4a30;
        uStack_2068 = uStack_4a28;
        fStack_2044 = fStack_4204;
        local_2040 = local_4da0;
        uStack_2038 = uStack_4d98;
        uStack_2030 = uStack_4d90;
        uStack_2028 = uStack_4d88;
        fStack_2004 = fStack_41c4;
        local_2000 = local_5100;
        uStack_1ff8 = uStack_50f8;
        uStack_1ff0 = uStack_50f0;
        uStack_1fe8 = uStack_50e8;
        fStack_1fc4 = fStack_4184;
        local_1fc0 = local_4b60;
        uStack_1fb8 = uStack_4b58;
        uStack_1fb0 = uStack_4b50;
        uStack_1fa8 = uStack_4b48;
        fStack_1f84 = fStack_4144;
        local_1f80 = local_4ec0;
        uStack_1f78 = uStack_4eb8;
        uStack_1f70 = uStack_4eb0;
        uStack_1f68 = uStack_4ea8;
        fStack_1f44 = fStack_4104;
        local_1f40 = local_5220;
        uStack_1f38 = uStack_5218;
        uStack_1f30 = uStack_5210;
        uStack_1f28 = uStack_5208;
        fStack_1f04 = fStack_40c4;
        local_1f00 = local_4c80;
        uStack_1ef8 = uStack_4c78;
        uStack_1ef0 = uStack_4c70;
        uStack_1ee8 = uStack_4c68;
        fStack_1ec4 = fStack_4084;
        local_1ec0 = local_4fe0;
        uStack_1eb8 = uStack_4fd8;
        uStack_1eb0 = uStack_4fd0;
        uStack_1ea8 = uStack_4fc8;
        fStack_1e84 = fStack_4044;
        local_1e80 = local_5340;
        uStack_1e78 = uStack_5338;
        uStack_1e70 = uStack_5330;
        uStack_1e68 = uStack_5328;
        fStack_1e44 = fStack_4004;
        local_1e40 = local_4da0;
        uStack_1e38 = uStack_4d98;
        uStack_1e30 = uStack_4d90;
        uStack_1e28 = uStack_4d88;
        fStack_1e04 = fStack_3fc4;
        local_1e00 = local_5100;
        uStack_1df8 = uStack_50f8;
        uStack_1df0 = uStack_50f0;
        uStack_1de8 = uStack_50e8;
        fStack_1dc4 = fStack_3f84;
        local_1dc0 = local_5460;
        uStack_1db8 = uStack_5458;
        uStack_1db0 = uStack_5450;
        uStack_1da8 = uStack_5448;
        fStack_1d84 = fStack_3f44;
        local_1d80 = local_4ec0;
        uStack_1d78 = uStack_4eb8;
        uStack_1d70 = uStack_4eb0;
        uStack_1d68 = uStack_4ea8;
        fStack_1d44 = fStack_3f04;
        local_1d40 = local_5220;
        uStack_1d38 = uStack_5218;
        uStack_1d30 = uStack_5210;
        uStack_1d28 = uStack_5208;
        fStack_1d04 = fStack_3ec4;
        local_1d00 = local_5580;
        uStack_1cf8 = uStack_5578;
        uStack_1cf0 = uStack_5570;
        uStack_1ce8 = uStack_5568;
        fStack_1cc4 = fStack_3e84;
        local_1cc0 = local_4fe0;
        uStack_1cb8 = uStack_4fd8;
        uStack_1cb0 = uStack_4fd0;
        uStack_1ca8 = uStack_4fc8;
        fStack_1c84 = fStack_3e44;
        local_1c80 = local_5340;
        uStack_1c78 = uStack_5338;
        uStack_1c70 = uStack_5330;
        uStack_1c68 = uStack_5328;
        fStack_1c44 = fStack_3e04;
        local_1c40 = local_56a0;
        uStack_1c38 = uStack_5698;
        uStack_1c30 = uStack_5690;
        uStack_1c28 = uStack_5688;
        fStack_1c04 = fStack_3dc4;
        local_1c00 = local_5100;
        uStack_1bf8 = uStack_50f8;
        uStack_1bf0 = uStack_50f0;
        uStack_1be8 = uStack_50e8;
        fStack_1bc4 = fStack_3d84;
        local_1bc0 = local_5460;
        uStack_1bb8 = uStack_5458;
        uStack_1bb0 = uStack_5450;
        uStack_1ba8 = uStack_5448;
        fStack_1b84 = fStack_3d44;
        local_1b80 = local_57c0;
        uStack_1b78 = uStack_57b8;
        uStack_1b70 = uStack_57b0;
        uStack_1b68 = uStack_57a8;
        fStack_1b44 = fStack_3d04;
        local_1b40 = local_5220;
        uStack_1b38 = uStack_5218;
        uStack_1b30 = uStack_5210;
        uStack_1b28 = uStack_5208;
        fStack_1b04 = fStack_3cc4;
        local_1b00 = local_5580;
        uStack_1af8 = uStack_5578;
        uStack_1af0 = uStack_5570;
        uStack_1ae8 = uStack_5568;
        fStack_1ac4 = fStack_3c84;
        local_1ac0 = local_58e0;
        uStack_1ab8 = uStack_58d8;
        uStack_1ab0 = uStack_58d0;
        uStack_1aa8 = uStack_58c8;
        fStack_1a84 = fStack_3c44;
        local_1a80 = local_5340;
        uStack_1a78 = uStack_5338;
        uStack_1a70 = uStack_5330;
        uStack_1a68 = uStack_5328;
        fStack_1a44 = fStack_3c04;
        local_1a40 = local_56a0;
        uStack_1a38 = uStack_5698;
        uStack_1a30 = uStack_5690;
        uStack_1a28 = uStack_5688;
        fStack_1a04 = fStack_3bc4;
        local_1a00 = local_5a00;
        uStack_19f8 = uStack_59f8;
        uStack_19f0 = uStack_59f0;
        uStack_19e8 = uStack_59e8;
        fStack_19c4 = fStack_3b84;
        local_19c0 = local_5460;
        uStack_19b8 = uStack_5458;
        uStack_19b0 = uStack_5450;
        uStack_19a8 = uStack_5448;
        fStack_1984 = fStack_3b44;
        local_1980 = local_57c0;
        uStack_1978 = uStack_57b8;
        uStack_1970 = uStack_57b0;
        uStack_1968 = uStack_57a8;
        fStack_1944 = fStack_3b04;
        local_1940 = local_5b20;
        uStack_1938 = uStack_5b18;
        uStack_1930 = uStack_5b10;
        uStack_1928 = uStack_5b08;
        fStack_1904 = fStack_3ac4;
        local_1900 = local_5580;
        uStack_18f8 = uStack_5578;
        uStack_18f0 = uStack_5570;
        uStack_18e8 = uStack_5568;
        fStack_18c4 = fStack_3a84;
        local_18c0 = local_58e0;
        uStack_18b8 = uStack_58d8;
        uStack_18b0 = uStack_58d0;
        uStack_18a8 = uStack_58c8;
        fStack_1884 = fStack_3a44;
        local_1880 = local_5c40;
        uStack_1878 = uStack_5c38;
        uStack_1870 = uStack_5c30;
        uStack_1868 = uStack_5c28;
        fStack_1844 = fStack_3a04;
        local_1840 = local_56a0;
        uStack_1838 = uStack_5698;
        uStack_1830 = uStack_5690;
        uStack_1828 = uStack_5688;
        fStack_1804 = fStack_39c4;
        local_1800 = local_5a00;
        uStack_17f8 = uStack_59f8;
        uStack_17f0 = uStack_59f0;
        uStack_17e8 = uStack_59e8;
        fStack_17c4 = fStack_3984;
        local_17c0 = local_5d60;
        uStack_17b8 = uStack_5d58;
        uStack_17b0 = uStack_5d50;
        uStack_17a8 = uStack_5d48;
        fStack_1784 = fStack_3944;
        local_1780 = local_57c0;
        uStack_1778 = uStack_57b8;
        uStack_1770 = uStack_57b0;
        uStack_1768 = uStack_57a8;
        fStack_1744 = fStack_3904;
        local_1740 = local_5b20;
        uStack_1738 = uStack_5b18;
        uStack_1730 = uStack_5b10;
        uStack_1728 = uStack_5b08;
        fStack_1704 = fStack_38c4;
        local_1700 = local_5e80;
        uStack_16f8 = uStack_5e78;
        uStack_16f0 = uStack_5e70;
        uStack_16e8 = uStack_5e68;
        fStack_16c4 = fStack_3884;
        local_16c0 = local_58e0;
        uStack_16b8 = uStack_58d8;
        uStack_16b0 = uStack_58d0;
        uStack_16a8 = uStack_58c8;
        fStack_1684 = fStack_3844;
        local_1680 = local_5c40;
        uStack_1678 = uStack_5c38;
        uStack_1670 = uStack_5c30;
        uStack_1668 = uStack_5c28;
        fStack_1644 = fStack_3804;
        local_1640 = local_5fa0;
        uStack_1638 = uStack_5f98;
        uStack_1630 = uStack_5f90;
        uStack_1628 = uStack_5f88;
        fStack_1604 = fStack_37c4;
        local_1600 = local_5a00;
        uStack_15f8 = uStack_59f8;
        uStack_15f0 = uStack_59f0;
        uStack_15e8 = uStack_59e8;
        fStack_15c4 = fStack_3784;
        local_15c0 = local_5d60;
        uStack_15b8 = uStack_5d58;
        uStack_15b0 = uStack_5d50;
        uStack_15a8 = uStack_5d48;
        fStack_1584 = fStack_3744;
        local_1580 = local_60c0;
        uStack_1578 = uStack_60b8;
        uStack_1570 = uStack_60b0;
        uStack_1568 = uStack_60a8;
        fStack_1544 = fStack_3704;
        local_1540 = local_5b20;
        uStack_1538 = uStack_5b18;
        uStack_1530 = uStack_5b10;
        uStack_1528 = uStack_5b08;
        fStack_1504 = fStack_36c4;
        local_1500 = local_5e80;
        uStack_14f8 = uStack_5e78;
        uStack_14f0 = uStack_5e70;
        uStack_14e8 = uStack_5e68;
        fStack_14c4 = fStack_3684;
        local_14c0 = local_61e0;
        uStack_14b8 = uStack_61d8;
        uStack_14b0 = uStack_61d0;
        uStack_14a8 = uStack_61c8;
        fStack_1484 = fStack_3644;
        local_1480 = local_5c40;
        uStack_1478 = uStack_5c38;
        uStack_1470 = uStack_5c30;
        uStack_1468 = uStack_5c28;
        fStack_1444 = fStack_3604;
        local_1440 = local_5fa0;
        uStack_1438 = uStack_5f98;
        uStack_1430 = uStack_5f90;
        uStack_1428 = uStack_5f88;
        fStack_1404 = fStack_35c4;
        local_1400 = local_6000;
        uStack_13f8 = uStack_5ff8;
        uStack_13f0 = uStack_5ff0;
        uStack_13e8 = uStack_5fe8;
        fStack_13c4 = fStack_3584;
        local_13c0 = local_5d60;
        uStack_13b8 = uStack_5d58;
        uStack_13b0 = uStack_5d50;
        uStack_13a8 = uStack_5d48;
        fStack_1384 = fStack_3544;
        local_1380 = local_60c0;
        uStack_1378 = uStack_60b8;
        uStack_1370 = uStack_60b0;
        uStack_1368 = uStack_60a8;
        fStack_1344 = fStack_3504;
        local_1340 = local_6120;
        uStack_1338 = uStack_6118;
        uStack_1330 = uStack_6110;
        uStack_1328 = uStack_6108;
        fStack_1304 = fStack_34c4;
        local_1300 = local_5e80;
        uStack_12f8 = uStack_5e78;
        uStack_12f0 = uStack_5e70;
        uStack_12e8 = uStack_5e68;
        fStack_12c4 = fStack_3484;
        local_12c0 = local_61e0;
        uStack_12b8 = uStack_61d8;
        uStack_12b0 = uStack_61d0;
        uStack_12a8 = uStack_61c8;
        fStack_1284 = fStack_3444;
        local_1280 = local_6240;
        uStack_1278 = uStack_6238;
        uStack_1270 = uStack_6230;
        uStack_1268 = uStack_6228;
        fStack_1244 = fStack_3404;
        local_1240 = local_5fa0;
        uStack_1238 = uStack_5f98;
        uStack_1230 = uStack_5f90;
        uStack_1228 = uStack_5f88;
        fStack_1204 = fStack_33c4;
        local_1200 = local_6000;
        uStack_11f8 = uStack_5ff8;
        uStack_11f0 = uStack_5ff0;
        uStack_11e8 = uStack_5fe8;
        fStack_11c4 = fStack_3384;
        local_11c0 = local_6060;
        uStack_11b8 = uStack_6058;
        uStack_11b0 = uStack_6050;
        uStack_11a8 = uStack_6048;
        fStack_1184 = fStack_3344;
        local_1180 = local_60c0;
        uStack_1178 = uStack_60b8;
        uStack_1170 = uStack_60b0;
        uStack_1168 = uStack_60a8;
        fStack_1144 = fStack_3304;
        local_1140 = local_6120;
        uStack_1138 = uStack_6118;
        uStack_1130 = uStack_6110;
        uStack_1128 = uStack_6108;
        fStack_1104 = fStack_32c4;
        local_1100 = local_6180;
        uStack_10f8 = uStack_6178;
        uStack_10f0 = uStack_6170;
        uStack_10e8 = uStack_6168;
        fStack_10c4 = fStack_3284;
        local_10c0 = local_61e0;
        uStack_10b8 = uStack_61d8;
        uStack_10b0 = uStack_61d0;
        uStack_10a8 = uStack_61c8;
        fStack_1084 = fStack_3244;
        local_1080 = local_6240;
        uStack_1078 = uStack_6238;
        uStack_1070 = uStack_6230;
        uStack_1068 = uStack_6228;
        fStack_1044 = fStack_3204;
        local_1040 = local_62a0;
        uStack_1038 = uStack_6298;
        uStack_1030 = uStack_6290;
        uStack_1028 = uStack_6288;
        fStack_1004 = fStack_31c4;
      }
      for (; local_7f48 + 3 < local_7d0c; local_7f48 = local_7f48 + 4) {
        local_7ba8 = local_7e10;
        local_6300 = *(undefined8 *)local_7e10;
        uStack_62f8 = *(undefined8 *)(local_7e10 + 2);
        uStack_62f0 = *(undefined8 *)(local_7e10 + 4);
        uStack_62e8 = *(undefined8 *)(local_7e10 + 6);
        local_7bb0 = local_7e10 + 8;
        local_6660 = *(undefined8 *)local_7bb0;
        uStack_6658 = *(undefined8 *)(local_7e10 + 10);
        uStack_6650 = *(undefined8 *)(local_7e10 + 0xc);
        uStack_6648 = *(undefined8 *)(local_7e10 + 0xe);
        local_7bb8 = local_7e10 + 0x10;
        local_69c0 = *(undefined8 *)local_7bb8;
        uStack_69b8 = *(undefined8 *)(local_7e10 + 0x12);
        uStack_69b0 = *(undefined8 *)(local_7e10 + 0x14);
        uStack_69a8 = *(undefined8 *)(local_7e10 + 0x16);
        local_7bc0 = local_7e18;
        local_6420 = *(undefined8 *)local_7e18;
        uStack_6418 = *(undefined8 *)(local_7e18 + 2);
        uStack_6410 = *(undefined8 *)(local_7e18 + 4);
        uStack_6408 = *(undefined8 *)(local_7e18 + 6);
        local_7bc8 = local_7e18 + 8;
        local_6780 = *(undefined8 *)local_7bc8;
        uStack_6778 = *(undefined8 *)(local_7e18 + 10);
        uStack_6770 = *(undefined8 *)(local_7e18 + 0xc);
        uStack_6768 = *(undefined8 *)(local_7e18 + 0xe);
        local_7bd0 = local_7e18 + 0x10;
        local_6ae0 = *(undefined8 *)local_7bd0;
        uStack_6ad8 = *(undefined8 *)(local_7e18 + 0x12);
        uStack_6ad0 = *(undefined8 *)(local_7e18 + 0x14);
        uStack_6ac8 = *(undefined8 *)(local_7e18 + 0x16);
        local_7bd8 = local_7e20;
        local_6540 = *(undefined8 *)local_7e20;
        uStack_6538 = *(undefined8 *)(local_7e20 + 2);
        uStack_6530 = *(undefined8 *)(local_7e20 + 4);
        uStack_6528 = *(undefined8 *)(local_7e20 + 6);
        local_7be0 = local_7e20 + 8;
        local_68a0 = *(undefined8 *)local_7be0;
        uStack_6898 = *(undefined8 *)(local_7e20 + 10);
        uStack_6890 = *(undefined8 *)(local_7e20 + 0xc);
        uStack_6888 = *(undefined8 *)(local_7e20 + 0xe);
        local_7be8 = local_7e20 + 0x10;
        local_6c00 = *(undefined8 *)local_7be8;
        uStack_6bf8 = *(undefined8 *)(local_7e20 + 0x12);
        uStack_6bf0 = *(undefined8 *)(local_7e20 + 0x14);
        uStack_6be8 = *(undefined8 *)(local_7e20 + 0x16);
        local_6320 = local_7da0;
        uStack_6318 = uStack_7d98;
        uStack_6310 = uStack_7d90;
        uStack_6308 = uStack_7d88;
        local_fe0 = (float)local_47e0;
        fStack_fdc = local_47e0._4_4_;
        fStack_fd8 = (float)uStack_47d8;
        fStack_fd4 = uStack_47d8._4_4_;
        fStack_fd0 = (float)uStack_47d0;
        fStack_fcc = uStack_47d0._4_4_;
        fStack_fc8 = (float)uStack_47c8;
        fStack_3184 = uStack_47c8._4_4_;
        local_1000._0_4_ = (float)local_6300;
        local_1000._4_4_ = (float)((ulong)local_6300 >> 0x20);
        uStack_ff8._0_4_ = (float)uStack_62f8;
        uStack_ff8._4_4_ = (float)((ulong)uStack_62f8 >> 0x20);
        uStack_ff0._0_4_ = (float)uStack_62f0;
        uStack_ff0._4_4_ = (float)((ulong)uStack_62f0 >> 0x20);
        uStack_fe8._0_4_ = (float)uStack_62e8;
        local_31a0 = (float)local_47e0 * (float)local_1000;
        fStack_319c = local_47e0._4_4_ * local_1000._4_4_;
        fStack_3198 = (float)uStack_47d8 * (float)uStack_ff8;
        fStack_3194 = uStack_47d8._4_4_ * uStack_ff8._4_4_;
        fStack_3190 = (float)uStack_47d0 * (float)uStack_ff0;
        fStack_318c = uStack_47d0._4_4_ * uStack_ff0._4_4_;
        fStack_3188 = (float)uStack_47c8 * (float)uStack_fe8;
        local_31c0 = local_7da0;
        uStack_31b8 = uStack_7d98;
        uStack_31b0 = uStack_7d90;
        uStack_31a8 = uStack_7d88;
        local_6380 = CONCAT44(fStack_319c + local_43c0._4_4_,local_31a0 + (float)local_43c0);
        uStack_6378 = CONCAT44(fStack_3194 + uStack_43b8._4_4_,fStack_3198 + (float)uStack_43b8);
        uStack_6370 = CONCAT44(fStack_318c + uStack_43b0._4_4_,fStack_3190 + (float)uStack_43b0);
        uStack_6368 = CONCAT44(uStack_47c8._4_4_ + uStack_43a8._4_4_,
                               fStack_3188 + (float)uStack_43a8);
        local_fa0 = (float)local_4840;
        fStack_f9c = local_4840._4_4_;
        fStack_f98 = (float)uStack_4838;
        fStack_f94 = uStack_4838._4_4_;
        fStack_f90 = (float)uStack_4830;
        fStack_f8c = uStack_4830._4_4_;
        fStack_f88 = (float)uStack_4828;
        fStack_3144 = uStack_4828._4_4_;
        local_fc0._0_4_ = (float)local_6660;
        local_fc0._4_4_ = (float)((ulong)local_6660 >> 0x20);
        uStack_fb8._0_4_ = (float)uStack_6658;
        uStack_fb8._4_4_ = (float)((ulong)uStack_6658 >> 0x20);
        uStack_fb0._0_4_ = (float)uStack_6650;
        uStack_fb0._4_4_ = (float)((ulong)uStack_6650 >> 0x20);
        uStack_fa8._0_4_ = (float)uStack_6648;
        local_3160 = (float)local_4840 * (float)local_fc0;
        fStack_315c = local_4840._4_4_ * local_fc0._4_4_;
        fStack_3158 = (float)uStack_4838 * (float)uStack_fb8;
        fStack_3154 = uStack_4838._4_4_ * uStack_fb8._4_4_;
        fStack_3150 = (float)uStack_4830 * (float)uStack_fb0;
        fStack_314c = uStack_4830._4_4_ * uStack_fb0._4_4_;
        fStack_3148 = (float)uStack_4828 * (float)uStack_fa8;
        fVar79 = local_3160 + local_31a0 + (float)local_43c0;
        fVar81 = fStack_315c + fStack_319c + local_43c0._4_4_;
        fVar82 = fStack_3158 + fStack_3198 + (float)uStack_43b8;
        fVar83 = fStack_3154 + fStack_3194 + uStack_43b8._4_4_;
        fVar84 = fStack_3150 + fStack_3190 + (float)uStack_43b0;
        fVar85 = fStack_314c + fStack_318c + uStack_43b0._4_4_;
        fVar86 = fStack_3148 + fStack_3188 + (float)uStack_43a8;
        fVar87 = uStack_4828._4_4_ + uStack_47c8._4_4_ + uStack_43a8._4_4_;
        local_63e0 = CONCAT44(fVar81,fVar79);
        uStack_63d8 = CONCAT44(fVar83,fVar82);
        uStack_63d0 = CONCAT44(fVar85,fVar84);
        uStack_63c8 = CONCAT44(fVar87,fVar86);
        local_f60 = (float)local_48a0;
        fStack_f5c = local_48a0._4_4_;
        fStack_f58 = (float)uStack_4898;
        fStack_f54 = uStack_4898._4_4_;
        fStack_f50 = (float)uStack_4890;
        fStack_f4c = uStack_4890._4_4_;
        fStack_f48 = (float)uStack_4888;
        fStack_3104 = uStack_4888._4_4_;
        local_f80._0_4_ = (float)local_69c0;
        local_f80._4_4_ = (float)((ulong)local_69c0 >> 0x20);
        uStack_f78._0_4_ = (float)uStack_69b8;
        uStack_f78._4_4_ = (float)((ulong)uStack_69b8 >> 0x20);
        uStack_f70._0_4_ = (float)uStack_69b0;
        uStack_f70._4_4_ = (float)((ulong)uStack_69b0 >> 0x20);
        uStack_f68._0_4_ = (float)uStack_69a8;
        local_3120 = (float)local_48a0 * (float)local_f80;
        fStack_311c = local_48a0._4_4_ * local_f80._4_4_;
        fStack_3118 = (float)uStack_4898 * (float)uStack_f78;
        fStack_3114 = uStack_4898._4_4_ * uStack_f78._4_4_;
        fStack_3110 = (float)uStack_4890 * (float)uStack_f70;
        fStack_310c = uStack_4890._4_4_ * uStack_f70._4_4_;
        fStack_3108 = (float)uStack_4888 * (float)uStack_f68;
        fVar79 = local_3120 + fVar79;
        fVar81 = fStack_311c + fVar81;
        fVar82 = fStack_3118 + fVar82;
        fVar83 = fStack_3114 + fVar83;
        fVar84 = fStack_3110 + fVar84;
        fVar85 = fStack_310c + fVar85;
        fVar86 = fStack_3108 + fVar86;
        fVar87 = uStack_4888._4_4_ + fVar87;
        local_6440 = CONCAT44(fVar81,fVar79);
        uStack_6438 = CONCAT44(fVar83,fVar82);
        uStack_6430 = CONCAT44(fVar85,fVar84);
        uStack_6428 = CONCAT44(fVar87,fVar86);
        local_f20 = (float)local_4900;
        fStack_f1c = local_4900._4_4_;
        fStack_f18 = (float)uStack_48f8;
        fStack_f14 = uStack_48f8._4_4_;
        fStack_f10 = (float)uStack_48f0;
        fStack_f0c = uStack_48f0._4_4_;
        fStack_f08 = (float)uStack_48e8;
        fStack_30c4 = uStack_48e8._4_4_;
        local_f40._0_4_ = (float)local_6420;
        local_f40._4_4_ = (float)((ulong)local_6420 >> 0x20);
        uStack_f38._0_4_ = (float)uStack_6418;
        uStack_f38._4_4_ = (float)((ulong)uStack_6418 >> 0x20);
        uStack_f30._0_4_ = (float)uStack_6410;
        uStack_f30._4_4_ = (float)((ulong)uStack_6410 >> 0x20);
        uStack_f28._0_4_ = (float)uStack_6408;
        local_30e0 = (float)local_4900 * (float)local_f40;
        fStack_30dc = local_4900._4_4_ * local_f40._4_4_;
        fStack_30d8 = (float)uStack_48f8 * (float)uStack_f38;
        fStack_30d4 = uStack_48f8._4_4_ * uStack_f38._4_4_;
        fStack_30d0 = (float)uStack_48f0 * (float)uStack_f30;
        fStack_30cc = uStack_48f0._4_4_ * uStack_f30._4_4_;
        fStack_30c8 = (float)uStack_48e8 * (float)uStack_f28;
        fVar79 = local_30e0 + fVar79;
        fVar81 = fStack_30dc + fVar81;
        fVar82 = fStack_30d8 + fVar82;
        fVar83 = fStack_30d4 + fVar83;
        fVar84 = fStack_30d0 + fVar84;
        fVar85 = fStack_30cc + fVar85;
        fVar86 = fStack_30c8 + fVar86;
        fVar87 = uStack_48e8._4_4_ + fVar87;
        local_64a0 = CONCAT44(fVar81,fVar79);
        uStack_6498 = CONCAT44(fVar83,fVar82);
        uStack_6490 = CONCAT44(fVar85,fVar84);
        uStack_6488 = CONCAT44(fVar87,fVar86);
        local_ee0 = (float)local_4960;
        fStack_edc = local_4960._4_4_;
        fStack_ed8 = (float)uStack_4958;
        fStack_ed4 = uStack_4958._4_4_;
        fStack_ed0 = (float)uStack_4950;
        fStack_ecc = uStack_4950._4_4_;
        fStack_ec8 = (float)uStack_4948;
        fStack_3084 = uStack_4948._4_4_;
        local_f00._0_4_ = (float)local_6780;
        local_f00._4_4_ = (float)((ulong)local_6780 >> 0x20);
        uStack_ef8._0_4_ = (float)uStack_6778;
        uStack_ef8._4_4_ = (float)((ulong)uStack_6778 >> 0x20);
        uStack_ef0._0_4_ = (float)uStack_6770;
        uStack_ef0._4_4_ = (float)((ulong)uStack_6770 >> 0x20);
        uStack_ee8._0_4_ = (float)uStack_6768;
        local_30a0 = (float)local_4960 * (float)local_f00;
        fStack_309c = local_4960._4_4_ * local_f00._4_4_;
        fStack_3098 = (float)uStack_4958 * (float)uStack_ef8;
        fStack_3094 = uStack_4958._4_4_ * uStack_ef8._4_4_;
        fStack_3090 = (float)uStack_4950 * (float)uStack_ef0;
        fStack_308c = uStack_4950._4_4_ * uStack_ef0._4_4_;
        fStack_3088 = (float)uStack_4948 * (float)uStack_ee8;
        fVar79 = local_30a0 + fVar79;
        fVar81 = fStack_309c + fVar81;
        fVar82 = fStack_3098 + fVar82;
        fVar83 = fStack_3094 + fVar83;
        fVar84 = fStack_3090 + fVar84;
        fVar85 = fStack_308c + fVar85;
        fVar86 = fStack_3088 + fVar86;
        fVar87 = uStack_4948._4_4_ + fVar87;
        local_6500 = CONCAT44(fVar81,fVar79);
        uStack_64f8 = CONCAT44(fVar83,fVar82);
        uStack_64f0 = CONCAT44(fVar85,fVar84);
        uStack_64e8 = CONCAT44(fVar87,fVar86);
        local_ea0 = (float)local_49c0;
        fStack_e9c = local_49c0._4_4_;
        fStack_e98 = (float)uStack_49b8;
        fStack_e94 = uStack_49b8._4_4_;
        fStack_e90 = (float)uStack_49b0;
        fStack_e8c = uStack_49b0._4_4_;
        fStack_e88 = (float)uStack_49a8;
        fStack_3044 = uStack_49a8._4_4_;
        local_ec0._0_4_ = (float)local_6ae0;
        local_ec0._4_4_ = (float)((ulong)local_6ae0 >> 0x20);
        uStack_eb8._0_4_ = (float)uStack_6ad8;
        uStack_eb8._4_4_ = (float)((ulong)uStack_6ad8 >> 0x20);
        uStack_eb0._0_4_ = (float)uStack_6ad0;
        uStack_eb0._4_4_ = (float)((ulong)uStack_6ad0 >> 0x20);
        uStack_ea8._0_4_ = (float)uStack_6ac8;
        local_3060 = (float)local_49c0 * (float)local_ec0;
        fStack_305c = local_49c0._4_4_ * local_ec0._4_4_;
        fStack_3058 = (float)uStack_49b8 * (float)uStack_eb8;
        fStack_3054 = uStack_49b8._4_4_ * uStack_eb8._4_4_;
        fStack_3050 = (float)uStack_49b0 * (float)uStack_eb0;
        fStack_304c = uStack_49b0._4_4_ * uStack_eb0._4_4_;
        fStack_3048 = (float)uStack_49a8 * (float)uStack_ea8;
        fVar79 = local_3060 + fVar79;
        fVar81 = fStack_305c + fVar81;
        fVar82 = fStack_3058 + fVar82;
        fVar83 = fStack_3054 + fVar83;
        fVar84 = fStack_3050 + fVar84;
        fVar85 = fStack_304c + fVar85;
        fVar86 = fStack_3048 + fVar86;
        fVar87 = uStack_49a8._4_4_ + fVar87;
        local_6560 = CONCAT44(fVar81,fVar79);
        uStack_6558 = CONCAT44(fVar83,fVar82);
        uStack_6550 = CONCAT44(fVar85,fVar84);
        uStack_6548 = CONCAT44(fVar87,fVar86);
        local_e60 = (float)local_4a20;
        fStack_e5c = local_4a20._4_4_;
        fStack_e58 = (float)uStack_4a18;
        fStack_e54 = uStack_4a18._4_4_;
        fStack_e50 = (float)uStack_4a10;
        fStack_e4c = uStack_4a10._4_4_;
        fStack_e48 = (float)uStack_4a08;
        fStack_3004 = uStack_4a08._4_4_;
        local_e80._0_4_ = (float)local_6540;
        local_e80._4_4_ = (float)((ulong)local_6540 >> 0x20);
        uStack_e78._0_4_ = (float)uStack_6538;
        uStack_e78._4_4_ = (float)((ulong)uStack_6538 >> 0x20);
        uStack_e70._0_4_ = (float)uStack_6530;
        uStack_e70._4_4_ = (float)((ulong)uStack_6530 >> 0x20);
        uStack_e68._0_4_ = (float)uStack_6528;
        local_3020 = (float)local_4a20 * (float)local_e80;
        fStack_301c = local_4a20._4_4_ * local_e80._4_4_;
        fStack_3018 = (float)uStack_4a18 * (float)uStack_e78;
        fStack_3014 = uStack_4a18._4_4_ * uStack_e78._4_4_;
        fStack_3010 = (float)uStack_4a10 * (float)uStack_e70;
        fStack_300c = uStack_4a10._4_4_ * uStack_e70._4_4_;
        fStack_3008 = (float)uStack_4a08 * (float)uStack_e68;
        fVar79 = local_3020 + fVar79;
        fVar81 = fStack_301c + fVar81;
        fVar82 = fStack_3018 + fVar82;
        fVar83 = fStack_3014 + fVar83;
        fVar84 = fStack_3010 + fVar84;
        fVar85 = fStack_300c + fVar85;
        fVar86 = fStack_3008 + fVar86;
        fVar87 = uStack_4a08._4_4_ + fVar87;
        local_65c0 = CONCAT44(fVar81,fVar79);
        uStack_65b8 = CONCAT44(fVar83,fVar82);
        uStack_65b0 = CONCAT44(fVar85,fVar84);
        uStack_65a8 = CONCAT44(fVar87,fVar86);
        local_e20 = (float)local_4a80;
        fStack_e1c = local_4a80._4_4_;
        fStack_e18 = (float)uStack_4a78;
        fStack_e14 = uStack_4a78._4_4_;
        fStack_e10 = (float)uStack_4a70;
        fStack_e0c = uStack_4a70._4_4_;
        fStack_e08 = (float)uStack_4a68;
        fStack_2fc4 = uStack_4a68._4_4_;
        local_e40._0_4_ = (float)local_68a0;
        local_e40._4_4_ = (float)((ulong)local_68a0 >> 0x20);
        uStack_e38._0_4_ = (float)uStack_6898;
        uStack_e38._4_4_ = (float)((ulong)uStack_6898 >> 0x20);
        uStack_e30._0_4_ = (float)uStack_6890;
        uStack_e30._4_4_ = (float)((ulong)uStack_6890 >> 0x20);
        uStack_e28._0_4_ = (float)uStack_6888;
        local_2fe0 = (float)local_4a80 * (float)local_e40;
        fStack_2fdc = local_4a80._4_4_ * local_e40._4_4_;
        fStack_2fd8 = (float)uStack_4a78 * (float)uStack_e38;
        fStack_2fd4 = uStack_4a78._4_4_ * uStack_e38._4_4_;
        fStack_2fd0 = (float)uStack_4a70 * (float)uStack_e30;
        fStack_2fcc = uStack_4a70._4_4_ * uStack_e30._4_4_;
        fStack_2fc8 = (float)uStack_4a68 * (float)uStack_e28;
        fVar79 = local_2fe0 + fVar79;
        fVar81 = fStack_2fdc + fVar81;
        fVar82 = fStack_2fd8 + fVar82;
        fVar83 = fStack_2fd4 + fVar83;
        fVar84 = fStack_2fd0 + fVar84;
        fVar85 = fStack_2fcc + fVar85;
        fVar86 = fStack_2fc8 + fVar86;
        fVar87 = uStack_4a68._4_4_ + fVar87;
        local_6620 = CONCAT44(fVar81,fVar79);
        uStack_6618 = CONCAT44(fVar83,fVar82);
        uStack_6610 = CONCAT44(fVar85,fVar84);
        uStack_6608 = CONCAT44(fVar87,fVar86);
        local_de0 = (float)local_4ae0;
        fStack_ddc = local_4ae0._4_4_;
        fStack_dd8 = (float)uStack_4ad8;
        fStack_dd4 = uStack_4ad8._4_4_;
        fStack_dd0 = (float)uStack_4ad0;
        fStack_dcc = uStack_4ad0._4_4_;
        fStack_dc8 = (float)uStack_4ac8;
        fStack_2f84 = uStack_4ac8._4_4_;
        local_e00._0_4_ = (float)local_6c00;
        local_e00._4_4_ = (float)((ulong)local_6c00 >> 0x20);
        uStack_df8._0_4_ = (float)uStack_6bf8;
        uStack_df8._4_4_ = (float)((ulong)uStack_6bf8 >> 0x20);
        uStack_df0._0_4_ = (float)uStack_6bf0;
        uStack_df0._4_4_ = (float)((ulong)uStack_6bf0 >> 0x20);
        uStack_de8._0_4_ = (float)uStack_6be8;
        local_2fa0 = (float)local_4ae0 * (float)local_e00;
        fStack_2f9c = local_4ae0._4_4_ * local_e00._4_4_;
        fStack_2f98 = (float)uStack_4ad8 * (float)uStack_df8;
        fStack_2f94 = uStack_4ad8._4_4_ * uStack_df8._4_4_;
        fStack_2f90 = (float)uStack_4ad0 * (float)uStack_df0;
        fStack_2f8c = uStack_4ad0._4_4_ * uStack_df0._4_4_;
        fStack_2f88 = (float)uStack_4ac8 * (float)uStack_de8;
        local_4640 = CONCAT44(fStack_2f9c + fVar81,local_2fa0 + fVar79);
        uStack_4638 = CONCAT44(fStack_2f94 + fVar83,fStack_2f98 + fVar82);
        uStack_4630 = CONCAT44(fStack_2f8c + fVar85,fStack_2f90 + fVar84);
        uStack_4628 = CONCAT44(uStack_4ac8._4_4_ + fVar87,fStack_2f88 + fVar86);
        local_7bf0 = local_7e10 + 0x18;
        local_6d20 = *(undefined8 *)local_7bf0;
        uStack_6d18 = *(undefined8 *)(local_7e10 + 0x1a);
        uStack_6d10 = *(undefined8 *)(local_7e10 + 0x1c);
        uStack_6d08 = *(undefined8 *)(local_7e10 + 0x1e);
        local_7bf8 = local_7e18 + 0x18;
        local_6e40 = *(undefined8 *)local_7bf8;
        uStack_6e38 = *(undefined8 *)(local_7e18 + 0x1a);
        uStack_6e30 = *(undefined8 *)(local_7e18 + 0x1c);
        uStack_6e28 = *(undefined8 *)(local_7e18 + 0x1e);
        local_7c00 = local_7e20 + 0x18;
        local_6f60 = *(undefined8 *)local_7c00;
        uStack_6f58 = *(undefined8 *)(local_7e20 + 0x1a);
        uStack_6f50 = *(undefined8 *)(local_7e20 + 0x1c);
        uStack_6f48 = *(undefined8 *)(local_7e20 + 0x1e);
        local_4608 = local_7dc0;
        *(undefined8 *)local_7dc0 = local_4640;
        *(undefined8 *)(local_7dc0 + 2) = uStack_4638;
        *(undefined8 *)(local_7dc0 + 4) = uStack_4630;
        *(undefined8 *)(local_7dc0 + 6) = uStack_4628;
        local_6680 = local_7da0;
        uStack_6678 = uStack_7d98;
        uStack_6670 = uStack_7d90;
        uStack_6668 = uStack_7d88;
        local_da0 = (float)local_47e0;
        fStack_d9c = local_47e0._4_4_;
        fStack_d98 = (float)uStack_47d8;
        fStack_d94 = uStack_47d8._4_4_;
        fStack_d90 = (float)uStack_47d0;
        fStack_d8c = uStack_47d0._4_4_;
        fStack_d88 = (float)uStack_47c8;
        fStack_2f44 = uStack_47c8._4_4_;
        local_2f60 = (float)local_47e0 * (float)local_fc0;
        fStack_2f5c = local_47e0._4_4_ * local_fc0._4_4_;
        fStack_2f58 = (float)uStack_47d8 * (float)uStack_fb8;
        fStack_2f54 = uStack_47d8._4_4_ * uStack_fb8._4_4_;
        fStack_2f50 = (float)uStack_47d0 * (float)uStack_fb0;
        fStack_2f4c = uStack_47d0._4_4_ * uStack_fb0._4_4_;
        fStack_2f48 = (float)uStack_47c8 * (float)uStack_fa8;
        local_2f80 = local_7da0;
        uStack_2f78 = uStack_7d98;
        uStack_2f70 = uStack_7d90;
        uStack_2f68 = uStack_7d88;
        local_66e0 = CONCAT44(fStack_2f5c + local_43c0._4_4_,local_2f60 + (float)local_43c0);
        uStack_66d8 = CONCAT44(fStack_2f54 + uStack_43b8._4_4_,fStack_2f58 + (float)uStack_43b8);
        uStack_66d0 = CONCAT44(fStack_2f4c + uStack_43b0._4_4_,fStack_2f50 + (float)uStack_43b0);
        uStack_66c8 = CONCAT44(uStack_47c8._4_4_ + uStack_43a8._4_4_,
                               fStack_2f48 + (float)uStack_43a8);
        local_d60 = (float)local_4840;
        fStack_d5c = local_4840._4_4_;
        fStack_d58 = (float)uStack_4838;
        fStack_d54 = uStack_4838._4_4_;
        fStack_d50 = (float)uStack_4830;
        fStack_d4c = uStack_4830._4_4_;
        fStack_d48 = (float)uStack_4828;
        fStack_2f04 = uStack_4828._4_4_;
        local_2f20 = (float)local_4840 * (float)local_f80;
        fStack_2f1c = local_4840._4_4_ * local_f80._4_4_;
        fStack_2f18 = (float)uStack_4838 * (float)uStack_f78;
        fStack_2f14 = uStack_4838._4_4_ * uStack_f78._4_4_;
        fStack_2f10 = (float)uStack_4830 * (float)uStack_f70;
        fStack_2f0c = uStack_4830._4_4_ * uStack_f70._4_4_;
        fStack_2f08 = (float)uStack_4828 * (float)uStack_f68;
        fVar79 = local_2f20 + local_2f60 + (float)local_43c0;
        fVar81 = fStack_2f1c + fStack_2f5c + local_43c0._4_4_;
        fVar82 = fStack_2f18 + fStack_2f58 + (float)uStack_43b8;
        fVar83 = fStack_2f14 + fStack_2f54 + uStack_43b8._4_4_;
        fVar84 = fStack_2f10 + fStack_2f50 + (float)uStack_43b0;
        fVar85 = fStack_2f0c + fStack_2f4c + uStack_43b0._4_4_;
        fVar86 = fStack_2f08 + fStack_2f48 + (float)uStack_43a8;
        fVar87 = uStack_4828._4_4_ + uStack_47c8._4_4_ + uStack_43a8._4_4_;
        local_6740 = CONCAT44(fVar81,fVar79);
        uStack_6738 = CONCAT44(fVar83,fVar82);
        uStack_6730 = CONCAT44(fVar85,fVar84);
        uStack_6728 = CONCAT44(fVar87,fVar86);
        local_d20 = (float)local_48a0;
        fStack_d1c = local_48a0._4_4_;
        fStack_d18 = (float)uStack_4898;
        fStack_d14 = uStack_4898._4_4_;
        fStack_d10 = (float)uStack_4890;
        fStack_d0c = uStack_4890._4_4_;
        fStack_d08 = (float)uStack_4888;
        fStack_2ec4 = uStack_4888._4_4_;
        local_d40._0_4_ = (float)local_6d20;
        local_d40._4_4_ = (float)((ulong)local_6d20 >> 0x20);
        uStack_d38._0_4_ = (float)uStack_6d18;
        uStack_d38._4_4_ = (float)((ulong)uStack_6d18 >> 0x20);
        uStack_d30._0_4_ = (float)uStack_6d10;
        uStack_d30._4_4_ = (float)((ulong)uStack_6d10 >> 0x20);
        uStack_d28._0_4_ = (float)uStack_6d08;
        local_2ee0 = (float)local_48a0 * (float)local_d40;
        fStack_2edc = local_48a0._4_4_ * local_d40._4_4_;
        fStack_2ed8 = (float)uStack_4898 * (float)uStack_d38;
        fStack_2ed4 = uStack_4898._4_4_ * uStack_d38._4_4_;
        fStack_2ed0 = (float)uStack_4890 * (float)uStack_d30;
        fStack_2ecc = uStack_4890._4_4_ * uStack_d30._4_4_;
        fStack_2ec8 = (float)uStack_4888 * (float)uStack_d28;
        fVar79 = local_2ee0 + fVar79;
        fVar81 = fStack_2edc + fVar81;
        fVar82 = fStack_2ed8 + fVar82;
        fVar83 = fStack_2ed4 + fVar83;
        fVar84 = fStack_2ed0 + fVar84;
        fVar85 = fStack_2ecc + fVar85;
        fVar86 = fStack_2ec8 + fVar86;
        fVar87 = uStack_4888._4_4_ + fVar87;
        local_67a0 = CONCAT44(fVar81,fVar79);
        uStack_6798 = CONCAT44(fVar83,fVar82);
        uStack_6790 = CONCAT44(fVar85,fVar84);
        uStack_6788 = CONCAT44(fVar87,fVar86);
        local_ce0 = (float)local_4900;
        fStack_cdc = local_4900._4_4_;
        fStack_cd8 = (float)uStack_48f8;
        fStack_cd4 = uStack_48f8._4_4_;
        fStack_cd0 = (float)uStack_48f0;
        fStack_ccc = uStack_48f0._4_4_;
        fStack_cc8 = (float)uStack_48e8;
        fStack_2e84 = uStack_48e8._4_4_;
        local_2ea0 = (float)local_4900 * (float)local_f00;
        fStack_2e9c = local_4900._4_4_ * local_f00._4_4_;
        fStack_2e98 = (float)uStack_48f8 * (float)uStack_ef8;
        fStack_2e94 = uStack_48f8._4_4_ * uStack_ef8._4_4_;
        fStack_2e90 = (float)uStack_48f0 * (float)uStack_ef0;
        fStack_2e8c = uStack_48f0._4_4_ * uStack_ef0._4_4_;
        fStack_2e88 = (float)uStack_48e8 * (float)uStack_ee8;
        fVar79 = local_2ea0 + fVar79;
        fVar81 = fStack_2e9c + fVar81;
        fVar82 = fStack_2e98 + fVar82;
        fVar83 = fStack_2e94 + fVar83;
        fVar84 = fStack_2e90 + fVar84;
        fVar85 = fStack_2e8c + fVar85;
        fVar86 = fStack_2e88 + fVar86;
        fVar87 = uStack_48e8._4_4_ + fVar87;
        local_6800 = CONCAT44(fVar81,fVar79);
        uStack_67f8 = CONCAT44(fVar83,fVar82);
        uStack_67f0 = CONCAT44(fVar85,fVar84);
        uStack_67e8 = CONCAT44(fVar87,fVar86);
        local_ca0 = (float)local_4960;
        fStack_c9c = local_4960._4_4_;
        fStack_c98 = (float)uStack_4958;
        fStack_c94 = uStack_4958._4_4_;
        fStack_c90 = (float)uStack_4950;
        fStack_c8c = uStack_4950._4_4_;
        fStack_c88 = (float)uStack_4948;
        fStack_2e44 = uStack_4948._4_4_;
        local_2e60 = (float)local_4960 * (float)local_ec0;
        fStack_2e5c = local_4960._4_4_ * local_ec0._4_4_;
        fStack_2e58 = (float)uStack_4958 * (float)uStack_eb8;
        fStack_2e54 = uStack_4958._4_4_ * uStack_eb8._4_4_;
        fStack_2e50 = (float)uStack_4950 * (float)uStack_eb0;
        fStack_2e4c = uStack_4950._4_4_ * uStack_eb0._4_4_;
        fStack_2e48 = (float)uStack_4948 * (float)uStack_ea8;
        fVar79 = local_2e60 + fVar79;
        fVar81 = fStack_2e5c + fVar81;
        fVar82 = fStack_2e58 + fVar82;
        fVar83 = fStack_2e54 + fVar83;
        fVar84 = fStack_2e50 + fVar84;
        fVar85 = fStack_2e4c + fVar85;
        fVar86 = fStack_2e48 + fVar86;
        fVar87 = uStack_4948._4_4_ + fVar87;
        local_6860 = CONCAT44(fVar81,fVar79);
        uStack_6858 = CONCAT44(fVar83,fVar82);
        uStack_6850 = CONCAT44(fVar85,fVar84);
        uStack_6848 = CONCAT44(fVar87,fVar86);
        local_c60 = (float)local_49c0;
        fStack_c5c = local_49c0._4_4_;
        fStack_c58 = (float)uStack_49b8;
        fStack_c54 = uStack_49b8._4_4_;
        fStack_c50 = (float)uStack_49b0;
        fStack_c4c = uStack_49b0._4_4_;
        fStack_c48 = (float)uStack_49a8;
        fStack_2e04 = uStack_49a8._4_4_;
        local_c80._0_4_ = (float)local_6e40;
        local_c80._4_4_ = (float)((ulong)local_6e40 >> 0x20);
        uStack_c78._0_4_ = (float)uStack_6e38;
        uStack_c78._4_4_ = (float)((ulong)uStack_6e38 >> 0x20);
        uStack_c70._0_4_ = (float)uStack_6e30;
        uStack_c70._4_4_ = (float)((ulong)uStack_6e30 >> 0x20);
        uStack_c68._0_4_ = (float)uStack_6e28;
        local_2e20 = (float)local_49c0 * (float)local_c80;
        fStack_2e1c = local_49c0._4_4_ * local_c80._4_4_;
        fStack_2e18 = (float)uStack_49b8 * (float)uStack_c78;
        fStack_2e14 = uStack_49b8._4_4_ * uStack_c78._4_4_;
        fStack_2e10 = (float)uStack_49b0 * (float)uStack_c70;
        fStack_2e0c = uStack_49b0._4_4_ * uStack_c70._4_4_;
        fStack_2e08 = (float)uStack_49a8 * (float)uStack_c68;
        fVar79 = local_2e20 + fVar79;
        fVar81 = fStack_2e1c + fVar81;
        fVar82 = fStack_2e18 + fVar82;
        fVar83 = fStack_2e14 + fVar83;
        fVar84 = fStack_2e10 + fVar84;
        fVar85 = fStack_2e0c + fVar85;
        fVar86 = fStack_2e08 + fVar86;
        fVar87 = uStack_49a8._4_4_ + fVar87;
        local_68c0 = CONCAT44(fVar81,fVar79);
        uStack_68b8 = CONCAT44(fVar83,fVar82);
        uStack_68b0 = CONCAT44(fVar85,fVar84);
        uStack_68a8 = CONCAT44(fVar87,fVar86);
        local_c20 = (float)local_4a20;
        fStack_c1c = local_4a20._4_4_;
        fStack_c18 = (float)uStack_4a18;
        fStack_c14 = uStack_4a18._4_4_;
        fStack_c10 = (float)uStack_4a10;
        fStack_c0c = uStack_4a10._4_4_;
        fStack_c08 = (float)uStack_4a08;
        fStack_2dc4 = uStack_4a08._4_4_;
        local_2de0 = (float)local_4a20 * (float)local_e40;
        fStack_2ddc = local_4a20._4_4_ * local_e40._4_4_;
        fStack_2dd8 = (float)uStack_4a18 * (float)uStack_e38;
        fStack_2dd4 = uStack_4a18._4_4_ * uStack_e38._4_4_;
        fStack_2dd0 = (float)uStack_4a10 * (float)uStack_e30;
        fStack_2dcc = uStack_4a10._4_4_ * uStack_e30._4_4_;
        fStack_2dc8 = (float)uStack_4a08 * (float)uStack_e28;
        fVar79 = local_2de0 + fVar79;
        fVar81 = fStack_2ddc + fVar81;
        fVar82 = fStack_2dd8 + fVar82;
        fVar83 = fStack_2dd4 + fVar83;
        fVar84 = fStack_2dd0 + fVar84;
        fVar85 = fStack_2dcc + fVar85;
        fVar86 = fStack_2dc8 + fVar86;
        fVar87 = uStack_4a08._4_4_ + fVar87;
        local_6920 = CONCAT44(fVar81,fVar79);
        uStack_6918 = CONCAT44(fVar83,fVar82);
        uStack_6910 = CONCAT44(fVar85,fVar84);
        uStack_6908 = CONCAT44(fVar87,fVar86);
        local_be0 = (float)local_4a80;
        fStack_bdc = local_4a80._4_4_;
        fStack_bd8 = (float)uStack_4a78;
        fStack_bd4 = uStack_4a78._4_4_;
        fStack_bd0 = (float)uStack_4a70;
        fStack_bcc = uStack_4a70._4_4_;
        fStack_bc8 = (float)uStack_4a68;
        fStack_2d84 = uStack_4a68._4_4_;
        local_2da0 = (float)local_4a80 * (float)local_e00;
        fStack_2d9c = local_4a80._4_4_ * local_e00._4_4_;
        fStack_2d98 = (float)uStack_4a78 * (float)uStack_df8;
        fStack_2d94 = uStack_4a78._4_4_ * uStack_df8._4_4_;
        fStack_2d90 = (float)uStack_4a70 * (float)uStack_df0;
        fStack_2d8c = uStack_4a70._4_4_ * uStack_df0._4_4_;
        fStack_2d88 = (float)uStack_4a68 * (float)uStack_de8;
        fVar79 = local_2da0 + fVar79;
        fVar81 = fStack_2d9c + fVar81;
        fVar82 = fStack_2d98 + fVar82;
        fVar83 = fStack_2d94 + fVar83;
        fVar84 = fStack_2d90 + fVar84;
        fVar85 = fStack_2d8c + fVar85;
        fVar86 = fStack_2d88 + fVar86;
        fVar87 = uStack_4a68._4_4_ + fVar87;
        local_6980 = CONCAT44(fVar81,fVar79);
        uStack_6978 = CONCAT44(fVar83,fVar82);
        uStack_6970 = CONCAT44(fVar85,fVar84);
        uStack_6968 = CONCAT44(fVar87,fVar86);
        local_ba0 = (float)local_4ae0;
        fStack_b9c = local_4ae0._4_4_;
        fStack_b98 = (float)uStack_4ad8;
        fStack_b94 = uStack_4ad8._4_4_;
        fStack_b90 = (float)uStack_4ad0;
        fStack_b8c = uStack_4ad0._4_4_;
        fStack_b88 = (float)uStack_4ac8;
        fStack_2d44 = uStack_4ac8._4_4_;
        local_bc0._0_4_ = (float)local_6f60;
        local_bc0._4_4_ = (float)((ulong)local_6f60 >> 0x20);
        uStack_bb8._0_4_ = (float)uStack_6f58;
        uStack_bb8._4_4_ = (float)((ulong)uStack_6f58 >> 0x20);
        uStack_bb0._0_4_ = (float)uStack_6f50;
        uStack_bb0._4_4_ = (float)((ulong)uStack_6f50 >> 0x20);
        uStack_ba8._0_4_ = (float)uStack_6f48;
        local_2d60 = (float)local_4ae0 * (float)local_bc0;
        fStack_2d5c = local_4ae0._4_4_ * local_bc0._4_4_;
        fStack_2d58 = (float)uStack_4ad8 * (float)uStack_bb8;
        fStack_2d54 = uStack_4ad8._4_4_ * uStack_bb8._4_4_;
        fStack_2d50 = (float)uStack_4ad0 * (float)uStack_bb0;
        fStack_2d4c = uStack_4ad0._4_4_ * uStack_bb0._4_4_;
        fStack_2d48 = (float)uStack_4ac8 * (float)uStack_ba8;
        local_4680 = CONCAT44(fStack_2d5c + fVar81,local_2d60 + fVar79);
        uStack_4678 = CONCAT44(fStack_2d54 + fVar83,fStack_2d58 + fVar82);
        uStack_4670 = CONCAT44(fStack_2d4c + fVar85,fStack_2d50 + fVar84);
        uStack_4668 = CONCAT44(uStack_4ac8._4_4_ + fVar87,fStack_2d48 + fVar86);
        local_7c08 = local_7e10 + 0x20;
        local_6d80 = *(undefined8 *)local_7c08;
        uStack_6d78 = *(undefined8 *)(local_7e10 + 0x22);
        uStack_6d70 = *(undefined8 *)(local_7e10 + 0x24);
        uStack_6d68 = *(undefined8 *)(local_7e10 + 0x26);
        local_7c10 = local_7e18 + 0x20;
        local_6ea0 = *(undefined8 *)local_7c10;
        uStack_6e98 = *(undefined8 *)(local_7e18 + 0x22);
        uStack_6e90 = *(undefined8 *)(local_7e18 + 0x24);
        uStack_6e88 = *(undefined8 *)(local_7e18 + 0x26);
        local_7c18 = local_7e20 + 0x20;
        local_6fc0 = *(undefined8 *)local_7c18;
        uStack_6fb8 = *(undefined8 *)(local_7e20 + 0x22);
        uStack_6fb0 = *(undefined8 *)(local_7e20 + 0x24);
        uStack_6fa8 = *(undefined8 *)(local_7e20 + 0x26);
        local_4648 = local_7dc0 + 8;
        *(undefined8 *)local_4648 = local_4680;
        *(undefined8 *)(local_7dc0 + 10) = uStack_4678;
        *(undefined8 *)(local_7dc0 + 0xc) = uStack_4670;
        *(undefined8 *)(local_7dc0 + 0xe) = uStack_4668;
        local_69e0 = local_7da0;
        uStack_69d8 = uStack_7d98;
        uStack_69d0 = uStack_7d90;
        uStack_69c8 = uStack_7d88;
        local_b60 = (float)local_47e0;
        fStack_b5c = local_47e0._4_4_;
        fStack_b58 = (float)uStack_47d8;
        fStack_b54 = uStack_47d8._4_4_;
        fStack_b50 = (float)uStack_47d0;
        fStack_b4c = uStack_47d0._4_4_;
        fStack_b48 = (float)uStack_47c8;
        fStack_2d04 = uStack_47c8._4_4_;
        local_2d20 = (float)local_47e0 * (float)local_f80;
        fStack_2d1c = local_47e0._4_4_ * local_f80._4_4_;
        fStack_2d18 = (float)uStack_47d8 * (float)uStack_f78;
        fStack_2d14 = uStack_47d8._4_4_ * uStack_f78._4_4_;
        fStack_2d10 = (float)uStack_47d0 * (float)uStack_f70;
        fStack_2d0c = uStack_47d0._4_4_ * uStack_f70._4_4_;
        fStack_2d08 = (float)uStack_47c8 * (float)uStack_f68;
        local_2d40 = local_7da0;
        uStack_2d38 = uStack_7d98;
        uStack_2d30 = uStack_7d90;
        uStack_2d28 = uStack_7d88;
        local_6a40 = CONCAT44(fStack_2d1c + local_43c0._4_4_,local_2d20 + (float)local_43c0);
        uStack_6a38 = CONCAT44(fStack_2d14 + uStack_43b8._4_4_,fStack_2d18 + (float)uStack_43b8);
        uStack_6a30 = CONCAT44(fStack_2d0c + uStack_43b0._4_4_,fStack_2d10 + (float)uStack_43b0);
        uStack_6a28 = CONCAT44(uStack_47c8._4_4_ + uStack_43a8._4_4_,
                               fStack_2d08 + (float)uStack_43a8);
        local_b20 = (float)local_4840;
        fStack_b1c = local_4840._4_4_;
        fStack_b18 = (float)uStack_4838;
        fStack_b14 = uStack_4838._4_4_;
        fStack_b10 = (float)uStack_4830;
        fStack_b0c = uStack_4830._4_4_;
        fStack_b08 = (float)uStack_4828;
        fStack_2cc4 = uStack_4828._4_4_;
        local_2ce0 = (float)local_4840 * (float)local_d40;
        fStack_2cdc = local_4840._4_4_ * local_d40._4_4_;
        fStack_2cd8 = (float)uStack_4838 * (float)uStack_d38;
        fStack_2cd4 = uStack_4838._4_4_ * uStack_d38._4_4_;
        fStack_2cd0 = (float)uStack_4830 * (float)uStack_d30;
        fStack_2ccc = uStack_4830._4_4_ * uStack_d30._4_4_;
        fStack_2cc8 = (float)uStack_4828 * (float)uStack_d28;
        fVar79 = local_2ce0 + local_2d20 + (float)local_43c0;
        fVar81 = fStack_2cdc + fStack_2d1c + local_43c0._4_4_;
        fVar82 = fStack_2cd8 + fStack_2d18 + (float)uStack_43b8;
        fVar83 = fStack_2cd4 + fStack_2d14 + uStack_43b8._4_4_;
        fVar84 = fStack_2cd0 + fStack_2d10 + (float)uStack_43b0;
        fVar85 = fStack_2ccc + fStack_2d0c + uStack_43b0._4_4_;
        fVar86 = fStack_2cc8 + fStack_2d08 + (float)uStack_43a8;
        fVar87 = uStack_4828._4_4_ + uStack_47c8._4_4_ + uStack_43a8._4_4_;
        local_6aa0 = CONCAT44(fVar81,fVar79);
        uStack_6a98 = CONCAT44(fVar83,fVar82);
        uStack_6a90 = CONCAT44(fVar85,fVar84);
        uStack_6a88 = CONCAT44(fVar87,fVar86);
        local_ae0 = (float)local_48a0;
        fStack_adc = local_48a0._4_4_;
        fStack_ad8 = (float)uStack_4898;
        fStack_ad4 = uStack_4898._4_4_;
        fStack_ad0 = (float)uStack_4890;
        fStack_acc = uStack_4890._4_4_;
        fStack_ac8 = (float)uStack_4888;
        fStack_2c84 = uStack_4888._4_4_;
        local_b00._0_4_ = (float)local_6d80;
        local_b00._4_4_ = (float)((ulong)local_6d80 >> 0x20);
        uStack_af8._0_4_ = (float)uStack_6d78;
        uStack_af8._4_4_ = (float)((ulong)uStack_6d78 >> 0x20);
        uStack_af0._0_4_ = (float)uStack_6d70;
        uStack_af0._4_4_ = (float)((ulong)uStack_6d70 >> 0x20);
        uStack_ae8._0_4_ = (float)uStack_6d68;
        local_2ca0 = (float)local_48a0 * (float)local_b00;
        fStack_2c9c = local_48a0._4_4_ * local_b00._4_4_;
        fStack_2c98 = (float)uStack_4898 * (float)uStack_af8;
        fStack_2c94 = uStack_4898._4_4_ * uStack_af8._4_4_;
        fStack_2c90 = (float)uStack_4890 * (float)uStack_af0;
        fStack_2c8c = uStack_4890._4_4_ * uStack_af0._4_4_;
        fStack_2c88 = (float)uStack_4888 * (float)uStack_ae8;
        fVar79 = local_2ca0 + fVar79;
        fVar81 = fStack_2c9c + fVar81;
        fVar82 = fStack_2c98 + fVar82;
        fVar83 = fStack_2c94 + fVar83;
        fVar84 = fStack_2c90 + fVar84;
        fVar85 = fStack_2c8c + fVar85;
        fVar86 = fStack_2c88 + fVar86;
        fVar87 = uStack_4888._4_4_ + fVar87;
        local_6b00 = CONCAT44(fVar81,fVar79);
        uStack_6af8 = CONCAT44(fVar83,fVar82);
        uStack_6af0 = CONCAT44(fVar85,fVar84);
        uStack_6ae8 = CONCAT44(fVar87,fVar86);
        local_aa0 = (float)local_4900;
        fStack_a9c = local_4900._4_4_;
        fStack_a98 = (float)uStack_48f8;
        fStack_a94 = uStack_48f8._4_4_;
        fStack_a90 = (float)uStack_48f0;
        fStack_a8c = uStack_48f0._4_4_;
        fStack_a88 = (float)uStack_48e8;
        fStack_2c44 = uStack_48e8._4_4_;
        local_2c60 = (float)local_4900 * (float)local_ec0;
        fStack_2c5c = local_4900._4_4_ * local_ec0._4_4_;
        fStack_2c58 = (float)uStack_48f8 * (float)uStack_eb8;
        fStack_2c54 = uStack_48f8._4_4_ * uStack_eb8._4_4_;
        fStack_2c50 = (float)uStack_48f0 * (float)uStack_eb0;
        fStack_2c4c = uStack_48f0._4_4_ * uStack_eb0._4_4_;
        fStack_2c48 = (float)uStack_48e8 * (float)uStack_ea8;
        fVar79 = local_2c60 + fVar79;
        fVar81 = fStack_2c5c + fVar81;
        fVar82 = fStack_2c58 + fVar82;
        fVar83 = fStack_2c54 + fVar83;
        fVar84 = fStack_2c50 + fVar84;
        fVar85 = fStack_2c4c + fVar85;
        fVar86 = fStack_2c48 + fVar86;
        fVar87 = uStack_48e8._4_4_ + fVar87;
        local_6b60 = CONCAT44(fVar81,fVar79);
        uStack_6b58 = CONCAT44(fVar83,fVar82);
        uStack_6b50 = CONCAT44(fVar85,fVar84);
        uStack_6b48 = CONCAT44(fVar87,fVar86);
        local_a60 = (float)local_4960;
        fStack_a5c = local_4960._4_4_;
        fStack_a58 = (float)uStack_4958;
        fStack_a54 = uStack_4958._4_4_;
        fStack_a50 = (float)uStack_4950;
        fStack_a4c = uStack_4950._4_4_;
        fStack_a48 = (float)uStack_4948;
        fStack_2c04 = uStack_4948._4_4_;
        local_2c20 = (float)local_4960 * (float)local_c80;
        fStack_2c1c = local_4960._4_4_ * local_c80._4_4_;
        fStack_2c18 = (float)uStack_4958 * (float)uStack_c78;
        fStack_2c14 = uStack_4958._4_4_ * uStack_c78._4_4_;
        fStack_2c10 = (float)uStack_4950 * (float)uStack_c70;
        fStack_2c0c = uStack_4950._4_4_ * uStack_c70._4_4_;
        fStack_2c08 = (float)uStack_4948 * (float)uStack_c68;
        fVar79 = local_2c20 + fVar79;
        fVar81 = fStack_2c1c + fVar81;
        fVar82 = fStack_2c18 + fVar82;
        fVar83 = fStack_2c14 + fVar83;
        fVar84 = fStack_2c10 + fVar84;
        fVar85 = fStack_2c0c + fVar85;
        fVar86 = fStack_2c08 + fVar86;
        fVar87 = uStack_4948._4_4_ + fVar87;
        local_6bc0 = CONCAT44(fVar81,fVar79);
        uStack_6bb8 = CONCAT44(fVar83,fVar82);
        uStack_6bb0 = CONCAT44(fVar85,fVar84);
        uStack_6ba8 = CONCAT44(fVar87,fVar86);
        local_a20 = (float)local_49c0;
        fStack_a1c = local_49c0._4_4_;
        fStack_a18 = (float)uStack_49b8;
        fStack_a14 = uStack_49b8._4_4_;
        fStack_a10 = (float)uStack_49b0;
        fStack_a0c = uStack_49b0._4_4_;
        fStack_a08 = (float)uStack_49a8;
        fStack_2bc4 = uStack_49a8._4_4_;
        local_a40._0_4_ = (float)local_6ea0;
        local_a40._4_4_ = (float)((ulong)local_6ea0 >> 0x20);
        uStack_a38._0_4_ = (float)uStack_6e98;
        uStack_a38._4_4_ = (float)((ulong)uStack_6e98 >> 0x20);
        uStack_a30._0_4_ = (float)uStack_6e90;
        uStack_a30._4_4_ = (float)((ulong)uStack_6e90 >> 0x20);
        uStack_a28._0_4_ = (float)uStack_6e88;
        local_2be0 = (float)local_49c0 * (float)local_a40;
        fStack_2bdc = local_49c0._4_4_ * local_a40._4_4_;
        fStack_2bd8 = (float)uStack_49b8 * (float)uStack_a38;
        fStack_2bd4 = uStack_49b8._4_4_ * uStack_a38._4_4_;
        fStack_2bd0 = (float)uStack_49b0 * (float)uStack_a30;
        fStack_2bcc = uStack_49b0._4_4_ * uStack_a30._4_4_;
        fStack_2bc8 = (float)uStack_49a8 * (float)uStack_a28;
        fVar79 = local_2be0 + fVar79;
        fVar81 = fStack_2bdc + fVar81;
        fVar82 = fStack_2bd8 + fVar82;
        fVar83 = fStack_2bd4 + fVar83;
        fVar84 = fStack_2bd0 + fVar84;
        fVar85 = fStack_2bcc + fVar85;
        fVar86 = fStack_2bc8 + fVar86;
        fVar87 = uStack_49a8._4_4_ + fVar87;
        local_6c20 = CONCAT44(fVar81,fVar79);
        uStack_6c18 = CONCAT44(fVar83,fVar82);
        uStack_6c10 = CONCAT44(fVar85,fVar84);
        uStack_6c08 = CONCAT44(fVar87,fVar86);
        local_9e0 = (float)local_4a20;
        fStack_9dc = local_4a20._4_4_;
        fStack_9d8 = (float)uStack_4a18;
        fStack_9d4 = uStack_4a18._4_4_;
        fStack_9d0 = (float)uStack_4a10;
        fStack_9cc = uStack_4a10._4_4_;
        fStack_9c8 = (float)uStack_4a08;
        fStack_2b84 = uStack_4a08._4_4_;
        local_2ba0 = (float)local_4a20 * (float)local_e00;
        fStack_2b9c = local_4a20._4_4_ * local_e00._4_4_;
        fStack_2b98 = (float)uStack_4a18 * (float)uStack_df8;
        fStack_2b94 = uStack_4a18._4_4_ * uStack_df8._4_4_;
        fStack_2b90 = (float)uStack_4a10 * (float)uStack_df0;
        fStack_2b8c = uStack_4a10._4_4_ * uStack_df0._4_4_;
        fStack_2b88 = (float)uStack_4a08 * (float)uStack_de8;
        fVar79 = local_2ba0 + fVar79;
        fVar81 = fStack_2b9c + fVar81;
        fVar82 = fStack_2b98 + fVar82;
        fVar83 = fStack_2b94 + fVar83;
        fVar84 = fStack_2b90 + fVar84;
        fVar85 = fStack_2b8c + fVar85;
        fVar86 = fStack_2b88 + fVar86;
        fVar87 = uStack_4a08._4_4_ + fVar87;
        local_6c80 = CONCAT44(fVar81,fVar79);
        uStack_6c78 = CONCAT44(fVar83,fVar82);
        uStack_6c70 = CONCAT44(fVar85,fVar84);
        uStack_6c68 = CONCAT44(fVar87,fVar86);
        local_9a0 = (float)local_4a80;
        fStack_99c = local_4a80._4_4_;
        fStack_998 = (float)uStack_4a78;
        fStack_994 = uStack_4a78._4_4_;
        fStack_990 = (float)uStack_4a70;
        fStack_98c = uStack_4a70._4_4_;
        fStack_988 = (float)uStack_4a68;
        fStack_2b44 = uStack_4a68._4_4_;
        local_2b60 = (float)local_4a80 * (float)local_bc0;
        fStack_2b5c = local_4a80._4_4_ * local_bc0._4_4_;
        fStack_2b58 = (float)uStack_4a78 * (float)uStack_bb8;
        fStack_2b54 = uStack_4a78._4_4_ * uStack_bb8._4_4_;
        fStack_2b50 = (float)uStack_4a70 * (float)uStack_bb0;
        fStack_2b4c = uStack_4a70._4_4_ * uStack_bb0._4_4_;
        fStack_2b48 = (float)uStack_4a68 * (float)uStack_ba8;
        fVar79 = local_2b60 + fVar79;
        fVar81 = fStack_2b5c + fVar81;
        fVar82 = fStack_2b58 + fVar82;
        fVar83 = fStack_2b54 + fVar83;
        fVar84 = fStack_2b50 + fVar84;
        fVar85 = fStack_2b4c + fVar85;
        fVar86 = fStack_2b48 + fVar86;
        fVar87 = uStack_4a68._4_4_ + fVar87;
        local_6ce0 = CONCAT44(fVar81,fVar79);
        uStack_6cd8 = CONCAT44(fVar83,fVar82);
        uStack_6cd0 = CONCAT44(fVar85,fVar84);
        uStack_6cc8 = CONCAT44(fVar87,fVar86);
        local_960 = (float)local_4ae0;
        fStack_95c = local_4ae0._4_4_;
        fStack_958 = (float)uStack_4ad8;
        fStack_954 = uStack_4ad8._4_4_;
        fStack_950 = (float)uStack_4ad0;
        fStack_94c = uStack_4ad0._4_4_;
        fStack_948 = (float)uStack_4ac8;
        fStack_2b04 = uStack_4ac8._4_4_;
        local_980._0_4_ = (float)local_6fc0;
        local_980._4_4_ = (float)((ulong)local_6fc0 >> 0x20);
        uStack_978._0_4_ = (float)uStack_6fb8;
        uStack_978._4_4_ = (float)((ulong)uStack_6fb8 >> 0x20);
        uStack_970._0_4_ = (float)uStack_6fb0;
        uStack_970._4_4_ = (float)((ulong)uStack_6fb0 >> 0x20);
        uStack_968._0_4_ = (float)uStack_6fa8;
        local_2b20 = (float)local_4ae0 * (float)local_980;
        fStack_2b1c = local_4ae0._4_4_ * local_980._4_4_;
        fStack_2b18 = (float)uStack_4ad8 * (float)uStack_978;
        fStack_2b14 = uStack_4ad8._4_4_ * uStack_978._4_4_;
        fStack_2b10 = (float)uStack_4ad0 * (float)uStack_970;
        fStack_2b0c = uStack_4ad0._4_4_ * uStack_970._4_4_;
        fStack_2b08 = (float)uStack_4ac8 * (float)uStack_968;
        local_46c0 = CONCAT44(fStack_2b1c + fVar81,local_2b20 + fVar79);
        uStack_46b8 = CONCAT44(fStack_2b14 + fVar83,fStack_2b18 + fVar82);
        uStack_46b0 = CONCAT44(fStack_2b0c + fVar85,fStack_2b10 + fVar84);
        uStack_46a8 = CONCAT44(uStack_4ac8._4_4_ + fVar87,fStack_2b08 + fVar86);
        local_7c20 = local_7e10 + 0x28;
        local_6de0 = *(undefined8 *)local_7c20;
        uStack_6dd8 = *(undefined8 *)(local_7e10 + 0x2a);
        uStack_6dd0 = *(undefined8 *)(local_7e10 + 0x2c);
        uStack_6dc8 = *(undefined8 *)(local_7e10 + 0x2e);
        local_7c28 = local_7e18 + 0x28;
        local_6f00 = *(undefined8 *)local_7c28;
        uStack_6ef8 = *(undefined8 *)(local_7e18 + 0x2a);
        uStack_6ef0 = *(undefined8 *)(local_7e18 + 0x2c);
        uStack_6ee8 = *(undefined8 *)(local_7e18 + 0x2e);
        local_7c30 = local_7e20 + 0x28;
        local_7020 = *(undefined8 *)local_7c30;
        uStack_7018 = *(undefined8 *)(local_7e20 + 0x2a);
        uStack_7010 = *(undefined8 *)(local_7e20 + 0x2c);
        uStack_7008 = *(undefined8 *)(local_7e20 + 0x2e);
        local_4688 = local_7dc0 + 0x10;
        *(undefined8 *)local_4688 = local_46c0;
        *(undefined8 *)(local_7dc0 + 0x12) = uStack_46b8;
        *(undefined8 *)(local_7dc0 + 0x14) = uStack_46b0;
        *(undefined8 *)(local_7dc0 + 0x16) = uStack_46a8;
        local_6d40 = local_7da0;
        uStack_6d38 = uStack_7d98;
        uStack_6d30 = uStack_7d90;
        uStack_6d28 = uStack_7d88;
        local_920 = (float)local_47e0;
        fStack_91c = local_47e0._4_4_;
        fStack_918 = (float)uStack_47d8;
        fStack_914 = uStack_47d8._4_4_;
        fStack_910 = (float)uStack_47d0;
        fStack_90c = uStack_47d0._4_4_;
        fStack_908 = (float)uStack_47c8;
        fStack_2ac4 = uStack_47c8._4_4_;
        local_2ae0 = (float)local_47e0 * (float)local_d40;
        fStack_2adc = local_47e0._4_4_ * local_d40._4_4_;
        fStack_2ad8 = (float)uStack_47d8 * (float)uStack_d38;
        fStack_2ad4 = uStack_47d8._4_4_ * uStack_d38._4_4_;
        fStack_2ad0 = (float)uStack_47d0 * (float)uStack_d30;
        fStack_2acc = uStack_47d0._4_4_ * uStack_d30._4_4_;
        fStack_2ac8 = (float)uStack_47c8 * (float)uStack_d28;
        local_2b00 = local_7da0;
        uStack_2af8 = uStack_7d98;
        uStack_2af0 = uStack_7d90;
        uStack_2ae8 = uStack_7d88;
        local_6da0 = CONCAT44(fStack_2adc + local_43c0._4_4_,local_2ae0 + (float)local_43c0);
        uStack_6d98 = CONCAT44(fStack_2ad4 + uStack_43b8._4_4_,fStack_2ad8 + (float)uStack_43b8);
        uStack_6d90 = CONCAT44(fStack_2acc + uStack_43b0._4_4_,fStack_2ad0 + (float)uStack_43b0);
        uStack_6d88 = CONCAT44(uStack_47c8._4_4_ + uStack_43a8._4_4_,
                               fStack_2ac8 + (float)uStack_43a8);
        local_8e0 = (float)local_4840;
        fStack_8dc = local_4840._4_4_;
        fStack_8d8 = (float)uStack_4838;
        fStack_8d4 = uStack_4838._4_4_;
        fStack_8d0 = (float)uStack_4830;
        fStack_8cc = uStack_4830._4_4_;
        fStack_8c8 = (float)uStack_4828;
        fStack_2a84 = uStack_4828._4_4_;
        local_2aa0 = (float)local_4840 * (float)local_b00;
        fStack_2a9c = local_4840._4_4_ * local_b00._4_4_;
        fStack_2a98 = (float)uStack_4838 * (float)uStack_af8;
        fStack_2a94 = uStack_4838._4_4_ * uStack_af8._4_4_;
        fStack_2a90 = (float)uStack_4830 * (float)uStack_af0;
        fStack_2a8c = uStack_4830._4_4_ * uStack_af0._4_4_;
        fStack_2a88 = (float)uStack_4828 * (float)uStack_ae8;
        fVar79 = local_2aa0 + local_2ae0 + (float)local_43c0;
        fVar81 = fStack_2a9c + fStack_2adc + local_43c0._4_4_;
        fVar82 = fStack_2a98 + fStack_2ad8 + (float)uStack_43b8;
        fVar83 = fStack_2a94 + fStack_2ad4 + uStack_43b8._4_4_;
        fVar84 = fStack_2a90 + fStack_2ad0 + (float)uStack_43b0;
        fVar85 = fStack_2a8c + fStack_2acc + uStack_43b0._4_4_;
        fVar86 = fStack_2a88 + fStack_2ac8 + (float)uStack_43a8;
        fVar87 = uStack_4828._4_4_ + uStack_47c8._4_4_ + uStack_43a8._4_4_;
        local_6e00 = CONCAT44(fVar81,fVar79);
        uStack_6df8 = CONCAT44(fVar83,fVar82);
        uStack_6df0 = CONCAT44(fVar85,fVar84);
        uStack_6de8 = CONCAT44(fVar87,fVar86);
        local_8a0 = (float)local_48a0;
        fStack_89c = local_48a0._4_4_;
        fStack_898 = (float)uStack_4898;
        fStack_894 = uStack_4898._4_4_;
        fStack_890 = (float)uStack_4890;
        fStack_88c = uStack_4890._4_4_;
        fStack_888 = (float)uStack_4888;
        fStack_2a44 = uStack_4888._4_4_;
        local_8c0._0_4_ = (float)local_6de0;
        local_8c0._4_4_ = (float)((ulong)local_6de0 >> 0x20);
        uStack_8b8._0_4_ = (float)uStack_6dd8;
        uStack_8b8._4_4_ = (float)((ulong)uStack_6dd8 >> 0x20);
        uStack_8b0._0_4_ = (float)uStack_6dd0;
        uStack_8b0._4_4_ = (float)((ulong)uStack_6dd0 >> 0x20);
        uStack_8a8._0_4_ = (float)uStack_6dc8;
        local_2a60 = (float)local_48a0 * (float)local_8c0;
        fStack_2a5c = local_48a0._4_4_ * local_8c0._4_4_;
        fStack_2a58 = (float)uStack_4898 * (float)uStack_8b8;
        fStack_2a54 = uStack_4898._4_4_ * uStack_8b8._4_4_;
        fStack_2a50 = (float)uStack_4890 * (float)uStack_8b0;
        fStack_2a4c = uStack_4890._4_4_ * uStack_8b0._4_4_;
        fStack_2a48 = (float)uStack_4888 * (float)uStack_8a8;
        fVar79 = local_2a60 + fVar79;
        fVar81 = fStack_2a5c + fVar81;
        fVar82 = fStack_2a58 + fVar82;
        fVar83 = fStack_2a54 + fVar83;
        fVar84 = fStack_2a50 + fVar84;
        fVar85 = fStack_2a4c + fVar85;
        fVar86 = fStack_2a48 + fVar86;
        fVar87 = uStack_4888._4_4_ + fVar87;
        local_6e60 = CONCAT44(fVar81,fVar79);
        uStack_6e58 = CONCAT44(fVar83,fVar82);
        uStack_6e50 = CONCAT44(fVar85,fVar84);
        uStack_6e48 = CONCAT44(fVar87,fVar86);
        local_860 = (float)local_4900;
        fStack_85c = local_4900._4_4_;
        fStack_858 = (float)uStack_48f8;
        fStack_854 = uStack_48f8._4_4_;
        fStack_850 = (float)uStack_48f0;
        fStack_84c = uStack_48f0._4_4_;
        fStack_848 = (float)uStack_48e8;
        fStack_2a04 = uStack_48e8._4_4_;
        local_2a20 = (float)local_4900 * (float)local_c80;
        fStack_2a1c = local_4900._4_4_ * local_c80._4_4_;
        fStack_2a18 = (float)uStack_48f8 * (float)uStack_c78;
        fStack_2a14 = uStack_48f8._4_4_ * uStack_c78._4_4_;
        fStack_2a10 = (float)uStack_48f0 * (float)uStack_c70;
        fStack_2a0c = uStack_48f0._4_4_ * uStack_c70._4_4_;
        fStack_2a08 = (float)uStack_48e8 * (float)uStack_c68;
        fVar79 = local_2a20 + fVar79;
        fVar81 = fStack_2a1c + fVar81;
        fVar82 = fStack_2a18 + fVar82;
        fVar83 = fStack_2a14 + fVar83;
        fVar84 = fStack_2a10 + fVar84;
        fVar85 = fStack_2a0c + fVar85;
        fVar86 = fStack_2a08 + fVar86;
        fVar87 = uStack_48e8._4_4_ + fVar87;
        local_6ec0 = CONCAT44(fVar81,fVar79);
        uStack_6eb8 = CONCAT44(fVar83,fVar82);
        uStack_6eb0 = CONCAT44(fVar85,fVar84);
        uStack_6ea8 = CONCAT44(fVar87,fVar86);
        local_820 = (float)local_4960;
        fStack_81c = local_4960._4_4_;
        fStack_818 = (float)uStack_4958;
        fStack_814 = uStack_4958._4_4_;
        fStack_810 = (float)uStack_4950;
        fStack_80c = uStack_4950._4_4_;
        fStack_808 = (float)uStack_4948;
        fStack_29c4 = uStack_4948._4_4_;
        local_29e0 = (float)local_4960 * (float)local_a40;
        fStack_29dc = local_4960._4_4_ * local_a40._4_4_;
        fStack_29d8 = (float)uStack_4958 * (float)uStack_a38;
        fStack_29d4 = uStack_4958._4_4_ * uStack_a38._4_4_;
        fStack_29d0 = (float)uStack_4950 * (float)uStack_a30;
        fStack_29cc = uStack_4950._4_4_ * uStack_a30._4_4_;
        fStack_29c8 = (float)uStack_4948 * (float)uStack_a28;
        fVar79 = local_29e0 + fVar79;
        fVar81 = fStack_29dc + fVar81;
        fVar82 = fStack_29d8 + fVar82;
        fVar83 = fStack_29d4 + fVar83;
        fVar84 = fStack_29d0 + fVar84;
        fVar85 = fStack_29cc + fVar85;
        fVar86 = fStack_29c8 + fVar86;
        fVar87 = uStack_4948._4_4_ + fVar87;
        local_6f20 = CONCAT44(fVar81,fVar79);
        uStack_6f18 = CONCAT44(fVar83,fVar82);
        uStack_6f10 = CONCAT44(fVar85,fVar84);
        uStack_6f08 = CONCAT44(fVar87,fVar86);
        local_7e0 = (float)local_49c0;
        fStack_7dc = local_49c0._4_4_;
        fStack_7d8 = (float)uStack_49b8;
        fStack_7d4 = uStack_49b8._4_4_;
        fStack_7d0 = (float)uStack_49b0;
        fStack_7cc = uStack_49b0._4_4_;
        fStack_7c8 = (float)uStack_49a8;
        fStack_2984 = uStack_49a8._4_4_;
        local_800._0_4_ = (float)local_6f00;
        local_800._4_4_ = (float)((ulong)local_6f00 >> 0x20);
        uStack_7f8._0_4_ = (float)uStack_6ef8;
        uStack_7f8._4_4_ = (float)((ulong)uStack_6ef8 >> 0x20);
        uStack_7f0._0_4_ = (float)uStack_6ef0;
        uStack_7f0._4_4_ = (float)((ulong)uStack_6ef0 >> 0x20);
        uStack_7e8._0_4_ = (float)uStack_6ee8;
        local_29a0 = (float)local_49c0 * (float)local_800;
        fStack_299c = local_49c0._4_4_ * local_800._4_4_;
        fStack_2998 = (float)uStack_49b8 * (float)uStack_7f8;
        fStack_2994 = uStack_49b8._4_4_ * uStack_7f8._4_4_;
        fStack_2990 = (float)uStack_49b0 * (float)uStack_7f0;
        fStack_298c = uStack_49b0._4_4_ * uStack_7f0._4_4_;
        fStack_2988 = (float)uStack_49a8 * (float)uStack_7e8;
        fVar79 = local_29a0 + fVar79;
        fVar81 = fStack_299c + fVar81;
        fVar82 = fStack_2998 + fVar82;
        fVar83 = fStack_2994 + fVar83;
        fVar84 = fStack_2990 + fVar84;
        fVar85 = fStack_298c + fVar85;
        fVar86 = fStack_2988 + fVar86;
        fVar87 = uStack_49a8._4_4_ + fVar87;
        local_6f80 = CONCAT44(fVar81,fVar79);
        uStack_6f78 = CONCAT44(fVar83,fVar82);
        uStack_6f70 = CONCAT44(fVar85,fVar84);
        uStack_6f68 = CONCAT44(fVar87,fVar86);
        local_7a0 = (float)local_4a20;
        fStack_79c = local_4a20._4_4_;
        fStack_798 = (float)uStack_4a18;
        fStack_794 = uStack_4a18._4_4_;
        fStack_790 = (float)uStack_4a10;
        fStack_78c = uStack_4a10._4_4_;
        fStack_788 = (float)uStack_4a08;
        fStack_2944 = uStack_4a08._4_4_;
        local_2960 = (float)local_4a20 * (float)local_bc0;
        fStack_295c = local_4a20._4_4_ * local_bc0._4_4_;
        fStack_2958 = (float)uStack_4a18 * (float)uStack_bb8;
        fStack_2954 = uStack_4a18._4_4_ * uStack_bb8._4_4_;
        fStack_2950 = (float)uStack_4a10 * (float)uStack_bb0;
        fStack_294c = uStack_4a10._4_4_ * uStack_bb0._4_4_;
        fStack_2948 = (float)uStack_4a08 * (float)uStack_ba8;
        fVar79 = local_2960 + fVar79;
        fVar81 = fStack_295c + fVar81;
        fVar82 = fStack_2958 + fVar82;
        fVar83 = fStack_2954 + fVar83;
        fVar84 = fStack_2950 + fVar84;
        fVar85 = fStack_294c + fVar85;
        fVar86 = fStack_2948 + fVar86;
        fVar87 = uStack_4a08._4_4_ + fVar87;
        local_6fe0 = CONCAT44(fVar81,fVar79);
        uStack_6fd8 = CONCAT44(fVar83,fVar82);
        uStack_6fd0 = CONCAT44(fVar85,fVar84);
        uStack_6fc8 = CONCAT44(fVar87,fVar86);
        local_760 = (float)local_4a80;
        fStack_75c = local_4a80._4_4_;
        fStack_758 = (float)uStack_4a78;
        fStack_754 = uStack_4a78._4_4_;
        fStack_750 = (float)uStack_4a70;
        fStack_74c = uStack_4a70._4_4_;
        fStack_748 = (float)uStack_4a68;
        fStack_2904 = uStack_4a68._4_4_;
        local_2920 = (float)local_4a80 * (float)local_980;
        fStack_291c = local_4a80._4_4_ * local_980._4_4_;
        fStack_2918 = (float)uStack_4a78 * (float)uStack_978;
        fStack_2914 = uStack_4a78._4_4_ * uStack_978._4_4_;
        fStack_2910 = (float)uStack_4a70 * (float)uStack_970;
        fStack_290c = uStack_4a70._4_4_ * uStack_970._4_4_;
        fStack_2908 = (float)uStack_4a68 * (float)uStack_968;
        fVar79 = local_2920 + fVar79;
        fVar81 = fStack_291c + fVar81;
        fVar82 = fStack_2918 + fVar82;
        fVar83 = fStack_2914 + fVar83;
        fVar84 = fStack_2910 + fVar84;
        fVar85 = fStack_290c + fVar85;
        fVar86 = fStack_2908 + fVar86;
        fVar87 = uStack_4a68._4_4_ + fVar87;
        local_7040 = CONCAT44(fVar81,fVar79);
        uStack_7038 = CONCAT44(fVar83,fVar82);
        uStack_7030 = CONCAT44(fVar85,fVar84);
        uStack_7028 = CONCAT44(fVar87,fVar86);
        local_720 = (float)local_4ae0;
        fStack_71c = local_4ae0._4_4_;
        fStack_718 = (float)uStack_4ad8;
        fStack_714 = uStack_4ad8._4_4_;
        fStack_710 = (float)uStack_4ad0;
        fStack_70c = uStack_4ad0._4_4_;
        fStack_708 = (float)uStack_4ac8;
        fStack_28c4 = uStack_4ac8._4_4_;
        local_740._0_4_ = (float)local_7020;
        local_740._4_4_ = (float)((ulong)local_7020 >> 0x20);
        uStack_738._0_4_ = (float)uStack_7018;
        uStack_738._4_4_ = (float)((ulong)uStack_7018 >> 0x20);
        uStack_730._0_4_ = (float)uStack_7010;
        uStack_730._4_4_ = (float)((ulong)uStack_7010 >> 0x20);
        uStack_728._0_4_ = (float)uStack_7008;
        local_28e0 = (float)local_4ae0 * (float)local_740;
        fStack_28dc = local_4ae0._4_4_ * local_740._4_4_;
        fStack_28d8 = (float)uStack_4ad8 * (float)uStack_738;
        fStack_28d4 = uStack_4ad8._4_4_ * uStack_738._4_4_;
        fStack_28d0 = (float)uStack_4ad0 * (float)uStack_730;
        fStack_28cc = uStack_4ad0._4_4_ * uStack_730._4_4_;
        fStack_28c8 = (float)uStack_4ac8 * (float)uStack_728;
        local_4700 = CONCAT44(fStack_28dc + fVar81,local_28e0 + fVar79);
        uStack_46f8 = CONCAT44(fStack_28d4 + fVar83,fStack_28d8 + fVar82);
        uStack_46f0 = CONCAT44(fStack_28cc + fVar85,fStack_28d0 + fVar84);
        uStack_46e8 = CONCAT44(uStack_4ac8._4_4_ + fVar87,fStack_28c8 + fVar86);
        local_46c8 = local_7dc0 + 0x18;
        *(undefined8 *)local_46c8 = local_4700;
        *(undefined8 *)(local_7dc0 + 0x1a) = uStack_46f8;
        *(undefined8 *)(local_7dc0 + 0x1c) = uStack_46f0;
        *(undefined8 *)(local_7dc0 + 0x1e) = uStack_46e8;
        local_7e10 = local_7e10 + 0x20;
        local_7e18 = local_7e18 + 0x20;
        local_7e20 = local_7e20 + 0x20;
        local_7dc0 = local_7dc0 + 0x20;
        local_7000 = uVar35;
        uStack_6ff8 = uVar36;
        uStack_6ff0 = uVar37;
        uStack_6fe8 = uVar38;
        local_6fa0 = uVar31;
        uStack_6f98 = uVar32;
        uStack_6f90 = uVar33;
        uStack_6f88 = uVar34;
        local_6f40 = uVar27;
        uStack_6f38 = uVar28;
        uStack_6f30 = uVar29;
        uStack_6f28 = uVar30;
        local_6ee0 = uVar23;
        uStack_6ed8 = uVar24;
        uStack_6ed0 = uVar25;
        uStack_6ec8 = uVar26;
        local_6e80 = uVar19;
        uStack_6e78 = uVar20;
        uStack_6e70 = uVar21;
        uStack_6e68 = uVar22;
        local_6e20 = uVar15;
        uStack_6e18 = uVar16;
        uStack_6e10 = uVar17;
        uStack_6e08 = uVar18;
        local_6dc0 = uVar11;
        uStack_6db8 = uVar12;
        uStack_6db0 = uVar13;
        uStack_6da8 = uVar14;
        local_6d60 = uVar7;
        uStack_6d58 = uVar8;
        uStack_6d50 = uVar9;
        uStack_6d48 = uVar10;
        local_6d00 = uVar3;
        uStack_6cf8 = uVar4;
        uStack_6cf0 = uVar5;
        uStack_6ce8 = uVar6;
        local_6cc0 = local_6fc0;
        uStack_6cb8 = uStack_6fb8;
        uStack_6cb0 = uStack_6fb0;
        uStack_6ca8 = uStack_6fa8;
        local_6ca0 = uVar35;
        uStack_6c98 = uVar36;
        uStack_6c90 = uVar37;
        uStack_6c88 = uVar38;
        local_6c60 = local_6f60;
        uStack_6c58 = uStack_6f58;
        uStack_6c50 = uStack_6f50;
        uStack_6c48 = uStack_6f48;
        local_6c40 = uVar31;
        uStack_6c38 = uVar32;
        uStack_6c30 = uVar33;
        uStack_6c28 = uVar34;
        local_6be0 = uVar27;
        uStack_6bd8 = uVar28;
        uStack_6bd0 = uVar29;
        uStack_6bc8 = uVar30;
        local_6ba0 = local_6ea0;
        uStack_6b98 = uStack_6e98;
        uStack_6b90 = uStack_6e90;
        uStack_6b88 = uStack_6e88;
        local_6b80 = uVar23;
        uStack_6b78 = uVar24;
        uStack_6b70 = uVar25;
        uStack_6b68 = uVar26;
        local_6b40 = local_6e40;
        uStack_6b38 = uStack_6e38;
        uStack_6b30 = uStack_6e30;
        uStack_6b28 = uStack_6e28;
        local_6b20 = uVar19;
        uStack_6b18 = uVar20;
        uStack_6b10 = uVar21;
        uStack_6b08 = uVar22;
        local_6ac0 = uVar15;
        uStack_6ab8 = uVar16;
        uStack_6ab0 = uVar17;
        uStack_6aa8 = uVar18;
        local_6a80 = local_6d80;
        uStack_6a78 = uStack_6d78;
        uStack_6a70 = uStack_6d70;
        uStack_6a68 = uStack_6d68;
        local_6a60 = uVar11;
        uStack_6a58 = uVar12;
        uStack_6a50 = uVar13;
        uStack_6a48 = uVar14;
        local_6a20 = local_6d20;
        uStack_6a18 = uStack_6d18;
        uStack_6a10 = uStack_6d10;
        uStack_6a08 = uStack_6d08;
        local_6a00 = uVar7;
        uStack_69f8 = uVar8;
        uStack_69f0 = uVar9;
        uStack_69e8 = uVar10;
        local_69a0 = uVar3;
        uStack_6998 = uVar4;
        uStack_6990 = uVar5;
        uStack_6988 = uVar6;
        local_6960 = local_6f60;
        uStack_6958 = uStack_6f58;
        uStack_6950 = uStack_6f50;
        uStack_6948 = uStack_6f48;
        local_6940 = uVar35;
        uStack_6938 = uVar36;
        uStack_6930 = uVar37;
        uStack_6928 = uVar38;
        local_6900 = local_6c00;
        uStack_68f8 = uStack_6bf8;
        uStack_68f0 = uStack_6bf0;
        uStack_68e8 = uStack_6be8;
        local_68e0 = uVar31;
        uStack_68d8 = uVar32;
        uStack_68d0 = uVar33;
        uStack_68c8 = uVar34;
        local_6880 = uVar27;
        uStack_6878 = uVar28;
        uStack_6870 = uVar29;
        uStack_6868 = uVar30;
        local_6840 = local_6e40;
        uStack_6838 = uStack_6e38;
        uStack_6830 = uStack_6e30;
        uStack_6828 = uStack_6e28;
        local_6820 = uVar23;
        uStack_6818 = uVar24;
        uStack_6810 = uVar25;
        uStack_6808 = uVar26;
        local_67e0 = local_6ae0;
        uStack_67d8 = uStack_6ad8;
        uStack_67d0 = uStack_6ad0;
        uStack_67c8 = uStack_6ac8;
        local_67c0 = uVar19;
        uStack_67b8 = uVar20;
        uStack_67b0 = uVar21;
        uStack_67a8 = uVar22;
        local_6760 = uVar15;
        uStack_6758 = uVar16;
        uStack_6750 = uVar17;
        uStack_6748 = uVar18;
        local_6720 = local_6d20;
        uStack_6718 = uStack_6d18;
        uStack_6710 = uStack_6d10;
        uStack_6708 = uStack_6d08;
        local_6700 = uVar11;
        uStack_66f8 = uVar12;
        uStack_66f0 = uVar13;
        uStack_66e8 = uVar14;
        local_66c0 = local_69c0;
        uStack_66b8 = uStack_69b8;
        uStack_66b0 = uStack_69b0;
        uStack_66a8 = uStack_69a8;
        local_66a0 = uVar7;
        uStack_6698 = uVar8;
        uStack_6690 = uVar9;
        uStack_6688 = uVar10;
        local_6640 = uVar3;
        uStack_6638 = uVar4;
        uStack_6630 = uVar5;
        uStack_6628 = uVar6;
        local_6600 = local_6c00;
        uStack_65f8 = uStack_6bf8;
        uStack_65f0 = uStack_6bf0;
        uStack_65e8 = uStack_6be8;
        local_65e0 = uVar35;
        uStack_65d8 = uVar36;
        uStack_65d0 = uVar37;
        uStack_65c8 = uVar38;
        local_65a0 = local_68a0;
        uStack_6598 = uStack_6898;
        uStack_6590 = uStack_6890;
        uStack_6588 = uStack_6888;
        local_6580 = uVar31;
        uStack_6578 = uVar32;
        uStack_6570 = uVar33;
        uStack_6568 = uVar34;
        local_6520 = uVar27;
        uStack_6518 = uVar28;
        uStack_6510 = uVar29;
        uStack_6508 = uVar30;
        local_64e0 = local_6ae0;
        uStack_64d8 = uStack_6ad8;
        uStack_64d0 = uStack_6ad0;
        uStack_64c8 = uStack_6ac8;
        local_64c0 = uVar23;
        uStack_64b8 = uVar24;
        uStack_64b0 = uVar25;
        uStack_64a8 = uVar26;
        local_6480 = local_6780;
        uStack_6478 = uStack_6778;
        uStack_6470 = uStack_6770;
        uStack_6468 = uStack_6768;
        local_6460 = uVar19;
        uStack_6458 = uVar20;
        uStack_6450 = uVar21;
        uStack_6448 = uVar22;
        local_6400 = uVar15;
        uStack_63f8 = uVar16;
        uStack_63f0 = uVar17;
        uStack_63e8 = uVar18;
        local_63c0 = local_69c0;
        uStack_63b8 = uStack_69b8;
        uStack_63b0 = uStack_69b0;
        uStack_63a8 = uStack_69a8;
        local_63a0 = uVar11;
        uStack_6398 = uVar12;
        uStack_6390 = uVar13;
        uStack_6388 = uVar14;
        local_6360 = local_6660;
        uStack_6358 = uStack_6658;
        uStack_6350 = uStack_6650;
        uStack_6348 = uStack_6648;
        local_6340 = uVar7;
        uStack_6338 = uVar8;
        uStack_6330 = uVar9;
        uStack_6328 = uVar10;
        local_62e0 = uVar3;
        uStack_62d8 = uVar4;
        uStack_62d0 = uVar5;
        uStack_62c8 = uVar6;
        local_3180 = local_6380;
        uStack_3178 = uStack_6378;
        uStack_3170 = uStack_6370;
        uStack_3168 = uStack_6368;
        local_3140 = local_63e0;
        uStack_3138 = uStack_63d8;
        uStack_3130 = uStack_63d0;
        uStack_3128 = uStack_63c8;
        local_3100 = local_6440;
        uStack_30f8 = uStack_6438;
        uStack_30f0 = uStack_6430;
        uStack_30e8 = uStack_6428;
        local_30c0 = local_64a0;
        uStack_30b8 = uStack_6498;
        uStack_30b0 = uStack_6490;
        uStack_30a8 = uStack_6488;
        local_3080 = local_6500;
        uStack_3078 = uStack_64f8;
        uStack_3070 = uStack_64f0;
        uStack_3068 = uStack_64e8;
        local_3040 = local_6560;
        uStack_3038 = uStack_6558;
        uStack_3030 = uStack_6550;
        uStack_3028 = uStack_6548;
        local_3000 = local_65c0;
        uStack_2ff8 = uStack_65b8;
        uStack_2ff0 = uStack_65b0;
        uStack_2fe8 = uStack_65a8;
        local_2fc0 = local_6620;
        uStack_2fb8 = uStack_6618;
        uStack_2fb0 = uStack_6610;
        uStack_2fa8 = uStack_6608;
        local_2f40 = local_66e0;
        uStack_2f38 = uStack_66d8;
        uStack_2f30 = uStack_66d0;
        uStack_2f28 = uStack_66c8;
        local_2f00 = local_6740;
        uStack_2ef8 = uStack_6738;
        uStack_2ef0 = uStack_6730;
        uStack_2ee8 = uStack_6728;
        local_2ec0 = local_67a0;
        uStack_2eb8 = uStack_6798;
        uStack_2eb0 = uStack_6790;
        uStack_2ea8 = uStack_6788;
        local_2e80 = local_6800;
        uStack_2e78 = uStack_67f8;
        uStack_2e70 = uStack_67f0;
        uStack_2e68 = uStack_67e8;
        local_2e40 = local_6860;
        uStack_2e38 = uStack_6858;
        uStack_2e30 = uStack_6850;
        uStack_2e28 = uStack_6848;
        local_2e00 = local_68c0;
        uStack_2df8 = uStack_68b8;
        uStack_2df0 = uStack_68b0;
        uStack_2de8 = uStack_68a8;
        local_2dc0 = local_6920;
        uStack_2db8 = uStack_6918;
        uStack_2db0 = uStack_6910;
        uStack_2da8 = uStack_6908;
        local_2d80 = local_6980;
        uStack_2d78 = uStack_6978;
        uStack_2d70 = uStack_6970;
        uStack_2d68 = uStack_6968;
        local_2d00 = local_6a40;
        uStack_2cf8 = uStack_6a38;
        uStack_2cf0 = uStack_6a30;
        uStack_2ce8 = uStack_6a28;
        local_2cc0 = local_6aa0;
        uStack_2cb8 = uStack_6a98;
        uStack_2cb0 = uStack_6a90;
        uStack_2ca8 = uStack_6a88;
        local_2c80 = local_6b00;
        uStack_2c78 = uStack_6af8;
        uStack_2c70 = uStack_6af0;
        uStack_2c68 = uStack_6ae8;
        local_2c40 = local_6b60;
        uStack_2c38 = uStack_6b58;
        uStack_2c30 = uStack_6b50;
        uStack_2c28 = uStack_6b48;
        local_2c00 = local_6bc0;
        uStack_2bf8 = uStack_6bb8;
        uStack_2bf0 = uStack_6bb0;
        uStack_2be8 = uStack_6ba8;
        local_2bc0 = local_6c20;
        uStack_2bb8 = uStack_6c18;
        uStack_2bb0 = uStack_6c10;
        uStack_2ba8 = uStack_6c08;
        local_2b80 = local_6c80;
        uStack_2b78 = uStack_6c78;
        uStack_2b70 = uStack_6c70;
        uStack_2b68 = uStack_6c68;
        local_2b40 = local_6ce0;
        uStack_2b38 = uStack_6cd8;
        uStack_2b30 = uStack_6cd0;
        uStack_2b28 = uStack_6cc8;
        local_2ac0 = local_6da0;
        uStack_2ab8 = uStack_6d98;
        uStack_2ab0 = uStack_6d90;
        uStack_2aa8 = uStack_6d88;
        local_2a80 = local_6e00;
        uStack_2a78 = uStack_6df8;
        uStack_2a70 = uStack_6df0;
        uStack_2a68 = uStack_6de8;
        local_2a40 = local_6e60;
        uStack_2a38 = uStack_6e58;
        uStack_2a30 = uStack_6e50;
        uStack_2a28 = uStack_6e48;
        local_2a00 = local_6ec0;
        uStack_29f8 = uStack_6eb8;
        uStack_29f0 = uStack_6eb0;
        uStack_29e8 = uStack_6ea8;
        local_29c0 = local_6f20;
        uStack_29b8 = uStack_6f18;
        uStack_29b0 = uStack_6f10;
        uStack_29a8 = uStack_6f08;
        local_2980 = local_6f80;
        uStack_2978 = uStack_6f78;
        uStack_2970 = uStack_6f70;
        uStack_2968 = uStack_6f68;
        local_2940 = local_6fe0;
        uStack_2938 = uStack_6fd8;
        uStack_2930 = uStack_6fd0;
        uStack_2928 = uStack_6fc8;
        local_2900 = local_7040;
        uStack_28f8 = uStack_7038;
        uStack_28f0 = uStack_7030;
        uStack_28e8 = uStack_7028;
        local_1000 = local_6300;
        uStack_ff8 = uStack_62f8;
        uStack_ff0 = uStack_62f0;
        uStack_fe8 = uStack_62e8;
        fStack_fc4 = fStack_3184;
        local_fc0 = local_6660;
        uStack_fb8 = uStack_6658;
        uStack_fb0 = uStack_6650;
        uStack_fa8 = uStack_6648;
        fStack_f84 = fStack_3144;
        local_f80 = local_69c0;
        uStack_f78 = uStack_69b8;
        uStack_f70 = uStack_69b0;
        uStack_f68 = uStack_69a8;
        fStack_f44 = fStack_3104;
        local_f40 = local_6420;
        uStack_f38 = uStack_6418;
        uStack_f30 = uStack_6410;
        uStack_f28 = uStack_6408;
        fStack_f04 = fStack_30c4;
        local_f00 = local_6780;
        uStack_ef8 = uStack_6778;
        uStack_ef0 = uStack_6770;
        uStack_ee8 = uStack_6768;
        fStack_ec4 = fStack_3084;
        local_ec0 = local_6ae0;
        uStack_eb8 = uStack_6ad8;
        uStack_eb0 = uStack_6ad0;
        uStack_ea8 = uStack_6ac8;
        fStack_e84 = fStack_3044;
        local_e80 = local_6540;
        uStack_e78 = uStack_6538;
        uStack_e70 = uStack_6530;
        uStack_e68 = uStack_6528;
        fStack_e44 = fStack_3004;
        local_e40 = local_68a0;
        uStack_e38 = uStack_6898;
        uStack_e30 = uStack_6890;
        uStack_e28 = uStack_6888;
        fStack_e04 = fStack_2fc4;
        local_e00 = local_6c00;
        uStack_df8 = uStack_6bf8;
        uStack_df0 = uStack_6bf0;
        uStack_de8 = uStack_6be8;
        fStack_dc4 = fStack_2f84;
        local_dc0 = local_6660;
        uStack_db8 = uStack_6658;
        uStack_db0 = uStack_6650;
        uStack_da8 = uStack_6648;
        fStack_d84 = fStack_2f44;
        local_d80 = local_69c0;
        uStack_d78 = uStack_69b8;
        uStack_d70 = uStack_69b0;
        uStack_d68 = uStack_69a8;
        fStack_d44 = fStack_2f04;
        local_d40 = local_6d20;
        uStack_d38 = uStack_6d18;
        uStack_d30 = uStack_6d10;
        uStack_d28 = uStack_6d08;
        fStack_d04 = fStack_2ec4;
        local_d00 = local_6780;
        uStack_cf8 = uStack_6778;
        uStack_cf0 = uStack_6770;
        uStack_ce8 = uStack_6768;
        fStack_cc4 = fStack_2e84;
        local_cc0 = local_6ae0;
        uStack_cb8 = uStack_6ad8;
        uStack_cb0 = uStack_6ad0;
        uStack_ca8 = uStack_6ac8;
        fStack_c84 = fStack_2e44;
        local_c80 = local_6e40;
        uStack_c78 = uStack_6e38;
        uStack_c70 = uStack_6e30;
        uStack_c68 = uStack_6e28;
        fStack_c44 = fStack_2e04;
        local_c40 = local_68a0;
        uStack_c38 = uStack_6898;
        uStack_c30 = uStack_6890;
        uStack_c28 = uStack_6888;
        fStack_c04 = fStack_2dc4;
        local_c00 = local_6c00;
        uStack_bf8 = uStack_6bf8;
        uStack_bf0 = uStack_6bf0;
        uStack_be8 = uStack_6be8;
        fStack_bc4 = fStack_2d84;
        local_bc0 = local_6f60;
        uStack_bb8 = uStack_6f58;
        uStack_bb0 = uStack_6f50;
        uStack_ba8 = uStack_6f48;
        fStack_b84 = fStack_2d44;
        local_b80 = local_69c0;
        uStack_b78 = uStack_69b8;
        uStack_b70 = uStack_69b0;
        uStack_b68 = uStack_69a8;
        fStack_b44 = fStack_2d04;
        local_b40 = local_6d20;
        uStack_b38 = uStack_6d18;
        uStack_b30 = uStack_6d10;
        uStack_b28 = uStack_6d08;
        fStack_b04 = fStack_2cc4;
        local_b00 = local_6d80;
        uStack_af8 = uStack_6d78;
        uStack_af0 = uStack_6d70;
        uStack_ae8 = uStack_6d68;
        fStack_ac4 = fStack_2c84;
        local_ac0 = local_6ae0;
        uStack_ab8 = uStack_6ad8;
        uStack_ab0 = uStack_6ad0;
        uStack_aa8 = uStack_6ac8;
        fStack_a84 = fStack_2c44;
        local_a80 = local_6e40;
        uStack_a78 = uStack_6e38;
        uStack_a70 = uStack_6e30;
        uStack_a68 = uStack_6e28;
        fStack_a44 = fStack_2c04;
        local_a40 = local_6ea0;
        uStack_a38 = uStack_6e98;
        uStack_a30 = uStack_6e90;
        uStack_a28 = uStack_6e88;
        fStack_a04 = fStack_2bc4;
        local_a00 = local_6c00;
        uStack_9f8 = uStack_6bf8;
        uStack_9f0 = uStack_6bf0;
        uStack_9e8 = uStack_6be8;
        fStack_9c4 = fStack_2b84;
        local_9c0 = local_6f60;
        uStack_9b8 = uStack_6f58;
        uStack_9b0 = uStack_6f50;
        uStack_9a8 = uStack_6f48;
        fStack_984 = fStack_2b44;
        local_980 = local_6fc0;
        uStack_978 = uStack_6fb8;
        uStack_970 = uStack_6fb0;
        uStack_968 = uStack_6fa8;
        fStack_944 = fStack_2b04;
        local_940 = local_6d20;
        uStack_938 = uStack_6d18;
        uStack_930 = uStack_6d10;
        uStack_928 = uStack_6d08;
        fStack_904 = fStack_2ac4;
        local_900 = local_6d80;
        uStack_8f8 = uStack_6d78;
        uStack_8f0 = uStack_6d70;
        uStack_8e8 = uStack_6d68;
        fStack_8c4 = fStack_2a84;
        local_8c0 = local_6de0;
        uStack_8b8 = uStack_6dd8;
        uStack_8b0 = uStack_6dd0;
        uStack_8a8 = uStack_6dc8;
        fStack_884 = fStack_2a44;
        local_880 = local_6e40;
        uStack_878 = uStack_6e38;
        uStack_870 = uStack_6e30;
        uStack_868 = uStack_6e28;
        fStack_844 = fStack_2a04;
        local_840 = local_6ea0;
        uStack_838 = uStack_6e98;
        uStack_830 = uStack_6e90;
        uStack_828 = uStack_6e88;
        fStack_804 = fStack_29c4;
        local_800 = local_6f00;
        uStack_7f8 = uStack_6ef8;
        uStack_7f0 = uStack_6ef0;
        uStack_7e8 = uStack_6ee8;
        fStack_7c4 = fStack_2984;
        local_7c0 = local_6f60;
        uStack_7b8 = uStack_6f58;
        uStack_7b0 = uStack_6f50;
        uStack_7a8 = uStack_6f48;
        fStack_784 = fStack_2944;
        local_780 = local_6fc0;
        uStack_778 = uStack_6fb8;
        uStack_770 = uStack_6fb0;
        uStack_768 = uStack_6fa8;
        fStack_744 = fStack_2904;
        local_740 = local_7020;
        uStack_738 = uStack_7018;
        uStack_730 = uStack_7010;
        uStack_728 = uStack_7008;
        fStack_704 = fStack_28c4;
      }
      for (; local_7f48 + 1 < local_7d0c; local_7f48 = local_7f48 + 2) {
        local_7c38 = local_7e10;
        local_7080 = *(undefined8 *)local_7e10;
        uStack_7078 = *(undefined8 *)(local_7e10 + 2);
        uStack_7070 = *(undefined8 *)(local_7e10 + 4);
        uStack_7068 = *(undefined8 *)(local_7e10 + 6);
        local_7c40 = local_7e10 + 8;
        local_73e0 = *(undefined8 *)local_7c40;
        uStack_73d8 = *(undefined8 *)(local_7e10 + 10);
        uStack_73d0 = *(undefined8 *)(local_7e10 + 0xc);
        uStack_73c8 = *(undefined8 *)(local_7e10 + 0xe);
        local_7c48 = local_7e10 + 0x10;
        local_7440 = *(undefined8 *)local_7c48;
        uStack_7438 = *(undefined8 *)(local_7e10 + 0x12);
        uStack_7430 = *(undefined8 *)(local_7e10 + 0x14);
        uStack_7428 = *(undefined8 *)(local_7e10 + 0x16);
        local_7c50 = local_7e18;
        local_71a0 = *(undefined8 *)local_7e18;
        uStack_7198 = *(undefined8 *)(local_7e18 + 2);
        uStack_7190 = *(undefined8 *)(local_7e18 + 4);
        uStack_7188 = *(undefined8 *)(local_7e18 + 6);
        local_7c58 = local_7e18 + 8;
        local_7500 = *(undefined8 *)local_7c58;
        uStack_74f8 = *(undefined8 *)(local_7e18 + 10);
        uStack_74f0 = *(undefined8 *)(local_7e18 + 0xc);
        uStack_74e8 = *(undefined8 *)(local_7e18 + 0xe);
        local_7c60 = local_7e18 + 0x10;
        local_7560 = *(undefined8 *)local_7c60;
        uStack_7558 = *(undefined8 *)(local_7e18 + 0x12);
        uStack_7550 = *(undefined8 *)(local_7e18 + 0x14);
        uStack_7548 = *(undefined8 *)(local_7e18 + 0x16);
        local_7c68 = local_7e20;
        local_72c0 = *(undefined8 *)local_7e20;
        uStack_72b8 = *(undefined8 *)(local_7e20 + 2);
        uStack_72b0 = *(undefined8 *)(local_7e20 + 4);
        uStack_72a8 = *(undefined8 *)(local_7e20 + 6);
        local_7c70 = local_7e20 + 8;
        local_7620 = *(undefined8 *)local_7c70;
        uStack_7618 = *(undefined8 *)(local_7e20 + 10);
        uStack_7610 = *(undefined8 *)(local_7e20 + 0xc);
        uStack_7608 = *(undefined8 *)(local_7e20 + 0xe);
        local_7c78 = local_7e20 + 0x10;
        local_7680 = *(undefined8 *)local_7c78;
        uStack_7678 = *(undefined8 *)(local_7e20 + 0x12);
        uStack_7670 = *(undefined8 *)(local_7e20 + 0x14);
        uStack_7668 = *(undefined8 *)(local_7e20 + 0x16);
        local_70a0 = local_7da0;
        uStack_7098 = uStack_7d98;
        uStack_7090 = uStack_7d90;
        uStack_7088 = uStack_7d88;
        local_6e0 = (float)local_47e0;
        fStack_6dc = local_47e0._4_4_;
        fStack_6d8 = (float)uStack_47d8;
        fStack_6d4 = uStack_47d8._4_4_;
        fStack_6d0 = (float)uStack_47d0;
        fStack_6cc = uStack_47d0._4_4_;
        fStack_6c8 = (float)uStack_47c8;
        fStack_2884 = uStack_47c8._4_4_;
        local_700._0_4_ = (float)local_7080;
        local_700._4_4_ = (float)((ulong)local_7080 >> 0x20);
        uStack_6f8._0_4_ = (float)uStack_7078;
        uStack_6f8._4_4_ = (float)((ulong)uStack_7078 >> 0x20);
        uStack_6f0._0_4_ = (float)uStack_7070;
        uStack_6f0._4_4_ = (float)((ulong)uStack_7070 >> 0x20);
        uStack_6e8._0_4_ = (float)uStack_7068;
        local_28a0 = (float)local_47e0 * (float)local_700;
        fStack_289c = local_47e0._4_4_ * local_700._4_4_;
        fStack_2898 = (float)uStack_47d8 * (float)uStack_6f8;
        fStack_2894 = uStack_47d8._4_4_ * uStack_6f8._4_4_;
        fStack_2890 = (float)uStack_47d0 * (float)uStack_6f0;
        fStack_288c = uStack_47d0._4_4_ * uStack_6f0._4_4_;
        fStack_2888 = (float)uStack_47c8 * (float)uStack_6e8;
        local_28c0 = local_7da0;
        uStack_28b8 = uStack_7d98;
        uStack_28b0 = uStack_7d90;
        uStack_28a8 = uStack_7d88;
        local_7100 = CONCAT44(fStack_289c + local_43c0._4_4_,local_28a0 + (float)local_43c0);
        uStack_70f8 = CONCAT44(fStack_2894 + uStack_43b8._4_4_,fStack_2898 + (float)uStack_43b8);
        uStack_70f0 = CONCAT44(fStack_288c + uStack_43b0._4_4_,fStack_2890 + (float)uStack_43b0);
        uStack_70e8 = CONCAT44(uStack_47c8._4_4_ + uStack_43a8._4_4_,
                               fStack_2888 + (float)uStack_43a8);
        local_6a0 = (float)local_4840;
        fStack_69c = local_4840._4_4_;
        fStack_698 = (float)uStack_4838;
        fStack_694 = uStack_4838._4_4_;
        fStack_690 = (float)uStack_4830;
        fStack_68c = uStack_4830._4_4_;
        fStack_688 = (float)uStack_4828;
        fStack_2844 = uStack_4828._4_4_;
        local_6c0._0_4_ = (float)local_73e0;
        local_6c0._4_4_ = (float)((ulong)local_73e0 >> 0x20);
        uStack_6b8._0_4_ = (float)uStack_73d8;
        uStack_6b8._4_4_ = (float)((ulong)uStack_73d8 >> 0x20);
        uStack_6b0._0_4_ = (float)uStack_73d0;
        uStack_6b0._4_4_ = (float)((ulong)uStack_73d0 >> 0x20);
        uStack_6a8._0_4_ = (float)uStack_73c8;
        local_2860 = (float)local_4840 * (float)local_6c0;
        fStack_285c = local_4840._4_4_ * local_6c0._4_4_;
        fStack_2858 = (float)uStack_4838 * (float)uStack_6b8;
        fStack_2854 = uStack_4838._4_4_ * uStack_6b8._4_4_;
        fStack_2850 = (float)uStack_4830 * (float)uStack_6b0;
        fStack_284c = uStack_4830._4_4_ * uStack_6b0._4_4_;
        fStack_2848 = (float)uStack_4828 * (float)uStack_6a8;
        fVar79 = local_2860 + local_28a0 + (float)local_43c0;
        fVar81 = fStack_285c + fStack_289c + local_43c0._4_4_;
        fVar82 = fStack_2858 + fStack_2898 + (float)uStack_43b8;
        fVar83 = fStack_2854 + fStack_2894 + uStack_43b8._4_4_;
        fVar84 = fStack_2850 + fStack_2890 + (float)uStack_43b0;
        fVar85 = fStack_284c + fStack_288c + uStack_43b0._4_4_;
        fVar86 = fStack_2848 + fStack_2888 + (float)uStack_43a8;
        fVar87 = uStack_4828._4_4_ + uStack_47c8._4_4_ + uStack_43a8._4_4_;
        local_7160 = CONCAT44(fVar81,fVar79);
        uStack_7158 = CONCAT44(fVar83,fVar82);
        uStack_7150 = CONCAT44(fVar85,fVar84);
        uStack_7148 = CONCAT44(fVar87,fVar86);
        local_660 = (float)local_48a0;
        fStack_65c = local_48a0._4_4_;
        fStack_658 = (float)uStack_4898;
        fStack_654 = uStack_4898._4_4_;
        fStack_650 = (float)uStack_4890;
        fStack_64c = uStack_4890._4_4_;
        fStack_648 = (float)uStack_4888;
        fStack_2804 = uStack_4888._4_4_;
        local_680._0_4_ = (float)local_7440;
        local_680._4_4_ = (float)((ulong)local_7440 >> 0x20);
        uStack_678._0_4_ = (float)uStack_7438;
        uStack_678._4_4_ = (float)((ulong)uStack_7438 >> 0x20);
        uStack_670._0_4_ = (float)uStack_7430;
        uStack_670._4_4_ = (float)((ulong)uStack_7430 >> 0x20);
        uStack_668._0_4_ = (float)uStack_7428;
        local_2820 = (float)local_48a0 * (float)local_680;
        fStack_281c = local_48a0._4_4_ * local_680._4_4_;
        fStack_2818 = (float)uStack_4898 * (float)uStack_678;
        fStack_2814 = uStack_4898._4_4_ * uStack_678._4_4_;
        fStack_2810 = (float)uStack_4890 * (float)uStack_670;
        fStack_280c = uStack_4890._4_4_ * uStack_670._4_4_;
        fStack_2808 = (float)uStack_4888 * (float)uStack_668;
        fVar79 = local_2820 + fVar79;
        fVar81 = fStack_281c + fVar81;
        fVar82 = fStack_2818 + fVar82;
        fVar83 = fStack_2814 + fVar83;
        fVar84 = fStack_2810 + fVar84;
        fVar85 = fStack_280c + fVar85;
        fVar86 = fStack_2808 + fVar86;
        fVar87 = uStack_4888._4_4_ + fVar87;
        local_71c0 = CONCAT44(fVar81,fVar79);
        uStack_71b8 = CONCAT44(fVar83,fVar82);
        uStack_71b0 = CONCAT44(fVar85,fVar84);
        uStack_71a8 = CONCAT44(fVar87,fVar86);
        local_620 = (float)local_4900;
        fStack_61c = local_4900._4_4_;
        fStack_618 = (float)uStack_48f8;
        fStack_614 = uStack_48f8._4_4_;
        fStack_610 = (float)uStack_48f0;
        fStack_60c = uStack_48f0._4_4_;
        fStack_608 = (float)uStack_48e8;
        fStack_27c4 = uStack_48e8._4_4_;
        local_640._0_4_ = (float)local_71a0;
        local_640._4_4_ = (float)((ulong)local_71a0 >> 0x20);
        uStack_638._0_4_ = (float)uStack_7198;
        uStack_638._4_4_ = (float)((ulong)uStack_7198 >> 0x20);
        uStack_630._0_4_ = (float)uStack_7190;
        uStack_630._4_4_ = (float)((ulong)uStack_7190 >> 0x20);
        uStack_628._0_4_ = (float)uStack_7188;
        local_27e0 = (float)local_4900 * (float)local_640;
        fStack_27dc = local_4900._4_4_ * local_640._4_4_;
        fStack_27d8 = (float)uStack_48f8 * (float)uStack_638;
        fStack_27d4 = uStack_48f8._4_4_ * uStack_638._4_4_;
        fStack_27d0 = (float)uStack_48f0 * (float)uStack_630;
        fStack_27cc = uStack_48f0._4_4_ * uStack_630._4_4_;
        fStack_27c8 = (float)uStack_48e8 * (float)uStack_628;
        fVar79 = local_27e0 + fVar79;
        fVar81 = fStack_27dc + fVar81;
        fVar82 = fStack_27d8 + fVar82;
        fVar83 = fStack_27d4 + fVar83;
        fVar84 = fStack_27d0 + fVar84;
        fVar85 = fStack_27cc + fVar85;
        fVar86 = fStack_27c8 + fVar86;
        fVar87 = uStack_48e8._4_4_ + fVar87;
        local_7220 = CONCAT44(fVar81,fVar79);
        uStack_7218 = CONCAT44(fVar83,fVar82);
        uStack_7210 = CONCAT44(fVar85,fVar84);
        uStack_7208 = CONCAT44(fVar87,fVar86);
        local_5e0 = (float)local_4960;
        fStack_5dc = local_4960._4_4_;
        fStack_5d8 = (float)uStack_4958;
        fStack_5d4 = uStack_4958._4_4_;
        fStack_5d0 = (float)uStack_4950;
        fStack_5cc = uStack_4950._4_4_;
        fStack_5c8 = (float)uStack_4948;
        fStack_2784 = uStack_4948._4_4_;
        local_600._0_4_ = (float)local_7500;
        local_600._4_4_ = (float)((ulong)local_7500 >> 0x20);
        uStack_5f8._0_4_ = (float)uStack_74f8;
        uStack_5f8._4_4_ = (float)((ulong)uStack_74f8 >> 0x20);
        uStack_5f0._0_4_ = (float)uStack_74f0;
        uStack_5f0._4_4_ = (float)((ulong)uStack_74f0 >> 0x20);
        uStack_5e8._0_4_ = (float)uStack_74e8;
        local_27a0 = (float)local_4960 * (float)local_600;
        fStack_279c = local_4960._4_4_ * local_600._4_4_;
        fStack_2798 = (float)uStack_4958 * (float)uStack_5f8;
        fStack_2794 = uStack_4958._4_4_ * uStack_5f8._4_4_;
        fStack_2790 = (float)uStack_4950 * (float)uStack_5f0;
        fStack_278c = uStack_4950._4_4_ * uStack_5f0._4_4_;
        fStack_2788 = (float)uStack_4948 * (float)uStack_5e8;
        fVar79 = local_27a0 + fVar79;
        fVar81 = fStack_279c + fVar81;
        fVar82 = fStack_2798 + fVar82;
        fVar83 = fStack_2794 + fVar83;
        fVar84 = fStack_2790 + fVar84;
        fVar85 = fStack_278c + fVar85;
        fVar86 = fStack_2788 + fVar86;
        fVar87 = uStack_4948._4_4_ + fVar87;
        local_7280 = CONCAT44(fVar81,fVar79);
        uStack_7278 = CONCAT44(fVar83,fVar82);
        uStack_7270 = CONCAT44(fVar85,fVar84);
        uStack_7268 = CONCAT44(fVar87,fVar86);
        local_5a0 = (float)local_49c0;
        fStack_59c = local_49c0._4_4_;
        fStack_598 = (float)uStack_49b8;
        fStack_594 = uStack_49b8._4_4_;
        fStack_590 = (float)uStack_49b0;
        fStack_58c = uStack_49b0._4_4_;
        fStack_588 = (float)uStack_49a8;
        fStack_2744 = uStack_49a8._4_4_;
        local_5c0._0_4_ = (float)local_7560;
        local_5c0._4_4_ = (float)((ulong)local_7560 >> 0x20);
        uStack_5b8._0_4_ = (float)uStack_7558;
        uStack_5b8._4_4_ = (float)((ulong)uStack_7558 >> 0x20);
        uStack_5b0._0_4_ = (float)uStack_7550;
        uStack_5b0._4_4_ = (float)((ulong)uStack_7550 >> 0x20);
        uStack_5a8._0_4_ = (float)uStack_7548;
        local_2760 = (float)local_49c0 * (float)local_5c0;
        fStack_275c = local_49c0._4_4_ * local_5c0._4_4_;
        fStack_2758 = (float)uStack_49b8 * (float)uStack_5b8;
        fStack_2754 = uStack_49b8._4_4_ * uStack_5b8._4_4_;
        fStack_2750 = (float)uStack_49b0 * (float)uStack_5b0;
        fStack_274c = uStack_49b0._4_4_ * uStack_5b0._4_4_;
        fStack_2748 = (float)uStack_49a8 * (float)uStack_5a8;
        fVar79 = local_2760 + fVar79;
        fVar81 = fStack_275c + fVar81;
        fVar82 = fStack_2758 + fVar82;
        fVar83 = fStack_2754 + fVar83;
        fVar84 = fStack_2750 + fVar84;
        fVar85 = fStack_274c + fVar85;
        fVar86 = fStack_2748 + fVar86;
        fVar87 = uStack_49a8._4_4_ + fVar87;
        local_72e0 = CONCAT44(fVar81,fVar79);
        uStack_72d8 = CONCAT44(fVar83,fVar82);
        uStack_72d0 = CONCAT44(fVar85,fVar84);
        uStack_72c8 = CONCAT44(fVar87,fVar86);
        local_560 = (float)local_4a20;
        fStack_55c = local_4a20._4_4_;
        fStack_558 = (float)uStack_4a18;
        fStack_554 = uStack_4a18._4_4_;
        fStack_550 = (float)uStack_4a10;
        fStack_54c = uStack_4a10._4_4_;
        fStack_548 = (float)uStack_4a08;
        fStack_2704 = uStack_4a08._4_4_;
        local_580._0_4_ = (float)local_72c0;
        local_580._4_4_ = (float)((ulong)local_72c0 >> 0x20);
        uStack_578._0_4_ = (float)uStack_72b8;
        uStack_578._4_4_ = (float)((ulong)uStack_72b8 >> 0x20);
        uStack_570._0_4_ = (float)uStack_72b0;
        uStack_570._4_4_ = (float)((ulong)uStack_72b0 >> 0x20);
        uStack_568._0_4_ = (float)uStack_72a8;
        local_2720 = (float)local_4a20 * (float)local_580;
        fStack_271c = local_4a20._4_4_ * local_580._4_4_;
        fStack_2718 = (float)uStack_4a18 * (float)uStack_578;
        fStack_2714 = uStack_4a18._4_4_ * uStack_578._4_4_;
        fStack_2710 = (float)uStack_4a10 * (float)uStack_570;
        fStack_270c = uStack_4a10._4_4_ * uStack_570._4_4_;
        fStack_2708 = (float)uStack_4a08 * (float)uStack_568;
        fVar79 = local_2720 + fVar79;
        fVar81 = fStack_271c + fVar81;
        fVar82 = fStack_2718 + fVar82;
        fVar83 = fStack_2714 + fVar83;
        fVar84 = fStack_2710 + fVar84;
        fVar85 = fStack_270c + fVar85;
        fVar86 = fStack_2708 + fVar86;
        fVar87 = uStack_4a08._4_4_ + fVar87;
        local_7340 = CONCAT44(fVar81,fVar79);
        uStack_7338 = CONCAT44(fVar83,fVar82);
        uStack_7330 = CONCAT44(fVar85,fVar84);
        uStack_7328 = CONCAT44(fVar87,fVar86);
        local_520 = (float)local_4a80;
        fStack_51c = local_4a80._4_4_;
        fStack_518 = (float)uStack_4a78;
        fStack_514 = uStack_4a78._4_4_;
        fStack_510 = (float)uStack_4a70;
        fStack_50c = uStack_4a70._4_4_;
        fStack_508 = (float)uStack_4a68;
        fStack_26c4 = uStack_4a68._4_4_;
        local_540._0_4_ = (float)local_7620;
        local_540._4_4_ = (float)((ulong)local_7620 >> 0x20);
        uStack_538._0_4_ = (float)uStack_7618;
        uStack_538._4_4_ = (float)((ulong)uStack_7618 >> 0x20);
        uStack_530._0_4_ = (float)uStack_7610;
        uStack_530._4_4_ = (float)((ulong)uStack_7610 >> 0x20);
        uStack_528._0_4_ = (float)uStack_7608;
        local_26e0 = (float)local_4a80 * (float)local_540;
        fStack_26dc = local_4a80._4_4_ * local_540._4_4_;
        fStack_26d8 = (float)uStack_4a78 * (float)uStack_538;
        fStack_26d4 = uStack_4a78._4_4_ * uStack_538._4_4_;
        fStack_26d0 = (float)uStack_4a70 * (float)uStack_530;
        fStack_26cc = uStack_4a70._4_4_ * uStack_530._4_4_;
        fStack_26c8 = (float)uStack_4a68 * (float)uStack_528;
        fVar79 = local_26e0 + fVar79;
        fVar81 = fStack_26dc + fVar81;
        fVar82 = fStack_26d8 + fVar82;
        fVar83 = fStack_26d4 + fVar83;
        fVar84 = fStack_26d0 + fVar84;
        fVar85 = fStack_26cc + fVar85;
        fVar86 = fStack_26c8 + fVar86;
        fVar87 = uStack_4a68._4_4_ + fVar87;
        local_73a0 = CONCAT44(fVar81,fVar79);
        uStack_7398 = CONCAT44(fVar83,fVar82);
        uStack_7390 = CONCAT44(fVar85,fVar84);
        uStack_7388 = CONCAT44(fVar87,fVar86);
        local_4e0 = (float)local_4ae0;
        fStack_4dc = local_4ae0._4_4_;
        fStack_4d8 = (float)uStack_4ad8;
        fStack_4d4 = uStack_4ad8._4_4_;
        fStack_4d0 = (float)uStack_4ad0;
        fStack_4cc = uStack_4ad0._4_4_;
        fStack_4c8 = (float)uStack_4ac8;
        fStack_2684 = uStack_4ac8._4_4_;
        local_500._0_4_ = (float)local_7680;
        local_500._4_4_ = (float)((ulong)local_7680 >> 0x20);
        uStack_4f8._0_4_ = (float)uStack_7678;
        uStack_4f8._4_4_ = (float)((ulong)uStack_7678 >> 0x20);
        uStack_4f0._0_4_ = (float)uStack_7670;
        uStack_4f0._4_4_ = (float)((ulong)uStack_7670 >> 0x20);
        uStack_4e8._0_4_ = (float)uStack_7668;
        local_26a0 = (float)local_4ae0 * (float)local_500;
        fStack_269c = local_4ae0._4_4_ * local_500._4_4_;
        fStack_2698 = (float)uStack_4ad8 * (float)uStack_4f8;
        fStack_2694 = uStack_4ad8._4_4_ * uStack_4f8._4_4_;
        fStack_2690 = (float)uStack_4ad0 * (float)uStack_4f0;
        fStack_268c = uStack_4ad0._4_4_ * uStack_4f0._4_4_;
        fStack_2688 = (float)uStack_4ac8 * (float)uStack_4e8;
        local_4740 = CONCAT44(fStack_269c + fVar81,local_26a0 + fVar79);
        uStack_4738 = CONCAT44(fStack_2694 + fVar83,fStack_2698 + fVar82);
        uStack_4730 = CONCAT44(fStack_268c + fVar85,fStack_2690 + fVar84);
        uStack_4728 = CONCAT44(uStack_4ac8._4_4_ + fVar87,fStack_2688 + fVar86);
        local_7c80 = local_7e10 + 0x18;
        local_74a0 = *(undefined8 *)local_7c80;
        uStack_7498 = *(undefined8 *)(local_7e10 + 0x1a);
        uStack_7490 = *(undefined8 *)(local_7e10 + 0x1c);
        uStack_7488 = *(undefined8 *)(local_7e10 + 0x1e);
        local_7c88 = local_7e18 + 0x18;
        local_75c0 = *(undefined8 *)local_7c88;
        uStack_75b8 = *(undefined8 *)(local_7e18 + 0x1a);
        uStack_75b0 = *(undefined8 *)(local_7e18 + 0x1c);
        uStack_75a8 = *(undefined8 *)(local_7e18 + 0x1e);
        local_7c90 = local_7e20 + 0x18;
        local_76e0 = *(undefined8 *)local_7c90;
        uStack_76d8 = *(undefined8 *)(local_7e20 + 0x1a);
        uStack_76d0 = *(undefined8 *)(local_7e20 + 0x1c);
        uStack_76c8 = *(undefined8 *)(local_7e20 + 0x1e);
        local_4708 = local_7dc0;
        *(undefined8 *)local_7dc0 = local_4740;
        *(undefined8 *)(local_7dc0 + 2) = uStack_4738;
        *(undefined8 *)(local_7dc0 + 4) = uStack_4730;
        *(undefined8 *)(local_7dc0 + 6) = uStack_4728;
        local_7400 = local_7da0;
        uStack_73f8 = uStack_7d98;
        uStack_73f0 = uStack_7d90;
        uStack_73e8 = uStack_7d88;
        local_4a0 = (float)local_47e0;
        fStack_49c = local_47e0._4_4_;
        fStack_498 = (float)uStack_47d8;
        fStack_494 = uStack_47d8._4_4_;
        fStack_490 = (float)uStack_47d0;
        fStack_48c = uStack_47d0._4_4_;
        fStack_488 = (float)uStack_47c8;
        fStack_2644 = uStack_47c8._4_4_;
        local_2660 = (float)local_47e0 * (float)local_6c0;
        fStack_265c = local_47e0._4_4_ * local_6c0._4_4_;
        fStack_2658 = (float)uStack_47d8 * (float)uStack_6b8;
        fStack_2654 = uStack_47d8._4_4_ * uStack_6b8._4_4_;
        fStack_2650 = (float)uStack_47d0 * (float)uStack_6b0;
        fStack_264c = uStack_47d0._4_4_ * uStack_6b0._4_4_;
        fStack_2648 = (float)uStack_47c8 * (float)uStack_6a8;
        local_2680 = local_7da0;
        uStack_2678 = uStack_7d98;
        uStack_2670 = uStack_7d90;
        uStack_2668 = uStack_7d88;
        local_7460 = CONCAT44(fStack_265c + local_43c0._4_4_,local_2660 + (float)local_43c0);
        uStack_7458 = CONCAT44(fStack_2654 + uStack_43b8._4_4_,fStack_2658 + (float)uStack_43b8);
        uStack_7450 = CONCAT44(fStack_264c + uStack_43b0._4_4_,fStack_2650 + (float)uStack_43b0);
        uStack_7448 = CONCAT44(uStack_47c8._4_4_ + uStack_43a8._4_4_,
                               fStack_2648 + (float)uStack_43a8);
        local_460 = (float)local_4840;
        fStack_45c = local_4840._4_4_;
        fStack_458 = (float)uStack_4838;
        fStack_454 = uStack_4838._4_4_;
        fStack_450 = (float)uStack_4830;
        fStack_44c = uStack_4830._4_4_;
        fStack_448 = (float)uStack_4828;
        fStack_2604 = uStack_4828._4_4_;
        local_2620 = (float)local_4840 * (float)local_680;
        fStack_261c = local_4840._4_4_ * local_680._4_4_;
        fStack_2618 = (float)uStack_4838 * (float)uStack_678;
        fStack_2614 = uStack_4838._4_4_ * uStack_678._4_4_;
        fStack_2610 = (float)uStack_4830 * (float)uStack_670;
        fStack_260c = uStack_4830._4_4_ * uStack_670._4_4_;
        fStack_2608 = (float)uStack_4828 * (float)uStack_668;
        fVar79 = local_2620 + local_2660 + (float)local_43c0;
        fVar81 = fStack_261c + fStack_265c + local_43c0._4_4_;
        fVar82 = fStack_2618 + fStack_2658 + (float)uStack_43b8;
        fVar83 = fStack_2614 + fStack_2654 + uStack_43b8._4_4_;
        fVar84 = fStack_2610 + fStack_2650 + (float)uStack_43b0;
        fVar85 = fStack_260c + fStack_264c + uStack_43b0._4_4_;
        fVar86 = fStack_2608 + fStack_2648 + (float)uStack_43a8;
        fVar87 = uStack_4828._4_4_ + uStack_47c8._4_4_ + uStack_43a8._4_4_;
        local_74c0 = CONCAT44(fVar81,fVar79);
        uStack_74b8 = CONCAT44(fVar83,fVar82);
        uStack_74b0 = CONCAT44(fVar85,fVar84);
        uStack_74a8 = CONCAT44(fVar87,fVar86);
        local_420 = (float)local_48a0;
        fStack_41c = local_48a0._4_4_;
        fStack_418 = (float)uStack_4898;
        fStack_414 = uStack_4898._4_4_;
        fStack_410 = (float)uStack_4890;
        fStack_40c = uStack_4890._4_4_;
        fStack_408 = (float)uStack_4888;
        fStack_25c4 = uStack_4888._4_4_;
        local_440._0_4_ = (float)local_74a0;
        local_440._4_4_ = (float)((ulong)local_74a0 >> 0x20);
        uStack_438._0_4_ = (float)uStack_7498;
        uStack_438._4_4_ = (float)((ulong)uStack_7498 >> 0x20);
        uStack_430._0_4_ = (float)uStack_7490;
        uStack_430._4_4_ = (float)((ulong)uStack_7490 >> 0x20);
        uStack_428._0_4_ = (float)uStack_7488;
        local_25e0 = (float)local_48a0 * (float)local_440;
        fStack_25dc = local_48a0._4_4_ * local_440._4_4_;
        fStack_25d8 = (float)uStack_4898 * (float)uStack_438;
        fStack_25d4 = uStack_4898._4_4_ * uStack_438._4_4_;
        fStack_25d0 = (float)uStack_4890 * (float)uStack_430;
        fStack_25cc = uStack_4890._4_4_ * uStack_430._4_4_;
        fStack_25c8 = (float)uStack_4888 * (float)uStack_428;
        fVar79 = local_25e0 + fVar79;
        fVar81 = fStack_25dc + fVar81;
        fVar82 = fStack_25d8 + fVar82;
        fVar83 = fStack_25d4 + fVar83;
        fVar84 = fStack_25d0 + fVar84;
        fVar85 = fStack_25cc + fVar85;
        fVar86 = fStack_25c8 + fVar86;
        fVar87 = uStack_4888._4_4_ + fVar87;
        local_7520 = CONCAT44(fVar81,fVar79);
        uStack_7518 = CONCAT44(fVar83,fVar82);
        uStack_7510 = CONCAT44(fVar85,fVar84);
        uStack_7508 = CONCAT44(fVar87,fVar86);
        local_3e0 = (float)local_4900;
        fStack_3dc = local_4900._4_4_;
        fStack_3d8 = (float)uStack_48f8;
        fStack_3d4 = uStack_48f8._4_4_;
        fStack_3d0 = (float)uStack_48f0;
        fStack_3cc = uStack_48f0._4_4_;
        fStack_3c8 = (float)uStack_48e8;
        fStack_2584 = uStack_48e8._4_4_;
        local_25a0 = (float)local_4900 * (float)local_600;
        fStack_259c = local_4900._4_4_ * local_600._4_4_;
        fStack_2598 = (float)uStack_48f8 * (float)uStack_5f8;
        fStack_2594 = uStack_48f8._4_4_ * uStack_5f8._4_4_;
        fStack_2590 = (float)uStack_48f0 * (float)uStack_5f0;
        fStack_258c = uStack_48f0._4_4_ * uStack_5f0._4_4_;
        fStack_2588 = (float)uStack_48e8 * (float)uStack_5e8;
        fVar79 = local_25a0 + fVar79;
        fVar81 = fStack_259c + fVar81;
        fVar82 = fStack_2598 + fVar82;
        fVar83 = fStack_2594 + fVar83;
        fVar84 = fStack_2590 + fVar84;
        fVar85 = fStack_258c + fVar85;
        fVar86 = fStack_2588 + fVar86;
        fVar87 = uStack_48e8._4_4_ + fVar87;
        local_7580 = CONCAT44(fVar81,fVar79);
        uStack_7578 = CONCAT44(fVar83,fVar82);
        uStack_7570 = CONCAT44(fVar85,fVar84);
        uStack_7568 = CONCAT44(fVar87,fVar86);
        local_3a0 = (float)local_4960;
        fStack_39c = local_4960._4_4_;
        fStack_398 = (float)uStack_4958;
        fStack_394 = uStack_4958._4_4_;
        fStack_390 = (float)uStack_4950;
        fStack_38c = uStack_4950._4_4_;
        fStack_388 = (float)uStack_4948;
        fStack_2544 = uStack_4948._4_4_;
        local_2560 = (float)local_4960 * (float)local_5c0;
        fStack_255c = local_4960._4_4_ * local_5c0._4_4_;
        fStack_2558 = (float)uStack_4958 * (float)uStack_5b8;
        fStack_2554 = uStack_4958._4_4_ * uStack_5b8._4_4_;
        fStack_2550 = (float)uStack_4950 * (float)uStack_5b0;
        fStack_254c = uStack_4950._4_4_ * uStack_5b0._4_4_;
        fStack_2548 = (float)uStack_4948 * (float)uStack_5a8;
        fVar79 = local_2560 + fVar79;
        fVar81 = fStack_255c + fVar81;
        fVar82 = fStack_2558 + fVar82;
        fVar83 = fStack_2554 + fVar83;
        fVar84 = fStack_2550 + fVar84;
        fVar85 = fStack_254c + fVar85;
        fVar86 = fStack_2548 + fVar86;
        fVar87 = uStack_4948._4_4_ + fVar87;
        local_75e0 = CONCAT44(fVar81,fVar79);
        uStack_75d8 = CONCAT44(fVar83,fVar82);
        uStack_75d0 = CONCAT44(fVar85,fVar84);
        uStack_75c8 = CONCAT44(fVar87,fVar86);
        local_360 = (float)local_49c0;
        fStack_35c = local_49c0._4_4_;
        fStack_358 = (float)uStack_49b8;
        fStack_354 = uStack_49b8._4_4_;
        fStack_350 = (float)uStack_49b0;
        fStack_34c = uStack_49b0._4_4_;
        fStack_348 = (float)uStack_49a8;
        fStack_2504 = uStack_49a8._4_4_;
        local_380._0_4_ = (float)local_75c0;
        local_380._4_4_ = (float)((ulong)local_75c0 >> 0x20);
        uStack_378._0_4_ = (float)uStack_75b8;
        uStack_378._4_4_ = (float)((ulong)uStack_75b8 >> 0x20);
        uStack_370._0_4_ = (float)uStack_75b0;
        uStack_370._4_4_ = (float)((ulong)uStack_75b0 >> 0x20);
        uStack_368._0_4_ = (float)uStack_75a8;
        local_2520 = (float)local_49c0 * (float)local_380;
        fStack_251c = local_49c0._4_4_ * local_380._4_4_;
        fStack_2518 = (float)uStack_49b8 * (float)uStack_378;
        fStack_2514 = uStack_49b8._4_4_ * uStack_378._4_4_;
        fStack_2510 = (float)uStack_49b0 * (float)uStack_370;
        fStack_250c = uStack_49b0._4_4_ * uStack_370._4_4_;
        fStack_2508 = (float)uStack_49a8 * (float)uStack_368;
        fVar79 = local_2520 + fVar79;
        fVar81 = fStack_251c + fVar81;
        fVar82 = fStack_2518 + fVar82;
        fVar83 = fStack_2514 + fVar83;
        fVar84 = fStack_2510 + fVar84;
        fVar85 = fStack_250c + fVar85;
        fVar86 = fStack_2508 + fVar86;
        fVar87 = uStack_49a8._4_4_ + fVar87;
        local_7640 = CONCAT44(fVar81,fVar79);
        uStack_7638 = CONCAT44(fVar83,fVar82);
        uStack_7630 = CONCAT44(fVar85,fVar84);
        uStack_7628 = CONCAT44(fVar87,fVar86);
        local_320 = (float)local_4a20;
        fStack_31c = local_4a20._4_4_;
        fStack_318 = (float)uStack_4a18;
        fStack_314 = uStack_4a18._4_4_;
        fStack_310 = (float)uStack_4a10;
        fStack_30c = uStack_4a10._4_4_;
        fStack_308 = (float)uStack_4a08;
        fStack_24c4 = uStack_4a08._4_4_;
        local_24e0 = (float)local_4a20 * (float)local_540;
        fStack_24dc = local_4a20._4_4_ * local_540._4_4_;
        fStack_24d8 = (float)uStack_4a18 * (float)uStack_538;
        fStack_24d4 = uStack_4a18._4_4_ * uStack_538._4_4_;
        fStack_24d0 = (float)uStack_4a10 * (float)uStack_530;
        fStack_24cc = uStack_4a10._4_4_ * uStack_530._4_4_;
        fStack_24c8 = (float)uStack_4a08 * (float)uStack_528;
        fVar79 = local_24e0 + fVar79;
        fVar81 = fStack_24dc + fVar81;
        fVar82 = fStack_24d8 + fVar82;
        fVar83 = fStack_24d4 + fVar83;
        fVar84 = fStack_24d0 + fVar84;
        fVar85 = fStack_24cc + fVar85;
        fVar86 = fStack_24c8 + fVar86;
        fVar87 = uStack_4a08._4_4_ + fVar87;
        local_76a0 = CONCAT44(fVar81,fVar79);
        uStack_7698 = CONCAT44(fVar83,fVar82);
        uStack_7690 = CONCAT44(fVar85,fVar84);
        uStack_7688 = CONCAT44(fVar87,fVar86);
        local_2e0 = (float)local_4a80;
        fStack_2dc = local_4a80._4_4_;
        fStack_2d8 = (float)uStack_4a78;
        fStack_2d4 = uStack_4a78._4_4_;
        fStack_2d0 = (float)uStack_4a70;
        fStack_2cc = uStack_4a70._4_4_;
        fStack_2c8 = (float)uStack_4a68;
        fStack_2484 = uStack_4a68._4_4_;
        local_24a0 = (float)local_4a80 * (float)local_500;
        fStack_249c = local_4a80._4_4_ * local_500._4_4_;
        fStack_2498 = (float)uStack_4a78 * (float)uStack_4f8;
        fStack_2494 = uStack_4a78._4_4_ * uStack_4f8._4_4_;
        fStack_2490 = (float)uStack_4a70 * (float)uStack_4f0;
        fStack_248c = uStack_4a70._4_4_ * uStack_4f0._4_4_;
        fStack_2488 = (float)uStack_4a68 * (float)uStack_4e8;
        fVar79 = local_24a0 + fVar79;
        fVar81 = fStack_249c + fVar81;
        fVar82 = fStack_2498 + fVar82;
        fVar83 = fStack_2494 + fVar83;
        fVar84 = fStack_2490 + fVar84;
        fVar85 = fStack_248c + fVar85;
        fVar86 = fStack_2488 + fVar86;
        fVar87 = uStack_4a68._4_4_ + fVar87;
        local_7700 = CONCAT44(fVar81,fVar79);
        uStack_76f8 = CONCAT44(fVar83,fVar82);
        uStack_76f0 = CONCAT44(fVar85,fVar84);
        uStack_76e8 = CONCAT44(fVar87,fVar86);
        local_2a0 = (float)local_4ae0;
        fStack_29c = local_4ae0._4_4_;
        fStack_298 = (float)uStack_4ad8;
        fStack_294 = uStack_4ad8._4_4_;
        fStack_290 = (float)uStack_4ad0;
        fStack_28c = uStack_4ad0._4_4_;
        fStack_288 = (float)uStack_4ac8;
        fStack_2444 = uStack_4ac8._4_4_;
        local_2c0._0_4_ = (float)local_76e0;
        local_2c0._4_4_ = (float)((ulong)local_76e0 >> 0x20);
        uStack_2b8._0_4_ = (float)uStack_76d8;
        uStack_2b8._4_4_ = (float)((ulong)uStack_76d8 >> 0x20);
        uStack_2b0._0_4_ = (float)uStack_76d0;
        uStack_2b0._4_4_ = (float)((ulong)uStack_76d0 >> 0x20);
        uStack_2a8._0_4_ = (float)uStack_76c8;
        local_2460 = (float)local_4ae0 * (float)local_2c0;
        fStack_245c = local_4ae0._4_4_ * local_2c0._4_4_;
        fStack_2458 = (float)uStack_4ad8 * (float)uStack_2b8;
        fStack_2454 = uStack_4ad8._4_4_ * uStack_2b8._4_4_;
        fStack_2450 = (float)uStack_4ad0 * (float)uStack_2b0;
        fStack_244c = uStack_4ad0._4_4_ * uStack_2b0._4_4_;
        fStack_2448 = (float)uStack_4ac8 * (float)uStack_2a8;
        local_4780 = CONCAT44(fStack_245c + fVar81,local_2460 + fVar79);
        uStack_4778 = CONCAT44(fStack_2454 + fVar83,fStack_2458 + fVar82);
        uStack_4770 = CONCAT44(fStack_244c + fVar85,fStack_2450 + fVar84);
        uStack_4768 = CONCAT44(uStack_4ac8._4_4_ + fVar87,fStack_2448 + fVar86);
        local_4748 = local_7dc0 + 8;
        *(undefined8 *)local_4748 = local_4780;
        *(undefined8 *)(local_7dc0 + 10) = uStack_4778;
        *(undefined8 *)(local_7dc0 + 0xc) = uStack_4770;
        *(undefined8 *)(local_7dc0 + 0xe) = uStack_4768;
        local_7e10 = local_7e10 + 0x10;
        local_7e18 = local_7e18 + 0x10;
        local_7e20 = local_7e20 + 0x10;
        local_7dc0 = local_7dc0 + 0x10;
        local_76c0 = uVar35;
        uStack_76b8 = uVar36;
        uStack_76b0 = uVar37;
        uStack_76a8 = uVar38;
        local_7660 = uVar31;
        uStack_7658 = uVar32;
        uStack_7650 = uVar33;
        uStack_7648 = uVar34;
        local_7600 = uVar27;
        uStack_75f8 = uVar28;
        uStack_75f0 = uVar29;
        uStack_75e8 = uVar30;
        local_75a0 = uVar23;
        uStack_7598 = uVar24;
        uStack_7590 = uVar25;
        uStack_7588 = uVar26;
        local_7540 = uVar19;
        uStack_7538 = uVar20;
        uStack_7530 = uVar21;
        uStack_7528 = uVar22;
        local_74e0 = uVar15;
        uStack_74d8 = uVar16;
        uStack_74d0 = uVar17;
        uStack_74c8 = uVar18;
        local_7480 = uVar11;
        uStack_7478 = uVar12;
        uStack_7470 = uVar13;
        uStack_7468 = uVar14;
        local_7420 = uVar7;
        uStack_7418 = uVar8;
        uStack_7410 = uVar9;
        uStack_7408 = uVar10;
        local_73c0 = uVar3;
        uStack_73b8 = uVar4;
        uStack_73b0 = uVar5;
        uStack_73a8 = uVar6;
        local_7380 = local_7680;
        uStack_7378 = uStack_7678;
        uStack_7370 = uStack_7670;
        uStack_7368 = uStack_7668;
        local_7360 = uVar35;
        uStack_7358 = uVar36;
        uStack_7350 = uVar37;
        uStack_7348 = uVar38;
        local_7320 = local_7620;
        uStack_7318 = uStack_7618;
        uStack_7310 = uStack_7610;
        uStack_7308 = uStack_7608;
        local_7300 = uVar31;
        uStack_72f8 = uVar32;
        uStack_72f0 = uVar33;
        uStack_72e8 = uVar34;
        local_72a0 = uVar27;
        uStack_7298 = uVar28;
        uStack_7290 = uVar29;
        uStack_7288 = uVar30;
        local_7260 = local_7560;
        uStack_7258 = uStack_7558;
        uStack_7250 = uStack_7550;
        uStack_7248 = uStack_7548;
        local_7240 = uVar23;
        uStack_7238 = uVar24;
        uStack_7230 = uVar25;
        uStack_7228 = uVar26;
        local_7200 = local_7500;
        uStack_71f8 = uStack_74f8;
        uStack_71f0 = uStack_74f0;
        uStack_71e8 = uStack_74e8;
        local_71e0 = uVar19;
        uStack_71d8 = uVar20;
        uStack_71d0 = uVar21;
        uStack_71c8 = uVar22;
        local_7180 = uVar15;
        uStack_7178 = uVar16;
        uStack_7170 = uVar17;
        uStack_7168 = uVar18;
        local_7140 = local_7440;
        uStack_7138 = uStack_7438;
        uStack_7130 = uStack_7430;
        uStack_7128 = uStack_7428;
        local_7120 = uVar11;
        uStack_7118 = uVar12;
        uStack_7110 = uVar13;
        uStack_7108 = uVar14;
        local_70e0 = local_73e0;
        uStack_70d8 = uStack_73d8;
        uStack_70d0 = uStack_73d0;
        uStack_70c8 = uStack_73c8;
        local_70c0 = uVar7;
        uStack_70b8 = uVar8;
        uStack_70b0 = uVar9;
        uStack_70a8 = uVar10;
        local_7060 = uVar3;
        uStack_7058 = uVar4;
        uStack_7050 = uVar5;
        uStack_7048 = uVar6;
        local_2880 = local_7100;
        uStack_2878 = uStack_70f8;
        uStack_2870 = uStack_70f0;
        uStack_2868 = uStack_70e8;
        local_2840 = local_7160;
        uStack_2838 = uStack_7158;
        uStack_2830 = uStack_7150;
        uStack_2828 = uStack_7148;
        local_2800 = local_71c0;
        uStack_27f8 = uStack_71b8;
        uStack_27f0 = uStack_71b0;
        uStack_27e8 = uStack_71a8;
        local_27c0 = local_7220;
        uStack_27b8 = uStack_7218;
        uStack_27b0 = uStack_7210;
        uStack_27a8 = uStack_7208;
        local_2780 = local_7280;
        uStack_2778 = uStack_7278;
        uStack_2770 = uStack_7270;
        uStack_2768 = uStack_7268;
        local_2740 = local_72e0;
        uStack_2738 = uStack_72d8;
        uStack_2730 = uStack_72d0;
        uStack_2728 = uStack_72c8;
        local_2700 = local_7340;
        uStack_26f8 = uStack_7338;
        uStack_26f0 = uStack_7330;
        uStack_26e8 = uStack_7328;
        local_26c0 = local_73a0;
        uStack_26b8 = uStack_7398;
        uStack_26b0 = uStack_7390;
        uStack_26a8 = uStack_7388;
        local_2640 = local_7460;
        uStack_2638 = uStack_7458;
        uStack_2630 = uStack_7450;
        uStack_2628 = uStack_7448;
        local_2600 = local_74c0;
        uStack_25f8 = uStack_74b8;
        uStack_25f0 = uStack_74b0;
        uStack_25e8 = uStack_74a8;
        local_25c0 = local_7520;
        uStack_25b8 = uStack_7518;
        uStack_25b0 = uStack_7510;
        uStack_25a8 = uStack_7508;
        local_2580 = local_7580;
        uStack_2578 = uStack_7578;
        uStack_2570 = uStack_7570;
        uStack_2568 = uStack_7568;
        local_2540 = local_75e0;
        uStack_2538 = uStack_75d8;
        uStack_2530 = uStack_75d0;
        uStack_2528 = uStack_75c8;
        local_2500 = local_7640;
        uStack_24f8 = uStack_7638;
        uStack_24f0 = uStack_7630;
        uStack_24e8 = uStack_7628;
        local_24c0 = local_76a0;
        uStack_24b8 = uStack_7698;
        uStack_24b0 = uStack_7690;
        uStack_24a8 = uStack_7688;
        local_2480 = local_7700;
        uStack_2478 = uStack_76f8;
        uStack_2470 = uStack_76f0;
        uStack_2468 = uStack_76e8;
        local_700 = local_7080;
        uStack_6f8 = uStack_7078;
        uStack_6f0 = uStack_7070;
        uStack_6e8 = uStack_7068;
        fStack_6c4 = fStack_2884;
        local_6c0 = local_73e0;
        uStack_6b8 = uStack_73d8;
        uStack_6b0 = uStack_73d0;
        uStack_6a8 = uStack_73c8;
        fStack_684 = fStack_2844;
        local_680 = local_7440;
        uStack_678 = uStack_7438;
        uStack_670 = uStack_7430;
        uStack_668 = uStack_7428;
        fStack_644 = fStack_2804;
        local_640 = local_71a0;
        uStack_638 = uStack_7198;
        uStack_630 = uStack_7190;
        uStack_628 = uStack_7188;
        fStack_604 = fStack_27c4;
        local_600 = local_7500;
        uStack_5f8 = uStack_74f8;
        uStack_5f0 = uStack_74f0;
        uStack_5e8 = uStack_74e8;
        fStack_5c4 = fStack_2784;
        local_5c0 = local_7560;
        uStack_5b8 = uStack_7558;
        uStack_5b0 = uStack_7550;
        uStack_5a8 = uStack_7548;
        fStack_584 = fStack_2744;
        local_580 = local_72c0;
        uStack_578 = uStack_72b8;
        uStack_570 = uStack_72b0;
        uStack_568 = uStack_72a8;
        fStack_544 = fStack_2704;
        local_540 = local_7620;
        uStack_538 = uStack_7618;
        uStack_530 = uStack_7610;
        uStack_528 = uStack_7608;
        fStack_504 = fStack_26c4;
        local_500 = local_7680;
        uStack_4f8 = uStack_7678;
        uStack_4f0 = uStack_7670;
        uStack_4e8 = uStack_7668;
        fStack_4c4 = fStack_2684;
        local_4c0 = local_73e0;
        uStack_4b8 = uStack_73d8;
        uStack_4b0 = uStack_73d0;
        uStack_4a8 = uStack_73c8;
        fStack_484 = fStack_2644;
        local_480 = local_7440;
        uStack_478 = uStack_7438;
        uStack_470 = uStack_7430;
        uStack_468 = uStack_7428;
        fStack_444 = fStack_2604;
        local_440 = local_74a0;
        uStack_438 = uStack_7498;
        uStack_430 = uStack_7490;
        uStack_428 = uStack_7488;
        fStack_404 = fStack_25c4;
        local_400 = local_7500;
        uStack_3f8 = uStack_74f8;
        uStack_3f0 = uStack_74f0;
        uStack_3e8 = uStack_74e8;
        fStack_3c4 = fStack_2584;
        local_3c0 = local_7560;
        uStack_3b8 = uStack_7558;
        uStack_3b0 = uStack_7550;
        uStack_3a8 = uStack_7548;
        fStack_384 = fStack_2544;
        local_380 = local_75c0;
        uStack_378 = uStack_75b8;
        uStack_370 = uStack_75b0;
        uStack_368 = uStack_75a8;
        fStack_344 = fStack_2504;
        local_340 = local_7620;
        uStack_338 = uStack_7618;
        uStack_330 = uStack_7610;
        uStack_328 = uStack_7608;
        fStack_304 = fStack_24c4;
        local_300 = local_7680;
        uStack_2f8 = uStack_7678;
        uStack_2f0 = uStack_7670;
        uStack_2e8 = uStack_7668;
        fStack_2c4 = fStack_2484;
        local_2c0 = local_76e0;
        uStack_2b8 = uStack_76d8;
        uStack_2b0 = uStack_76d0;
        uStack_2a8 = uStack_76c8;
        fStack_284 = fStack_2444;
      }
      for (; local_7f48 < local_7d0c; local_7f48 = local_7f48 + 1) {
        local_7c98 = local_7e10;
        local_7740 = *(undefined8 *)local_7e10;
        uStack_7738 = *(undefined8 *)(local_7e10 + 2);
        uStack_7730 = *(undefined8 *)(local_7e10 + 4);
        uStack_7728 = *(undefined8 *)(local_7e10 + 6);
        local_7ca0 = local_7e10 + 8;
        local_77a0 = *(undefined8 *)local_7ca0;
        uStack_7798 = *(undefined8 *)(local_7e10 + 10);
        uStack_7790 = *(undefined8 *)(local_7e10 + 0xc);
        uStack_7788 = *(undefined8 *)(local_7e10 + 0xe);
        local_7ca8 = local_7e10 + 0x10;
        local_7800 = *(undefined8 *)local_7ca8;
        uStack_77f8 = *(undefined8 *)(local_7e10 + 0x12);
        uStack_77f0 = *(undefined8 *)(local_7e10 + 0x14);
        uStack_77e8 = *(undefined8 *)(local_7e10 + 0x16);
        local_7cb0 = local_7e18;
        local_7860 = *(undefined8 *)local_7e18;
        uStack_7858 = *(undefined8 *)(local_7e18 + 2);
        uStack_7850 = *(undefined8 *)(local_7e18 + 4);
        uStack_7848 = *(undefined8 *)(local_7e18 + 6);
        local_7cb8 = local_7e18 + 8;
        local_78c0 = *(undefined8 *)local_7cb8;
        uStack_78b8 = *(undefined8 *)(local_7e18 + 10);
        uStack_78b0 = *(undefined8 *)(local_7e18 + 0xc);
        uStack_78a8 = *(undefined8 *)(local_7e18 + 0xe);
        local_7cc0 = local_7e18 + 0x10;
        local_7920 = *(undefined8 *)local_7cc0;
        uStack_7918 = *(undefined8 *)(local_7e18 + 0x12);
        uStack_7910 = *(undefined8 *)(local_7e18 + 0x14);
        uStack_7908 = *(undefined8 *)(local_7e18 + 0x16);
        local_7cc8 = local_7e20;
        local_7980 = *(undefined8 *)local_7e20;
        uStack_7978 = *(undefined8 *)(local_7e20 + 2);
        uStack_7970 = *(undefined8 *)(local_7e20 + 4);
        uStack_7968 = *(undefined8 *)(local_7e20 + 6);
        local_7cd0 = local_7e20 + 8;
        local_79e0 = *(undefined8 *)local_7cd0;
        uStack_79d8 = *(undefined8 *)(local_7e20 + 10);
        uStack_79d0 = *(undefined8 *)(local_7e20 + 0xc);
        uStack_79c8 = *(undefined8 *)(local_7e20 + 0xe);
        local_7cd8 = local_7e20 + 0x10;
        local_7a40 = *(undefined8 *)local_7cd8;
        uStack_7a38 = *(undefined8 *)(local_7e20 + 0x12);
        uStack_7a30 = *(undefined8 *)(local_7e20 + 0x14);
        uStack_7a28 = *(undefined8 *)(local_7e20 + 0x16);
        local_7760 = local_7da0;
        uStack_7758 = uStack_7d98;
        uStack_7750 = uStack_7d90;
        uStack_7748 = uStack_7d88;
        local_260 = (float)local_47e0;
        fStack_25c = local_47e0._4_4_;
        fStack_258 = (float)uStack_47d8;
        fStack_254 = uStack_47d8._4_4_;
        fStack_250 = (float)uStack_47d0;
        fStack_24c = uStack_47d0._4_4_;
        fStack_248 = (float)uStack_47c8;
        fStack_2404 = uStack_47c8._4_4_;
        local_280._0_4_ = (float)local_7740;
        local_280._4_4_ = (float)((ulong)local_7740 >> 0x20);
        uStack_278._0_4_ = (float)uStack_7738;
        uStack_278._4_4_ = (float)((ulong)uStack_7738 >> 0x20);
        uStack_270._0_4_ = (float)uStack_7730;
        uStack_270._4_4_ = (float)((ulong)uStack_7730 >> 0x20);
        uStack_268._0_4_ = (float)uStack_7728;
        local_2420 = (float)local_47e0 * (float)local_280;
        fStack_241c = local_47e0._4_4_ * local_280._4_4_;
        fStack_2418 = (float)uStack_47d8 * (float)uStack_278;
        fStack_2414 = uStack_47d8._4_4_ * uStack_278._4_4_;
        fStack_2410 = (float)uStack_47d0 * (float)uStack_270;
        fStack_240c = uStack_47d0._4_4_ * uStack_270._4_4_;
        fStack_2408 = (float)uStack_47c8 * (float)uStack_268;
        local_2440 = local_7da0;
        uStack_2438 = uStack_7d98;
        uStack_2430 = uStack_7d90;
        uStack_2428 = uStack_7d88;
        local_77c0 = CONCAT44(fStack_241c + local_43c0._4_4_,local_2420 + (float)local_43c0);
        uStack_77b8 = CONCAT44(fStack_2414 + uStack_43b8._4_4_,fStack_2418 + (float)uStack_43b8);
        uStack_77b0 = CONCAT44(fStack_240c + uStack_43b0._4_4_,fStack_2410 + (float)uStack_43b0);
        uStack_77a8 = CONCAT44(uStack_47c8._4_4_ + uStack_43a8._4_4_,
                               fStack_2408 + (float)uStack_43a8);
        local_220 = (float)local_4840;
        fStack_21c = local_4840._4_4_;
        fStack_218 = (float)uStack_4838;
        fStack_214 = uStack_4838._4_4_;
        fStack_210 = (float)uStack_4830;
        fStack_20c = uStack_4830._4_4_;
        fStack_208 = (float)uStack_4828;
        fStack_23c4 = uStack_4828._4_4_;
        local_240._0_4_ = (float)local_77a0;
        local_240._4_4_ = (float)((ulong)local_77a0 >> 0x20);
        uStack_238._0_4_ = (float)uStack_7798;
        uStack_238._4_4_ = (float)((ulong)uStack_7798 >> 0x20);
        uStack_230._0_4_ = (float)uStack_7790;
        uStack_230._4_4_ = (float)((ulong)uStack_7790 >> 0x20);
        uStack_228._0_4_ = (float)uStack_7788;
        local_23e0 = (float)local_4840 * (float)local_240;
        fStack_23dc = local_4840._4_4_ * local_240._4_4_;
        fStack_23d8 = (float)uStack_4838 * (float)uStack_238;
        fStack_23d4 = uStack_4838._4_4_ * uStack_238._4_4_;
        fStack_23d0 = (float)uStack_4830 * (float)uStack_230;
        fStack_23cc = uStack_4830._4_4_ * uStack_230._4_4_;
        fStack_23c8 = (float)uStack_4828 * (float)uStack_228;
        fVar79 = local_23e0 + local_2420 + (float)local_43c0;
        fVar81 = fStack_23dc + fStack_241c + local_43c0._4_4_;
        fVar82 = fStack_23d8 + fStack_2418 + (float)uStack_43b8;
        in_stack_ffffffffffff5b0c = fStack_23d4 + fStack_2414 + uStack_43b8._4_4_;
        in_stack_ffffffffffff5b10 = fStack_23d0 + fStack_2410 + (float)uStack_43b0;
        in_stack_ffffffffffff5b14 = fStack_23cc + fStack_240c + uStack_43b0._4_4_;
        fVar83 = fStack_23c8 + fStack_2408 + (float)uStack_43a8;
        fVar84 = uStack_4828._4_4_ + uStack_47c8._4_4_ + uStack_43a8._4_4_;
        local_7820 = CONCAT44(fVar81,fVar79);
        uStack_7818 = CONCAT44(in_stack_ffffffffffff5b0c,fVar82);
        uStack_7810 = CONCAT44(in_stack_ffffffffffff5b14,in_stack_ffffffffffff5b10);
        uStack_7808 = CONCAT44(fVar84,fVar83);
        local_1e0 = (float)local_48a0;
        fStack_1dc = local_48a0._4_4_;
        fStack_1d8 = (float)uStack_4898;
        fStack_1d4 = uStack_4898._4_4_;
        fStack_1d0 = (float)uStack_4890;
        fStack_1cc = uStack_4890._4_4_;
        fStack_1c8 = (float)uStack_4888;
        fStack_2384 = uStack_4888._4_4_;
        local_200._0_4_ = (float)local_7800;
        local_200._4_4_ = (float)((ulong)local_7800 >> 0x20);
        uStack_1f8._0_4_ = (float)uStack_77f8;
        uStack_1f8._4_4_ = (float)((ulong)uStack_77f8 >> 0x20);
        uStack_1f0._0_4_ = (float)uStack_77f0;
        uStack_1f0._4_4_ = (float)((ulong)uStack_77f0 >> 0x20);
        uStack_1e8._0_4_ = (float)uStack_77e8;
        local_23a0 = (float)local_48a0 * (float)local_200;
        fStack_239c = local_48a0._4_4_ * local_200._4_4_;
        fStack_2398 = (float)uStack_4898 * (float)uStack_1f8;
        fStack_2394 = uStack_4898._4_4_ * uStack_1f8._4_4_;
        fStack_2390 = (float)uStack_4890 * (float)uStack_1f0;
        fStack_238c = uStack_4890._4_4_ * uStack_1f0._4_4_;
        fStack_2388 = (float)uStack_4888 * (float)uStack_1e8;
        fVar79 = local_23a0 + fVar79;
        fVar81 = fStack_239c + fVar81;
        fVar82 = fStack_2398 + fVar82;
        in_stack_ffffffffffff5b0c = fStack_2394 + in_stack_ffffffffffff5b0c;
        in_stack_ffffffffffff5b10 = fStack_2390 + in_stack_ffffffffffff5b10;
        in_stack_ffffffffffff5b14 = fStack_238c + in_stack_ffffffffffff5b14;
        fVar83 = fStack_2388 + fVar83;
        fVar84 = uStack_4888._4_4_ + fVar84;
        local_7880 = CONCAT44(fVar81,fVar79);
        uStack_7878 = CONCAT44(in_stack_ffffffffffff5b0c,fVar82);
        uStack_7870 = CONCAT44(in_stack_ffffffffffff5b14,in_stack_ffffffffffff5b10);
        uStack_7868 = CONCAT44(fVar84,fVar83);
        local_1a0 = (float)local_4900;
        fStack_19c = local_4900._4_4_;
        fStack_198 = (float)uStack_48f8;
        fStack_194 = uStack_48f8._4_4_;
        fStack_190 = (float)uStack_48f0;
        fStack_18c = uStack_48f0._4_4_;
        fStack_188 = (float)uStack_48e8;
        fStack_2344 = uStack_48e8._4_4_;
        local_1c0._0_4_ = (float)local_7860;
        local_1c0._4_4_ = (float)((ulong)local_7860 >> 0x20);
        uStack_1b8._0_4_ = (float)uStack_7858;
        uStack_1b8._4_4_ = (float)((ulong)uStack_7858 >> 0x20);
        uStack_1b0._0_4_ = (float)uStack_7850;
        uStack_1b0._4_4_ = (float)((ulong)uStack_7850 >> 0x20);
        uStack_1a8._0_4_ = (float)uStack_7848;
        local_2360 = (float)local_4900 * (float)local_1c0;
        fStack_235c = local_4900._4_4_ * local_1c0._4_4_;
        fStack_2358 = (float)uStack_48f8 * (float)uStack_1b8;
        fStack_2354 = uStack_48f8._4_4_ * uStack_1b8._4_4_;
        fStack_2350 = (float)uStack_48f0 * (float)uStack_1b0;
        fStack_234c = uStack_48f0._4_4_ * uStack_1b0._4_4_;
        fStack_2348 = (float)uStack_48e8 * (float)uStack_1a8;
        fVar79 = local_2360 + fVar79;
        fVar81 = fStack_235c + fVar81;
        fVar82 = fStack_2358 + fVar82;
        in_stack_ffffffffffff5b0c = fStack_2354 + in_stack_ffffffffffff5b0c;
        in_stack_ffffffffffff5b10 = fStack_2350 + in_stack_ffffffffffff5b10;
        in_stack_ffffffffffff5b14 = fStack_234c + in_stack_ffffffffffff5b14;
        fVar83 = fStack_2348 + fVar83;
        fVar84 = uStack_48e8._4_4_ + fVar84;
        local_78e0 = CONCAT44(fVar81,fVar79);
        uStack_78d8 = CONCAT44(in_stack_ffffffffffff5b0c,fVar82);
        uStack_78d0 = CONCAT44(in_stack_ffffffffffff5b14,in_stack_ffffffffffff5b10);
        uStack_78c8 = CONCAT44(fVar84,fVar83);
        local_160 = (float)local_4960;
        fStack_15c = local_4960._4_4_;
        fStack_158 = (float)uStack_4958;
        fStack_154 = uStack_4958._4_4_;
        fStack_150 = (float)uStack_4950;
        fStack_14c = uStack_4950._4_4_;
        fStack_148 = (float)uStack_4948;
        fStack_2304 = uStack_4948._4_4_;
        local_180._0_4_ = (float)local_78c0;
        local_180._4_4_ = (float)((ulong)local_78c0 >> 0x20);
        uStack_178._0_4_ = (float)uStack_78b8;
        uStack_178._4_4_ = (float)((ulong)uStack_78b8 >> 0x20);
        uStack_170._0_4_ = (float)uStack_78b0;
        uStack_170._4_4_ = (float)((ulong)uStack_78b0 >> 0x20);
        uStack_168._0_4_ = (float)uStack_78a8;
        local_2320 = (float)local_4960 * (float)local_180;
        fStack_231c = local_4960._4_4_ * local_180._4_4_;
        fStack_2318 = (float)uStack_4958 * (float)uStack_178;
        fStack_2314 = uStack_4958._4_4_ * uStack_178._4_4_;
        fStack_2310 = (float)uStack_4950 * (float)uStack_170;
        fStack_230c = uStack_4950._4_4_ * uStack_170._4_4_;
        fStack_2308 = (float)uStack_4948 * (float)uStack_168;
        fVar79 = local_2320 + fVar79;
        fVar81 = fStack_231c + fVar81;
        fVar82 = fStack_2318 + fVar82;
        in_stack_ffffffffffff5b0c = fStack_2314 + in_stack_ffffffffffff5b0c;
        in_stack_ffffffffffff5b10 = fStack_2310 + in_stack_ffffffffffff5b10;
        in_stack_ffffffffffff5b14 = fStack_230c + in_stack_ffffffffffff5b14;
        fVar83 = fStack_2308 + fVar83;
        fVar84 = uStack_4948._4_4_ + fVar84;
        local_7940 = CONCAT44(fVar81,fVar79);
        uStack_7938 = CONCAT44(in_stack_ffffffffffff5b0c,fVar82);
        uStack_7930 = CONCAT44(in_stack_ffffffffffff5b14,in_stack_ffffffffffff5b10);
        uStack_7928 = CONCAT44(fVar84,fVar83);
        local_120 = (float)local_49c0;
        fStack_11c = local_49c0._4_4_;
        fStack_118 = (float)uStack_49b8;
        fStack_114 = uStack_49b8._4_4_;
        fStack_110 = (float)uStack_49b0;
        fStack_10c = uStack_49b0._4_4_;
        fStack_108 = (float)uStack_49a8;
        fStack_22c4 = uStack_49a8._4_4_;
        local_140._0_4_ = (float)local_7920;
        local_140._4_4_ = (float)((ulong)local_7920 >> 0x20);
        uStack_138._0_4_ = (float)uStack_7918;
        uStack_138._4_4_ = (float)((ulong)uStack_7918 >> 0x20);
        uStack_130._0_4_ = (float)uStack_7910;
        uStack_130._4_4_ = (float)((ulong)uStack_7910 >> 0x20);
        uStack_128._0_4_ = (float)uStack_7908;
        local_22e0 = (float)local_49c0 * (float)local_140;
        fStack_22dc = local_49c0._4_4_ * local_140._4_4_;
        fStack_22d8 = (float)uStack_49b8 * (float)uStack_138;
        fStack_22d4 = uStack_49b8._4_4_ * uStack_138._4_4_;
        fStack_22d0 = (float)uStack_49b0 * (float)uStack_130;
        fStack_22cc = uStack_49b0._4_4_ * uStack_130._4_4_;
        fStack_22c8 = (float)uStack_49a8 * (float)uStack_128;
        fVar79 = local_22e0 + fVar79;
        fVar81 = fStack_22dc + fVar81;
        fVar82 = fStack_22d8 + fVar82;
        in_stack_ffffffffffff5b0c = fStack_22d4 + in_stack_ffffffffffff5b0c;
        in_stack_ffffffffffff5b10 = fStack_22d0 + in_stack_ffffffffffff5b10;
        in_stack_ffffffffffff5b14 = fStack_22cc + in_stack_ffffffffffff5b14;
        fVar83 = fStack_22c8 + fVar83;
        fVar84 = uStack_49a8._4_4_ + fVar84;
        local_79a0 = CONCAT44(fVar81,fVar79);
        uStack_7998 = CONCAT44(in_stack_ffffffffffff5b0c,fVar82);
        uStack_7990 = CONCAT44(in_stack_ffffffffffff5b14,in_stack_ffffffffffff5b10);
        uStack_7988 = CONCAT44(fVar84,fVar83);
        local_e0 = (float)local_4a20;
        fStack_dc = local_4a20._4_4_;
        fStack_d8 = (float)uStack_4a18;
        fStack_d4 = uStack_4a18._4_4_;
        fStack_d0 = (float)uStack_4a10;
        fStack_cc = uStack_4a10._4_4_;
        fStack_c8 = (float)uStack_4a08;
        fStack_2284 = uStack_4a08._4_4_;
        local_100._0_4_ = (float)local_7980;
        local_100._4_4_ = (float)((ulong)local_7980 >> 0x20);
        uStack_f8._0_4_ = (float)uStack_7978;
        uStack_f8._4_4_ = (float)((ulong)uStack_7978 >> 0x20);
        uStack_f0._0_4_ = (float)uStack_7970;
        uStack_f0._4_4_ = (float)((ulong)uStack_7970 >> 0x20);
        uStack_e8._0_4_ = (float)uStack_7968;
        local_22a0 = (float)local_4a20 * (float)local_100;
        fStack_229c = local_4a20._4_4_ * local_100._4_4_;
        fStack_2298 = (float)uStack_4a18 * (float)uStack_f8;
        fStack_2294 = uStack_4a18._4_4_ * uStack_f8._4_4_;
        fStack_2290 = (float)uStack_4a10 * (float)uStack_f0;
        fStack_228c = uStack_4a10._4_4_ * uStack_f0._4_4_;
        fStack_2288 = (float)uStack_4a08 * (float)uStack_e8;
        fVar79 = local_22a0 + fVar79;
        fVar81 = fStack_229c + fVar81;
        fVar82 = fStack_2298 + fVar82;
        in_stack_ffffffffffff5b0c = fStack_2294 + in_stack_ffffffffffff5b0c;
        in_stack_ffffffffffff5b10 = fStack_2290 + in_stack_ffffffffffff5b10;
        in_stack_ffffffffffff5b14 = fStack_228c + in_stack_ffffffffffff5b14;
        fVar83 = fStack_2288 + fVar83;
        fVar84 = uStack_4a08._4_4_ + fVar84;
        local_7a00 = CONCAT44(fVar81,fVar79);
        uStack_79f8 = CONCAT44(in_stack_ffffffffffff5b0c,fVar82);
        uStack_79f0 = CONCAT44(in_stack_ffffffffffff5b14,in_stack_ffffffffffff5b10);
        uStack_79e8 = CONCAT44(fVar84,fVar83);
        local_a0 = (float)local_4a80;
        fStack_9c = local_4a80._4_4_;
        fStack_98 = (float)uStack_4a78;
        fStack_94 = uStack_4a78._4_4_;
        fStack_90 = (float)uStack_4a70;
        fStack_8c = uStack_4a70._4_4_;
        fStack_88 = (float)uStack_4a68;
        fStack_2244 = uStack_4a68._4_4_;
        local_c0._0_4_ = (float)local_79e0;
        local_c0._4_4_ = (float)((ulong)local_79e0 >> 0x20);
        uStack_b8._0_4_ = (float)uStack_79d8;
        uStack_b8._4_4_ = (float)((ulong)uStack_79d8 >> 0x20);
        uStack_b0._0_4_ = (float)uStack_79d0;
        uStack_b0._4_4_ = (float)((ulong)uStack_79d0 >> 0x20);
        uStack_a8._0_4_ = (float)uStack_79c8;
        local_2260 = (float)local_4a80 * (float)local_c0;
        fStack_225c = local_4a80._4_4_ * local_c0._4_4_;
        fStack_2258 = (float)uStack_4a78 * (float)uStack_b8;
        fStack_2254 = uStack_4a78._4_4_ * uStack_b8._4_4_;
        fStack_2250 = (float)uStack_4a70 * (float)uStack_b0;
        fStack_224c = uStack_4a70._4_4_ * uStack_b0._4_4_;
        fStack_2248 = (float)uStack_4a68 * (float)uStack_a8;
        fVar79 = local_2260 + fVar79;
        fVar81 = fStack_225c + fVar81;
        fVar82 = fStack_2258 + fVar82;
        in_stack_ffffffffffff5b0c = fStack_2254 + in_stack_ffffffffffff5b0c;
        in_stack_ffffffffffff5b10 = fStack_2250 + in_stack_ffffffffffff5b10;
        in_stack_ffffffffffff5b14 = fStack_224c + in_stack_ffffffffffff5b14;
        fVar83 = fStack_2248 + fVar83;
        fVar84 = uStack_4a68._4_4_ + fVar84;
        local_7a60 = CONCAT44(fVar81,fVar79);
        uStack_7a58 = CONCAT44(in_stack_ffffffffffff5b0c,fVar82);
        uStack_7a50 = CONCAT44(in_stack_ffffffffffff5b14,in_stack_ffffffffffff5b10);
        uStack_7a48 = CONCAT44(fVar84,fVar83);
        local_60 = (float)local_4ae0;
        fStack_5c = local_4ae0._4_4_;
        fStack_58 = (float)uStack_4ad8;
        fStack_54 = uStack_4ad8._4_4_;
        fStack_50 = (float)uStack_4ad0;
        fStack_4c = uStack_4ad0._4_4_;
        fStack_48 = (float)uStack_4ac8;
        fStack_2204 = uStack_4ac8._4_4_;
        local_80._0_4_ = (float)local_7a40;
        local_80._4_4_ = (float)((ulong)local_7a40 >> 0x20);
        uStack_78._0_4_ = (float)uStack_7a38;
        uStack_78._4_4_ = (float)((ulong)uStack_7a38 >> 0x20);
        uStack_70._0_4_ = (float)uStack_7a30;
        uStack_70._4_4_ = (float)((ulong)uStack_7a30 >> 0x20);
        uStack_68._0_4_ = (float)uStack_7a28;
        local_2220 = (float)local_4ae0 * (float)local_80;
        fStack_221c = local_4ae0._4_4_ * local_80._4_4_;
        fStack_2218 = (float)uStack_4ad8 * (float)uStack_78;
        fStack_2214 = uStack_4ad8._4_4_ * uStack_78._4_4_;
        fStack_2210 = (float)uStack_4ad0 * (float)uStack_70;
        fStack_220c = uStack_4ad0._4_4_ * uStack_70._4_4_;
        fStack_2208 = (float)uStack_4ac8 * (float)uStack_68;
        local_47c0 = CONCAT44(fStack_221c + fVar81,local_2220 + fVar79);
        uStack_47b8 = CONCAT44(fStack_2214 + in_stack_ffffffffffff5b0c,fStack_2218 + fVar82);
        uStack_47b0 = CONCAT44(fStack_220c + in_stack_ffffffffffff5b14,
                               fStack_2210 + in_stack_ffffffffffff5b10);
        uStack_47a8 = CONCAT44(uStack_4ac8._4_4_ + fVar84,fStack_2208 + fVar83);
        local_4788 = local_7dc0;
        *(undefined8 *)local_7dc0 = local_47c0;
        *(undefined8 *)(local_7dc0 + 2) = uStack_47b8;
        *(undefined8 *)(local_7dc0 + 4) = uStack_47b0;
        *(undefined8 *)(local_7dc0 + 6) = uStack_47a8;
        local_7e10 = local_7e10 + 8;
        local_7e18 = local_7e18 + 8;
        local_7e20 = local_7e20 + 8;
        local_7dc0 = local_7dc0 + 8;
        local_7a20 = uVar35;
        uStack_7a18 = uVar36;
        uStack_7a10 = uVar37;
        uStack_7a08 = uVar38;
        local_79c0 = uVar31;
        uStack_79b8 = uVar32;
        uStack_79b0 = uVar33;
        uStack_79a8 = uVar34;
        local_7960 = uVar27;
        uStack_7958 = uVar28;
        uStack_7950 = uVar29;
        uStack_7948 = uVar30;
        local_7900 = uVar23;
        uStack_78f8 = uVar24;
        uStack_78f0 = uVar25;
        uStack_78e8 = uVar26;
        local_78a0 = uVar19;
        uStack_7898 = uVar20;
        uStack_7890 = uVar21;
        uStack_7888 = uVar22;
        local_7840 = uVar15;
        uStack_7838 = uVar16;
        uStack_7830 = uVar17;
        uStack_7828 = uVar18;
        local_77e0 = uVar11;
        uStack_77d8 = uVar12;
        uStack_77d0 = uVar13;
        uStack_77c8 = uVar14;
        local_7780 = uVar7;
        uStack_7778 = uVar8;
        uStack_7770 = uVar9;
        uStack_7768 = uVar10;
        local_7720 = uVar3;
        uStack_7718 = uVar4;
        uStack_7710 = uVar5;
        uStack_7708 = uVar6;
        local_2400 = local_77c0;
        uStack_23f8 = uStack_77b8;
        uStack_23f0 = uStack_77b0;
        uStack_23e8 = uStack_77a8;
        local_23c0 = local_7820;
        uStack_23b8 = uStack_7818;
        uStack_23b0 = uStack_7810;
        uStack_23a8 = uStack_7808;
        local_2380 = local_7880;
        uStack_2378 = uStack_7878;
        uStack_2370 = uStack_7870;
        uStack_2368 = uStack_7868;
        local_2340 = local_78e0;
        uStack_2338 = uStack_78d8;
        uStack_2330 = uStack_78d0;
        uStack_2328 = uStack_78c8;
        local_2300 = local_7940;
        uStack_22f8 = uStack_7938;
        uStack_22f0 = uStack_7930;
        uStack_22e8 = uStack_7928;
        local_22c0 = local_79a0;
        uStack_22b8 = uStack_7998;
        uStack_22b0 = uStack_7990;
        uStack_22a8 = uStack_7988;
        local_2280 = local_7a00;
        uStack_2278 = uStack_79f8;
        uStack_2270 = uStack_79f0;
        uStack_2268 = uStack_79e8;
        local_2240 = local_7a60;
        uStack_2238 = uStack_7a58;
        uStack_2230 = uStack_7a50;
        uStack_2228 = uStack_7a48;
        local_280 = local_7740;
        uStack_278 = uStack_7738;
        uStack_270 = uStack_7730;
        uStack_268 = uStack_7728;
        fStack_244 = fStack_2404;
        local_240 = local_77a0;
        uStack_238 = uStack_7798;
        uStack_230 = uStack_7790;
        uStack_228 = uStack_7788;
        fStack_204 = fStack_23c4;
        local_200 = local_7800;
        uStack_1f8 = uStack_77f8;
        uStack_1f0 = uStack_77f0;
        uStack_1e8 = uStack_77e8;
        fStack_1c4 = fStack_2384;
        local_1c0 = local_7860;
        uStack_1b8 = uStack_7858;
        uStack_1b0 = uStack_7850;
        uStack_1a8 = uStack_7848;
        fStack_184 = fStack_2344;
        local_180 = local_78c0;
        uStack_178 = uStack_78b8;
        uStack_170 = uStack_78b0;
        uStack_168 = uStack_78a8;
        fStack_144 = fStack_2304;
        local_140 = local_7920;
        uStack_138 = uStack_7918;
        uStack_130 = uStack_7910;
        uStack_128 = uStack_7908;
        fStack_104 = fStack_22c4;
        local_100 = local_7980;
        uStack_f8 = uStack_7978;
        uStack_f0 = uStack_7970;
        uStack_e8 = uStack_7968;
        fStack_c4 = fStack_2284;
        local_c0 = local_79e0;
        uStack_b8 = uStack_79d8;
        uStack_b0 = uStack_79d0;
        uStack_a8 = uStack_79c8;
        fStack_84 = fStack_2244;
        local_80 = local_7a40;
        uStack_78 = uStack_7a38;
        uStack_70 = uStack_7a30;
        uStack_68 = uStack_7a28;
        fStack_44 = fStack_2204;
      }
      local_7e10 = local_7e10 + 0x10;
      local_7e18 = local_7e18 + 0x10;
      local_7e20 = local_7e20 + 0x10;
      local_4ae0 = uVar39;
      uStack_4ad8 = uVar40;
      uStack_4ad0 = uVar41;
      uStack_4ac8 = uVar42;
      local_4a80 = uVar43;
      uStack_4a78 = uVar44;
      uStack_4a70 = uVar45;
      uStack_4a68 = uVar46;
      local_4a20 = uVar47;
      uStack_4a18 = uVar48;
      uStack_4a10 = uVar49;
      uStack_4a08 = uVar50;
      local_49c0 = uVar51;
      uStack_49b8 = uVar52;
      uStack_49b0 = uVar53;
      uStack_49a8 = uVar54;
      local_4960 = uVar55;
      uStack_4958 = uVar56;
      uStack_4950 = uVar57;
      uStack_4948 = uVar58;
      local_4900 = uVar59;
      uStack_48f8 = uVar60;
      uStack_48f0 = uVar61;
      uStack_48e8 = uVar62;
      local_48a0 = uVar63;
      uStack_4898 = uVar64;
      uStack_4890 = uVar65;
      uStack_4888 = uVar66;
      local_4840 = uVar67;
      uStack_4838 = uVar68;
      uStack_4830 = uVar69;
      uStack_4828 = uVar70;
      local_47e0 = uVar71;
      uStack_47d8 = uVar72;
      uStack_47d0 = uVar73;
      uStack_47c8 = uVar74;
      local_43c0 = uVar75;
      uStack_43b8 = uVar76;
      uStack_43b0 = uVar77;
      uStack_43a8 = uVar78;
    }
    Mat::~Mat((Mat *)0x6600dc);
    Mat::~Mat((Mat *)0x6600e9);
  }
  return;
}

Assistant:

static void convdw3x3s1_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        __m256 _bias0 = bias ? _mm256_loadu_ps((const float*)bias + g * 8) : _mm256_set1_ps(0.f);

        const float* k0 = kernel.row(g);

        float* outptr0 = out.row(0);

        const Mat img0 = bottom_blob.channel(g);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);

        __m256 _k00 = _mm256_loadu_ps(k0);
        __m256 _k01 = _mm256_loadu_ps(k0 + 8);
        __m256 _k02 = _mm256_loadu_ps(k0 + 16);
        __m256 _k10 = _mm256_loadu_ps(k0 + 24);
        __m256 _k11 = _mm256_loadu_ps(k0 + 32);
        __m256 _k12 = _mm256_loadu_ps(k0 + 40);
        __m256 _k20 = _mm256_loadu_ps(k0 + 48);
        __m256 _k21 = _mm256_loadu_ps(k0 + 56);
        __m256 _k22 = _mm256_loadu_ps(k0 + 64);

        int i = 0;

        for (; i < outh; i++)
        {
            int j = 0;
            for (; j + 7 < outw; j += 8)
            {
                __m256 _sum0 = _bias0;

                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);

                __m256 _sum1 = _bias0;
                __m256 _r03 = _mm256_loadu_ps(r0 + 24);
                __m256 _r13 = _mm256_loadu_ps(r1 + 24);
                __m256 _r23 = _mm256_loadu_ps(r2 + 24);
                _mm256_storeu_ps(outptr0, _sum0);

                _sum1 = _mm256_comp_fmadd_ps(_k00, _r01, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k01, _r02, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k02, _r03, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k10, _r11, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k11, _r12, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k12, _r13, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k20, _r21, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k21, _r22, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k22, _r23, _sum1);

                __m256 _sum2 = _bias0;
                __m256 _r04 = _mm256_loadu_ps(r0 + 32);
                __m256 _r14 = _mm256_loadu_ps(r1 + 32);
                __m256 _r24 = _mm256_loadu_ps(r2 + 32);
                _mm256_storeu_ps(outptr0 + 8, _sum1);

                _sum2 = _mm256_comp_fmadd_ps(_k00, _r02, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k01, _r03, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k02, _r04, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k10, _r12, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k11, _r13, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k12, _r14, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k20, _r22, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k21, _r23, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k22, _r24, _sum2);

                __m256 _sum3 = _bias0;
                __m256 _r05 = _mm256_loadu_ps(r0 + 40);
                __m256 _r15 = _mm256_loadu_ps(r1 + 40);
                __m256 _r25 = _mm256_loadu_ps(r2 + 40);
                _mm256_storeu_ps(outptr0 + 16, _sum2);

                _sum3 = _mm256_comp_fmadd_ps(_k00, _r03, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k01, _r04, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k02, _r05, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k10, _r13, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k11, _r14, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k12, _r15, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k20, _r23, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k21, _r24, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k22, _r25, _sum3);

                __m256 _sum4 = _bias0;
                __m256 _r06 = _mm256_loadu_ps(r0 + 48);
                __m256 _r16 = _mm256_loadu_ps(r1 + 48);
                __m256 _r26 = _mm256_loadu_ps(r2 + 48);
                _mm256_storeu_ps(outptr0 + 24, _sum3);

                _sum4 = _mm256_comp_fmadd_ps(_k00, _r04, _sum4);
                _sum4 = _mm256_comp_fmadd_ps(_k01, _r05, _sum4);
                _sum4 = _mm256_comp_fmadd_ps(_k02, _r06, _sum4);
                _sum4 = _mm256_comp_fmadd_ps(_k10, _r14, _sum4);
                _sum4 = _mm256_comp_fmadd_ps(_k11, _r15, _sum4);
                _sum4 = _mm256_comp_fmadd_ps(_k12, _r16, _sum4);
                _sum4 = _mm256_comp_fmadd_ps(_k20, _r24, _sum4);
                _sum4 = _mm256_comp_fmadd_ps(_k21, _r25, _sum4);
                _sum4 = _mm256_comp_fmadd_ps(_k22, _r26, _sum4);

                __m256 _sum5 = _bias0;
                __m256 _r07 = _mm256_loadu_ps(r0 + 56);
                __m256 _r17 = _mm256_loadu_ps(r1 + 56);
                __m256 _r27 = _mm256_loadu_ps(r2 + 56);
                _mm256_storeu_ps(outptr0 + 32, _sum4);

                _sum5 = _mm256_comp_fmadd_ps(_k00, _r05, _sum5);
                _sum5 = _mm256_comp_fmadd_ps(_k01, _r06, _sum5);
                _sum5 = _mm256_comp_fmadd_ps(_k02, _r07, _sum5);
                _sum5 = _mm256_comp_fmadd_ps(_k10, _r15, _sum5);
                _sum5 = _mm256_comp_fmadd_ps(_k11, _r16, _sum5);
                _sum5 = _mm256_comp_fmadd_ps(_k12, _r17, _sum5);
                _sum5 = _mm256_comp_fmadd_ps(_k20, _r25, _sum5);
                _sum5 = _mm256_comp_fmadd_ps(_k21, _r26, _sum5);
                _sum5 = _mm256_comp_fmadd_ps(_k22, _r27, _sum5);

                __m256 _sum6 = _bias0;
                __m256 _r08 = _mm256_loadu_ps(r0 + 64);
                __m256 _r18 = _mm256_loadu_ps(r1 + 64);
                __m256 _r28 = _mm256_loadu_ps(r2 + 64);
                _mm256_storeu_ps(outptr0 + 40, _sum5);

                _sum6 = _mm256_comp_fmadd_ps(_k00, _r06, _sum6);
                _sum6 = _mm256_comp_fmadd_ps(_k01, _r07, _sum6);
                _sum6 = _mm256_comp_fmadd_ps(_k02, _r08, _sum6);
                _sum6 = _mm256_comp_fmadd_ps(_k10, _r16, _sum6);
                _sum6 = _mm256_comp_fmadd_ps(_k11, _r17, _sum6);
                _sum6 = _mm256_comp_fmadd_ps(_k12, _r18, _sum6);
                _sum6 = _mm256_comp_fmadd_ps(_k20, _r26, _sum6);
                _sum6 = _mm256_comp_fmadd_ps(_k21, _r27, _sum6);
                _sum6 = _mm256_comp_fmadd_ps(_k22, _r28, _sum6);

                __m256 _sum7 = _bias0;
                __m256 _r09 = _mm256_loadu_ps(r0 + 72);
                __m256 _r19 = _mm256_loadu_ps(r1 + 72);
                __m256 _r29 = _mm256_loadu_ps(r2 + 72);
                _mm256_storeu_ps(outptr0 + 48, _sum6);

                _sum7 = _mm256_comp_fmadd_ps(_k00, _r07, _sum7);
                _sum7 = _mm256_comp_fmadd_ps(_k01, _r08, _sum7);
                _sum7 = _mm256_comp_fmadd_ps(_k02, _r09, _sum7);
                _sum7 = _mm256_comp_fmadd_ps(_k10, _r17, _sum7);
                _sum7 = _mm256_comp_fmadd_ps(_k11, _r18, _sum7);
                _sum7 = _mm256_comp_fmadd_ps(_k12, _r19, _sum7);
                _sum7 = _mm256_comp_fmadd_ps(_k20, _r27, _sum7);
                _sum7 = _mm256_comp_fmadd_ps(_k21, _r28, _sum7);
                _sum7 = _mm256_comp_fmadd_ps(_k22, _r29, _sum7);
                _mm256_storeu_ps(outptr0 + 56, _sum7);

                r0 += 64;
                r1 += 64;
                r2 += 64;
                outptr0 += 64;
            }
            for (; j + 3 < outw; j += 4)
            {
                __m256 _sum0 = _bias0;

                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);

                __m256 _sum1 = _bias0;
                __m256 _r03 = _mm256_loadu_ps(r0 + 24);
                __m256 _r13 = _mm256_loadu_ps(r1 + 24);
                __m256 _r23 = _mm256_loadu_ps(r2 + 24);
                _mm256_storeu_ps(outptr0, _sum0);

                _sum1 = _mm256_comp_fmadd_ps(_k00, _r01, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k01, _r02, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k02, _r03, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k10, _r11, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k11, _r12, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k12, _r13, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k20, _r21, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k21, _r22, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k22, _r23, _sum1);

                __m256 _sum2 = _bias0;
                __m256 _r04 = _mm256_loadu_ps(r0 + 32);
                __m256 _r14 = _mm256_loadu_ps(r1 + 32);
                __m256 _r24 = _mm256_loadu_ps(r2 + 32);
                _mm256_storeu_ps(outptr0 + 8, _sum1);

                _sum2 = _mm256_comp_fmadd_ps(_k00, _r02, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k01, _r03, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k02, _r04, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k10, _r12, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k11, _r13, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k12, _r14, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k20, _r22, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k21, _r23, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k22, _r24, _sum2);

                __m256 _sum3 = _bias0;
                __m256 _r05 = _mm256_loadu_ps(r0 + 40);
                __m256 _r15 = _mm256_loadu_ps(r1 + 40);
                __m256 _r25 = _mm256_loadu_ps(r2 + 40);
                _mm256_storeu_ps(outptr0 + 16, _sum2);

                _sum3 = _mm256_comp_fmadd_ps(_k00, _r03, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k01, _r04, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k02, _r05, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k10, _r13, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k11, _r14, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k12, _r15, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k20, _r23, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k21, _r24, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k22, _r25, _sum3);

                _mm256_storeu_ps(outptr0 + 24, _sum3);

                r0 += 32;
                r1 += 32;
                r2 += 32;
                outptr0 += 32;
            }
            for (; j + 1 < outw; j += 2)
            {
                __m256 _sum0 = _bias0;

                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);

                __m256 _sum1 = _bias0;
                __m256 _r03 = _mm256_loadu_ps(r0 + 24);
                __m256 _r13 = _mm256_loadu_ps(r1 + 24);
                __m256 _r23 = _mm256_loadu_ps(r2 + 24);
                _mm256_storeu_ps(outptr0, _sum0);

                _sum1 = _mm256_comp_fmadd_ps(_k00, _r01, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k01, _r02, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k02, _r03, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k10, _r11, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k11, _r12, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k12, _r13, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k20, _r21, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k21, _r22, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k22, _r23, _sum1);

                _mm256_storeu_ps(outptr0 + 8, _sum1);

                r0 += 16;
                r1 += 16;
                r2 += 16;
                outptr0 += 16;
            }
            for (; j < outw; j++)
            {
                __m256 _sum0 = _bias0;

                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);

                _mm256_storeu_ps(outptr0, _sum0);

                r0 += 8;
                r1 += 8;
                r2 += 8;
                outptr0 += 8;
            }

            r0 += 2 * 8;
            r1 += 2 * 8;
            r2 += 2 * 8;
        }
    }
}